

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_2x2_pack8.h
# Opt level: O0

void ncnn::conv2x2s1_pack8_avx(Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  undefined8 uVar38;
  undefined8 uVar39;
  undefined8 uVar40;
  undefined8 uVar41;
  undefined8 uVar42;
  undefined8 uVar43;
  undefined8 uVar44;
  undefined8 uVar45;
  undefined8 uVar46;
  undefined8 uVar47;
  undefined8 uVar48;
  undefined8 uVar49;
  undefined8 uVar50;
  undefined8 uVar51;
  undefined8 uVar52;
  undefined8 uVar53;
  undefined8 uVar54;
  undefined8 uVar55;
  undefined8 uVar56;
  undefined8 uVar57;
  undefined8 uVar58;
  undefined8 uVar59;
  undefined8 uVar60;
  undefined8 uVar61;
  undefined8 uVar62;
  undefined8 uVar63;
  undefined8 uVar64;
  undefined8 uVar65;
  undefined8 uVar66;
  undefined8 uVar67;
  undefined8 uVar68;
  undefined8 uVar69;
  undefined8 uVar70;
  undefined8 uVar71;
  undefined8 uVar72;
  undefined8 uVar73;
  undefined8 uVar74;
  undefined8 uVar75;
  undefined8 uVar76;
  undefined8 uVar77;
  undefined8 uVar78;
  undefined8 uVar79;
  undefined8 uVar80;
  undefined8 uVar81;
  undefined8 uVar82;
  undefined8 uVar83;
  undefined8 uVar84;
  undefined8 uVar85;
  undefined8 uVar86;
  undefined8 uVar87;
  undefined8 uVar88;
  undefined8 uVar89;
  undefined8 uVar90;
  undefined8 uVar91;
  undefined8 uVar92;
  undefined8 uVar93;
  undefined8 uVar94;
  undefined8 uVar95;
  undefined8 uVar96;
  undefined8 uVar97;
  undefined8 uVar98;
  undefined8 uVar99;
  undefined8 uVar100;
  undefined8 uVar101;
  undefined8 uVar102;
  undefined8 uVar103;
  undefined8 uVar104;
  undefined8 uVar105;
  undefined8 uVar106;
  undefined8 uVar107;
  undefined8 uVar108;
  undefined8 uVar109;
  undefined8 uVar110;
  undefined8 uVar111;
  undefined8 uVar112;
  undefined8 uVar113;
  undefined8 uVar114;
  undefined8 uVar115;
  undefined8 uVar116;
  undefined8 uVar117;
  undefined8 uVar118;
  undefined8 uVar119;
  undefined8 uVar120;
  undefined8 uVar121;
  undefined8 uVar122;
  undefined8 uVar123;
  undefined8 uVar124;
  undefined8 uVar125;
  undefined8 uVar126;
  undefined8 uVar127;
  undefined8 uVar128;
  undefined8 uVar129;
  undefined8 uVar130;
  __m256 _v;
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  float *pfVar133;
  Mat *in_RCX;
  long in_RSI;
  long in_RDI;
  float fVar134;
  float fVar135;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  undefined1 auVar136 [32];
  float fVar149;
  __m256 _k17_1;
  __m256 _k16_1;
  __m256 _k15_1;
  __m256 _k14_1;
  __m256 _k13_1;
  __m256 _k12_1;
  __m256 _k11_1;
  __m256 _k10_1;
  __m256 _r17_1;
  __m256 _r16_1;
  __m256 _r15_1;
  __m256 _r14_1;
  __m256 _r13_1;
  __m256 _r12_1;
  __m256 _r11_1;
  __m256 _r10_1;
  __m256 _k07_1;
  __m256 _k06_1;
  __m256 _k05_1;
  __m256 _k04_1;
  __m256 _k03_1;
  __m256 _k02_1;
  __m256 _k01_1;
  __m256 _k00_1;
  __m256 _r07_1;
  __m256 _r06_1;
  __m256 _r05_1;
  __m256 _r04_1;
  __m256 _r03_1;
  __m256 _r02_1;
  __m256 _r01_1;
  __m256 _r00_1;
  __m256 _sum;
  __m256 _k17;
  __m256 _k16;
  __m256 _k15;
  __m256 _k14;
  __m256 _k13;
  __m256 _k12;
  __m256 _k11;
  __m256 _k10;
  __m256 _r17;
  __m256 _r16;
  __m256 _r15;
  __m256 _r14;
  __m256 _r13;
  __m256 _r12;
  __m256 _r11;
  __m256 _r10;
  __m256 _k07;
  __m256 _k06;
  __m256 _k05;
  __m256 _k04;
  __m256 _k03;
  __m256 _k02;
  __m256 _k01;
  __m256 _k00;
  __m256 _r07;
  __m256 _r06;
  __m256 _r05;
  __m256 _r04;
  __m256 _r03;
  __m256 _r02;
  __m256 _r01;
  __m256 _r00;
  __m256 _sum1;
  __m256 _sum0;
  int j;
  int i;
  float *kptr;
  float *r1;
  float *r0;
  Mat img0;
  float *outptr0;
  int q;
  __m256 _bias0;
  Mat out0;
  int p;
  float *bias;
  int outch;
  int outh;
  int outw;
  int inch;
  float in_stack_ffffffffffff6bd8;
  float in_stack_ffffffffffff6bdc;
  float in_stack_ffffffffffff6be0;
  float in_stack_ffffffffffff6be4;
  float in_stack_ffffffffffff6be8;
  float in_stack_ffffffffffff6bec;
  float in_stack_ffffffffffff6bf0;
  float in_stack_ffffffffffff6bf4;
  float in_stack_ffffffffffff6c10;
  float in_stack_ffffffffffff6c14;
  undefined8 local_75a0;
  undefined8 uStack_7598;
  undefined8 uStack_7590;
  undefined8 uStack_7588;
  int local_6ce8;
  int local_6ce4;
  Mat local_6ce0;
  float *local_6c98;
  float *local_6c90;
  float *local_6c88;
  Mat local_6c80;
  undefined1 (*local_6c38) [32];
  int local_6c30;
  undefined8 local_6c20;
  undefined8 uStack_6c18;
  undefined8 uStack_6c10;
  undefined8 uStack_6c08;
  Mat local_6bf8;
  int local_6bac;
  float *local_6ba8;
  int local_6ba0;
  int local_6b9c;
  int local_6b98;
  int local_6b94;
  undefined4 local_6b64;
  float *local_6b60;
  float *local_6b58;
  float *local_6b50;
  float *local_6b48;
  float *local_6b40;
  float *local_6b38;
  float *local_6b30;
  float *local_6b28;
  float *local_6b20;
  float *local_6b18;
  float *local_6b10;
  float *local_6b08;
  float *local_6b00;
  float *local_6af8;
  float *local_6af0;
  float *local_6ae8;
  float *local_6ae0;
  float *local_6ad8;
  float *local_6ad0;
  float *local_6ac8;
  float *local_6ac0;
  float *local_6ab8;
  float *local_6ab0;
  float *local_6aa8;
  float *local_6aa0;
  float *local_6a98;
  float *local_6a90;
  float *local_6a88;
  float *local_6a80;
  float *local_6a78;
  float *local_6a70;
  float *local_6a68;
  undefined1 (*local_6a60) [32];
  float *local_6a58;
  float *local_6a50;
  float *local_6a48;
  float *local_6a40;
  float *local_6a38;
  float *local_6a30;
  float *local_6a28;
  float *local_6a20;
  float *local_6a18;
  float *local_6a10;
  float *local_6a08;
  float *local_6a00;
  float *local_69f8;
  float *local_69f0;
  float *local_69e8;
  float *local_69e0;
  float *local_69d8;
  float *local_69d0;
  float *local_69c8;
  float *local_69c0;
  float *local_69b8;
  float *local_69b0;
  float *local_69a8;
  float *local_69a0;
  float *local_6998;
  float *local_6990;
  float *local_6988;
  float *local_6980;
  float *local_6978;
  float *local_6970;
  float *local_6968;
  float *local_6960;
  undefined1 (*local_6958) [32];
  undefined1 (*local_6950) [32];
  float *local_6948;
  float local_6940;
  float fStack_693c;
  float fStack_6938;
  float fStack_6934;
  float fStack_6930;
  float fStack_692c;
  float fStack_6928;
  float fStack_6924;
  float local_690c;
  float *local_6908;
  float local_6900;
  float fStack_68fc;
  float fStack_68f8;
  float fStack_68f4;
  float fStack_68f0;
  float fStack_68ec;
  float fStack_68e8;
  float fStack_68e4;
  float local_68cc;
  float *local_68c8;
  float local_68c0;
  float fStack_68bc;
  float fStack_68b8;
  float fStack_68b4;
  float fStack_68b0;
  float fStack_68ac;
  float fStack_68a8;
  float fStack_68a4;
  float local_688c;
  float *local_6888;
  float local_6880;
  float fStack_687c;
  float fStack_6878;
  float fStack_6874;
  float fStack_6870;
  float fStack_686c;
  float fStack_6868;
  float fStack_6864;
  float local_684c;
  float *local_6848;
  float local_6840;
  float fStack_683c;
  float fStack_6838;
  float fStack_6834;
  float fStack_6830;
  float fStack_682c;
  float fStack_6828;
  float fStack_6824;
  float local_680c;
  float *local_6808;
  float local_6800;
  float fStack_67fc;
  float fStack_67f8;
  float fStack_67f4;
  float fStack_67f0;
  float fStack_67ec;
  float fStack_67e8;
  float fStack_67e4;
  float local_67cc;
  float *local_67c8;
  float local_67c0;
  float fStack_67bc;
  float fStack_67b8;
  float fStack_67b4;
  float fStack_67b0;
  float fStack_67ac;
  float fStack_67a8;
  float fStack_67a4;
  float local_678c;
  float *local_6788;
  float local_6780;
  float fStack_677c;
  float fStack_6778;
  float fStack_6774;
  float fStack_6770;
  float fStack_676c;
  float fStack_6768;
  float fStack_6764;
  float local_674c;
  float *local_6748;
  float local_6740;
  float fStack_673c;
  float fStack_6738;
  float fStack_6734;
  float fStack_6730;
  float fStack_672c;
  float fStack_6728;
  float fStack_6724;
  float local_670c;
  float *local_6708;
  float local_6700;
  float fStack_66fc;
  float fStack_66f8;
  float fStack_66f4;
  float fStack_66f0;
  float fStack_66ec;
  float fStack_66e8;
  float fStack_66e4;
  float local_66cc;
  float *local_66c8;
  float local_66c0;
  float fStack_66bc;
  float fStack_66b8;
  float fStack_66b4;
  float fStack_66b0;
  float fStack_66ac;
  float fStack_66a8;
  float fStack_66a4;
  float local_668c;
  float *local_6688;
  float local_6680;
  float fStack_667c;
  float fStack_6678;
  float fStack_6674;
  float fStack_6670;
  float fStack_666c;
  float fStack_6668;
  float fStack_6664;
  float local_664c;
  float *local_6648;
  float local_6640;
  float fStack_663c;
  float fStack_6638;
  float fStack_6634;
  float fStack_6630;
  float fStack_662c;
  float fStack_6628;
  float fStack_6624;
  float local_660c;
  float *local_6608;
  float local_6600;
  float fStack_65fc;
  float fStack_65f8;
  float fStack_65f4;
  float fStack_65f0;
  float fStack_65ec;
  float fStack_65e8;
  float fStack_65e4;
  float local_65cc;
  float *local_65c8;
  float local_65c0;
  float fStack_65bc;
  float fStack_65b8;
  float fStack_65b4;
  float fStack_65b0;
  float fStack_65ac;
  float fStack_65a8;
  float fStack_65a4;
  float local_658c;
  float *local_6588;
  float local_6580;
  float fStack_657c;
  float fStack_6578;
  float fStack_6574;
  float fStack_6570;
  float fStack_656c;
  float fStack_6568;
  float fStack_6564;
  float local_654c;
  float *local_6548;
  float local_6540;
  float fStack_653c;
  float fStack_6538;
  float fStack_6534;
  float fStack_6530;
  float fStack_652c;
  float fStack_6528;
  float fStack_6524;
  float local_650c;
  float *local_6508;
  float local_6500;
  float fStack_64fc;
  float fStack_64f8;
  float fStack_64f4;
  float fStack_64f0;
  float fStack_64ec;
  float fStack_64e8;
  float fStack_64e4;
  float local_64cc;
  float *local_64c8;
  float local_64c0;
  float fStack_64bc;
  float fStack_64b8;
  float fStack_64b4;
  float fStack_64b0;
  float fStack_64ac;
  float fStack_64a8;
  float fStack_64a4;
  float local_648c;
  float *local_6488;
  float local_6480;
  float fStack_647c;
  float fStack_6478;
  float fStack_6474;
  float fStack_6470;
  float fStack_646c;
  float fStack_6468;
  float fStack_6464;
  float local_644c;
  float *local_6448;
  float local_6440;
  float fStack_643c;
  float fStack_6438;
  float fStack_6434;
  float fStack_6430;
  float fStack_642c;
  float fStack_6428;
  float fStack_6424;
  float local_640c;
  float *local_6408;
  float local_6400;
  float fStack_63fc;
  float fStack_63f8;
  float fStack_63f4;
  float fStack_63f0;
  float fStack_63ec;
  float fStack_63e8;
  float fStack_63e4;
  float local_63cc;
  float *local_63c8;
  float local_63c0;
  float fStack_63bc;
  float fStack_63b8;
  float fStack_63b4;
  float fStack_63b0;
  float fStack_63ac;
  float fStack_63a8;
  float fStack_63a4;
  float local_638c;
  float *local_6388;
  float local_6380;
  float fStack_637c;
  float fStack_6378;
  float fStack_6374;
  float fStack_6370;
  float fStack_636c;
  float fStack_6368;
  float fStack_6364;
  float local_634c;
  float *local_6348;
  float local_6340;
  float fStack_633c;
  float fStack_6338;
  float fStack_6334;
  float fStack_6330;
  float fStack_632c;
  float fStack_6328;
  float fStack_6324;
  float local_630c;
  float *local_6308;
  float local_6300;
  float fStack_62fc;
  float fStack_62f8;
  float fStack_62f4;
  float fStack_62f0;
  float fStack_62ec;
  float fStack_62e8;
  float fStack_62e4;
  float local_62cc;
  float *local_62c8;
  float local_62c0;
  float fStack_62bc;
  float fStack_62b8;
  float fStack_62b4;
  float fStack_62b0;
  float fStack_62ac;
  float fStack_62a8;
  float fStack_62a4;
  float local_628c;
  float *local_6288;
  float local_6280;
  float fStack_627c;
  float fStack_6278;
  float fStack_6274;
  float fStack_6270;
  float fStack_626c;
  float fStack_6268;
  float fStack_6264;
  float local_624c;
  float *local_6248;
  float local_6240;
  float fStack_623c;
  float fStack_6238;
  float fStack_6234;
  float fStack_6230;
  float fStack_622c;
  float fStack_6228;
  float fStack_6224;
  float local_620c;
  float *local_6208;
  float local_6200;
  float fStack_61fc;
  float fStack_61f8;
  float fStack_61f4;
  float fStack_61f0;
  float fStack_61ec;
  float fStack_61e8;
  float fStack_61e4;
  float local_61cc;
  float *local_61c8;
  float local_61c0;
  float fStack_61bc;
  float fStack_61b8;
  float fStack_61b4;
  float fStack_61b0;
  float fStack_61ac;
  float fStack_61a8;
  float fStack_61a4;
  float local_618c;
  float *local_6188;
  float local_6180;
  float fStack_617c;
  float fStack_6178;
  float fStack_6174;
  float fStack_6170;
  float fStack_616c;
  float fStack_6168;
  float fStack_6164;
  float local_614c;
  float *local_6148;
  float local_6140;
  float fStack_613c;
  float fStack_6138;
  float fStack_6134;
  float fStack_6130;
  float fStack_612c;
  float fStack_6128;
  float fStack_6124;
  float local_610c;
  float *local_6108;
  float local_6100;
  float fStack_60fc;
  float fStack_60f8;
  float fStack_60f4;
  float fStack_60f0;
  float fStack_60ec;
  float fStack_60e8;
  float fStack_60e4;
  float local_60cc;
  float *local_60c8;
  float local_60c0;
  float fStack_60bc;
  float fStack_60b8;
  float fStack_60b4;
  float fStack_60b0;
  float fStack_60ac;
  float fStack_60a8;
  float fStack_60a4;
  float local_608c;
  float *local_6088;
  float local_6080;
  float fStack_607c;
  float fStack_6078;
  float fStack_6074;
  float fStack_6070;
  float fStack_606c;
  float fStack_6068;
  float fStack_6064;
  float local_604c;
  float *local_6048;
  float local_6040;
  float fStack_603c;
  float fStack_6038;
  float fStack_6034;
  float fStack_6030;
  float fStack_602c;
  float fStack_6028;
  float fStack_6024;
  float local_600c;
  float *local_6008;
  float local_6000;
  float fStack_5ffc;
  float fStack_5ff8;
  float fStack_5ff4;
  float fStack_5ff0;
  float fStack_5fec;
  float fStack_5fe8;
  float fStack_5fe4;
  float local_5fcc;
  float *local_5fc8;
  float local_5fc0;
  float fStack_5fbc;
  float fStack_5fb8;
  float fStack_5fb4;
  float fStack_5fb0;
  float fStack_5fac;
  float fStack_5fa8;
  float fStack_5fa4;
  float local_5f8c;
  float *local_5f88;
  float local_5f80;
  float fStack_5f7c;
  float fStack_5f78;
  float fStack_5f74;
  float fStack_5f70;
  float fStack_5f6c;
  float fStack_5f68;
  float fStack_5f64;
  float local_5f4c;
  float *local_5f48;
  float local_5f40;
  float fStack_5f3c;
  float fStack_5f38;
  float fStack_5f34;
  float fStack_5f30;
  float fStack_5f2c;
  float fStack_5f28;
  float fStack_5f24;
  float local_5f0c;
  float *local_5f08;
  float local_5f00;
  float fStack_5efc;
  float fStack_5ef8;
  float fStack_5ef4;
  float fStack_5ef0;
  float fStack_5eec;
  float fStack_5ee8;
  float fStack_5ee4;
  float local_5ecc;
  float *local_5ec8;
  float local_5ec0;
  float fStack_5ebc;
  float fStack_5eb8;
  float fStack_5eb4;
  float fStack_5eb0;
  float fStack_5eac;
  float fStack_5ea8;
  float fStack_5ea4;
  float local_5e8c;
  float *local_5e88;
  float local_5e80;
  float fStack_5e7c;
  float fStack_5e78;
  float fStack_5e74;
  float fStack_5e70;
  float fStack_5e6c;
  float fStack_5e68;
  float fStack_5e64;
  float local_5e4c;
  float *local_5e48;
  float local_5e40;
  float fStack_5e3c;
  float fStack_5e38;
  float fStack_5e34;
  float fStack_5e30;
  float fStack_5e2c;
  float fStack_5e28;
  float fStack_5e24;
  float local_5e0c;
  float *local_5e08;
  float local_5e00;
  float fStack_5dfc;
  float fStack_5df8;
  float fStack_5df4;
  float fStack_5df0;
  float fStack_5dec;
  float fStack_5de8;
  float fStack_5de4;
  float local_5dcc;
  float *local_5dc8;
  float local_5dc0;
  float fStack_5dbc;
  float fStack_5db8;
  float fStack_5db4;
  float fStack_5db0;
  float fStack_5dac;
  float fStack_5da8;
  float fStack_5da4;
  float local_5d8c;
  float *local_5d88;
  float local_5d80;
  float fStack_5d7c;
  float fStack_5d78;
  float fStack_5d74;
  float fStack_5d70;
  float fStack_5d6c;
  float fStack_5d68;
  float fStack_5d64;
  float local_5d4c;
  float *local_5d48;
  float local_5d40;
  float fStack_5d3c;
  float fStack_5d38;
  float fStack_5d34;
  float fStack_5d30;
  float fStack_5d2c;
  float fStack_5d28;
  float fStack_5d24;
  float local_5d0c;
  float *local_5d08;
  float local_5d00;
  float fStack_5cfc;
  float fStack_5cf8;
  float fStack_5cf4;
  float fStack_5cf0;
  float fStack_5cec;
  float fStack_5ce8;
  float fStack_5ce4;
  float local_5ccc;
  float *local_5cc8;
  float local_5cc0;
  float fStack_5cbc;
  float fStack_5cb8;
  float fStack_5cb4;
  float fStack_5cb0;
  float fStack_5cac;
  float fStack_5ca8;
  float fStack_5ca4;
  float local_5c8c;
  float *local_5c88;
  float local_5c80;
  float fStack_5c7c;
  float fStack_5c78;
  float fStack_5c74;
  float fStack_5c70;
  float fStack_5c6c;
  float fStack_5c68;
  float fStack_5c64;
  float local_5c4c;
  float *local_5c48;
  float local_5c40;
  float fStack_5c3c;
  float fStack_5c38;
  float fStack_5c34;
  float fStack_5c30;
  float fStack_5c2c;
  float fStack_5c28;
  float fStack_5c24;
  float local_5c0c;
  float *local_5c08;
  float local_5c00;
  float fStack_5bfc;
  float fStack_5bf8;
  float fStack_5bf4;
  float fStack_5bf0;
  float fStack_5bec;
  float fStack_5be8;
  float fStack_5be4;
  float local_5bcc;
  float *local_5bc8;
  float local_5bc0;
  float fStack_5bbc;
  float fStack_5bb8;
  float fStack_5bb4;
  float fStack_5bb0;
  float fStack_5bac;
  float fStack_5ba8;
  float fStack_5ba4;
  float local_5b8c;
  float *local_5b88;
  float local_5b80;
  float fStack_5b7c;
  float fStack_5b78;
  float fStack_5b74;
  float fStack_5b70;
  float fStack_5b6c;
  float fStack_5b68;
  float fStack_5b64;
  float local_5b4c;
  float *local_5b48;
  float local_5b40;
  float fStack_5b3c;
  float fStack_5b38;
  float fStack_5b34;
  float fStack_5b30;
  float fStack_5b2c;
  float fStack_5b28;
  float fStack_5b24;
  float local_5b0c;
  float *local_5b08;
  float local_5b00;
  float fStack_5afc;
  float fStack_5af8;
  float fStack_5af4;
  float fStack_5af0;
  float fStack_5aec;
  float fStack_5ae8;
  float fStack_5ae4;
  float local_5acc;
  float *local_5ac8;
  float local_5ac0;
  float fStack_5abc;
  float fStack_5ab8;
  float fStack_5ab4;
  float fStack_5ab0;
  float fStack_5aac;
  float fStack_5aa8;
  float fStack_5aa4;
  float local_5a8c;
  float *local_5a88;
  float local_5a80;
  float fStack_5a7c;
  float fStack_5a78;
  float fStack_5a74;
  float fStack_5a70;
  float fStack_5a6c;
  float fStack_5a68;
  float fStack_5a64;
  float local_5a4c;
  float *local_5a48;
  float local_5a40;
  float fStack_5a3c;
  float fStack_5a38;
  float fStack_5a34;
  float fStack_5a30;
  float fStack_5a2c;
  float fStack_5a28;
  float fStack_5a24;
  float local_5a0c;
  float *local_5a08;
  float local_5a00;
  float fStack_59fc;
  float fStack_59f8;
  float fStack_59f4;
  float fStack_59f0;
  float fStack_59ec;
  float fStack_59e8;
  float fStack_59e4;
  float local_59cc;
  float *local_59c8;
  float local_59c0;
  float fStack_59bc;
  float fStack_59b8;
  float fStack_59b4;
  float fStack_59b0;
  float fStack_59ac;
  float fStack_59a8;
  float fStack_59a4;
  float local_598c;
  float *local_5988;
  float local_5980;
  float fStack_597c;
  float fStack_5978;
  float fStack_5974;
  float fStack_5970;
  float fStack_596c;
  float fStack_5968;
  float fStack_5964;
  float local_594c;
  float *local_5948;
  float local_5940;
  float fStack_593c;
  float fStack_5938;
  float fStack_5934;
  float fStack_5930;
  float fStack_592c;
  float fStack_5928;
  float fStack_5924;
  float local_590c;
  float *local_5908;
  float local_5900;
  float fStack_58fc;
  float fStack_58f8;
  float fStack_58f4;
  float fStack_58f0;
  float fStack_58ec;
  float fStack_58e8;
  float fStack_58e4;
  float local_58cc;
  float *local_58c8;
  float local_58c0;
  float fStack_58bc;
  float fStack_58b8;
  float fStack_58b4;
  float fStack_58b0;
  float fStack_58ac;
  float fStack_58a8;
  float fStack_58a4;
  float local_588c;
  float *local_5888;
  float local_5880;
  float fStack_587c;
  float fStack_5878;
  float fStack_5874;
  float fStack_5870;
  float fStack_586c;
  float fStack_5868;
  float fStack_5864;
  float local_584c;
  float *local_5848;
  float local_5840;
  float fStack_583c;
  float fStack_5838;
  float fStack_5834;
  float fStack_5830;
  float fStack_582c;
  float fStack_5828;
  float fStack_5824;
  float local_580c;
  float *local_5808;
  float local_5800;
  float fStack_57fc;
  float fStack_57f8;
  float fStack_57f4;
  float fStack_57f0;
  float fStack_57ec;
  float fStack_57e8;
  float fStack_57e4;
  float local_57cc;
  float *local_57c8;
  float local_57c0;
  float fStack_57bc;
  float fStack_57b8;
  float fStack_57b4;
  float fStack_57b0;
  float fStack_57ac;
  float fStack_57a8;
  float fStack_57a4;
  float local_578c;
  float *local_5788;
  float local_5780;
  float fStack_577c;
  float fStack_5778;
  float fStack_5774;
  float fStack_5770;
  float fStack_576c;
  float fStack_5768;
  float fStack_5764;
  float local_574c;
  float *local_5748;
  float local_5740;
  float fStack_573c;
  float fStack_5738;
  float fStack_5734;
  float fStack_5730;
  float fStack_572c;
  float fStack_5728;
  float fStack_5724;
  float local_570c;
  float *local_5708;
  float local_5700;
  float fStack_56fc;
  float fStack_56f8;
  float fStack_56f4;
  float fStack_56f0;
  float fStack_56ec;
  float fStack_56e8;
  float fStack_56e4;
  float local_56cc;
  float *local_56c8;
  float local_56c0;
  float fStack_56bc;
  float fStack_56b8;
  float fStack_56b4;
  float fStack_56b0;
  float fStack_56ac;
  float fStack_56a8;
  float fStack_56a4;
  float local_568c;
  float *local_5688;
  float local_5680;
  float fStack_567c;
  float fStack_5678;
  float fStack_5674;
  float fStack_5670;
  float fStack_566c;
  float fStack_5668;
  float fStack_5664;
  float local_564c;
  float *local_5648;
  float local_5640;
  float fStack_563c;
  float fStack_5638;
  float fStack_5634;
  float fStack_5630;
  float fStack_562c;
  float fStack_5628;
  float fStack_5624;
  float local_560c;
  float *local_5608;
  float local_5600;
  float fStack_55fc;
  float fStack_55f8;
  float fStack_55f4;
  float fStack_55f0;
  float fStack_55ec;
  float fStack_55e8;
  float fStack_55e4;
  float local_55cc;
  float *local_55c8;
  float local_55c0;
  float fStack_55bc;
  float fStack_55b8;
  float fStack_55b4;
  float fStack_55b0;
  float fStack_55ac;
  float fStack_55a8;
  float fStack_55a4;
  float local_558c;
  float *local_5588;
  float local_5580;
  float fStack_557c;
  float fStack_5578;
  float fStack_5574;
  float fStack_5570;
  float fStack_556c;
  float fStack_5568;
  float fStack_5564;
  float local_554c;
  float *local_5548;
  undefined8 local_5540;
  undefined8 uStack_5538;
  undefined8 uStack_5530;
  undefined8 uStack_5528;
  undefined1 (*local_5508) [32];
  undefined8 local_5500;
  undefined8 uStack_54f8;
  undefined8 uStack_54f0;
  undefined8 uStack_54e8;
  undefined1 (*local_54c8) [32];
  undefined8 local_54c0;
  undefined8 uStack_54b8;
  undefined8 uStack_54b0;
  undefined8 uStack_54a8;
  undefined1 (*local_5488) [32];
  undefined8 local_5480;
  undefined8 uStack_5478;
  undefined8 uStack_5470;
  undefined8 uStack_5468;
  undefined8 local_5460;
  undefined8 uStack_5458;
  undefined8 uStack_5450;
  undefined8 uStack_5448;
  undefined8 local_5440;
  undefined8 uStack_5438;
  undefined8 uStack_5430;
  undefined8 uStack_5428;
  undefined8 local_5420;
  undefined8 uStack_5418;
  undefined8 uStack_5410;
  undefined8 uStack_5408;
  undefined8 local_5400;
  undefined8 uStack_53f8;
  undefined8 uStack_53f0;
  undefined8 uStack_53e8;
  undefined8 local_53e0;
  undefined8 uStack_53d8;
  undefined8 uStack_53d0;
  undefined8 uStack_53c8;
  undefined8 local_53c0;
  undefined8 uStack_53b8;
  undefined8 uStack_53b0;
  undefined8 uStack_53a8;
  undefined8 local_53a0;
  undefined8 uStack_5398;
  undefined8 uStack_5390;
  undefined8 uStack_5388;
  undefined8 local_5380;
  undefined8 uStack_5378;
  undefined8 uStack_5370;
  undefined8 uStack_5368;
  undefined8 local_5360;
  undefined8 uStack_5358;
  undefined8 uStack_5350;
  undefined8 uStack_5348;
  undefined8 local_5340;
  undefined8 uStack_5338;
  undefined8 uStack_5330;
  undefined8 uStack_5328;
  undefined8 local_5320;
  undefined8 uStack_5318;
  undefined8 uStack_5310;
  undefined8 uStack_5308;
  undefined8 local_5300;
  undefined8 uStack_52f8;
  undefined8 uStack_52f0;
  undefined8 uStack_52e8;
  undefined8 local_52e0;
  undefined8 uStack_52d8;
  undefined8 uStack_52d0;
  undefined8 uStack_52c8;
  undefined8 local_52c0;
  undefined8 uStack_52b8;
  undefined8 uStack_52b0;
  undefined8 uStack_52a8;
  undefined8 local_52a0;
  undefined8 uStack_5298;
  undefined8 uStack_5290;
  undefined8 uStack_5288;
  undefined8 local_5280;
  undefined8 uStack_5278;
  undefined8 uStack_5270;
  undefined8 uStack_5268;
  undefined8 local_5260;
  undefined8 uStack_5258;
  undefined8 uStack_5250;
  undefined8 uStack_5248;
  undefined8 local_5240;
  undefined8 uStack_5238;
  undefined8 uStack_5230;
  undefined8 uStack_5228;
  undefined8 local_5220;
  undefined8 uStack_5218;
  undefined8 uStack_5210;
  undefined8 uStack_5208;
  undefined8 local_5200;
  undefined8 uStack_51f8;
  undefined8 uStack_51f0;
  undefined8 uStack_51e8;
  undefined8 local_51e0;
  undefined8 uStack_51d8;
  undefined8 uStack_51d0;
  undefined8 uStack_51c8;
  undefined8 local_51c0;
  undefined8 uStack_51b8;
  undefined8 uStack_51b0;
  undefined8 uStack_51a8;
  undefined8 local_51a0;
  undefined8 uStack_5198;
  undefined8 uStack_5190;
  undefined8 uStack_5188;
  undefined8 local_5180;
  undefined8 uStack_5178;
  undefined8 uStack_5170;
  undefined8 uStack_5168;
  undefined8 local_5160;
  undefined8 uStack_5158;
  undefined8 uStack_5150;
  undefined8 uStack_5148;
  undefined8 local_5140;
  undefined8 uStack_5138;
  undefined8 uStack_5130;
  undefined8 uStack_5128;
  undefined8 local_5120;
  undefined8 uStack_5118;
  undefined8 uStack_5110;
  undefined8 uStack_5108;
  undefined8 local_5100;
  undefined8 uStack_50f8;
  undefined8 uStack_50f0;
  undefined8 uStack_50e8;
  undefined8 local_50e0;
  undefined8 uStack_50d8;
  undefined8 uStack_50d0;
  undefined8 uStack_50c8;
  undefined8 local_50c0;
  undefined8 uStack_50b8;
  undefined8 uStack_50b0;
  undefined8 uStack_50a8;
  undefined8 local_50a0;
  undefined8 uStack_5098;
  undefined8 uStack_5090;
  undefined8 uStack_5088;
  undefined8 local_5080;
  undefined8 uStack_5078;
  undefined8 uStack_5070;
  undefined8 uStack_5068;
  undefined8 local_5060;
  undefined8 uStack_5058;
  undefined8 uStack_5050;
  undefined8 uStack_5048;
  undefined8 local_5040;
  undefined8 uStack_5038;
  undefined8 uStack_5030;
  undefined8 uStack_5028;
  undefined8 local_5020;
  undefined8 uStack_5018;
  undefined8 uStack_5010;
  undefined8 uStack_5008;
  undefined8 local_5000;
  undefined8 uStack_4ff8;
  undefined8 uStack_4ff0;
  undefined8 uStack_4fe8;
  undefined8 local_4fe0;
  undefined8 uStack_4fd8;
  undefined8 uStack_4fd0;
  undefined8 uStack_4fc8;
  undefined8 local_4fc0;
  undefined8 uStack_4fb8;
  undefined8 uStack_4fb0;
  undefined8 uStack_4fa8;
  undefined8 local_4fa0;
  undefined8 uStack_4f98;
  undefined8 uStack_4f90;
  undefined8 uStack_4f88;
  undefined8 local_4f80;
  undefined8 uStack_4f78;
  undefined8 uStack_4f70;
  undefined8 uStack_4f68;
  undefined8 local_4f60;
  undefined8 uStack_4f58;
  undefined8 uStack_4f50;
  undefined8 uStack_4f48;
  undefined8 local_4f40;
  undefined8 uStack_4f38;
  undefined8 uStack_4f30;
  undefined8 uStack_4f28;
  undefined8 local_4f20;
  undefined8 uStack_4f18;
  undefined8 uStack_4f10;
  undefined8 uStack_4f08;
  undefined8 local_4f00;
  undefined8 uStack_4ef8;
  undefined8 uStack_4ef0;
  undefined8 uStack_4ee8;
  undefined8 local_4ee0;
  undefined8 uStack_4ed8;
  undefined8 uStack_4ed0;
  undefined8 uStack_4ec8;
  undefined8 local_4ec0;
  undefined8 uStack_4eb8;
  undefined8 uStack_4eb0;
  undefined8 uStack_4ea8;
  undefined8 local_4ea0;
  undefined8 uStack_4e98;
  undefined8 uStack_4e90;
  undefined8 uStack_4e88;
  undefined8 local_4e80;
  undefined8 uStack_4e78;
  undefined8 uStack_4e70;
  undefined8 uStack_4e68;
  undefined8 local_4e60;
  undefined8 uStack_4e58;
  undefined8 uStack_4e50;
  undefined8 uStack_4e48;
  undefined8 local_4e40;
  undefined8 uStack_4e38;
  undefined8 uStack_4e30;
  undefined8 uStack_4e28;
  undefined8 local_4e20;
  undefined8 uStack_4e18;
  undefined8 uStack_4e10;
  undefined8 uStack_4e08;
  undefined8 local_4e00;
  undefined8 uStack_4df8;
  undefined8 uStack_4df0;
  undefined8 uStack_4de8;
  undefined8 local_4de0;
  undefined8 uStack_4dd8;
  undefined8 uStack_4dd0;
  undefined8 uStack_4dc8;
  undefined8 local_4dc0;
  undefined8 uStack_4db8;
  undefined8 uStack_4db0;
  undefined8 uStack_4da8;
  undefined8 local_4da0;
  undefined8 uStack_4d98;
  undefined8 uStack_4d90;
  undefined8 uStack_4d88;
  undefined8 local_4d80;
  undefined8 uStack_4d78;
  undefined8 uStack_4d70;
  undefined8 uStack_4d68;
  undefined8 local_4d60;
  undefined8 uStack_4d58;
  undefined8 uStack_4d50;
  undefined8 uStack_4d48;
  undefined8 local_4d40;
  undefined8 uStack_4d38;
  undefined8 uStack_4d30;
  undefined8 uStack_4d28;
  undefined8 local_4d20;
  undefined8 uStack_4d18;
  undefined8 uStack_4d10;
  undefined8 uStack_4d08;
  undefined8 local_4d00;
  undefined8 uStack_4cf8;
  undefined8 uStack_4cf0;
  undefined8 uStack_4ce8;
  undefined8 local_4ce0;
  undefined8 uStack_4cd8;
  undefined8 uStack_4cd0;
  undefined8 uStack_4cc8;
  undefined8 local_4cc0;
  undefined8 uStack_4cb8;
  undefined8 uStack_4cb0;
  undefined8 uStack_4ca8;
  undefined8 local_4ca0;
  undefined8 uStack_4c98;
  undefined8 uStack_4c90;
  undefined8 uStack_4c88;
  undefined8 local_4c80;
  undefined8 uStack_4c78;
  undefined8 uStack_4c70;
  undefined8 uStack_4c68;
  undefined8 local_4c60;
  undefined8 uStack_4c58;
  undefined8 uStack_4c50;
  undefined8 uStack_4c48;
  undefined8 local_4c40;
  undefined8 uStack_4c38;
  undefined8 uStack_4c30;
  undefined8 uStack_4c28;
  undefined8 local_4c20;
  undefined8 uStack_4c18;
  undefined8 uStack_4c10;
  undefined8 uStack_4c08;
  undefined8 local_4c00;
  undefined8 uStack_4bf8;
  undefined8 uStack_4bf0;
  undefined8 uStack_4be8;
  undefined8 local_4be0;
  undefined8 uStack_4bd8;
  undefined8 uStack_4bd0;
  undefined8 uStack_4bc8;
  undefined8 local_4bc0;
  undefined8 uStack_4bb8;
  undefined8 uStack_4bb0;
  undefined8 uStack_4ba8;
  undefined8 local_4ba0;
  undefined8 uStack_4b98;
  undefined8 uStack_4b90;
  undefined8 uStack_4b88;
  undefined8 local_4b80;
  undefined8 uStack_4b78;
  undefined8 uStack_4b70;
  undefined8 uStack_4b68;
  undefined8 local_4b60;
  undefined8 uStack_4b58;
  undefined8 uStack_4b50;
  undefined8 uStack_4b48;
  undefined8 local_4b40;
  undefined8 uStack_4b38;
  undefined8 uStack_4b30;
  undefined8 uStack_4b28;
  undefined8 local_4b20;
  undefined8 uStack_4b18;
  undefined8 uStack_4b10;
  undefined8 uStack_4b08;
  undefined8 local_4b00;
  undefined8 uStack_4af8;
  undefined8 uStack_4af0;
  undefined8 uStack_4ae8;
  undefined8 local_4ae0;
  undefined8 uStack_4ad8;
  undefined8 uStack_4ad0;
  undefined8 uStack_4ac8;
  undefined8 local_4ac0;
  undefined8 uStack_4ab8;
  undefined8 uStack_4ab0;
  undefined8 uStack_4aa8;
  undefined8 local_4aa0;
  undefined8 uStack_4a98;
  undefined8 uStack_4a90;
  undefined8 uStack_4a88;
  undefined8 local_4a80;
  undefined8 uStack_4a78;
  undefined8 uStack_4a70;
  undefined8 uStack_4a68;
  undefined8 local_4a60;
  undefined8 uStack_4a58;
  undefined8 uStack_4a50;
  undefined8 uStack_4a48;
  undefined8 local_4a40;
  undefined8 uStack_4a38;
  undefined8 uStack_4a30;
  undefined8 uStack_4a28;
  undefined8 local_4a20;
  undefined8 uStack_4a18;
  undefined8 uStack_4a10;
  undefined8 uStack_4a08;
  undefined8 local_4a00;
  undefined8 uStack_49f8;
  undefined8 uStack_49f0;
  undefined8 uStack_49e8;
  undefined8 local_49e0;
  undefined8 uStack_49d8;
  undefined8 uStack_49d0;
  undefined8 uStack_49c8;
  undefined8 local_49c0;
  undefined8 uStack_49b8;
  undefined8 uStack_49b0;
  undefined8 uStack_49a8;
  undefined8 local_49a0;
  undefined8 uStack_4998;
  undefined8 uStack_4990;
  undefined8 uStack_4988;
  undefined8 local_4980;
  undefined8 uStack_4978;
  undefined8 uStack_4970;
  undefined8 uStack_4968;
  undefined8 local_4960;
  undefined8 uStack_4958;
  undefined8 uStack_4950;
  undefined8 uStack_4948;
  undefined8 local_4940;
  undefined8 uStack_4938;
  undefined8 uStack_4930;
  undefined8 uStack_4928;
  undefined8 local_4920;
  undefined8 uStack_4918;
  undefined8 uStack_4910;
  undefined8 uStack_4908;
  undefined8 local_4900;
  undefined8 uStack_48f8;
  undefined8 uStack_48f0;
  undefined8 uStack_48e8;
  undefined8 local_48e0;
  undefined8 uStack_48d8;
  undefined8 uStack_48d0;
  undefined8 uStack_48c8;
  undefined8 local_48c0;
  undefined8 uStack_48b8;
  undefined8 uStack_48b0;
  undefined8 uStack_48a8;
  undefined8 local_48a0;
  undefined8 uStack_4898;
  undefined8 uStack_4890;
  undefined8 uStack_4888;
  undefined8 local_4880;
  undefined8 uStack_4878;
  undefined8 uStack_4870;
  undefined8 uStack_4868;
  undefined8 local_4860;
  undefined8 uStack_4858;
  undefined8 uStack_4850;
  undefined8 uStack_4848;
  undefined8 local_4840;
  undefined8 uStack_4838;
  undefined8 uStack_4830;
  undefined8 uStack_4828;
  undefined8 local_4820;
  undefined8 uStack_4818;
  undefined8 uStack_4810;
  undefined8 uStack_4808;
  undefined8 local_4800;
  undefined8 uStack_47f8;
  undefined8 uStack_47f0;
  undefined8 uStack_47e8;
  undefined8 local_47e0;
  undefined8 uStack_47d8;
  undefined8 uStack_47d0;
  undefined8 uStack_47c8;
  undefined8 local_47c0;
  undefined8 uStack_47b8;
  undefined8 uStack_47b0;
  undefined8 uStack_47a8;
  undefined8 local_47a0;
  undefined8 uStack_4798;
  undefined8 uStack_4790;
  undefined8 uStack_4788;
  undefined8 local_4780;
  undefined8 uStack_4778;
  undefined8 uStack_4770;
  undefined8 uStack_4768;
  undefined8 local_4760;
  undefined8 uStack_4758;
  undefined8 uStack_4750;
  undefined8 uStack_4748;
  undefined8 local_4740;
  undefined8 uStack_4738;
  undefined8 uStack_4730;
  undefined8 uStack_4728;
  undefined8 local_4720;
  undefined8 uStack_4718;
  undefined8 uStack_4710;
  undefined8 uStack_4708;
  undefined8 local_4700;
  undefined8 uStack_46f8;
  undefined8 uStack_46f0;
  undefined8 uStack_46e8;
  undefined8 local_46e0;
  undefined8 uStack_46d8;
  undefined8 uStack_46d0;
  undefined8 uStack_46c8;
  undefined8 local_46c0;
  undefined8 uStack_46b8;
  undefined8 uStack_46b0;
  undefined8 uStack_46a8;
  undefined8 local_46a0;
  undefined8 uStack_4698;
  undefined8 uStack_4690;
  undefined8 uStack_4688;
  undefined8 local_4680;
  undefined8 uStack_4678;
  undefined8 uStack_4670;
  undefined8 uStack_4668;
  undefined8 local_4660;
  undefined8 uStack_4658;
  undefined8 uStack_4650;
  undefined8 uStack_4648;
  undefined8 local_4640;
  undefined8 uStack_4638;
  undefined8 uStack_4630;
  undefined8 uStack_4628;
  undefined8 local_4620;
  undefined8 uStack_4618;
  undefined8 uStack_4610;
  undefined8 uStack_4608;
  undefined8 local_4600;
  undefined8 uStack_45f8;
  undefined8 uStack_45f0;
  undefined8 uStack_45e8;
  undefined8 local_45e0;
  undefined8 uStack_45d8;
  undefined8 uStack_45d0;
  undefined8 uStack_45c8;
  undefined8 local_45c0;
  undefined8 uStack_45b8;
  undefined8 uStack_45b0;
  undefined8 uStack_45a8;
  undefined8 local_45a0;
  undefined8 uStack_4598;
  undefined8 uStack_4590;
  undefined8 uStack_4588;
  undefined8 local_4580;
  undefined8 uStack_4578;
  undefined8 uStack_4570;
  undefined8 uStack_4568;
  undefined8 local_4560;
  undefined8 uStack_4558;
  undefined8 uStack_4550;
  undefined8 uStack_4548;
  undefined8 local_4540;
  undefined8 uStack_4538;
  undefined8 uStack_4530;
  undefined8 uStack_4528;
  undefined8 local_4520;
  undefined8 uStack_4518;
  undefined8 uStack_4510;
  undefined8 uStack_4508;
  undefined8 local_4500;
  undefined8 uStack_44f8;
  undefined8 uStack_44f0;
  undefined8 uStack_44e8;
  undefined8 local_44e0;
  undefined8 uStack_44d8;
  undefined8 uStack_44d0;
  undefined8 uStack_44c8;
  undefined8 local_44c0;
  undefined8 uStack_44b8;
  undefined8 uStack_44b0;
  undefined8 uStack_44a8;
  undefined8 local_44a0;
  undefined8 uStack_4498;
  undefined8 uStack_4490;
  undefined8 uStack_4488;
  undefined8 local_4480;
  undefined8 uStack_4478;
  undefined8 uStack_4470;
  undefined8 uStack_4468;
  undefined8 local_4460;
  undefined8 uStack_4458;
  undefined8 uStack_4450;
  undefined8 uStack_4448;
  undefined8 local_4440;
  undefined8 uStack_4438;
  undefined8 uStack_4430;
  undefined8 uStack_4428;
  undefined8 local_4420;
  undefined8 uStack_4418;
  undefined8 uStack_4410;
  undefined8 uStack_4408;
  undefined8 local_4400;
  undefined8 uStack_43f8;
  undefined8 uStack_43f0;
  undefined8 uStack_43e8;
  undefined8 local_43e0;
  undefined8 uStack_43d8;
  undefined8 uStack_43d0;
  undefined8 uStack_43c8;
  undefined8 local_43c0;
  undefined8 uStack_43b8;
  undefined8 uStack_43b0;
  undefined8 uStack_43a8;
  undefined8 local_43a0;
  undefined8 uStack_4398;
  undefined8 uStack_4390;
  undefined8 uStack_4388;
  undefined8 local_4380;
  undefined8 uStack_4378;
  undefined8 uStack_4370;
  undefined8 uStack_4368;
  undefined8 local_4360;
  undefined8 uStack_4358;
  undefined8 uStack_4350;
  undefined8 uStack_4348;
  undefined8 local_4340;
  undefined8 uStack_4338;
  undefined8 uStack_4330;
  undefined8 uStack_4328;
  undefined8 local_4320;
  undefined8 uStack_4318;
  undefined8 uStack_4310;
  undefined8 uStack_4308;
  undefined8 local_4300;
  undefined8 uStack_42f8;
  undefined8 uStack_42f0;
  undefined8 uStack_42e8;
  undefined8 local_42e0;
  undefined8 uStack_42d8;
  undefined8 uStack_42d0;
  undefined8 uStack_42c8;
  undefined8 local_42c0;
  undefined8 uStack_42b8;
  undefined8 uStack_42b0;
  undefined8 uStack_42a8;
  undefined8 local_42a0;
  undefined8 uStack_4298;
  undefined8 uStack_4290;
  undefined8 uStack_4288;
  undefined8 local_4280;
  undefined8 uStack_4278;
  undefined8 uStack_4270;
  undefined8 uStack_4268;
  undefined8 local_4260;
  undefined8 uStack_4258;
  undefined8 uStack_4250;
  undefined8 uStack_4248;
  undefined8 local_4240;
  undefined8 uStack_4238;
  undefined8 uStack_4230;
  undefined8 uStack_4228;
  undefined8 local_4220;
  undefined8 uStack_4218;
  undefined8 uStack_4210;
  undefined8 uStack_4208;
  undefined8 local_4200;
  undefined8 uStack_41f8;
  undefined8 uStack_41f0;
  undefined8 uStack_41e8;
  undefined8 local_41e0;
  undefined8 uStack_41d8;
  undefined8 uStack_41d0;
  undefined8 uStack_41c8;
  undefined8 local_41c0;
  undefined8 uStack_41b8;
  undefined8 uStack_41b0;
  undefined8 uStack_41a8;
  undefined8 local_41a0;
  undefined8 uStack_4198;
  undefined8 uStack_4190;
  undefined8 uStack_4188;
  undefined8 local_4180;
  undefined8 uStack_4178;
  undefined8 uStack_4170;
  undefined8 uStack_4168;
  undefined8 local_4160;
  undefined8 uStack_4158;
  undefined8 uStack_4150;
  undefined8 uStack_4148;
  undefined8 local_4140;
  undefined8 uStack_4138;
  undefined8 uStack_4130;
  undefined8 uStack_4128;
  undefined8 local_4120;
  undefined8 uStack_4118;
  undefined8 uStack_4110;
  undefined8 uStack_4108;
  undefined8 local_4100;
  undefined8 uStack_40f8;
  undefined8 uStack_40f0;
  undefined8 uStack_40e8;
  undefined8 local_40e0;
  undefined8 uStack_40d8;
  undefined8 uStack_40d0;
  undefined8 uStack_40c8;
  undefined8 local_40c0;
  undefined8 uStack_40b8;
  undefined8 uStack_40b0;
  undefined8 uStack_40a8;
  undefined8 local_40a0;
  undefined8 uStack_4098;
  undefined8 uStack_4090;
  undefined8 uStack_4088;
  undefined8 local_4080;
  undefined8 uStack_4078;
  undefined8 uStack_4070;
  undefined8 uStack_4068;
  undefined8 local_4060;
  undefined8 uStack_4058;
  undefined8 uStack_4050;
  undefined8 uStack_4048;
  undefined8 local_4040;
  undefined8 uStack_4038;
  undefined8 uStack_4030;
  undefined8 uStack_4028;
  undefined8 local_4020;
  undefined8 uStack_4018;
  undefined8 uStack_4010;
  undefined8 uStack_4008;
  undefined8 local_4000;
  undefined8 uStack_3ff8;
  undefined8 uStack_3ff0;
  undefined8 uStack_3fe8;
  undefined8 local_3fe0;
  undefined8 uStack_3fd8;
  undefined8 uStack_3fd0;
  undefined8 uStack_3fc8;
  undefined8 local_3fc0;
  undefined8 uStack_3fb8;
  undefined8 uStack_3fb0;
  undefined8 uStack_3fa8;
  undefined8 local_3fa0;
  undefined8 uStack_3f98;
  undefined8 uStack_3f90;
  undefined8 uStack_3f88;
  undefined8 local_3f80;
  undefined8 uStack_3f78;
  undefined8 uStack_3f70;
  undefined8 uStack_3f68;
  undefined8 local_3f60;
  undefined8 uStack_3f58;
  undefined8 uStack_3f50;
  undefined8 uStack_3f48;
  undefined8 local_3f40;
  undefined8 uStack_3f38;
  undefined8 uStack_3f30;
  undefined8 uStack_3f28;
  undefined8 local_3f20;
  undefined8 uStack_3f18;
  undefined8 uStack_3f10;
  undefined8 uStack_3f08;
  undefined8 local_3f00;
  undefined8 uStack_3ef8;
  undefined8 uStack_3ef0;
  undefined8 uStack_3ee8;
  undefined8 local_3ee0;
  undefined8 uStack_3ed8;
  undefined8 uStack_3ed0;
  undefined8 uStack_3ec8;
  undefined8 local_3ec0;
  undefined8 uStack_3eb8;
  undefined8 uStack_3eb0;
  undefined8 uStack_3ea8;
  undefined8 local_3ea0;
  undefined8 uStack_3e98;
  undefined8 uStack_3e90;
  undefined8 uStack_3e88;
  undefined8 local_3e80;
  undefined8 uStack_3e78;
  undefined8 uStack_3e70;
  undefined8 uStack_3e68;
  undefined8 local_3e60;
  undefined8 uStack_3e58;
  undefined8 uStack_3e50;
  undefined8 uStack_3e48;
  undefined8 local_3e40;
  undefined8 uStack_3e38;
  undefined8 uStack_3e30;
  undefined8 uStack_3e28;
  undefined8 local_3e20;
  undefined8 uStack_3e18;
  undefined8 uStack_3e10;
  undefined8 uStack_3e08;
  undefined8 local_3e00;
  undefined8 uStack_3df8;
  undefined8 uStack_3df0;
  undefined8 uStack_3de8;
  undefined8 local_3de0;
  undefined8 uStack_3dd8;
  undefined8 uStack_3dd0;
  undefined8 uStack_3dc8;
  undefined8 local_3dc0;
  undefined8 uStack_3db8;
  undefined8 uStack_3db0;
  undefined8 uStack_3da8;
  undefined8 local_3da0;
  undefined8 uStack_3d98;
  undefined8 uStack_3d90;
  undefined8 uStack_3d88;
  undefined8 local_3d80;
  undefined8 uStack_3d78;
  undefined8 uStack_3d70;
  undefined8 uStack_3d68;
  undefined8 local_3d60;
  undefined8 uStack_3d58;
  undefined8 uStack_3d50;
  undefined8 uStack_3d48;
  undefined8 local_3d40;
  undefined8 uStack_3d38;
  undefined8 uStack_3d30;
  undefined8 uStack_3d28;
  undefined8 local_3d20;
  undefined8 uStack_3d18;
  undefined8 uStack_3d10;
  undefined8 uStack_3d08;
  undefined8 local_3d00;
  undefined8 uStack_3cf8;
  undefined8 uStack_3cf0;
  undefined8 uStack_3ce8;
  undefined8 local_3ce0;
  undefined8 uStack_3cd8;
  undefined8 uStack_3cd0;
  undefined8 uStack_3cc8;
  undefined8 local_3cc0;
  undefined8 uStack_3cb8;
  undefined8 uStack_3cb0;
  undefined8 uStack_3ca8;
  undefined8 local_3ca0;
  undefined8 uStack_3c98;
  undefined8 uStack_3c90;
  undefined8 uStack_3c88;
  undefined8 local_3c80;
  undefined8 uStack_3c78;
  undefined8 uStack_3c70;
  undefined8 uStack_3c68;
  undefined8 local_3c60;
  undefined8 uStack_3c58;
  undefined8 uStack_3c50;
  undefined8 uStack_3c48;
  undefined8 local_3c40;
  undefined8 uStack_3c38;
  undefined8 uStack_3c30;
  undefined8 uStack_3c28;
  undefined8 local_3c20;
  undefined8 uStack_3c18;
  undefined8 uStack_3c10;
  undefined8 uStack_3c08;
  undefined8 local_3c00;
  undefined8 uStack_3bf8;
  undefined8 uStack_3bf0;
  undefined8 uStack_3be8;
  undefined8 local_3be0;
  undefined8 uStack_3bd8;
  undefined8 uStack_3bd0;
  undefined8 uStack_3bc8;
  undefined8 local_3bc0;
  undefined8 uStack_3bb8;
  undefined8 uStack_3bb0;
  undefined8 uStack_3ba8;
  undefined8 local_3ba0;
  undefined8 uStack_3b98;
  undefined8 uStack_3b90;
  undefined8 uStack_3b88;
  undefined8 local_3b80;
  undefined8 uStack_3b78;
  undefined8 uStack_3b70;
  undefined8 uStack_3b68;
  undefined8 local_3b60;
  undefined8 uStack_3b58;
  undefined8 uStack_3b50;
  undefined8 uStack_3b48;
  undefined8 local_3b40;
  undefined8 uStack_3b38;
  undefined8 uStack_3b30;
  undefined8 uStack_3b28;
  undefined8 local_3b20;
  undefined8 uStack_3b18;
  undefined8 uStack_3b10;
  undefined8 uStack_3b08;
  undefined8 local_3b00;
  undefined8 uStack_3af8;
  undefined8 uStack_3af0;
  undefined8 uStack_3ae8;
  undefined8 local_3ae0;
  undefined8 uStack_3ad8;
  undefined8 uStack_3ad0;
  undefined8 uStack_3ac8;
  undefined8 local_3ac0;
  undefined8 uStack_3ab8;
  undefined8 uStack_3ab0;
  undefined8 uStack_3aa8;
  undefined8 local_3aa0;
  undefined8 uStack_3a98;
  undefined8 uStack_3a90;
  undefined8 uStack_3a88;
  undefined8 local_3a80;
  undefined8 uStack_3a78;
  undefined8 uStack_3a70;
  undefined8 uStack_3a68;
  undefined8 local_3a60;
  undefined8 uStack_3a58;
  undefined8 uStack_3a50;
  undefined8 uStack_3a48;
  undefined8 local_3a40;
  undefined8 uStack_3a38;
  undefined8 uStack_3a30;
  undefined8 uStack_3a28;
  undefined8 local_3a20;
  undefined8 uStack_3a18;
  undefined8 uStack_3a10;
  undefined8 uStack_3a08;
  undefined8 local_3a00;
  undefined8 uStack_39f8;
  undefined8 uStack_39f0;
  undefined8 uStack_39e8;
  undefined8 local_39e0;
  undefined8 uStack_39d8;
  undefined8 uStack_39d0;
  undefined8 uStack_39c8;
  undefined8 local_39c0;
  undefined8 uStack_39b8;
  undefined8 uStack_39b0;
  undefined8 uStack_39a8;
  undefined8 local_39a0;
  undefined8 uStack_3998;
  undefined8 uStack_3990;
  undefined8 uStack_3988;
  undefined8 local_3980;
  undefined8 uStack_3978;
  undefined8 uStack_3970;
  undefined8 uStack_3968;
  undefined8 local_3960;
  undefined8 uStack_3958;
  undefined8 uStack_3950;
  undefined8 uStack_3948;
  undefined8 local_3940;
  undefined8 uStack_3938;
  undefined8 uStack_3930;
  undefined8 uStack_3928;
  undefined8 local_3920;
  undefined8 uStack_3918;
  undefined8 uStack_3910;
  undefined8 uStack_3908;
  undefined8 local_3900;
  undefined8 uStack_38f8;
  undefined8 uStack_38f0;
  undefined8 uStack_38e8;
  undefined8 local_38e0;
  undefined8 uStack_38d8;
  undefined8 uStack_38d0;
  undefined8 uStack_38c8;
  undefined8 local_38c0;
  undefined8 uStack_38b8;
  undefined8 uStack_38b0;
  undefined8 uStack_38a8;
  undefined8 local_38a0;
  undefined8 uStack_3898;
  undefined8 uStack_3890;
  undefined8 uStack_3888;
  undefined8 local_3880;
  undefined8 uStack_3878;
  undefined8 uStack_3870;
  undefined8 uStack_3868;
  undefined8 local_3860;
  undefined8 uStack_3858;
  undefined8 uStack_3850;
  undefined8 uStack_3848;
  undefined8 local_3840;
  undefined8 uStack_3838;
  undefined8 uStack_3830;
  undefined8 uStack_3828;
  undefined8 local_3820;
  undefined8 uStack_3818;
  undefined8 uStack_3810;
  undefined8 uStack_3808;
  undefined8 local_3800;
  undefined8 uStack_37f8;
  undefined8 uStack_37f0;
  undefined8 uStack_37e8;
  undefined8 local_37e0;
  undefined8 uStack_37d8;
  undefined8 uStack_37d0;
  undefined8 uStack_37c8;
  undefined8 local_37c0;
  undefined8 uStack_37b8;
  undefined8 uStack_37b0;
  undefined8 uStack_37a8;
  undefined8 local_37a0;
  undefined8 uStack_3798;
  undefined8 uStack_3790;
  undefined8 uStack_3788;
  undefined8 local_3780;
  undefined8 uStack_3778;
  undefined8 uStack_3770;
  undefined8 uStack_3768;
  undefined8 local_3760;
  undefined8 uStack_3758;
  undefined8 uStack_3750;
  undefined8 uStack_3748;
  undefined8 local_3740;
  undefined8 uStack_3738;
  undefined8 uStack_3730;
  undefined8 uStack_3728;
  undefined8 local_3720;
  undefined8 uStack_3718;
  undefined8 uStack_3710;
  undefined8 uStack_3708;
  undefined8 local_3700;
  undefined8 uStack_36f8;
  undefined8 uStack_36f0;
  undefined8 uStack_36e8;
  undefined8 local_36e0;
  undefined8 uStack_36d8;
  undefined8 uStack_36d0;
  undefined8 uStack_36c8;
  undefined8 local_36c0;
  undefined8 uStack_36b8;
  undefined8 uStack_36b0;
  undefined8 uStack_36a8;
  undefined8 local_36a0;
  undefined8 uStack_3698;
  undefined8 uStack_3690;
  undefined8 uStack_3688;
  undefined8 local_3680;
  undefined8 uStack_3678;
  undefined8 uStack_3670;
  undefined8 uStack_3668;
  undefined8 local_3660;
  undefined8 uStack_3658;
  undefined8 uStack_3650;
  undefined8 uStack_3648;
  undefined8 local_3640;
  undefined8 uStack_3638;
  undefined8 uStack_3630;
  undefined8 uStack_3628;
  undefined8 local_3620;
  undefined8 uStack_3618;
  undefined8 uStack_3610;
  undefined8 uStack_3608;
  undefined8 local_3600;
  undefined8 uStack_35f8;
  undefined8 uStack_35f0;
  undefined8 uStack_35e8;
  undefined8 local_35e0;
  undefined8 uStack_35d8;
  undefined8 uStack_35d0;
  undefined8 uStack_35c8;
  undefined8 local_35c0;
  undefined8 uStack_35b8;
  undefined8 uStack_35b0;
  undefined8 uStack_35a8;
  undefined8 local_35a0;
  undefined8 uStack_3598;
  undefined8 uStack_3590;
  undefined8 uStack_3588;
  undefined8 local_3580;
  undefined8 uStack_3578;
  undefined8 uStack_3570;
  undefined8 uStack_3568;
  undefined8 local_3560;
  undefined8 uStack_3558;
  undefined8 uStack_3550;
  undefined8 uStack_3548;
  undefined8 local_3540;
  undefined8 uStack_3538;
  undefined8 uStack_3530;
  undefined8 uStack_3528;
  undefined8 local_3520;
  undefined8 uStack_3518;
  undefined8 uStack_3510;
  undefined8 uStack_3508;
  undefined8 local_3500;
  undefined8 uStack_34f8;
  undefined8 uStack_34f0;
  undefined8 uStack_34e8;
  undefined8 local_34e0;
  undefined8 uStack_34d8;
  undefined8 uStack_34d0;
  undefined8 uStack_34c8;
  undefined8 local_34c0;
  undefined8 uStack_34b8;
  undefined8 uStack_34b0;
  undefined8 uStack_34a8;
  undefined8 local_34a0;
  undefined8 uStack_3498;
  undefined8 uStack_3490;
  undefined8 uStack_3488;
  undefined8 local_3480;
  undefined8 uStack_3478;
  undefined8 uStack_3470;
  undefined8 uStack_3468;
  undefined8 local_3460;
  undefined8 uStack_3458;
  undefined8 uStack_3450;
  undefined8 uStack_3448;
  undefined8 local_3440;
  undefined8 uStack_3438;
  undefined8 uStack_3430;
  undefined8 uStack_3428;
  undefined8 local_3420;
  undefined8 uStack_3418;
  undefined8 uStack_3410;
  undefined8 uStack_3408;
  undefined8 local_3400;
  undefined8 uStack_33f8;
  undefined8 uStack_33f0;
  undefined8 uStack_33e8;
  undefined8 local_33e0;
  undefined8 uStack_33d8;
  undefined8 uStack_33d0;
  undefined8 uStack_33c8;
  undefined8 local_33c0;
  undefined8 uStack_33b8;
  undefined8 uStack_33b0;
  undefined8 uStack_33a8;
  undefined8 local_33a0;
  undefined8 uStack_3398;
  undefined8 uStack_3390;
  undefined8 uStack_3388;
  undefined8 local_3380;
  undefined8 uStack_3378;
  undefined8 uStack_3370;
  undefined8 uStack_3368;
  undefined8 local_3360;
  undefined8 uStack_3358;
  undefined8 uStack_3350;
  undefined8 uStack_3348;
  undefined8 local_3340;
  undefined8 uStack_3338;
  undefined8 uStack_3330;
  undefined8 uStack_3328;
  undefined8 local_3320;
  undefined8 uStack_3318;
  undefined8 uStack_3310;
  undefined8 uStack_3308;
  undefined8 local_3300;
  undefined8 uStack_32f8;
  undefined8 uStack_32f0;
  undefined8 uStack_32e8;
  undefined8 local_32e0;
  undefined8 uStack_32d8;
  undefined8 uStack_32d0;
  undefined8 uStack_32c8;
  undefined8 local_32c0;
  undefined8 uStack_32b8;
  undefined8 uStack_32b0;
  undefined8 uStack_32a8;
  undefined8 local_32a0;
  undefined8 uStack_3298;
  undefined8 uStack_3290;
  undefined8 uStack_3288;
  undefined8 local_3280;
  undefined8 uStack_3278;
  undefined8 uStack_3270;
  undefined8 uStack_3268;
  undefined8 local_3260;
  undefined8 uStack_3258;
  undefined8 uStack_3250;
  undefined8 uStack_3248;
  undefined8 local_3240;
  undefined8 uStack_3238;
  undefined8 uStack_3230;
  undefined8 uStack_3228;
  undefined8 local_3220;
  undefined8 uStack_3218;
  undefined8 uStack_3210;
  undefined8 uStack_3208;
  undefined8 local_3200;
  undefined8 uStack_31f8;
  undefined8 uStack_31f0;
  undefined8 uStack_31e8;
  undefined8 local_31e0;
  undefined8 uStack_31d8;
  undefined8 uStack_31d0;
  undefined8 uStack_31c8;
  undefined8 local_31c0;
  undefined8 uStack_31b8;
  undefined8 uStack_31b0;
  undefined8 uStack_31a8;
  undefined8 local_31a0;
  undefined8 uStack_3198;
  undefined8 uStack_3190;
  undefined8 uStack_3188;
  undefined8 local_3180;
  undefined8 uStack_3178;
  undefined8 uStack_3170;
  undefined8 uStack_3168;
  undefined8 local_3160;
  undefined8 uStack_3158;
  undefined8 uStack_3150;
  undefined8 uStack_3148;
  undefined8 local_3140;
  undefined8 uStack_3138;
  undefined8 uStack_3130;
  undefined8 uStack_3128;
  undefined8 local_3120;
  undefined8 uStack_3118;
  undefined8 uStack_3110;
  undefined8 uStack_3108;
  undefined8 local_3100;
  undefined8 uStack_30f8;
  undefined8 uStack_30f0;
  undefined8 uStack_30e8;
  undefined8 local_30e0;
  undefined8 uStack_30d8;
  undefined8 uStack_30d0;
  undefined8 uStack_30c8;
  undefined8 local_30c0;
  undefined8 uStack_30b8;
  undefined8 uStack_30b0;
  undefined8 uStack_30a8;
  undefined8 local_30a0;
  undefined8 uStack_3098;
  undefined8 uStack_3090;
  undefined8 uStack_3088;
  undefined8 local_3080;
  undefined8 uStack_3078;
  undefined8 uStack_3070;
  undefined8 uStack_3068;
  float local_3060;
  float fStack_305c;
  float fStack_3058;
  float fStack_3054;
  float fStack_3050;
  float fStack_304c;
  float fStack_3048;
  float fStack_3044;
  undefined8 local_3040;
  undefined8 uStack_3038;
  undefined8 uStack_3030;
  undefined8 uStack_3028;
  float local_3020;
  float fStack_301c;
  float fStack_3018;
  float fStack_3014;
  float fStack_3010;
  float fStack_300c;
  float fStack_3008;
  float fStack_3004;
  undefined8 local_3000;
  undefined8 uStack_2ff8;
  undefined8 uStack_2ff0;
  undefined8 uStack_2fe8;
  float local_2fe0;
  float fStack_2fdc;
  float fStack_2fd8;
  float fStack_2fd4;
  float fStack_2fd0;
  float fStack_2fcc;
  float fStack_2fc8;
  float fStack_2fc4;
  undefined8 local_2fc0;
  undefined8 uStack_2fb8;
  undefined8 uStack_2fb0;
  undefined8 uStack_2fa8;
  float local_2fa0;
  float fStack_2f9c;
  float fStack_2f98;
  float fStack_2f94;
  float fStack_2f90;
  float fStack_2f8c;
  float fStack_2f88;
  float fStack_2f84;
  undefined8 local_2f80;
  undefined8 uStack_2f78;
  undefined8 uStack_2f70;
  undefined8 uStack_2f68;
  float local_2f60;
  float fStack_2f5c;
  float fStack_2f58;
  float fStack_2f54;
  float fStack_2f50;
  float fStack_2f4c;
  float fStack_2f48;
  float fStack_2f44;
  undefined8 local_2f40;
  undefined8 uStack_2f38;
  undefined8 uStack_2f30;
  undefined8 uStack_2f28;
  float local_2f20;
  float fStack_2f1c;
  float fStack_2f18;
  float fStack_2f14;
  float fStack_2f10;
  float fStack_2f0c;
  float fStack_2f08;
  float fStack_2f04;
  undefined8 local_2f00;
  undefined8 uStack_2ef8;
  undefined8 uStack_2ef0;
  undefined8 uStack_2ee8;
  float local_2ee0;
  float fStack_2edc;
  float fStack_2ed8;
  float fStack_2ed4;
  float fStack_2ed0;
  float fStack_2ecc;
  float fStack_2ec8;
  float fStack_2ec4;
  undefined8 local_2ec0;
  undefined8 uStack_2eb8;
  undefined8 uStack_2eb0;
  undefined8 uStack_2ea8;
  float local_2ea0;
  float fStack_2e9c;
  float fStack_2e98;
  float fStack_2e94;
  float fStack_2e90;
  float fStack_2e8c;
  float fStack_2e88;
  float fStack_2e84;
  undefined8 local_2e80;
  undefined8 uStack_2e78;
  undefined8 uStack_2e70;
  undefined8 uStack_2e68;
  float local_2e60;
  float fStack_2e5c;
  float fStack_2e58;
  float fStack_2e54;
  float fStack_2e50;
  float fStack_2e4c;
  float fStack_2e48;
  float fStack_2e44;
  undefined8 local_2e40;
  undefined8 uStack_2e38;
  undefined8 uStack_2e30;
  undefined8 uStack_2e28;
  float local_2e20;
  float fStack_2e1c;
  float fStack_2e18;
  float fStack_2e14;
  float fStack_2e10;
  float fStack_2e0c;
  float fStack_2e08;
  float fStack_2e04;
  undefined8 local_2e00;
  undefined8 uStack_2df8;
  undefined8 uStack_2df0;
  undefined8 uStack_2de8;
  float local_2de0;
  float fStack_2ddc;
  float fStack_2dd8;
  float fStack_2dd4;
  float fStack_2dd0;
  float fStack_2dcc;
  float fStack_2dc8;
  float fStack_2dc4;
  undefined8 local_2dc0;
  undefined8 uStack_2db8;
  undefined8 uStack_2db0;
  undefined8 uStack_2da8;
  float local_2da0;
  float fStack_2d9c;
  float fStack_2d98;
  float fStack_2d94;
  float fStack_2d90;
  float fStack_2d8c;
  float fStack_2d88;
  float fStack_2d84;
  undefined8 local_2d80;
  undefined8 uStack_2d78;
  undefined8 uStack_2d70;
  undefined8 uStack_2d68;
  float local_2d60;
  float fStack_2d5c;
  float fStack_2d58;
  float fStack_2d54;
  float fStack_2d50;
  float fStack_2d4c;
  float fStack_2d48;
  float fStack_2d44;
  undefined8 local_2d40;
  undefined8 uStack_2d38;
  undefined8 uStack_2d30;
  undefined8 uStack_2d28;
  float local_2d20;
  float fStack_2d1c;
  float fStack_2d18;
  float fStack_2d14;
  float fStack_2d10;
  float fStack_2d0c;
  float fStack_2d08;
  float fStack_2d04;
  undefined8 local_2d00;
  undefined8 uStack_2cf8;
  undefined8 uStack_2cf0;
  undefined8 uStack_2ce8;
  float local_2ce0;
  float fStack_2cdc;
  float fStack_2cd8;
  float fStack_2cd4;
  float fStack_2cd0;
  float fStack_2ccc;
  float fStack_2cc8;
  float fStack_2cc4;
  undefined8 local_2cc0;
  undefined8 uStack_2cb8;
  undefined8 uStack_2cb0;
  undefined8 uStack_2ca8;
  float local_2ca0;
  float fStack_2c9c;
  float fStack_2c98;
  float fStack_2c94;
  float fStack_2c90;
  float fStack_2c8c;
  float fStack_2c88;
  float fStack_2c84;
  undefined8 local_2c80;
  undefined8 uStack_2c78;
  undefined8 uStack_2c70;
  undefined8 uStack_2c68;
  float local_2c60;
  float fStack_2c5c;
  float fStack_2c58;
  float fStack_2c54;
  float fStack_2c50;
  float fStack_2c4c;
  float fStack_2c48;
  float fStack_2c44;
  undefined8 local_2c40;
  undefined8 uStack_2c38;
  undefined8 uStack_2c30;
  undefined8 uStack_2c28;
  float local_2c20;
  float fStack_2c1c;
  float fStack_2c18;
  float fStack_2c14;
  float fStack_2c10;
  float fStack_2c0c;
  float fStack_2c08;
  float fStack_2c04;
  undefined8 local_2c00;
  undefined8 uStack_2bf8;
  undefined8 uStack_2bf0;
  undefined8 uStack_2be8;
  float local_2be0;
  float fStack_2bdc;
  float fStack_2bd8;
  float fStack_2bd4;
  float fStack_2bd0;
  float fStack_2bcc;
  float fStack_2bc8;
  float fStack_2bc4;
  undefined8 local_2bc0;
  undefined8 uStack_2bb8;
  undefined8 uStack_2bb0;
  undefined8 uStack_2ba8;
  float local_2ba0;
  float fStack_2b9c;
  float fStack_2b98;
  float fStack_2b94;
  float fStack_2b90;
  float fStack_2b8c;
  float fStack_2b88;
  float fStack_2b84;
  undefined8 local_2b80;
  undefined8 uStack_2b78;
  undefined8 uStack_2b70;
  undefined8 uStack_2b68;
  float local_2b60;
  float fStack_2b5c;
  float fStack_2b58;
  float fStack_2b54;
  float fStack_2b50;
  float fStack_2b4c;
  float fStack_2b48;
  float fStack_2b44;
  undefined8 local_2b40;
  undefined8 uStack_2b38;
  undefined8 uStack_2b30;
  undefined8 uStack_2b28;
  float local_2b20;
  float fStack_2b1c;
  float fStack_2b18;
  float fStack_2b14;
  float fStack_2b10;
  float fStack_2b0c;
  float fStack_2b08;
  float fStack_2b04;
  undefined8 local_2b00;
  undefined8 uStack_2af8;
  undefined8 uStack_2af0;
  undefined8 uStack_2ae8;
  float local_2ae0;
  float fStack_2adc;
  float fStack_2ad8;
  float fStack_2ad4;
  float fStack_2ad0;
  float fStack_2acc;
  float fStack_2ac8;
  float fStack_2ac4;
  undefined8 local_2ac0;
  undefined8 uStack_2ab8;
  undefined8 uStack_2ab0;
  undefined8 uStack_2aa8;
  float local_2aa0;
  float fStack_2a9c;
  float fStack_2a98;
  float fStack_2a94;
  float fStack_2a90;
  float fStack_2a8c;
  float fStack_2a88;
  float fStack_2a84;
  undefined8 local_2a80;
  undefined8 uStack_2a78;
  undefined8 uStack_2a70;
  undefined8 uStack_2a68;
  float local_2a60;
  float fStack_2a5c;
  float fStack_2a58;
  float fStack_2a54;
  float fStack_2a50;
  float fStack_2a4c;
  float fStack_2a48;
  float fStack_2a44;
  undefined8 local_2a40;
  undefined8 uStack_2a38;
  undefined8 uStack_2a30;
  undefined8 uStack_2a28;
  float local_2a20;
  float fStack_2a1c;
  float fStack_2a18;
  float fStack_2a14;
  float fStack_2a10;
  float fStack_2a0c;
  float fStack_2a08;
  float fStack_2a04;
  undefined8 local_2a00;
  undefined8 uStack_29f8;
  undefined8 uStack_29f0;
  undefined8 uStack_29e8;
  float local_29e0;
  float fStack_29dc;
  float fStack_29d8;
  float fStack_29d4;
  float fStack_29d0;
  float fStack_29cc;
  float fStack_29c8;
  float fStack_29c4;
  undefined8 local_29c0;
  undefined8 uStack_29b8;
  undefined8 uStack_29b0;
  undefined8 uStack_29a8;
  float local_29a0;
  float fStack_299c;
  float fStack_2998;
  float fStack_2994;
  float fStack_2990;
  float fStack_298c;
  float fStack_2988;
  float fStack_2984;
  undefined8 local_2980;
  undefined8 uStack_2978;
  undefined8 uStack_2970;
  undefined8 uStack_2968;
  float local_2960;
  float fStack_295c;
  float fStack_2958;
  float fStack_2954;
  float fStack_2950;
  float fStack_294c;
  float fStack_2948;
  float fStack_2944;
  undefined8 local_2940;
  undefined8 uStack_2938;
  undefined8 uStack_2930;
  undefined8 uStack_2928;
  float local_2920;
  float fStack_291c;
  float fStack_2918;
  float fStack_2914;
  float fStack_2910;
  float fStack_290c;
  float fStack_2908;
  float fStack_2904;
  undefined8 local_2900;
  undefined8 uStack_28f8;
  undefined8 uStack_28f0;
  undefined8 uStack_28e8;
  float local_28e0;
  float fStack_28dc;
  float fStack_28d8;
  float fStack_28d4;
  float fStack_28d0;
  float fStack_28cc;
  float fStack_28c8;
  float fStack_28c4;
  undefined8 local_28c0;
  undefined8 uStack_28b8;
  undefined8 uStack_28b0;
  undefined8 uStack_28a8;
  float local_28a0;
  float fStack_289c;
  float fStack_2898;
  float fStack_2894;
  float fStack_2890;
  float fStack_288c;
  float fStack_2888;
  float fStack_2884;
  undefined8 local_2880;
  undefined8 uStack_2878;
  undefined8 uStack_2870;
  undefined8 uStack_2868;
  float local_2860;
  float fStack_285c;
  float fStack_2858;
  float fStack_2854;
  float fStack_2850;
  float fStack_284c;
  float fStack_2848;
  float fStack_2844;
  undefined8 local_2840;
  undefined8 uStack_2838;
  undefined8 uStack_2830;
  undefined8 uStack_2828;
  float local_2820;
  float fStack_281c;
  float fStack_2818;
  float fStack_2814;
  float fStack_2810;
  float fStack_280c;
  float fStack_2808;
  float fStack_2804;
  undefined8 local_2800;
  undefined8 uStack_27f8;
  undefined8 uStack_27f0;
  undefined8 uStack_27e8;
  float local_27e0;
  float fStack_27dc;
  float fStack_27d8;
  float fStack_27d4;
  float fStack_27d0;
  float fStack_27cc;
  float fStack_27c8;
  float fStack_27c4;
  undefined8 local_27c0;
  undefined8 uStack_27b8;
  undefined8 uStack_27b0;
  undefined8 uStack_27a8;
  float local_27a0;
  float fStack_279c;
  float fStack_2798;
  float fStack_2794;
  float fStack_2790;
  float fStack_278c;
  float fStack_2788;
  float fStack_2784;
  undefined8 local_2780;
  undefined8 uStack_2778;
  undefined8 uStack_2770;
  undefined8 uStack_2768;
  float local_2760;
  float fStack_275c;
  float fStack_2758;
  float fStack_2754;
  float fStack_2750;
  float fStack_274c;
  float fStack_2748;
  float fStack_2744;
  undefined8 local_2740;
  undefined8 uStack_2738;
  undefined8 uStack_2730;
  undefined8 uStack_2728;
  float local_2720;
  float fStack_271c;
  float fStack_2718;
  float fStack_2714;
  float fStack_2710;
  float fStack_270c;
  float fStack_2708;
  float fStack_2704;
  undefined8 local_2700;
  undefined8 uStack_26f8;
  undefined8 uStack_26f0;
  undefined8 uStack_26e8;
  float local_26e0;
  float fStack_26dc;
  float fStack_26d8;
  float fStack_26d4;
  float fStack_26d0;
  float fStack_26cc;
  float fStack_26c8;
  float fStack_26c4;
  undefined8 local_26c0;
  undefined8 uStack_26b8;
  undefined8 uStack_26b0;
  undefined8 uStack_26a8;
  float local_26a0;
  float fStack_269c;
  float fStack_2698;
  float fStack_2694;
  float fStack_2690;
  float fStack_268c;
  float fStack_2688;
  float fStack_2684;
  undefined8 local_2680;
  undefined8 uStack_2678;
  undefined8 uStack_2670;
  undefined8 uStack_2668;
  float local_2660;
  float fStack_265c;
  float fStack_2658;
  float fStack_2654;
  float fStack_2650;
  float fStack_264c;
  float fStack_2648;
  float fStack_2644;
  undefined8 local_2640;
  undefined8 uStack_2638;
  undefined8 uStack_2630;
  undefined8 uStack_2628;
  float local_2620;
  float fStack_261c;
  float fStack_2618;
  float fStack_2614;
  float fStack_2610;
  float fStack_260c;
  float fStack_2608;
  float fStack_2604;
  undefined8 local_2600;
  undefined8 uStack_25f8;
  undefined8 uStack_25f0;
  undefined8 uStack_25e8;
  float local_25e0;
  float fStack_25dc;
  float fStack_25d8;
  float fStack_25d4;
  float fStack_25d0;
  float fStack_25cc;
  float fStack_25c8;
  float fStack_25c4;
  undefined8 local_25c0;
  undefined8 uStack_25b8;
  undefined8 uStack_25b0;
  undefined8 uStack_25a8;
  float local_25a0;
  float fStack_259c;
  float fStack_2598;
  float fStack_2594;
  float fStack_2590;
  float fStack_258c;
  float fStack_2588;
  float fStack_2584;
  undefined8 local_2580;
  undefined8 uStack_2578;
  undefined8 uStack_2570;
  undefined8 uStack_2568;
  float local_2560;
  float fStack_255c;
  float fStack_2558;
  float fStack_2554;
  float fStack_2550;
  float fStack_254c;
  float fStack_2548;
  float fStack_2544;
  undefined8 local_2540;
  undefined8 uStack_2538;
  undefined8 uStack_2530;
  undefined8 uStack_2528;
  float local_2520;
  float fStack_251c;
  float fStack_2518;
  float fStack_2514;
  float fStack_2510;
  float fStack_250c;
  float fStack_2508;
  float fStack_2504;
  undefined8 local_2500;
  undefined8 uStack_24f8;
  undefined8 uStack_24f0;
  undefined8 uStack_24e8;
  float local_24e0;
  float fStack_24dc;
  float fStack_24d8;
  float fStack_24d4;
  float fStack_24d0;
  float fStack_24cc;
  float fStack_24c8;
  float fStack_24c4;
  undefined8 local_24c0;
  undefined8 uStack_24b8;
  undefined8 uStack_24b0;
  undefined8 uStack_24a8;
  float local_24a0;
  float fStack_249c;
  float fStack_2498;
  float fStack_2494;
  float fStack_2490;
  float fStack_248c;
  float fStack_2488;
  float fStack_2484;
  undefined8 local_2480;
  undefined8 uStack_2478;
  undefined8 uStack_2470;
  undefined8 uStack_2468;
  float local_2460;
  float fStack_245c;
  float fStack_2458;
  float fStack_2454;
  float fStack_2450;
  float fStack_244c;
  float fStack_2448;
  float fStack_2444;
  undefined8 local_2440;
  undefined8 uStack_2438;
  undefined8 uStack_2430;
  undefined8 uStack_2428;
  float local_2420;
  float fStack_241c;
  float fStack_2418;
  float fStack_2414;
  float fStack_2410;
  float fStack_240c;
  float fStack_2408;
  float fStack_2404;
  undefined8 local_2400;
  undefined8 uStack_23f8;
  undefined8 uStack_23f0;
  undefined8 uStack_23e8;
  float local_23e0;
  float fStack_23dc;
  float fStack_23d8;
  float fStack_23d4;
  float fStack_23d0;
  float fStack_23cc;
  float fStack_23c8;
  float fStack_23c4;
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  float local_23a0;
  float fStack_239c;
  float fStack_2398;
  float fStack_2394;
  float fStack_2390;
  float fStack_238c;
  float fStack_2388;
  float fStack_2384;
  undefined8 local_2380;
  undefined8 uStack_2378;
  undefined8 uStack_2370;
  undefined8 uStack_2368;
  float local_2360;
  float fStack_235c;
  float fStack_2358;
  float fStack_2354;
  float fStack_2350;
  float fStack_234c;
  float fStack_2348;
  float fStack_2344;
  undefined8 local_2340;
  undefined8 uStack_2338;
  undefined8 uStack_2330;
  undefined8 uStack_2328;
  float local_2320;
  float fStack_231c;
  float fStack_2318;
  float fStack_2314;
  float fStack_2310;
  float fStack_230c;
  float fStack_2308;
  float fStack_2304;
  undefined8 local_2300;
  undefined8 uStack_22f8;
  undefined8 uStack_22f0;
  undefined8 uStack_22e8;
  float local_22e0;
  float fStack_22dc;
  float fStack_22d8;
  float fStack_22d4;
  float fStack_22d0;
  float fStack_22cc;
  float fStack_22c8;
  float fStack_22c4;
  undefined8 local_22c0;
  undefined8 uStack_22b8;
  undefined8 uStack_22b0;
  undefined8 uStack_22a8;
  float local_22a0;
  float fStack_229c;
  float fStack_2298;
  float fStack_2294;
  float fStack_2290;
  float fStack_228c;
  float fStack_2288;
  float fStack_2284;
  undefined8 local_2280;
  undefined8 uStack_2278;
  undefined8 uStack_2270;
  undefined8 uStack_2268;
  float local_2260;
  float fStack_225c;
  float fStack_2258;
  float fStack_2254;
  float fStack_2250;
  float fStack_224c;
  float fStack_2248;
  float fStack_2244;
  undefined8 local_2240;
  undefined8 uStack_2238;
  undefined8 uStack_2230;
  undefined8 uStack_2228;
  float local_2220;
  float fStack_221c;
  float fStack_2218;
  float fStack_2214;
  float fStack_2210;
  float fStack_220c;
  float fStack_2208;
  float fStack_2204;
  undefined8 local_2200;
  undefined8 uStack_21f8;
  undefined8 uStack_21f0;
  undefined8 uStack_21e8;
  float local_21e0;
  float fStack_21dc;
  float fStack_21d8;
  float fStack_21d4;
  float fStack_21d0;
  float fStack_21cc;
  float fStack_21c8;
  float fStack_21c4;
  undefined8 local_21c0;
  undefined8 uStack_21b8;
  undefined8 uStack_21b0;
  undefined8 uStack_21a8;
  float local_21a0;
  float fStack_219c;
  float fStack_2198;
  float fStack_2194;
  float fStack_2190;
  float fStack_218c;
  float fStack_2188;
  float fStack_2184;
  undefined8 local_2180;
  undefined8 uStack_2178;
  undefined8 uStack_2170;
  undefined8 uStack_2168;
  float local_2160;
  float fStack_215c;
  float fStack_2158;
  float fStack_2154;
  float fStack_2150;
  float fStack_214c;
  float fStack_2148;
  float fStack_2144;
  undefined8 local_2140;
  undefined8 uStack_2138;
  undefined8 uStack_2130;
  undefined8 uStack_2128;
  float local_2120;
  float fStack_211c;
  float fStack_2118;
  float fStack_2114;
  float fStack_2110;
  float fStack_210c;
  float fStack_2108;
  float fStack_2104;
  undefined8 local_2100;
  undefined8 uStack_20f8;
  undefined8 uStack_20f0;
  undefined8 uStack_20e8;
  float local_20e0;
  float fStack_20dc;
  float fStack_20d8;
  float fStack_20d4;
  float fStack_20d0;
  float fStack_20cc;
  float fStack_20c8;
  float fStack_20c4;
  undefined8 local_20c0;
  undefined8 uStack_20b8;
  undefined8 uStack_20b0;
  undefined8 uStack_20a8;
  float local_20a0;
  float fStack_209c;
  float fStack_2098;
  float fStack_2094;
  float fStack_2090;
  float fStack_208c;
  float fStack_2088;
  float fStack_2084;
  undefined8 local_2080;
  undefined8 uStack_2078;
  undefined8 uStack_2070;
  undefined8 uStack_2068;
  float local_2060;
  float fStack_205c;
  float fStack_2058;
  float fStack_2054;
  float fStack_2050;
  float fStack_204c;
  float fStack_2048;
  float fStack_2044;
  undefined8 local_2040;
  undefined8 uStack_2038;
  undefined8 uStack_2030;
  undefined8 uStack_2028;
  float local_2020;
  float fStack_201c;
  float fStack_2018;
  float fStack_2014;
  float fStack_2010;
  float fStack_200c;
  float fStack_2008;
  float fStack_2004;
  undefined8 local_2000;
  undefined8 uStack_1ff8;
  undefined8 uStack_1ff0;
  undefined8 uStack_1fe8;
  float local_1fe0;
  float fStack_1fdc;
  float fStack_1fd8;
  float fStack_1fd4;
  float fStack_1fd0;
  float fStack_1fcc;
  float fStack_1fc8;
  float fStack_1fc4;
  undefined8 local_1fc0;
  undefined8 uStack_1fb8;
  undefined8 uStack_1fb0;
  undefined8 uStack_1fa8;
  float local_1fa0;
  float fStack_1f9c;
  float fStack_1f98;
  float fStack_1f94;
  float fStack_1f90;
  float fStack_1f8c;
  float fStack_1f88;
  float fStack_1f84;
  undefined8 local_1f80;
  undefined8 uStack_1f78;
  undefined8 uStack_1f70;
  undefined8 uStack_1f68;
  float local_1f60;
  float fStack_1f5c;
  float fStack_1f58;
  float fStack_1f54;
  float fStack_1f50;
  float fStack_1f4c;
  float fStack_1f48;
  float fStack_1f44;
  undefined8 local_1f40;
  undefined8 uStack_1f38;
  undefined8 uStack_1f30;
  undefined8 uStack_1f28;
  float local_1f20;
  float fStack_1f1c;
  float fStack_1f18;
  float fStack_1f14;
  float fStack_1f10;
  float fStack_1f0c;
  float fStack_1f08;
  float fStack_1f04;
  undefined8 local_1f00;
  undefined8 uStack_1ef8;
  undefined8 uStack_1ef0;
  undefined8 uStack_1ee8;
  float local_1ee0;
  float fStack_1edc;
  float fStack_1ed8;
  float fStack_1ed4;
  float fStack_1ed0;
  float fStack_1ecc;
  float fStack_1ec8;
  float fStack_1ec4;
  undefined8 local_1ec0;
  undefined8 uStack_1eb8;
  undefined8 uStack_1eb0;
  undefined8 uStack_1ea8;
  float local_1ea0;
  float fStack_1e9c;
  float fStack_1e98;
  float fStack_1e94;
  float fStack_1e90;
  float fStack_1e8c;
  float fStack_1e88;
  float fStack_1e84;
  undefined8 local_1e80;
  undefined8 uStack_1e78;
  undefined8 uStack_1e70;
  undefined8 uStack_1e68;
  float local_1e60;
  float fStack_1e5c;
  float fStack_1e58;
  float fStack_1e54;
  float fStack_1e50;
  float fStack_1e4c;
  float fStack_1e48;
  float fStack_1e44;
  undefined8 local_1e40;
  undefined8 uStack_1e38;
  undefined8 uStack_1e30;
  undefined8 uStack_1e28;
  float local_1e20;
  float fStack_1e1c;
  float fStack_1e18;
  float fStack_1e14;
  float fStack_1e10;
  float fStack_1e0c;
  float fStack_1e08;
  float fStack_1e04;
  undefined8 local_1e00;
  undefined8 uStack_1df8;
  undefined8 uStack_1df0;
  undefined8 uStack_1de8;
  float local_1de0;
  float fStack_1ddc;
  float fStack_1dd8;
  float fStack_1dd4;
  float fStack_1dd0;
  float fStack_1dcc;
  float fStack_1dc8;
  float fStack_1dc4;
  undefined8 local_1dc0;
  undefined8 uStack_1db8;
  undefined8 uStack_1db0;
  undefined8 uStack_1da8;
  float local_1da0;
  float fStack_1d9c;
  float fStack_1d98;
  float fStack_1d94;
  float fStack_1d90;
  float fStack_1d8c;
  float fStack_1d88;
  float fStack_1d84;
  undefined8 local_1d80;
  undefined8 uStack_1d78;
  undefined8 uStack_1d70;
  undefined8 uStack_1d68;
  float local_1d60;
  float fStack_1d5c;
  float fStack_1d58;
  float fStack_1d54;
  float fStack_1d50;
  float fStack_1d4c;
  float fStack_1d48;
  float fStack_1d44;
  undefined8 local_1d40;
  undefined8 uStack_1d38;
  undefined8 uStack_1d30;
  undefined8 uStack_1d28;
  float local_1d20;
  float fStack_1d1c;
  float fStack_1d18;
  float fStack_1d14;
  float fStack_1d10;
  float fStack_1d0c;
  float fStack_1d08;
  float fStack_1d04;
  undefined8 local_1d00;
  undefined8 uStack_1cf8;
  undefined8 uStack_1cf0;
  undefined8 uStack_1ce8;
  float local_1ce0;
  float fStack_1cdc;
  float fStack_1cd8;
  float fStack_1cd4;
  float fStack_1cd0;
  float fStack_1ccc;
  float fStack_1cc8;
  float fStack_1cc4;
  undefined8 local_1cc0;
  undefined8 uStack_1cb8;
  undefined8 uStack_1cb0;
  undefined8 uStack_1ca8;
  float local_1ca0;
  float fStack_1c9c;
  float fStack_1c98;
  float fStack_1c94;
  float fStack_1c90;
  float fStack_1c8c;
  float fStack_1c88;
  float fStack_1c84;
  undefined8 local_1c80;
  undefined8 uStack_1c78;
  undefined8 uStack_1c70;
  undefined8 uStack_1c68;
  float local_1c60;
  float fStack_1c5c;
  float fStack_1c58;
  float fStack_1c54;
  float fStack_1c50;
  float fStack_1c4c;
  float fStack_1c48;
  float fStack_1c44;
  undefined8 local_1c40;
  undefined8 uStack_1c38;
  undefined8 uStack_1c30;
  undefined8 uStack_1c28;
  float local_1c20;
  float fStack_1c1c;
  float fStack_1c18;
  float fStack_1c14;
  float fStack_1c10;
  float fStack_1c0c;
  float fStack_1c08;
  float fStack_1c04;
  undefined8 local_1c00;
  undefined8 uStack_1bf8;
  undefined8 uStack_1bf0;
  undefined8 uStack_1be8;
  float local_1be0;
  float fStack_1bdc;
  float fStack_1bd8;
  float fStack_1bd4;
  float fStack_1bd0;
  float fStack_1bcc;
  float fStack_1bc8;
  float fStack_1bc4;
  undefined8 local_1bc0;
  undefined8 uStack_1bb8;
  undefined8 uStack_1bb0;
  undefined8 uStack_1ba8;
  float local_1ba0;
  float fStack_1b9c;
  float fStack_1b98;
  float fStack_1b94;
  float fStack_1b90;
  float fStack_1b8c;
  float fStack_1b88;
  float fStack_1b84;
  undefined8 local_1b80;
  undefined8 uStack_1b78;
  undefined8 uStack_1b70;
  undefined8 uStack_1b68;
  float local_1b60;
  float fStack_1b5c;
  float fStack_1b58;
  float fStack_1b54;
  float fStack_1b50;
  float fStack_1b4c;
  float fStack_1b48;
  float fStack_1b44;
  undefined8 local_1b40;
  undefined8 uStack_1b38;
  undefined8 uStack_1b30;
  undefined8 uStack_1b28;
  float local_1b20;
  float fStack_1b1c;
  float fStack_1b18;
  float fStack_1b14;
  float fStack_1b10;
  float fStack_1b0c;
  float fStack_1b08;
  float fStack_1b04;
  undefined8 local_1b00;
  undefined8 uStack_1af8;
  undefined8 uStack_1af0;
  undefined8 uStack_1ae8;
  float local_1ae0;
  float fStack_1adc;
  float fStack_1ad8;
  float fStack_1ad4;
  float fStack_1ad0;
  float fStack_1acc;
  float fStack_1ac8;
  float fStack_1ac4;
  undefined8 local_1ac0;
  undefined8 uStack_1ab8;
  undefined8 uStack_1ab0;
  undefined8 uStack_1aa8;
  float local_1aa0;
  float fStack_1a9c;
  float fStack_1a98;
  float fStack_1a94;
  float fStack_1a90;
  float fStack_1a8c;
  float fStack_1a88;
  float fStack_1a84;
  undefined8 local_1a80;
  undefined8 uStack_1a78;
  undefined8 uStack_1a70;
  undefined8 uStack_1a68;
  float local_1a60;
  float fStack_1a5c;
  float fStack_1a58;
  float fStack_1a54;
  float fStack_1a50;
  float fStack_1a4c;
  float fStack_1a48;
  float fStack_1a44;
  undefined8 local_1a40;
  undefined8 uStack_1a38;
  undefined8 uStack_1a30;
  undefined8 uStack_1a28;
  float local_1a20;
  float fStack_1a1c;
  float fStack_1a18;
  float fStack_1a14;
  float fStack_1a10;
  float fStack_1a0c;
  float fStack_1a08;
  float fStack_1a04;
  undefined8 local_1a00;
  undefined8 uStack_19f8;
  undefined8 uStack_19f0;
  undefined8 uStack_19e8;
  float local_19e0;
  float fStack_19dc;
  float fStack_19d8;
  float fStack_19d4;
  float fStack_19d0;
  float fStack_19cc;
  float fStack_19c8;
  float fStack_19c4;
  undefined8 local_19c0;
  undefined8 uStack_19b8;
  undefined8 uStack_19b0;
  undefined8 uStack_19a8;
  float local_19a0;
  float fStack_199c;
  float fStack_1998;
  float fStack_1994;
  float fStack_1990;
  float fStack_198c;
  float fStack_1988;
  float fStack_1984;
  undefined8 local_1980;
  undefined8 uStack_1978;
  undefined8 uStack_1970;
  undefined8 uStack_1968;
  float local_1960;
  float fStack_195c;
  float fStack_1958;
  float fStack_1954;
  float fStack_1950;
  float fStack_194c;
  float fStack_1948;
  float fStack_1944;
  undefined8 local_1940;
  undefined8 uStack_1938;
  undefined8 uStack_1930;
  undefined8 uStack_1928;
  float local_1920;
  float fStack_191c;
  float fStack_1918;
  float fStack_1914;
  float fStack_1910;
  float fStack_190c;
  float fStack_1908;
  float fStack_1904;
  undefined8 local_1900;
  undefined8 uStack_18f8;
  undefined8 uStack_18f0;
  undefined8 uStack_18e8;
  float local_18e0;
  float fStack_18dc;
  float fStack_18d8;
  float fStack_18d4;
  float fStack_18d0;
  float fStack_18cc;
  float fStack_18c8;
  float fStack_18c4;
  undefined8 local_18c0;
  undefined8 uStack_18b8;
  undefined8 uStack_18b0;
  undefined8 uStack_18a8;
  float local_18a0;
  float fStack_189c;
  float fStack_1898;
  float fStack_1894;
  float fStack_1890;
  float fStack_188c;
  float fStack_1888;
  float fStack_1884;
  undefined8 local_1880;
  undefined8 uStack_1878;
  undefined8 uStack_1870;
  undefined8 uStack_1868;
  float local_1860;
  float fStack_185c;
  float fStack_1858;
  float fStack_1854;
  float fStack_1850;
  float fStack_184c;
  float fStack_1848;
  float fStack_1844;
  undefined8 local_1840;
  undefined8 uStack_1838;
  undefined8 uStack_1830;
  undefined8 uStack_1828;
  float local_1820;
  float fStack_181c;
  float fStack_1818;
  float fStack_1814;
  float fStack_1810;
  float fStack_180c;
  float fStack_1808;
  float fStack_1804;
  undefined8 local_1800;
  undefined8 uStack_17f8;
  undefined8 uStack_17f0;
  undefined8 uStack_17e8;
  float local_17e0;
  float fStack_17dc;
  float fStack_17d8;
  float fStack_17d4;
  float fStack_17d0;
  float fStack_17cc;
  float fStack_17c8;
  float fStack_17c4;
  undefined8 local_17c0;
  undefined8 uStack_17b8;
  undefined8 uStack_17b0;
  undefined8 uStack_17a8;
  float local_17a0;
  float fStack_179c;
  float fStack_1798;
  float fStack_1794;
  float fStack_1790;
  float fStack_178c;
  float fStack_1788;
  float fStack_1784;
  undefined8 local_1780;
  undefined8 uStack_1778;
  undefined8 uStack_1770;
  undefined8 uStack_1768;
  float local_1760;
  float fStack_175c;
  float fStack_1758;
  float fStack_1754;
  float fStack_1750;
  float fStack_174c;
  float fStack_1748;
  float fStack_1744;
  undefined8 local_1740;
  undefined8 uStack_1738;
  undefined8 uStack_1730;
  undefined8 uStack_1728;
  float local_1720;
  float fStack_171c;
  float fStack_1718;
  float fStack_1714;
  float fStack_1710;
  float fStack_170c;
  float fStack_1708;
  float fStack_1704;
  undefined8 local_1700;
  undefined8 uStack_16f8;
  undefined8 uStack_16f0;
  undefined8 uStack_16e8;
  float local_16e0;
  float fStack_16dc;
  float fStack_16d8;
  float fStack_16d4;
  float fStack_16d0;
  float fStack_16cc;
  float fStack_16c8;
  float fStack_16c4;
  undefined8 local_16c0;
  undefined8 uStack_16b8;
  undefined8 uStack_16b0;
  undefined8 uStack_16a8;
  float local_16a0;
  float fStack_169c;
  float fStack_1698;
  float fStack_1694;
  float fStack_1690;
  float fStack_168c;
  float fStack_1688;
  float fStack_1684;
  undefined8 local_1680;
  undefined8 uStack_1678;
  undefined8 uStack_1670;
  undefined8 uStack_1668;
  float local_1660;
  float fStack_165c;
  float fStack_1658;
  float fStack_1654;
  float fStack_1650;
  float fStack_164c;
  float fStack_1648;
  float fStack_1644;
  undefined8 local_1640;
  undefined8 uStack_1638;
  undefined8 uStack_1630;
  undefined8 uStack_1628;
  float local_1620;
  float fStack_161c;
  float fStack_1618;
  float fStack_1614;
  float fStack_1610;
  float fStack_160c;
  float fStack_1608;
  float fStack_1604;
  undefined8 local_1600;
  undefined8 uStack_15f8;
  undefined8 uStack_15f0;
  undefined8 uStack_15e8;
  float local_15e0;
  float fStack_15dc;
  float fStack_15d8;
  float fStack_15d4;
  float fStack_15d0;
  float fStack_15cc;
  float fStack_15c8;
  float fStack_15c4;
  undefined8 local_15c0;
  undefined8 uStack_15b8;
  undefined8 uStack_15b0;
  undefined8 uStack_15a8;
  float local_15a0;
  float fStack_159c;
  float fStack_1598;
  float fStack_1594;
  float fStack_1590;
  float fStack_158c;
  float fStack_1588;
  float fStack_1584;
  undefined8 local_1580;
  undefined8 uStack_1578;
  undefined8 uStack_1570;
  undefined8 uStack_1568;
  float local_1560;
  float fStack_155c;
  float fStack_1558;
  float fStack_1554;
  float fStack_1550;
  float fStack_154c;
  float fStack_1548;
  float fStack_1544;
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined8 uStack_1530;
  undefined8 uStack_1528;
  float local_1520;
  float fStack_151c;
  float fStack_1518;
  float fStack_1514;
  float fStack_1510;
  float fStack_150c;
  float fStack_1508;
  float fStack_1504;
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  float local_14e0;
  float fStack_14dc;
  float fStack_14d8;
  float fStack_14d4;
  float fStack_14d0;
  float fStack_14cc;
  float fStack_14c8;
  float fStack_14c4;
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  float local_14a0;
  float fStack_149c;
  float fStack_1498;
  float fStack_1494;
  float fStack_1490;
  float fStack_148c;
  float fStack_1488;
  float fStack_1484;
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  float local_1460;
  float fStack_145c;
  float fStack_1458;
  float fStack_1454;
  float fStack_1450;
  float fStack_144c;
  float fStack_1448;
  float fStack_1444;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  float local_1420;
  float fStack_141c;
  float fStack_1418;
  float fStack_1414;
  float fStack_1410;
  float fStack_140c;
  float fStack_1408;
  float fStack_1404;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  float local_13e0;
  float fStack_13dc;
  float fStack_13d8;
  float fStack_13d4;
  float fStack_13d0;
  float fStack_13cc;
  float fStack_13c8;
  float fStack_13c4;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  float local_13a0;
  float fStack_139c;
  float fStack_1398;
  float fStack_1394;
  float fStack_1390;
  float fStack_138c;
  float fStack_1388;
  float fStack_1384;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  float local_1360;
  float fStack_135c;
  float fStack_1358;
  float fStack_1354;
  float fStack_1350;
  float fStack_134c;
  float fStack_1348;
  float fStack_1344;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  float local_1320;
  float fStack_131c;
  float fStack_1318;
  float fStack_1314;
  float fStack_1310;
  float fStack_130c;
  float fStack_1308;
  float fStack_1304;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  float local_12e0;
  float fStack_12dc;
  float fStack_12d8;
  float fStack_12d4;
  float fStack_12d0;
  float fStack_12cc;
  float fStack_12c8;
  float fStack_12c4;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  float local_12a0;
  float fStack_129c;
  float fStack_1298;
  float fStack_1294;
  float fStack_1290;
  float fStack_128c;
  float fStack_1288;
  float fStack_1284;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  float local_1260;
  float fStack_125c;
  float fStack_1258;
  float fStack_1254;
  float fStack_1250;
  float fStack_124c;
  float fStack_1248;
  float fStack_1244;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  float local_1220;
  float fStack_121c;
  float fStack_1218;
  float fStack_1214;
  float fStack_1210;
  float fStack_120c;
  float fStack_1208;
  float fStack_1204;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  float local_11e0;
  float fStack_11dc;
  float fStack_11d8;
  float fStack_11d4;
  float fStack_11d0;
  float fStack_11cc;
  float fStack_11c8;
  float fStack_11c4;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  float local_11a0;
  float fStack_119c;
  float fStack_1198;
  float fStack_1194;
  float fStack_1190;
  float fStack_118c;
  float fStack_1188;
  float fStack_1184;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  float local_1160;
  float fStack_115c;
  float fStack_1158;
  float fStack_1154;
  float fStack_1150;
  float fStack_114c;
  float fStack_1148;
  float fStack_1144;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  float local_1120;
  float fStack_111c;
  float fStack_1118;
  float fStack_1114;
  float fStack_1110;
  float fStack_110c;
  float fStack_1108;
  float fStack_1104;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  float local_10e0;
  float fStack_10dc;
  float fStack_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  float fStack_10c8;
  float fStack_10c4;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  float local_10a0;
  float fStack_109c;
  float fStack_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  float fStack_1088;
  float fStack_1084;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  float local_1060;
  float fStack_105c;
  float fStack_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float fStack_1048;
  float fStack_1044;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  float local_1020;
  float fStack_101c;
  float fStack_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float fStack_1008;
  float fStack_1004;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  float local_fe0;
  float fStack_fdc;
  float fStack_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float fStack_fc8;
  float fStack_fc4;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  float local_fa0;
  float fStack_f9c;
  float fStack_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float fStack_f88;
  float fStack_f84;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  float local_f60;
  float fStack_f5c;
  float fStack_f58;
  float fStack_f54;
  float fStack_f50;
  float fStack_f4c;
  float fStack_f48;
  float fStack_f44;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  float local_f20;
  float fStack_f1c;
  float fStack_f18;
  float fStack_f14;
  float fStack_f10;
  float fStack_f0c;
  float fStack_f08;
  float fStack_f04;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  float local_ee0;
  float fStack_edc;
  float fStack_ed8;
  float fStack_ed4;
  float fStack_ed0;
  float fStack_ecc;
  float fStack_ec8;
  float fStack_ec4;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  float local_ea0;
  float fStack_e9c;
  float fStack_e98;
  float fStack_e94;
  float fStack_e90;
  float fStack_e8c;
  float fStack_e88;
  float fStack_e84;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  float local_e60;
  float fStack_e5c;
  float fStack_e58;
  float fStack_e54;
  float fStack_e50;
  float fStack_e4c;
  float fStack_e48;
  float fStack_e44;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  float local_e20;
  float fStack_e1c;
  float fStack_e18;
  float fStack_e14;
  float fStack_e10;
  float fStack_e0c;
  float fStack_e08;
  float fStack_e04;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  float local_de0;
  float fStack_ddc;
  float fStack_dd8;
  float fStack_dd4;
  float fStack_dd0;
  float fStack_dcc;
  float fStack_dc8;
  float fStack_dc4;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  float local_da0;
  float fStack_d9c;
  float fStack_d98;
  float fStack_d94;
  float fStack_d90;
  float fStack_d8c;
  float fStack_d88;
  float fStack_d84;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  float local_d60;
  float fStack_d5c;
  float fStack_d58;
  float fStack_d54;
  float fStack_d50;
  float fStack_d4c;
  float fStack_d48;
  float fStack_d44;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  float local_d20;
  float fStack_d1c;
  float fStack_d18;
  float fStack_d14;
  float fStack_d10;
  float fStack_d0c;
  float fStack_d08;
  float fStack_d04;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  float local_ce0;
  float fStack_cdc;
  float fStack_cd8;
  float fStack_cd4;
  float fStack_cd0;
  float fStack_ccc;
  float fStack_cc8;
  float fStack_cc4;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  float local_ca0;
  float fStack_c9c;
  float fStack_c98;
  float fStack_c94;
  float fStack_c90;
  float fStack_c8c;
  float fStack_c88;
  float fStack_c84;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  float local_c60;
  float fStack_c5c;
  float fStack_c58;
  float fStack_c54;
  float fStack_c50;
  float fStack_c4c;
  float fStack_c48;
  float fStack_c44;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  float local_c20;
  float fStack_c1c;
  float fStack_c18;
  float fStack_c14;
  float fStack_c10;
  float fStack_c0c;
  float fStack_c08;
  float fStack_c04;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  float local_be0;
  float fStack_bdc;
  float fStack_bd8;
  float fStack_bd4;
  float fStack_bd0;
  float fStack_bcc;
  float fStack_bc8;
  float fStack_bc4;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  float local_ba0;
  float fStack_b9c;
  float fStack_b98;
  float fStack_b94;
  float fStack_b90;
  float fStack_b8c;
  float fStack_b88;
  float fStack_b84;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  float local_b60;
  float fStack_b5c;
  float fStack_b58;
  float fStack_b54;
  float fStack_b50;
  float fStack_b4c;
  float fStack_b48;
  float fStack_b44;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  float local_b20;
  float fStack_b1c;
  float fStack_b18;
  float fStack_b14;
  float fStack_b10;
  float fStack_b0c;
  float fStack_b08;
  float fStack_b04;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  float local_ae0;
  float fStack_adc;
  float fStack_ad8;
  float fStack_ad4;
  float fStack_ad0;
  float fStack_acc;
  float fStack_ac8;
  float fStack_ac4;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  float local_aa0;
  float fStack_a9c;
  float fStack_a98;
  float fStack_a94;
  float fStack_a90;
  float fStack_a8c;
  float fStack_a88;
  float fStack_a84;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  float local_a60;
  float fStack_a5c;
  float fStack_a58;
  float fStack_a54;
  float fStack_a50;
  float fStack_a4c;
  float fStack_a48;
  float fStack_a44;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  float local_a20;
  float fStack_a1c;
  float fStack_a18;
  float fStack_a14;
  float fStack_a10;
  float fStack_a0c;
  float fStack_a08;
  float fStack_a04;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  float local_9e0;
  float fStack_9dc;
  float fStack_9d8;
  float fStack_9d4;
  float fStack_9d0;
  float fStack_9cc;
  float fStack_9c8;
  float fStack_9c4;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  float local_9a0;
  float fStack_99c;
  float fStack_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  float fStack_984;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  float local_960;
  float fStack_95c;
  float fStack_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float fStack_948;
  float fStack_944;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  float local_920;
  float fStack_91c;
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  float fStack_904;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  float local_8e0;
  float fStack_8dc;
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  float local_8a0;
  float fStack_89c;
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  float local_860;
  float fStack_85c;
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  float local_820;
  float fStack_81c;
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  float local_7e0;
  float fStack_7dc;
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  float local_7a0;
  float fStack_79c;
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  float local_760;
  float fStack_75c;
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  float local_720;
  float fStack_71c;
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  float local_6e0;
  float fStack_6dc;
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  float local_6a0;
  float fStack_69c;
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  float local_5e0;
  float fStack_5dc;
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  float local_4e0;
  float fStack_4dc;
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  float local_4a0;
  float fStack_49c;
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  float local_460;
  float fStack_45c;
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  float local_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  float local_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  float local_1e0;
  float fStack_1dc;
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  float local_1a0;
  float fStack_19c;
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  float local_160;
  float fStack_15c;
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  float local_e0;
  float fStack_dc;
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  float local_a0;
  float fStack_9c;
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  undefined1 local_80 [32];
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 local_44;
  undefined4 local_40;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  
  local_6b94 = *(int *)(in_RDI + 0x38);
  local_6b98 = *(int *)(in_RSI + 0x2c);
  local_6b9c = *(int *)(in_RSI + 0x30);
  local_6ba0 = *(int *)(in_RSI + 0x38);
  local_6ba8 = Mat::operator_cast_to_float_(in_RCX);
  for (local_6bac = 0; local_6bac < local_6ba0; local_6bac = local_6bac + 1) {
    Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffff6bf4,in_stack_ffffffffffff6bf0),
                 (int)in_stack_ffffffffffff6bec);
    if (local_6ba8 == (float *)0x0) {
      local_6b64 = 0;
      local_34 = 0;
      local_38 = 0;
      local_3c = 0;
      local_40 = 0;
      local_44 = 0;
      local_48 = 0;
      local_4c = 0;
      local_50 = 0;
      auVar1 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0),0x20);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0),0x20);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0),0x30);
      auVar136._16_16_ = auVar1;
      auVar136._0_16_ = auVar2;
      local_80._0_8_ = auVar2._0_8_;
      local_80._8_8_ = auVar2._8_8_;
      local_80._16_8_ = auVar1._0_8_;
      local_80._24_8_ = auVar1._8_8_;
      local_75a0 = local_80._0_8_;
      uStack_7598 = local_80._8_8_;
      uStack_7590 = local_80._16_8_;
      uStack_7588 = local_80._24_8_;
      local_80 = auVar136;
    }
    else {
      local_6948 = local_6ba8 + (local_6bac << 3);
      local_75a0 = *(undefined8 *)local_6948;
      uStack_7598 = *(undefined8 *)(local_6948 + 2);
      uStack_7590 = *(undefined8 *)(local_6948 + 4);
      uStack_7588 = *(undefined8 *)(local_6948 + 6);
    }
    local_6c20 = local_75a0;
    uStack_6c18 = uStack_7598;
    uStack_6c10 = uStack_7590;
    uStack_6c08 = uStack_7588;
    _v[1] = in_stack_ffffffffffff6bdc;
    _v[0] = in_stack_ffffffffffff6bd8;
    _v[2] = in_stack_ffffffffffff6be0;
    _v[3] = in_stack_ffffffffffff6be4;
    _v[4] = in_stack_ffffffffffff6be8;
    _v[5] = in_stack_ffffffffffff6bec;
    _v[6] = in_stack_ffffffffffff6bf0;
    _v[7] = in_stack_ffffffffffff6bf4;
    Mat::fill((Mat *)CONCAT44(in_stack_ffffffffffff6c14,in_stack_ffffffffffff6c10),_v);
    for (local_6c30 = 0; local_6c30 < local_6b94; local_6c30 = local_6c30 + 1) {
      local_6c38 = (undefined1 (*) [32])Mat::row(&local_6bf8,0);
      Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffff6bf4,in_stack_ffffffffffff6bf0),
                   (int)in_stack_ffffffffffff6bec);
      local_6c88 = Mat::row(&local_6c80,0);
      local_6c90 = Mat::row(&local_6c80,1);
      Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffff6bf4,in_stack_ffffffffffff6bf0),
                   (int)in_stack_ffffffffffff6bec);
      pfVar133 = Mat::row(&local_6ce0,local_6c30);
      Mat::~Mat((Mat *)0x3056f3);
      for (local_6ce4 = 0; local_6ce4 < local_6b9c; local_6ce4 = local_6ce4 + 1) {
        for (local_6ce8 = 0; local_6ce8 + 1 < local_6b98; local_6ce8 = local_6ce8 + 2) {
          local_6950 = local_6c38;
          local_30e0 = *(undefined8 *)*local_6c38;
          uStack_30d8 = *(undefined8 *)(*local_6c38 + 8);
          uStack_30d0 = *(undefined8 *)(*local_6c38 + 0x10);
          uStack_30c8 = *(undefined8 *)(*local_6c38 + 0x18);
          local_6958 = local_6c38 + 1;
          local_33e0 = *(undefined8 *)*local_6958;
          uStack_33d8 = *(undefined8 *)(local_6c38[1] + 8);
          uStack_33d0 = *(undefined8 *)(local_6c38[1] + 0x10);
          uStack_33c8 = *(undefined8 *)(local_6c38[1] + 0x18);
          local_5548 = local_6c88;
          local_5580 = *local_6c88;
          local_30c0 = CONCAT44(local_5580,local_5580);
          uStack_30b8 = CONCAT44(local_5580,local_5580);
          uStack_30b0 = CONCAT44(local_5580,local_5580);
          uStack_30a8 = CONCAT44(local_5580,local_5580);
          local_5588 = local_6c88 + 1;
          local_55c0 = *local_5588;
          local_3120 = CONCAT44(local_55c0,local_55c0);
          uStack_3118 = CONCAT44(local_55c0,local_55c0);
          uStack_3110 = CONCAT44(local_55c0,local_55c0);
          uStack_3108 = CONCAT44(local_55c0,local_55c0);
          local_55c8 = local_6c88 + 2;
          local_5600 = *local_55c8;
          local_3180 = CONCAT44(local_5600,local_5600);
          uStack_3178 = CONCAT44(local_5600,local_5600);
          uStack_3170 = CONCAT44(local_5600,local_5600);
          uStack_3168 = CONCAT44(local_5600,local_5600);
          local_5608 = local_6c88 + 3;
          local_5640 = *local_5608;
          local_31e0 = CONCAT44(local_5640,local_5640);
          uStack_31d8 = CONCAT44(local_5640,local_5640);
          uStack_31d0 = CONCAT44(local_5640,local_5640);
          uStack_31c8 = CONCAT44(local_5640,local_5640);
          local_5648 = local_6c88 + 4;
          local_5680 = *local_5648;
          local_3240 = CONCAT44(local_5680,local_5680);
          uStack_3238 = CONCAT44(local_5680,local_5680);
          uStack_3230 = CONCAT44(local_5680,local_5680);
          uStack_3228 = CONCAT44(local_5680,local_5680);
          local_5688 = local_6c88 + 5;
          local_56c0 = *local_5688;
          local_32a0 = CONCAT44(local_56c0,local_56c0);
          uStack_3298 = CONCAT44(local_56c0,local_56c0);
          uStack_3290 = CONCAT44(local_56c0,local_56c0);
          uStack_3288 = CONCAT44(local_56c0,local_56c0);
          local_56c8 = local_6c88 + 6;
          local_5700 = *local_56c8;
          local_3300 = CONCAT44(local_5700,local_5700);
          uStack_32f8 = CONCAT44(local_5700,local_5700);
          uStack_32f0 = CONCAT44(local_5700,local_5700);
          uStack_32e8 = CONCAT44(local_5700,local_5700);
          local_5708 = local_6c88 + 7;
          local_5740 = *local_5708;
          local_3360 = CONCAT44(local_5740,local_5740);
          uStack_3358 = CONCAT44(local_5740,local_5740);
          uStack_3350 = CONCAT44(local_5740,local_5740);
          uStack_3348 = CONCAT44(local_5740,local_5740);
          local_5748 = local_6c88 + 8;
          local_33a0 = *(undefined8 *)pfVar133;
          uStack_3398 = *(undefined8 *)(pfVar133 + 2);
          uStack_3390 = *(undefined8 *)(pfVar133 + 4);
          uStack_3388 = *(undefined8 *)(pfVar133 + 6);
          local_6968 = pfVar133 + 8;
          local_3400 = *(undefined8 *)local_6968;
          uStack_33f8 = *(undefined8 *)(pfVar133 + 10);
          uStack_33f0 = *(undefined8 *)(pfVar133 + 0xc);
          uStack_33e8 = *(undefined8 *)(pfVar133 + 0xe);
          local_6970 = pfVar133 + 0x10;
          local_3460 = *(undefined8 *)local_6970;
          uStack_3458 = *(undefined8 *)(pfVar133 + 0x12);
          uStack_3450 = *(undefined8 *)(pfVar133 + 0x14);
          uStack_3448 = *(undefined8 *)(pfVar133 + 0x16);
          local_6978 = pfVar133 + 0x18;
          local_34c0 = *(undefined8 *)local_6978;
          uStack_34b8 = *(undefined8 *)(pfVar133 + 0x1a);
          uStack_34b0 = *(undefined8 *)(pfVar133 + 0x1c);
          uStack_34a8 = *(undefined8 *)(pfVar133 + 0x1e);
          local_6980 = pfVar133 + 0x20;
          local_30a0._0_4_ = (float)local_33a0;
          local_3060 = (float)local_30a0;
          local_30a0._4_4_ = (float)((ulong)local_33a0 >> 0x20);
          fStack_305c = local_30a0._4_4_;
          uStack_3098._0_4_ = (float)uStack_3398;
          fStack_3058 = (float)uStack_3098;
          uStack_3098._4_4_ = (float)((ulong)uStack_3398 >> 0x20);
          fStack_3054 = uStack_3098._4_4_;
          uStack_3090._0_4_ = (float)uStack_3390;
          fStack_3050 = (float)uStack_3090;
          uStack_3090._4_4_ = (float)((ulong)uStack_3390 >> 0x20);
          fStack_304c = uStack_3090._4_4_;
          uStack_3088._0_4_ = (float)uStack_3388;
          fStack_3048 = (float)uStack_3088;
          uStack_3088._4_4_ = (float)((ulong)uStack_3388 >> 0x20);
          fStack_3044 = uStack_3088._4_4_;
          local_1860 = (float)local_30a0 * local_5580;
          fStack_185c = local_30a0._4_4_ * local_5580;
          fStack_1858 = (float)uStack_3098 * local_5580;
          fStack_1854 = uStack_3098._4_4_ * local_5580;
          fStack_1850 = (float)uStack_3090 * local_5580;
          fStack_184c = uStack_3090._4_4_ * local_5580;
          fStack_1848 = (float)uStack_3088 * local_5580;
          local_1880._0_4_ = (float)local_30e0;
          local_1880._4_4_ = (float)((ulong)local_30e0 >> 0x20);
          uStack_1878._0_4_ = (float)uStack_30d8;
          uStack_1878._4_4_ = (float)((ulong)uStack_30d8 >> 0x20);
          uStack_1870._0_4_ = (float)uStack_30d0;
          uStack_1870._4_4_ = (float)((ulong)uStack_30d0 >> 0x20);
          uStack_1868._0_4_ = (float)uStack_30c8;
          uStack_1868._4_4_ = (float)((ulong)uStack_30c8 >> 0x20);
          local_3140 = CONCAT44(fStack_185c + local_1880._4_4_,local_1860 + (float)local_1880);
          uStack_3138 = CONCAT44(fStack_1854 + uStack_1878._4_4_,fStack_1858 + (float)uStack_1878);
          uStack_3130 = CONCAT44(fStack_184c + uStack_1870._4_4_,fStack_1850 + (float)uStack_1870);
          uStack_3128 = CONCAT44(uStack_3088._4_4_ + uStack_1868._4_4_,
                                 fStack_1848 + (float)uStack_1868);
          local_3100._0_4_ = (float)local_3400;
          local_3020 = (float)local_3100;
          local_3100._4_4_ = (float)((ulong)local_3400 >> 0x20);
          fStack_301c = local_3100._4_4_;
          uStack_30f8._0_4_ = (float)uStack_33f8;
          fStack_3018 = (float)uStack_30f8;
          uStack_30f8._4_4_ = (float)((ulong)uStack_33f8 >> 0x20);
          fStack_3014 = uStack_30f8._4_4_;
          uStack_30f0._0_4_ = (float)uStack_33f0;
          fStack_3010 = (float)uStack_30f0;
          uStack_30f0._4_4_ = (float)((ulong)uStack_33f0 >> 0x20);
          fStack_300c = uStack_30f0._4_4_;
          uStack_30e8._0_4_ = (float)uStack_33e8;
          fStack_3008 = (float)uStack_30e8;
          uStack_30e8._4_4_ = (float)((ulong)uStack_33e8 >> 0x20);
          fStack_3004 = uStack_30e8._4_4_;
          local_1820 = (float)local_3100 * local_55c0;
          fStack_181c = local_3100._4_4_ * local_55c0;
          fStack_1818 = (float)uStack_30f8 * local_55c0;
          fStack_1814 = uStack_30f8._4_4_ * local_55c0;
          fStack_1810 = (float)uStack_30f0 * local_55c0;
          fStack_180c = uStack_30f0._4_4_ * local_55c0;
          fStack_1808 = (float)uStack_30e8 * local_55c0;
          fVar134 = local_1820 + local_1860 + (float)local_1880;
          fVar137 = fStack_181c + fStack_185c + local_1880._4_4_;
          fVar139 = fStack_1818 + fStack_1858 + (float)uStack_1878;
          fVar141 = fStack_1814 + fStack_1854 + uStack_1878._4_4_;
          fVar143 = fStack_1810 + fStack_1850 + (float)uStack_1870;
          fVar145 = fStack_180c + fStack_184c + uStack_1870._4_4_;
          fVar147 = fStack_1808 + fStack_1848 + (float)uStack_1868;
          fVar149 = uStack_30e8._4_4_ + uStack_3088._4_4_ + uStack_1868._4_4_;
          local_31a0 = CONCAT44(fVar137,fVar134);
          uStack_3198 = CONCAT44(fVar141,fVar139);
          uStack_3190 = CONCAT44(fVar145,fVar143);
          uStack_3188 = CONCAT44(fVar149,fVar147);
          local_3160._0_4_ = (float)local_3460;
          local_2fe0 = (float)local_3160;
          local_3160._4_4_ = (float)((ulong)local_3460 >> 0x20);
          fStack_2fdc = local_3160._4_4_;
          uStack_3158._0_4_ = (float)uStack_3458;
          fStack_2fd8 = (float)uStack_3158;
          uStack_3158._4_4_ = (float)((ulong)uStack_3458 >> 0x20);
          fStack_2fd4 = uStack_3158._4_4_;
          uStack_3150._0_4_ = (float)uStack_3450;
          fStack_2fd0 = (float)uStack_3150;
          uStack_3150._4_4_ = (float)((ulong)uStack_3450 >> 0x20);
          fStack_2fcc = uStack_3150._4_4_;
          uStack_3148._0_4_ = (float)uStack_3448;
          fStack_2fc8 = (float)uStack_3148;
          uStack_3148._4_4_ = (float)((ulong)uStack_3448 >> 0x20);
          fStack_2fc4 = uStack_3148._4_4_;
          local_17e0 = (float)local_3160 * local_5600;
          fStack_17dc = local_3160._4_4_ * local_5600;
          fStack_17d8 = (float)uStack_3158 * local_5600;
          fStack_17d4 = uStack_3158._4_4_ * local_5600;
          fStack_17d0 = (float)uStack_3150 * local_5600;
          fStack_17cc = uStack_3150._4_4_ * local_5600;
          fStack_17c8 = (float)uStack_3148 * local_5600;
          fVar134 = local_17e0 + fVar134;
          fVar137 = fStack_17dc + fVar137;
          fVar139 = fStack_17d8 + fVar139;
          fVar141 = fStack_17d4 + fVar141;
          fVar143 = fStack_17d0 + fVar143;
          fVar145 = fStack_17cc + fVar145;
          fVar147 = fStack_17c8 + fVar147;
          fVar149 = uStack_3148._4_4_ + fVar149;
          local_3200 = CONCAT44(fVar137,fVar134);
          uStack_31f8 = CONCAT44(fVar141,fVar139);
          uStack_31f0 = CONCAT44(fVar145,fVar143);
          uStack_31e8 = CONCAT44(fVar149,fVar147);
          local_31c0._0_4_ = (float)local_34c0;
          local_2fa0 = (float)local_31c0;
          local_31c0._4_4_ = (float)((ulong)local_34c0 >> 0x20);
          fStack_2f9c = local_31c0._4_4_;
          uStack_31b8._0_4_ = (float)uStack_34b8;
          fStack_2f98 = (float)uStack_31b8;
          uStack_31b8._4_4_ = (float)((ulong)uStack_34b8 >> 0x20);
          fStack_2f94 = uStack_31b8._4_4_;
          uStack_31b0._0_4_ = (float)uStack_34b0;
          fStack_2f90 = (float)uStack_31b0;
          uStack_31b0._4_4_ = (float)((ulong)uStack_34b0 >> 0x20);
          fStack_2f8c = uStack_31b0._4_4_;
          uStack_31a8._0_4_ = (float)uStack_34a8;
          fStack_2f88 = (float)uStack_31a8;
          uStack_31a8._4_4_ = (float)((ulong)uStack_34a8 >> 0x20);
          fStack_2f84 = uStack_31a8._4_4_;
          local_17a0 = (float)local_31c0 * local_5640;
          fStack_179c = local_31c0._4_4_ * local_5640;
          fStack_1798 = (float)uStack_31b8 * local_5640;
          fStack_1794 = uStack_31b8._4_4_ * local_5640;
          fStack_1790 = (float)uStack_31b0 * local_5640;
          fStack_178c = uStack_31b0._4_4_ * local_5640;
          fStack_1788 = (float)uStack_31a8 * local_5640;
          fVar134 = local_17a0 + fVar134;
          fVar137 = fStack_179c + fVar137;
          fVar139 = fStack_1798 + fVar139;
          fVar141 = fStack_1794 + fVar141;
          fVar143 = fStack_1790 + fVar143;
          fVar145 = fStack_178c + fVar145;
          fVar147 = fStack_1788 + fVar147;
          fVar149 = uStack_31a8._4_4_ + fVar149;
          local_3260 = CONCAT44(fVar137,fVar134);
          uStack_3258 = CONCAT44(fVar141,fVar139);
          uStack_3250 = CONCAT44(fVar145,fVar143);
          uStack_3248 = CONCAT44(fVar149,fVar147);
          local_3520 = *(undefined8 *)local_6980;
          uStack_3518 = *(undefined8 *)(pfVar133 + 0x22);
          uStack_3510 = *(undefined8 *)(pfVar133 + 0x24);
          uStack_3508 = *(undefined8 *)(pfVar133 + 0x26);
          local_6988 = pfVar133 + 0x28;
          local_3580 = *(undefined8 *)local_6988;
          uStack_3578 = *(undefined8 *)(pfVar133 + 0x2a);
          uStack_3570 = *(undefined8 *)(pfVar133 + 0x2c);
          uStack_3568 = *(undefined8 *)(pfVar133 + 0x2e);
          local_6990 = pfVar133 + 0x30;
          local_35e0 = *(undefined8 *)local_6990;
          uStack_35d8 = *(undefined8 *)(pfVar133 + 0x32);
          uStack_35d0 = *(undefined8 *)(pfVar133 + 0x34);
          uStack_35c8 = *(undefined8 *)(pfVar133 + 0x36);
          local_6998 = pfVar133 + 0x38;
          local_3640 = *(undefined8 *)local_6998;
          uStack_3638 = *(undefined8 *)(pfVar133 + 0x3a);
          uStack_3630 = *(undefined8 *)(pfVar133 + 0x3c);
          uStack_3628 = *(undefined8 *)(pfVar133 + 0x3e);
          local_69a0 = pfVar133 + 0x40;
          local_3220._0_4_ = (float)local_3520;
          local_2f60 = (float)local_3220;
          local_3220._4_4_ = (float)((ulong)local_3520 >> 0x20);
          fStack_2f5c = local_3220._4_4_;
          uStack_3218._0_4_ = (float)uStack_3518;
          fStack_2f58 = (float)uStack_3218;
          uStack_3218._4_4_ = (float)((ulong)uStack_3518 >> 0x20);
          fStack_2f54 = uStack_3218._4_4_;
          uStack_3210._0_4_ = (float)uStack_3510;
          fStack_2f50 = (float)uStack_3210;
          uStack_3210._4_4_ = (float)((ulong)uStack_3510 >> 0x20);
          fStack_2f4c = uStack_3210._4_4_;
          uStack_3208._0_4_ = (float)uStack_3508;
          fStack_2f48 = (float)uStack_3208;
          uStack_3208._4_4_ = (float)((ulong)uStack_3508 >> 0x20);
          fStack_2f44 = uStack_3208._4_4_;
          local_1760 = (float)local_3220 * local_5680;
          fStack_175c = local_3220._4_4_ * local_5680;
          fStack_1758 = (float)uStack_3218 * local_5680;
          fStack_1754 = uStack_3218._4_4_ * local_5680;
          fStack_1750 = (float)uStack_3210 * local_5680;
          fStack_174c = uStack_3210._4_4_ * local_5680;
          fStack_1748 = (float)uStack_3208 * local_5680;
          fVar134 = local_1760 + fVar134;
          fVar137 = fStack_175c + fVar137;
          fVar139 = fStack_1758 + fVar139;
          fVar141 = fStack_1754 + fVar141;
          fVar143 = fStack_1750 + fVar143;
          fVar145 = fStack_174c + fVar145;
          fVar147 = fStack_1748 + fVar147;
          fVar149 = uStack_3208._4_4_ + fVar149;
          local_32c0 = CONCAT44(fVar137,fVar134);
          uStack_32b8 = CONCAT44(fVar141,fVar139);
          uStack_32b0 = CONCAT44(fVar145,fVar143);
          uStack_32a8 = CONCAT44(fVar149,fVar147);
          local_3280._0_4_ = (float)local_3580;
          local_2f20 = (float)local_3280;
          local_3280._4_4_ = (float)((ulong)local_3580 >> 0x20);
          fStack_2f1c = local_3280._4_4_;
          uStack_3278._0_4_ = (float)uStack_3578;
          fStack_2f18 = (float)uStack_3278;
          uStack_3278._4_4_ = (float)((ulong)uStack_3578 >> 0x20);
          fStack_2f14 = uStack_3278._4_4_;
          uStack_3270._0_4_ = (float)uStack_3570;
          fStack_2f10 = (float)uStack_3270;
          uStack_3270._4_4_ = (float)((ulong)uStack_3570 >> 0x20);
          fStack_2f0c = uStack_3270._4_4_;
          uStack_3268._0_4_ = (float)uStack_3568;
          fStack_2f08 = (float)uStack_3268;
          uStack_3268._4_4_ = (float)((ulong)uStack_3568 >> 0x20);
          fStack_2f04 = uStack_3268._4_4_;
          local_1720 = (float)local_3280 * local_56c0;
          fStack_171c = local_3280._4_4_ * local_56c0;
          fStack_1718 = (float)uStack_3278 * local_56c0;
          fStack_1714 = uStack_3278._4_4_ * local_56c0;
          fStack_1710 = (float)uStack_3270 * local_56c0;
          fStack_170c = uStack_3270._4_4_ * local_56c0;
          fStack_1708 = (float)uStack_3268 * local_56c0;
          fVar134 = local_1720 + fVar134;
          fVar137 = fStack_171c + fVar137;
          fVar139 = fStack_1718 + fVar139;
          fVar141 = fStack_1714 + fVar141;
          fVar143 = fStack_1710 + fVar143;
          fVar145 = fStack_170c + fVar145;
          fVar147 = fStack_1708 + fVar147;
          fVar149 = uStack_3268._4_4_ + fVar149;
          local_3320 = CONCAT44(fVar137,fVar134);
          uStack_3318 = CONCAT44(fVar141,fVar139);
          uStack_3310 = CONCAT44(fVar145,fVar143);
          uStack_3308 = CONCAT44(fVar149,fVar147);
          local_32e0._0_4_ = (float)local_35e0;
          local_2ee0 = (float)local_32e0;
          local_32e0._4_4_ = (float)((ulong)local_35e0 >> 0x20);
          fStack_2edc = local_32e0._4_4_;
          uStack_32d8._0_4_ = (float)uStack_35d8;
          fStack_2ed8 = (float)uStack_32d8;
          uStack_32d8._4_4_ = (float)((ulong)uStack_35d8 >> 0x20);
          fStack_2ed4 = uStack_32d8._4_4_;
          uStack_32d0._0_4_ = (float)uStack_35d0;
          fStack_2ed0 = (float)uStack_32d0;
          uStack_32d0._4_4_ = (float)((ulong)uStack_35d0 >> 0x20);
          fStack_2ecc = uStack_32d0._4_4_;
          uStack_32c8._0_4_ = (float)uStack_35c8;
          fStack_2ec8 = (float)uStack_32c8;
          uStack_32c8._4_4_ = (float)((ulong)uStack_35c8 >> 0x20);
          fStack_2ec4 = uStack_32c8._4_4_;
          local_16e0 = (float)local_32e0 * local_5700;
          fStack_16dc = local_32e0._4_4_ * local_5700;
          fStack_16d8 = (float)uStack_32d8 * local_5700;
          fStack_16d4 = uStack_32d8._4_4_ * local_5700;
          fStack_16d0 = (float)uStack_32d0 * local_5700;
          fStack_16cc = uStack_32d0._4_4_ * local_5700;
          fStack_16c8 = (float)uStack_32c8 * local_5700;
          fVar134 = local_16e0 + fVar134;
          fVar137 = fStack_16dc + fVar137;
          fVar139 = fStack_16d8 + fVar139;
          fVar141 = fStack_16d4 + fVar141;
          fVar143 = fStack_16d0 + fVar143;
          fVar145 = fStack_16cc + fVar145;
          fVar147 = fStack_16c8 + fVar147;
          fVar149 = uStack_32c8._4_4_ + fVar149;
          local_3380 = CONCAT44(fVar137,fVar134);
          uStack_3378 = CONCAT44(fVar141,fVar139);
          uStack_3370 = CONCAT44(fVar145,fVar143);
          uStack_3368 = CONCAT44(fVar149,fVar147);
          local_3340._0_4_ = (float)local_3640;
          local_2ea0 = (float)local_3340;
          local_3340._4_4_ = (float)((ulong)local_3640 >> 0x20);
          fStack_2e9c = local_3340._4_4_;
          uStack_3338._0_4_ = (float)uStack_3638;
          fStack_2e98 = (float)uStack_3338;
          uStack_3338._4_4_ = (float)((ulong)uStack_3638 >> 0x20);
          fStack_2e94 = uStack_3338._4_4_;
          uStack_3330._0_4_ = (float)uStack_3630;
          fStack_2e90 = (float)uStack_3330;
          uStack_3330._4_4_ = (float)((ulong)uStack_3630 >> 0x20);
          fStack_2e8c = uStack_3330._4_4_;
          uStack_3328._0_4_ = (float)uStack_3628;
          fStack_2e88 = (float)uStack_3328;
          uStack_3328._4_4_ = (float)((ulong)uStack_3628 >> 0x20);
          fStack_2e84 = uStack_3328._4_4_;
          local_16a0 = (float)local_3340 * local_5740;
          fStack_169c = local_3340._4_4_ * local_5740;
          fStack_1698 = (float)uStack_3338 * local_5740;
          fStack_1694 = uStack_3338._4_4_ * local_5740;
          fStack_1690 = (float)uStack_3330 * local_5740;
          fStack_168c = uStack_3330._4_4_ * local_5740;
          fStack_1688 = (float)uStack_3328 * local_5740;
          fVar134 = local_16a0 + fVar134;
          fVar137 = fStack_169c + fVar137;
          fVar139 = fStack_1698 + fVar139;
          fVar141 = fStack_1694 + fVar141;
          fVar143 = fStack_1690 + fVar143;
          fVar145 = fStack_168c + fVar145;
          fVar147 = fStack_1688 + fVar147;
          fVar149 = uStack_3328._4_4_ + fVar149;
          local_36e0 = CONCAT44(fVar137,fVar134);
          uStack_36d8 = CONCAT44(fVar141,fVar139);
          uStack_36d0 = CONCAT44(fVar145,fVar143);
          uStack_36c8 = CONCAT44(fVar149,fVar147);
          local_5780 = *local_5748;
          local_36c0 = CONCAT44(local_5780,local_5780);
          uStack_36b8 = CONCAT44(local_5780,local_5780);
          uStack_36b0 = CONCAT44(local_5780,local_5780);
          uStack_36a8 = CONCAT44(local_5780,local_5780);
          local_5788 = local_6c88 + 9;
          local_57c0 = *local_5788;
          local_3720 = CONCAT44(local_57c0,local_57c0);
          uStack_3718 = CONCAT44(local_57c0,local_57c0);
          uStack_3710 = CONCAT44(local_57c0,local_57c0);
          uStack_3708 = CONCAT44(local_57c0,local_57c0);
          local_57c8 = local_6c88 + 10;
          local_5800 = *local_57c8;
          local_3780 = CONCAT44(local_5800,local_5800);
          uStack_3778 = CONCAT44(local_5800,local_5800);
          uStack_3770 = CONCAT44(local_5800,local_5800);
          uStack_3768 = CONCAT44(local_5800,local_5800);
          local_5808 = local_6c88 + 0xb;
          local_5840 = *local_5808;
          local_37e0 = CONCAT44(local_5840,local_5840);
          uStack_37d8 = CONCAT44(local_5840,local_5840);
          uStack_37d0 = CONCAT44(local_5840,local_5840);
          uStack_37c8 = CONCAT44(local_5840,local_5840);
          local_5848 = local_6c88 + 0xc;
          local_5880 = *local_5848;
          local_3840 = CONCAT44(local_5880,local_5880);
          uStack_3838 = CONCAT44(local_5880,local_5880);
          uStack_3830 = CONCAT44(local_5880,local_5880);
          uStack_3828 = CONCAT44(local_5880,local_5880);
          local_5888 = local_6c88 + 0xd;
          local_58c0 = *local_5888;
          local_38a0 = CONCAT44(local_58c0,local_58c0);
          uStack_3898 = CONCAT44(local_58c0,local_58c0);
          uStack_3890 = CONCAT44(local_58c0,local_58c0);
          uStack_3888 = CONCAT44(local_58c0,local_58c0);
          local_58c8 = local_6c88 + 0xe;
          local_5900 = *local_58c8;
          local_3900 = CONCAT44(local_5900,local_5900);
          uStack_38f8 = CONCAT44(local_5900,local_5900);
          uStack_38f0 = CONCAT44(local_5900,local_5900);
          uStack_38e8 = CONCAT44(local_5900,local_5900);
          local_5908 = local_6c88 + 0xf;
          local_5940 = *local_5908;
          local_3960 = CONCAT44(local_5940,local_5940);
          uStack_3958 = CONCAT44(local_5940,local_5940);
          uStack_3950 = CONCAT44(local_5940,local_5940);
          uStack_3948 = CONCAT44(local_5940,local_5940);
          local_5948 = local_6c88 + 0x10;
          local_2e60 = (float)local_30a0;
          fStack_2e5c = local_30a0._4_4_;
          fStack_2e58 = (float)uStack_3098;
          fStack_2e54 = uStack_3098._4_4_;
          fStack_2e50 = (float)uStack_3090;
          fStack_2e4c = uStack_3090._4_4_;
          fStack_2e48 = (float)uStack_3088;
          fStack_2e44 = uStack_3088._4_4_;
          local_1660 = (float)local_30a0 * local_5780;
          fStack_165c = local_30a0._4_4_ * local_5780;
          fStack_1658 = (float)uStack_3098 * local_5780;
          fStack_1654 = uStack_3098._4_4_ * local_5780;
          fStack_1650 = (float)uStack_3090 * local_5780;
          fStack_164c = uStack_3090._4_4_ * local_5780;
          fStack_1648 = (float)uStack_3088 * local_5780;
          local_1680._0_4_ = (float)local_33e0;
          local_1680._4_4_ = (float)((ulong)local_33e0 >> 0x20);
          uStack_1678._0_4_ = (float)uStack_33d8;
          uStack_1678._4_4_ = (float)((ulong)uStack_33d8 >> 0x20);
          uStack_1670._0_4_ = (float)uStack_33d0;
          uStack_1670._4_4_ = (float)((ulong)uStack_33d0 >> 0x20);
          uStack_1668._0_4_ = (float)uStack_33c8;
          uStack_1668._4_4_ = (float)((ulong)uStack_33c8 >> 0x20);
          local_3440 = CONCAT44(fStack_165c + local_1680._4_4_,local_1660 + (float)local_1680);
          uStack_3438 = CONCAT44(fStack_1654 + uStack_1678._4_4_,fStack_1658 + (float)uStack_1678);
          uStack_3430 = CONCAT44(fStack_164c + uStack_1670._4_4_,fStack_1650 + (float)uStack_1670);
          uStack_3428 = CONCAT44(uStack_3088._4_4_ + uStack_1668._4_4_,
                                 fStack_1648 + (float)uStack_1668);
          local_2e20 = (float)local_3100;
          fStack_2e1c = local_3100._4_4_;
          fStack_2e18 = (float)uStack_30f8;
          fStack_2e14 = uStack_30f8._4_4_;
          fStack_2e10 = (float)uStack_30f0;
          fStack_2e0c = uStack_30f0._4_4_;
          fStack_2e08 = (float)uStack_30e8;
          fStack_2e04 = uStack_30e8._4_4_;
          local_1620 = (float)local_3100 * local_57c0;
          fStack_161c = local_3100._4_4_ * local_57c0;
          fStack_1618 = (float)uStack_30f8 * local_57c0;
          fStack_1614 = uStack_30f8._4_4_ * local_57c0;
          fStack_1610 = (float)uStack_30f0 * local_57c0;
          fStack_160c = uStack_30f0._4_4_ * local_57c0;
          fStack_1608 = (float)uStack_30e8 * local_57c0;
          fVar135 = local_1620 + local_1660 + (float)local_1680;
          fVar138 = fStack_161c + fStack_165c + local_1680._4_4_;
          fVar140 = fStack_1618 + fStack_1658 + (float)uStack_1678;
          fVar142 = fStack_1614 + fStack_1654 + uStack_1678._4_4_;
          fVar144 = fStack_1610 + fStack_1650 + (float)uStack_1670;
          fVar146 = fStack_160c + fStack_164c + uStack_1670._4_4_;
          fVar148 = fStack_1608 + fStack_1648 + (float)uStack_1668;
          uStack_30e8._4_4_ = uStack_30e8._4_4_ + uStack_3088._4_4_ + uStack_1668._4_4_;
          local_34a0 = CONCAT44(fVar138,fVar135);
          uStack_3498 = CONCAT44(fVar142,fVar140);
          uStack_3490 = CONCAT44(fVar146,fVar144);
          uStack_3488 = CONCAT44(uStack_30e8._4_4_,fVar148);
          local_2de0 = (float)local_3160;
          fStack_2ddc = local_3160._4_4_;
          fStack_2dd8 = (float)uStack_3158;
          fStack_2dd4 = uStack_3158._4_4_;
          fStack_2dd0 = (float)uStack_3150;
          fStack_2dcc = uStack_3150._4_4_;
          fStack_2dc8 = (float)uStack_3148;
          fStack_2dc4 = uStack_3148._4_4_;
          local_15e0 = (float)local_3160 * local_5800;
          fStack_15dc = local_3160._4_4_ * local_5800;
          fStack_15d8 = (float)uStack_3158 * local_5800;
          fStack_15d4 = uStack_3158._4_4_ * local_5800;
          fStack_15d0 = (float)uStack_3150 * local_5800;
          fStack_15cc = uStack_3150._4_4_ * local_5800;
          fStack_15c8 = (float)uStack_3148 * local_5800;
          fVar135 = local_15e0 + fVar135;
          fVar138 = fStack_15dc + fVar138;
          fVar140 = fStack_15d8 + fVar140;
          fVar142 = fStack_15d4 + fVar142;
          fVar144 = fStack_15d0 + fVar144;
          fVar146 = fStack_15cc + fVar146;
          fVar148 = fStack_15c8 + fVar148;
          uStack_3148._4_4_ = uStack_3148._4_4_ + uStack_30e8._4_4_;
          local_3500 = CONCAT44(fVar138,fVar135);
          uStack_34f8 = CONCAT44(fVar142,fVar140);
          uStack_34f0 = CONCAT44(fVar146,fVar144);
          uStack_34e8 = CONCAT44(uStack_3148._4_4_,fVar148);
          local_2da0 = (float)local_31c0;
          fStack_2d9c = local_31c0._4_4_;
          fStack_2d98 = (float)uStack_31b8;
          fStack_2d94 = uStack_31b8._4_4_;
          fStack_2d90 = (float)uStack_31b0;
          fStack_2d8c = uStack_31b0._4_4_;
          fStack_2d88 = (float)uStack_31a8;
          fStack_2d84 = uStack_31a8._4_4_;
          local_15a0 = (float)local_31c0 * local_5840;
          fStack_159c = local_31c0._4_4_ * local_5840;
          fStack_1598 = (float)uStack_31b8 * local_5840;
          fStack_1594 = uStack_31b8._4_4_ * local_5840;
          fStack_1590 = (float)uStack_31b0 * local_5840;
          fStack_158c = uStack_31b0._4_4_ * local_5840;
          fStack_1588 = (float)uStack_31a8 * local_5840;
          fVar135 = local_15a0 + fVar135;
          fVar138 = fStack_159c + fVar138;
          fVar140 = fStack_1598 + fVar140;
          fVar142 = fStack_1594 + fVar142;
          fVar144 = fStack_1590 + fVar144;
          fVar146 = fStack_158c + fVar146;
          fVar148 = fStack_1588 + fVar148;
          uStack_31a8._4_4_ = uStack_31a8._4_4_ + uStack_3148._4_4_;
          local_3560 = CONCAT44(fVar138,fVar135);
          uStack_3558 = CONCAT44(fVar142,fVar140);
          uStack_3550 = CONCAT44(fVar146,fVar144);
          uStack_3548 = CONCAT44(uStack_31a8._4_4_,fVar148);
          local_2d60 = (float)local_3220;
          fStack_2d5c = local_3220._4_4_;
          fStack_2d58 = (float)uStack_3218;
          fStack_2d54 = uStack_3218._4_4_;
          fStack_2d50 = (float)uStack_3210;
          fStack_2d4c = uStack_3210._4_4_;
          fStack_2d48 = (float)uStack_3208;
          fStack_2d44 = uStack_3208._4_4_;
          local_1560 = (float)local_3220 * local_5880;
          fStack_155c = local_3220._4_4_ * local_5880;
          fStack_1558 = (float)uStack_3218 * local_5880;
          fStack_1554 = uStack_3218._4_4_ * local_5880;
          fStack_1550 = (float)uStack_3210 * local_5880;
          fStack_154c = uStack_3210._4_4_ * local_5880;
          fStack_1548 = (float)uStack_3208 * local_5880;
          fVar135 = local_1560 + fVar135;
          fVar138 = fStack_155c + fVar138;
          fVar140 = fStack_1558 + fVar140;
          fVar142 = fStack_1554 + fVar142;
          fVar144 = fStack_1550 + fVar144;
          fVar146 = fStack_154c + fVar146;
          fVar148 = fStack_1548 + fVar148;
          uStack_3208._4_4_ = uStack_3208._4_4_ + uStack_31a8._4_4_;
          local_35c0 = CONCAT44(fVar138,fVar135);
          uStack_35b8 = CONCAT44(fVar142,fVar140);
          uStack_35b0 = CONCAT44(fVar146,fVar144);
          uStack_35a8 = CONCAT44(uStack_3208._4_4_,fVar148);
          local_2d20 = (float)local_3280;
          fStack_2d1c = local_3280._4_4_;
          fStack_2d18 = (float)uStack_3278;
          fStack_2d14 = uStack_3278._4_4_;
          fStack_2d10 = (float)uStack_3270;
          fStack_2d0c = uStack_3270._4_4_;
          fStack_2d08 = (float)uStack_3268;
          fStack_2d04 = uStack_3268._4_4_;
          local_1520 = (float)local_3280 * local_58c0;
          fStack_151c = local_3280._4_4_ * local_58c0;
          fStack_1518 = (float)uStack_3278 * local_58c0;
          fStack_1514 = uStack_3278._4_4_ * local_58c0;
          fStack_1510 = (float)uStack_3270 * local_58c0;
          fStack_150c = uStack_3270._4_4_ * local_58c0;
          fStack_1508 = (float)uStack_3268 * local_58c0;
          fVar135 = local_1520 + fVar135;
          fVar138 = fStack_151c + fVar138;
          fVar140 = fStack_1518 + fVar140;
          fVar142 = fStack_1514 + fVar142;
          fVar144 = fStack_1510 + fVar144;
          fVar146 = fStack_150c + fVar146;
          fVar148 = fStack_1508 + fVar148;
          uStack_3268._4_4_ = uStack_3268._4_4_ + uStack_3208._4_4_;
          local_3620 = CONCAT44(fVar138,fVar135);
          uStack_3618 = CONCAT44(fVar142,fVar140);
          uStack_3610 = CONCAT44(fVar146,fVar144);
          uStack_3608 = CONCAT44(uStack_3268._4_4_,fVar148);
          local_2ce0 = (float)local_32e0;
          fStack_2cdc = local_32e0._4_4_;
          fStack_2cd8 = (float)uStack_32d8;
          fStack_2cd4 = uStack_32d8._4_4_;
          fStack_2cd0 = (float)uStack_32d0;
          fStack_2ccc = uStack_32d0._4_4_;
          fStack_2cc8 = (float)uStack_32c8;
          fStack_2cc4 = uStack_32c8._4_4_;
          local_14e0 = (float)local_32e0 * local_5900;
          fStack_14dc = local_32e0._4_4_ * local_5900;
          fStack_14d8 = (float)uStack_32d8 * local_5900;
          fStack_14d4 = uStack_32d8._4_4_ * local_5900;
          fStack_14d0 = (float)uStack_32d0 * local_5900;
          fStack_14cc = uStack_32d0._4_4_ * local_5900;
          fStack_14c8 = (float)uStack_32c8 * local_5900;
          fVar135 = local_14e0 + fVar135;
          fVar138 = fStack_14dc + fVar138;
          fVar140 = fStack_14d8 + fVar140;
          fVar142 = fStack_14d4 + fVar142;
          fVar144 = fStack_14d0 + fVar144;
          fVar146 = fStack_14cc + fVar146;
          fVar148 = fStack_14c8 + fVar148;
          uStack_32c8._4_4_ = uStack_32c8._4_4_ + uStack_3268._4_4_;
          local_3680 = CONCAT44(fVar138,fVar135);
          uStack_3678 = CONCAT44(fVar142,fVar140);
          uStack_3670 = CONCAT44(fVar146,fVar144);
          uStack_3668 = CONCAT44(uStack_32c8._4_4_,fVar148);
          local_2ca0 = (float)local_3340;
          fStack_2c9c = local_3340._4_4_;
          fStack_2c98 = (float)uStack_3338;
          fStack_2c94 = uStack_3338._4_4_;
          fStack_2c90 = (float)uStack_3330;
          fStack_2c8c = uStack_3330._4_4_;
          fStack_2c88 = (float)uStack_3328;
          fStack_2c84 = uStack_3328._4_4_;
          local_14a0 = (float)local_3340 * local_5940;
          fStack_149c = local_3340._4_4_ * local_5940;
          fStack_1498 = (float)uStack_3338 * local_5940;
          fStack_1494 = uStack_3338._4_4_ * local_5940;
          fStack_1490 = (float)uStack_3330 * local_5940;
          fStack_148c = uStack_3330._4_4_ * local_5940;
          fStack_1488 = (float)uStack_3328 * local_5940;
          fVar135 = local_14a0 + fVar135;
          fVar138 = fStack_149c + fVar138;
          fVar140 = fStack_1498 + fVar140;
          fVar142 = fStack_1494 + fVar142;
          fVar144 = fStack_1490 + fVar144;
          fVar146 = fStack_148c + fVar146;
          fVar148 = fStack_1488 + fVar148;
          uStack_3328._4_4_ = uStack_3328._4_4_ + uStack_32c8._4_4_;
          local_39e0 = CONCAT44(fVar138,fVar135);
          uStack_39d8 = CONCAT44(fVar142,fVar140);
          uStack_39d0 = CONCAT44(fVar146,fVar144);
          uStack_39c8 = CONCAT44(uStack_3328._4_4_,fVar148);
          local_39a0 = *(undefined8 *)local_69a0;
          uStack_3998 = *(undefined8 *)(pfVar133 + 0x42);
          uStack_3990 = *(undefined8 *)(pfVar133 + 0x44);
          uStack_3988 = *(undefined8 *)(pfVar133 + 0x46);
          local_69a8 = pfVar133 + 0x48;
          local_3a00 = *(undefined8 *)local_69a8;
          uStack_39f8 = *(undefined8 *)(pfVar133 + 0x4a);
          uStack_39f0 = *(undefined8 *)(pfVar133 + 0x4c);
          uStack_39e8 = *(undefined8 *)(pfVar133 + 0x4e);
          local_69b0 = pfVar133 + 0x50;
          local_3a60 = *(undefined8 *)local_69b0;
          uStack_3a58 = *(undefined8 *)(pfVar133 + 0x52);
          uStack_3a50 = *(undefined8 *)(pfVar133 + 0x54);
          uStack_3a48 = *(undefined8 *)(pfVar133 + 0x56);
          local_69b8 = pfVar133 + 0x58;
          local_3ac0 = *(undefined8 *)local_69b8;
          uStack_3ab8 = *(undefined8 *)(pfVar133 + 0x5a);
          uStack_3ab0 = *(undefined8 *)(pfVar133 + 0x5c);
          uStack_3aa8 = *(undefined8 *)(pfVar133 + 0x5e);
          local_69c0 = pfVar133 + 0x60;
          local_36a0._0_4_ = (float)local_39a0;
          local_2c60 = (float)local_36a0;
          local_36a0._4_4_ = (float)((ulong)local_39a0 >> 0x20);
          fStack_2c5c = local_36a0._4_4_;
          uStack_3698._0_4_ = (float)uStack_3998;
          fStack_2c58 = (float)uStack_3698;
          uStack_3698._4_4_ = (float)((ulong)uStack_3998 >> 0x20);
          fStack_2c54 = uStack_3698._4_4_;
          uStack_3690._0_4_ = (float)uStack_3990;
          fStack_2c50 = (float)uStack_3690;
          uStack_3690._4_4_ = (float)((ulong)uStack_3990 >> 0x20);
          fStack_2c4c = uStack_3690._4_4_;
          uStack_3688._0_4_ = (float)uStack_3988;
          fStack_2c48 = (float)uStack_3688;
          uStack_3688._4_4_ = (float)((ulong)uStack_3988 >> 0x20);
          fStack_2c44 = uStack_3688._4_4_;
          local_1460 = (float)local_36a0 * local_5780;
          fStack_145c = local_36a0._4_4_ * local_5780;
          fStack_1458 = (float)uStack_3698 * local_5780;
          fStack_1454 = uStack_3698._4_4_ * local_5780;
          fStack_1450 = (float)uStack_3690 * local_5780;
          fStack_144c = uStack_3690._4_4_ * local_5780;
          fStack_1448 = (float)uStack_3688 * local_5780;
          fVar134 = local_1460 + fVar134;
          fVar137 = fStack_145c + fVar137;
          fVar139 = fStack_1458 + fVar139;
          fVar141 = fStack_1454 + fVar141;
          fVar143 = fStack_1450 + fVar143;
          fVar145 = fStack_144c + fVar145;
          fVar147 = fStack_1448 + fVar147;
          fVar149 = uStack_3688._4_4_ + fVar149;
          local_3740 = CONCAT44(fVar137,fVar134);
          uStack_3738 = CONCAT44(fVar141,fVar139);
          uStack_3730 = CONCAT44(fVar145,fVar143);
          uStack_3728 = CONCAT44(fVar149,fVar147);
          local_3700._0_4_ = (float)local_3a00;
          local_2c20 = (float)local_3700;
          local_3700._4_4_ = (float)((ulong)local_3a00 >> 0x20);
          fStack_2c1c = local_3700._4_4_;
          uStack_36f8._0_4_ = (float)uStack_39f8;
          fStack_2c18 = (float)uStack_36f8;
          uStack_36f8._4_4_ = (float)((ulong)uStack_39f8 >> 0x20);
          fStack_2c14 = uStack_36f8._4_4_;
          uStack_36f0._0_4_ = (float)uStack_39f0;
          fStack_2c10 = (float)uStack_36f0;
          uStack_36f0._4_4_ = (float)((ulong)uStack_39f0 >> 0x20);
          fStack_2c0c = uStack_36f0._4_4_;
          uStack_36e8._0_4_ = (float)uStack_39e8;
          fStack_2c08 = (float)uStack_36e8;
          uStack_36e8._4_4_ = (float)((ulong)uStack_39e8 >> 0x20);
          fStack_2c04 = uStack_36e8._4_4_;
          local_1420 = (float)local_3700 * local_57c0;
          fStack_141c = local_3700._4_4_ * local_57c0;
          fStack_1418 = (float)uStack_36f8 * local_57c0;
          fStack_1414 = uStack_36f8._4_4_ * local_57c0;
          fStack_1410 = (float)uStack_36f0 * local_57c0;
          fStack_140c = uStack_36f0._4_4_ * local_57c0;
          fStack_1408 = (float)uStack_36e8 * local_57c0;
          fVar134 = local_1420 + fVar134;
          fVar137 = fStack_141c + fVar137;
          fVar139 = fStack_1418 + fVar139;
          fVar141 = fStack_1414 + fVar141;
          fVar143 = fStack_1410 + fVar143;
          fVar145 = fStack_140c + fVar145;
          fVar147 = fStack_1408 + fVar147;
          fVar149 = uStack_36e8._4_4_ + fVar149;
          local_37a0 = CONCAT44(fVar137,fVar134);
          uStack_3798 = CONCAT44(fVar141,fVar139);
          uStack_3790 = CONCAT44(fVar145,fVar143);
          uStack_3788 = CONCAT44(fVar149,fVar147);
          local_3760._0_4_ = (float)local_3a60;
          local_2be0 = (float)local_3760;
          local_3760._4_4_ = (float)((ulong)local_3a60 >> 0x20);
          fStack_2bdc = local_3760._4_4_;
          uStack_3758._0_4_ = (float)uStack_3a58;
          fStack_2bd8 = (float)uStack_3758;
          uStack_3758._4_4_ = (float)((ulong)uStack_3a58 >> 0x20);
          fStack_2bd4 = uStack_3758._4_4_;
          uStack_3750._0_4_ = (float)uStack_3a50;
          fStack_2bd0 = (float)uStack_3750;
          uStack_3750._4_4_ = (float)((ulong)uStack_3a50 >> 0x20);
          fStack_2bcc = uStack_3750._4_4_;
          uStack_3748._0_4_ = (float)uStack_3a48;
          fStack_2bc8 = (float)uStack_3748;
          uStack_3748._4_4_ = (float)((ulong)uStack_3a48 >> 0x20);
          fStack_2bc4 = uStack_3748._4_4_;
          local_13e0 = (float)local_3760 * local_5800;
          fStack_13dc = local_3760._4_4_ * local_5800;
          fStack_13d8 = (float)uStack_3758 * local_5800;
          fStack_13d4 = uStack_3758._4_4_ * local_5800;
          fStack_13d0 = (float)uStack_3750 * local_5800;
          fStack_13cc = uStack_3750._4_4_ * local_5800;
          fStack_13c8 = (float)uStack_3748 * local_5800;
          fVar134 = local_13e0 + fVar134;
          fVar137 = fStack_13dc + fVar137;
          fVar139 = fStack_13d8 + fVar139;
          fVar141 = fStack_13d4 + fVar141;
          fVar143 = fStack_13d0 + fVar143;
          fVar145 = fStack_13cc + fVar145;
          fVar147 = fStack_13c8 + fVar147;
          fVar149 = uStack_3748._4_4_ + fVar149;
          local_3800 = CONCAT44(fVar137,fVar134);
          uStack_37f8 = CONCAT44(fVar141,fVar139);
          uStack_37f0 = CONCAT44(fVar145,fVar143);
          uStack_37e8 = CONCAT44(fVar149,fVar147);
          local_37c0._0_4_ = (float)local_3ac0;
          local_2ba0 = (float)local_37c0;
          local_37c0._4_4_ = (float)((ulong)local_3ac0 >> 0x20);
          fStack_2b9c = local_37c0._4_4_;
          uStack_37b8._0_4_ = (float)uStack_3ab8;
          fStack_2b98 = (float)uStack_37b8;
          uStack_37b8._4_4_ = (float)((ulong)uStack_3ab8 >> 0x20);
          fStack_2b94 = uStack_37b8._4_4_;
          uStack_37b0._0_4_ = (float)uStack_3ab0;
          fStack_2b90 = (float)uStack_37b0;
          uStack_37b0._4_4_ = (float)((ulong)uStack_3ab0 >> 0x20);
          fStack_2b8c = uStack_37b0._4_4_;
          uStack_37a8._0_4_ = (float)uStack_3aa8;
          fStack_2b88 = (float)uStack_37a8;
          uStack_37a8._4_4_ = (float)((ulong)uStack_3aa8 >> 0x20);
          fStack_2b84 = uStack_37a8._4_4_;
          local_13a0 = (float)local_37c0 * local_5840;
          fStack_139c = local_37c0._4_4_ * local_5840;
          fStack_1398 = (float)uStack_37b8 * local_5840;
          fStack_1394 = uStack_37b8._4_4_ * local_5840;
          fStack_1390 = (float)uStack_37b0 * local_5840;
          fStack_138c = uStack_37b0._4_4_ * local_5840;
          fStack_1388 = (float)uStack_37a8 * local_5840;
          fVar134 = local_13a0 + fVar134;
          fVar137 = fStack_139c + fVar137;
          fVar139 = fStack_1398 + fVar139;
          fVar141 = fStack_1394 + fVar141;
          fVar143 = fStack_1390 + fVar143;
          fVar145 = fStack_138c + fVar145;
          fVar147 = fStack_1388 + fVar147;
          fVar149 = uStack_37a8._4_4_ + fVar149;
          local_3860 = CONCAT44(fVar137,fVar134);
          uStack_3858 = CONCAT44(fVar141,fVar139);
          uStack_3850 = CONCAT44(fVar145,fVar143);
          uStack_3848 = CONCAT44(fVar149,fVar147);
          local_3b20 = *(undefined8 *)local_69c0;
          uStack_3b18 = *(undefined8 *)(pfVar133 + 0x62);
          uStack_3b10 = *(undefined8 *)(pfVar133 + 100);
          uStack_3b08 = *(undefined8 *)(pfVar133 + 0x66);
          local_69c8 = pfVar133 + 0x68;
          local_3b80 = *(undefined8 *)local_69c8;
          uStack_3b78 = *(undefined8 *)(pfVar133 + 0x6a);
          uStack_3b70 = *(undefined8 *)(pfVar133 + 0x6c);
          uStack_3b68 = *(undefined8 *)(pfVar133 + 0x6e);
          local_69d0 = pfVar133 + 0x70;
          local_3be0 = *(undefined8 *)local_69d0;
          uStack_3bd8 = *(undefined8 *)(pfVar133 + 0x72);
          uStack_3bd0 = *(undefined8 *)(pfVar133 + 0x74);
          uStack_3bc8 = *(undefined8 *)(pfVar133 + 0x76);
          local_69d8 = pfVar133 + 0x78;
          local_3c40 = *(undefined8 *)local_69d8;
          uStack_3c38 = *(undefined8 *)(pfVar133 + 0x7a);
          uStack_3c30 = *(undefined8 *)(pfVar133 + 0x7c);
          uStack_3c28 = *(undefined8 *)(pfVar133 + 0x7e);
          local_69e0 = pfVar133 + 0x80;
          local_3820._0_4_ = (float)local_3b20;
          local_2b60 = (float)local_3820;
          local_3820._4_4_ = (float)((ulong)local_3b20 >> 0x20);
          fStack_2b5c = local_3820._4_4_;
          uStack_3818._0_4_ = (float)uStack_3b18;
          fStack_2b58 = (float)uStack_3818;
          uStack_3818._4_4_ = (float)((ulong)uStack_3b18 >> 0x20);
          fStack_2b54 = uStack_3818._4_4_;
          uStack_3810._0_4_ = (float)uStack_3b10;
          fStack_2b50 = (float)uStack_3810;
          uStack_3810._4_4_ = (float)((ulong)uStack_3b10 >> 0x20);
          fStack_2b4c = uStack_3810._4_4_;
          uStack_3808._0_4_ = (float)uStack_3b08;
          fStack_2b48 = (float)uStack_3808;
          uStack_3808._4_4_ = (float)((ulong)uStack_3b08 >> 0x20);
          fStack_2b44 = uStack_3808._4_4_;
          local_1360 = (float)local_3820 * local_5880;
          fStack_135c = local_3820._4_4_ * local_5880;
          fStack_1358 = (float)uStack_3818 * local_5880;
          fStack_1354 = uStack_3818._4_4_ * local_5880;
          fStack_1350 = (float)uStack_3810 * local_5880;
          fStack_134c = uStack_3810._4_4_ * local_5880;
          fStack_1348 = (float)uStack_3808 * local_5880;
          fVar134 = local_1360 + fVar134;
          fVar137 = fStack_135c + fVar137;
          fVar139 = fStack_1358 + fVar139;
          fVar141 = fStack_1354 + fVar141;
          fVar143 = fStack_1350 + fVar143;
          fVar145 = fStack_134c + fVar145;
          fVar147 = fStack_1348 + fVar147;
          fVar149 = uStack_3808._4_4_ + fVar149;
          local_38c0 = CONCAT44(fVar137,fVar134);
          uStack_38b8 = CONCAT44(fVar141,fVar139);
          uStack_38b0 = CONCAT44(fVar145,fVar143);
          uStack_38a8 = CONCAT44(fVar149,fVar147);
          local_3880._0_4_ = (float)local_3b80;
          local_2b20 = (float)local_3880;
          local_3880._4_4_ = (float)((ulong)local_3b80 >> 0x20);
          fStack_2b1c = local_3880._4_4_;
          uStack_3878._0_4_ = (float)uStack_3b78;
          fStack_2b18 = (float)uStack_3878;
          uStack_3878._4_4_ = (float)((ulong)uStack_3b78 >> 0x20);
          fStack_2b14 = uStack_3878._4_4_;
          uStack_3870._0_4_ = (float)uStack_3b70;
          fStack_2b10 = (float)uStack_3870;
          uStack_3870._4_4_ = (float)((ulong)uStack_3b70 >> 0x20);
          fStack_2b0c = uStack_3870._4_4_;
          uStack_3868._0_4_ = (float)uStack_3b68;
          fStack_2b08 = (float)uStack_3868;
          uStack_3868._4_4_ = (float)((ulong)uStack_3b68 >> 0x20);
          fStack_2b04 = uStack_3868._4_4_;
          local_1320 = (float)local_3880 * local_58c0;
          fStack_131c = local_3880._4_4_ * local_58c0;
          fStack_1318 = (float)uStack_3878 * local_58c0;
          fStack_1314 = uStack_3878._4_4_ * local_58c0;
          fStack_1310 = (float)uStack_3870 * local_58c0;
          fStack_130c = uStack_3870._4_4_ * local_58c0;
          fStack_1308 = (float)uStack_3868 * local_58c0;
          fVar134 = local_1320 + fVar134;
          fVar137 = fStack_131c + fVar137;
          fVar139 = fStack_1318 + fVar139;
          fVar141 = fStack_1314 + fVar141;
          fVar143 = fStack_1310 + fVar143;
          fVar145 = fStack_130c + fVar145;
          fVar147 = fStack_1308 + fVar147;
          fVar149 = uStack_3868._4_4_ + fVar149;
          local_3920 = CONCAT44(fVar137,fVar134);
          uStack_3918 = CONCAT44(fVar141,fVar139);
          uStack_3910 = CONCAT44(fVar145,fVar143);
          uStack_3908 = CONCAT44(fVar149,fVar147);
          local_38e0._0_4_ = (float)local_3be0;
          local_2ae0 = (float)local_38e0;
          local_38e0._4_4_ = (float)((ulong)local_3be0 >> 0x20);
          fStack_2adc = local_38e0._4_4_;
          uStack_38d8._0_4_ = (float)uStack_3bd8;
          fStack_2ad8 = (float)uStack_38d8;
          uStack_38d8._4_4_ = (float)((ulong)uStack_3bd8 >> 0x20);
          fStack_2ad4 = uStack_38d8._4_4_;
          uStack_38d0._0_4_ = (float)uStack_3bd0;
          fStack_2ad0 = (float)uStack_38d0;
          uStack_38d0._4_4_ = (float)((ulong)uStack_3bd0 >> 0x20);
          fStack_2acc = uStack_38d0._4_4_;
          uStack_38c8._0_4_ = (float)uStack_3bc8;
          fStack_2ac8 = (float)uStack_38c8;
          uStack_38c8._4_4_ = (float)((ulong)uStack_3bc8 >> 0x20);
          fStack_2ac4 = uStack_38c8._4_4_;
          local_12e0 = (float)local_38e0 * local_5900;
          fStack_12dc = local_38e0._4_4_ * local_5900;
          fStack_12d8 = (float)uStack_38d8 * local_5900;
          fStack_12d4 = uStack_38d8._4_4_ * local_5900;
          fStack_12d0 = (float)uStack_38d0 * local_5900;
          fStack_12cc = uStack_38d0._4_4_ * local_5900;
          fStack_12c8 = (float)uStack_38c8 * local_5900;
          fVar134 = local_12e0 + fVar134;
          fVar137 = fStack_12dc + fVar137;
          fVar139 = fStack_12d8 + fVar139;
          fVar141 = fStack_12d4 + fVar141;
          fVar143 = fStack_12d0 + fVar143;
          fVar145 = fStack_12cc + fVar145;
          fVar147 = fStack_12c8 + fVar147;
          fVar149 = uStack_38c8._4_4_ + fVar149;
          local_3980 = CONCAT44(fVar137,fVar134);
          uStack_3978 = CONCAT44(fVar141,fVar139);
          uStack_3970 = CONCAT44(fVar145,fVar143);
          uStack_3968 = CONCAT44(fVar149,fVar147);
          local_3940._0_4_ = (float)local_3c40;
          local_2aa0 = (float)local_3940;
          local_3940._4_4_ = (float)((ulong)local_3c40 >> 0x20);
          fStack_2a9c = local_3940._4_4_;
          uStack_3938._0_4_ = (float)uStack_3c38;
          fStack_2a98 = (float)uStack_3938;
          uStack_3938._4_4_ = (float)((ulong)uStack_3c38 >> 0x20);
          fStack_2a94 = uStack_3938._4_4_;
          uStack_3930._0_4_ = (float)uStack_3c30;
          fStack_2a90 = (float)uStack_3930;
          uStack_3930._4_4_ = (float)((ulong)uStack_3c30 >> 0x20);
          fStack_2a8c = uStack_3930._4_4_;
          uStack_3928._0_4_ = (float)uStack_3c28;
          fStack_2a88 = (float)uStack_3928;
          uStack_3928._4_4_ = (float)((ulong)uStack_3c28 >> 0x20);
          fStack_2a84 = uStack_3928._4_4_;
          local_12a0 = (float)local_3940 * local_5940;
          fStack_129c = local_3940._4_4_ * local_5940;
          fStack_1298 = (float)uStack_3938 * local_5940;
          fStack_1294 = uStack_3938._4_4_ * local_5940;
          fStack_1290 = (float)uStack_3930 * local_5940;
          fStack_128c = uStack_3930._4_4_ * local_5940;
          fStack_1288 = (float)uStack_3928 * local_5940;
          fVar134 = local_12a0 + fVar134;
          fVar137 = fStack_129c + fVar137;
          fVar139 = fStack_1298 + fVar139;
          fVar141 = fStack_1294 + fVar141;
          fVar143 = fStack_1290 + fVar143;
          fVar145 = fStack_128c + fVar145;
          fVar147 = fStack_1288 + fVar147;
          fVar149 = uStack_3928._4_4_ + fVar149;
          local_3ce0 = CONCAT44(fVar137,fVar134);
          uStack_3cd8 = CONCAT44(fVar141,fVar139);
          uStack_3cd0 = CONCAT44(fVar145,fVar143);
          uStack_3cc8 = CONCAT44(fVar149,fVar147);
          local_5980 = *local_5948;
          local_39c0 = CONCAT44(local_5980,local_5980);
          uStack_39b8 = CONCAT44(local_5980,local_5980);
          uStack_39b0 = CONCAT44(local_5980,local_5980);
          uStack_39a8 = CONCAT44(local_5980,local_5980);
          local_5988 = local_6c88 + 0x11;
          local_59c0 = *local_5988;
          local_3a20 = CONCAT44(local_59c0,local_59c0);
          uStack_3a18 = CONCAT44(local_59c0,local_59c0);
          uStack_3a10 = CONCAT44(local_59c0,local_59c0);
          uStack_3a08 = CONCAT44(local_59c0,local_59c0);
          local_59c8 = local_6c88 + 0x12;
          local_5a00 = *local_59c8;
          local_3a80 = CONCAT44(local_5a00,local_5a00);
          uStack_3a78 = CONCAT44(local_5a00,local_5a00);
          uStack_3a70 = CONCAT44(local_5a00,local_5a00);
          uStack_3a68 = CONCAT44(local_5a00,local_5a00);
          local_5a08 = local_6c88 + 0x13;
          local_5a40 = *local_5a08;
          local_3ae0 = CONCAT44(local_5a40,local_5a40);
          uStack_3ad8 = CONCAT44(local_5a40,local_5a40);
          uStack_3ad0 = CONCAT44(local_5a40,local_5a40);
          uStack_3ac8 = CONCAT44(local_5a40,local_5a40);
          local_5a48 = local_6c88 + 0x14;
          local_5a80 = *local_5a48;
          local_3b40 = CONCAT44(local_5a80,local_5a80);
          uStack_3b38 = CONCAT44(local_5a80,local_5a80);
          uStack_3b30 = CONCAT44(local_5a80,local_5a80);
          uStack_3b28 = CONCAT44(local_5a80,local_5a80);
          local_5a88 = local_6c88 + 0x15;
          local_5ac0 = *local_5a88;
          local_3ba0 = CONCAT44(local_5ac0,local_5ac0);
          uStack_3b98 = CONCAT44(local_5ac0,local_5ac0);
          uStack_3b90 = CONCAT44(local_5ac0,local_5ac0);
          uStack_3b88 = CONCAT44(local_5ac0,local_5ac0);
          local_5ac8 = local_6c88 + 0x16;
          local_5b00 = *local_5ac8;
          local_3c00 = CONCAT44(local_5b00,local_5b00);
          uStack_3bf8 = CONCAT44(local_5b00,local_5b00);
          uStack_3bf0 = CONCAT44(local_5b00,local_5b00);
          uStack_3be8 = CONCAT44(local_5b00,local_5b00);
          local_5b08 = local_6c88 + 0x17;
          local_5b40 = *local_5b08;
          local_3c60 = CONCAT44(local_5b40,local_5b40);
          uStack_3c58 = CONCAT44(local_5b40,local_5b40);
          uStack_3c50 = CONCAT44(local_5b40,local_5b40);
          uStack_3c48 = CONCAT44(local_5b40,local_5b40);
          local_2a60 = (float)local_36a0;
          fStack_2a5c = local_36a0._4_4_;
          fStack_2a58 = (float)uStack_3698;
          fStack_2a54 = uStack_3698._4_4_;
          fStack_2a50 = (float)uStack_3690;
          fStack_2a4c = uStack_3690._4_4_;
          fStack_2a48 = (float)uStack_3688;
          fStack_2a44 = uStack_3688._4_4_;
          local_1260 = (float)local_36a0 * local_5980;
          fStack_125c = local_36a0._4_4_ * local_5980;
          fStack_1258 = (float)uStack_3698 * local_5980;
          fStack_1254 = uStack_3698._4_4_ * local_5980;
          fStack_1250 = (float)uStack_3690 * local_5980;
          fStack_124c = uStack_3690._4_4_ * local_5980;
          fStack_1248 = (float)uStack_3688 * local_5980;
          fVar135 = local_1260 + fVar135;
          fVar138 = fStack_125c + fVar138;
          fVar140 = fStack_1258 + fVar140;
          fVar142 = fStack_1254 + fVar142;
          fVar144 = fStack_1250 + fVar144;
          fVar146 = fStack_124c + fVar146;
          fVar148 = fStack_1248 + fVar148;
          uStack_3688._4_4_ = uStack_3688._4_4_ + uStack_3328._4_4_;
          local_3a40 = CONCAT44(fVar138,fVar135);
          uStack_3a38 = CONCAT44(fVar142,fVar140);
          uStack_3a30 = CONCAT44(fVar146,fVar144);
          uStack_3a28 = CONCAT44(uStack_3688._4_4_,fVar148);
          local_2a20 = (float)local_3700;
          fStack_2a1c = local_3700._4_4_;
          fStack_2a18 = (float)uStack_36f8;
          fStack_2a14 = uStack_36f8._4_4_;
          fStack_2a10 = (float)uStack_36f0;
          fStack_2a0c = uStack_36f0._4_4_;
          fStack_2a08 = (float)uStack_36e8;
          fStack_2a04 = uStack_36e8._4_4_;
          local_1220 = (float)local_3700 * local_59c0;
          fStack_121c = local_3700._4_4_ * local_59c0;
          fStack_1218 = (float)uStack_36f8 * local_59c0;
          fStack_1214 = uStack_36f8._4_4_ * local_59c0;
          fStack_1210 = (float)uStack_36f0 * local_59c0;
          fStack_120c = uStack_36f0._4_4_ * local_59c0;
          fStack_1208 = (float)uStack_36e8 * local_59c0;
          fVar135 = local_1220 + fVar135;
          fVar138 = fStack_121c + fVar138;
          fVar140 = fStack_1218 + fVar140;
          fVar142 = fStack_1214 + fVar142;
          fVar144 = fStack_1210 + fVar144;
          fVar146 = fStack_120c + fVar146;
          fVar148 = fStack_1208 + fVar148;
          uStack_36e8._4_4_ = uStack_36e8._4_4_ + uStack_3688._4_4_;
          local_3aa0 = CONCAT44(fVar138,fVar135);
          uStack_3a98 = CONCAT44(fVar142,fVar140);
          uStack_3a90 = CONCAT44(fVar146,fVar144);
          uStack_3a88 = CONCAT44(uStack_36e8._4_4_,fVar148);
          local_29e0 = (float)local_3760;
          fStack_29dc = local_3760._4_4_;
          fStack_29d8 = (float)uStack_3758;
          fStack_29d4 = uStack_3758._4_4_;
          fStack_29d0 = (float)uStack_3750;
          fStack_29cc = uStack_3750._4_4_;
          fStack_29c8 = (float)uStack_3748;
          fStack_29c4 = uStack_3748._4_4_;
          local_11e0 = (float)local_3760 * local_5a00;
          fStack_11dc = local_3760._4_4_ * local_5a00;
          fStack_11d8 = (float)uStack_3758 * local_5a00;
          fStack_11d4 = uStack_3758._4_4_ * local_5a00;
          fStack_11d0 = (float)uStack_3750 * local_5a00;
          fStack_11cc = uStack_3750._4_4_ * local_5a00;
          fStack_11c8 = (float)uStack_3748 * local_5a00;
          fVar135 = local_11e0 + fVar135;
          fVar138 = fStack_11dc + fVar138;
          fVar140 = fStack_11d8 + fVar140;
          fVar142 = fStack_11d4 + fVar142;
          fVar144 = fStack_11d0 + fVar144;
          fVar146 = fStack_11cc + fVar146;
          fVar148 = fStack_11c8 + fVar148;
          uStack_3748._4_4_ = uStack_3748._4_4_ + uStack_36e8._4_4_;
          local_3b00 = CONCAT44(fVar138,fVar135);
          uStack_3af8 = CONCAT44(fVar142,fVar140);
          uStack_3af0 = CONCAT44(fVar146,fVar144);
          uStack_3ae8 = CONCAT44(uStack_3748._4_4_,fVar148);
          local_29a0 = (float)local_37c0;
          fStack_299c = local_37c0._4_4_;
          fStack_2998 = (float)uStack_37b8;
          fStack_2994 = uStack_37b8._4_4_;
          fStack_2990 = (float)uStack_37b0;
          fStack_298c = uStack_37b0._4_4_;
          fStack_2988 = (float)uStack_37a8;
          fStack_2984 = uStack_37a8._4_4_;
          local_11a0 = (float)local_37c0 * local_5a40;
          fStack_119c = local_37c0._4_4_ * local_5a40;
          fStack_1198 = (float)uStack_37b8 * local_5a40;
          fStack_1194 = uStack_37b8._4_4_ * local_5a40;
          fStack_1190 = (float)uStack_37b0 * local_5a40;
          fStack_118c = uStack_37b0._4_4_ * local_5a40;
          fStack_1188 = (float)uStack_37a8 * local_5a40;
          fVar135 = local_11a0 + fVar135;
          fVar138 = fStack_119c + fVar138;
          fVar140 = fStack_1198 + fVar140;
          fVar142 = fStack_1194 + fVar142;
          fVar144 = fStack_1190 + fVar144;
          fVar146 = fStack_118c + fVar146;
          fVar148 = fStack_1188 + fVar148;
          uStack_37a8._4_4_ = uStack_37a8._4_4_ + uStack_3748._4_4_;
          local_3b60 = CONCAT44(fVar138,fVar135);
          uStack_3b58 = CONCAT44(fVar142,fVar140);
          uStack_3b50 = CONCAT44(fVar146,fVar144);
          uStack_3b48 = CONCAT44(uStack_37a8._4_4_,fVar148);
          local_2960 = (float)local_3820;
          fStack_295c = local_3820._4_4_;
          fStack_2958 = (float)uStack_3818;
          fStack_2954 = uStack_3818._4_4_;
          fStack_2950 = (float)uStack_3810;
          fStack_294c = uStack_3810._4_4_;
          fStack_2948 = (float)uStack_3808;
          fStack_2944 = uStack_3808._4_4_;
          local_1160 = (float)local_3820 * local_5a80;
          fStack_115c = local_3820._4_4_ * local_5a80;
          fStack_1158 = (float)uStack_3818 * local_5a80;
          fStack_1154 = uStack_3818._4_4_ * local_5a80;
          fStack_1150 = (float)uStack_3810 * local_5a80;
          fStack_114c = uStack_3810._4_4_ * local_5a80;
          fStack_1148 = (float)uStack_3808 * local_5a80;
          fVar135 = local_1160 + fVar135;
          fVar138 = fStack_115c + fVar138;
          fVar140 = fStack_1158 + fVar140;
          fVar142 = fStack_1154 + fVar142;
          fVar144 = fStack_1150 + fVar144;
          fVar146 = fStack_114c + fVar146;
          fVar148 = fStack_1148 + fVar148;
          uStack_3808._4_4_ = uStack_3808._4_4_ + uStack_37a8._4_4_;
          local_3bc0 = CONCAT44(fVar138,fVar135);
          uStack_3bb8 = CONCAT44(fVar142,fVar140);
          uStack_3bb0 = CONCAT44(fVar146,fVar144);
          uStack_3ba8 = CONCAT44(uStack_3808._4_4_,fVar148);
          local_2920 = (float)local_3880;
          fStack_291c = local_3880._4_4_;
          fStack_2918 = (float)uStack_3878;
          fStack_2914 = uStack_3878._4_4_;
          fStack_2910 = (float)uStack_3870;
          fStack_290c = uStack_3870._4_4_;
          fStack_2908 = (float)uStack_3868;
          fStack_2904 = uStack_3868._4_4_;
          local_1120 = (float)local_3880 * local_5ac0;
          fStack_111c = local_3880._4_4_ * local_5ac0;
          fStack_1118 = (float)uStack_3878 * local_5ac0;
          fStack_1114 = uStack_3878._4_4_ * local_5ac0;
          fStack_1110 = (float)uStack_3870 * local_5ac0;
          fStack_110c = uStack_3870._4_4_ * local_5ac0;
          fStack_1108 = (float)uStack_3868 * local_5ac0;
          fVar135 = local_1120 + fVar135;
          fVar138 = fStack_111c + fVar138;
          fVar140 = fStack_1118 + fVar140;
          fVar142 = fStack_1114 + fVar142;
          fVar144 = fStack_1110 + fVar144;
          fVar146 = fStack_110c + fVar146;
          fVar148 = fStack_1108 + fVar148;
          uStack_3868._4_4_ = uStack_3868._4_4_ + uStack_3808._4_4_;
          local_3c20 = CONCAT44(fVar138,fVar135);
          uStack_3c18 = CONCAT44(fVar142,fVar140);
          uStack_3c10 = CONCAT44(fVar146,fVar144);
          uStack_3c08 = CONCAT44(uStack_3868._4_4_,fVar148);
          local_28e0 = (float)local_38e0;
          fStack_28dc = local_38e0._4_4_;
          fStack_28d8 = (float)uStack_38d8;
          fStack_28d4 = uStack_38d8._4_4_;
          fStack_28d0 = (float)uStack_38d0;
          fStack_28cc = uStack_38d0._4_4_;
          fStack_28c8 = (float)uStack_38c8;
          fStack_28c4 = uStack_38c8._4_4_;
          local_10e0 = (float)local_38e0 * local_5b00;
          fStack_10dc = local_38e0._4_4_ * local_5b00;
          fStack_10d8 = (float)uStack_38d8 * local_5b00;
          fStack_10d4 = uStack_38d8._4_4_ * local_5b00;
          fStack_10d0 = (float)uStack_38d0 * local_5b00;
          fStack_10cc = uStack_38d0._4_4_ * local_5b00;
          fStack_10c8 = (float)uStack_38c8 * local_5b00;
          fVar135 = local_10e0 + fVar135;
          fVar138 = fStack_10dc + fVar138;
          fVar140 = fStack_10d8 + fVar140;
          fVar142 = fStack_10d4 + fVar142;
          fVar144 = fStack_10d0 + fVar144;
          fVar146 = fStack_10cc + fVar146;
          fVar148 = fStack_10c8 + fVar148;
          uStack_38c8._4_4_ = uStack_38c8._4_4_ + uStack_3868._4_4_;
          local_3c80 = CONCAT44(fVar138,fVar135);
          uStack_3c78 = CONCAT44(fVar142,fVar140);
          uStack_3c70 = CONCAT44(fVar146,fVar144);
          uStack_3c68 = CONCAT44(uStack_38c8._4_4_,fVar148);
          local_28a0 = (float)local_3940;
          fStack_289c = local_3940._4_4_;
          fStack_2898 = (float)uStack_3938;
          fStack_2894 = uStack_3938._4_4_;
          fStack_2890 = (float)uStack_3930;
          fStack_288c = uStack_3930._4_4_;
          fStack_2888 = (float)uStack_3928;
          fStack_2884 = uStack_3928._4_4_;
          local_10a0 = (float)local_3940 * local_5b40;
          fStack_109c = local_3940._4_4_ * local_5b40;
          fStack_1098 = (float)uStack_3938 * local_5b40;
          fStack_1094 = uStack_3938._4_4_ * local_5b40;
          fStack_1090 = (float)uStack_3930 * local_5b40;
          fStack_108c = uStack_3930._4_4_ * local_5b40;
          fStack_1088 = (float)uStack_3928 * local_5b40;
          fVar135 = local_10a0 + fVar135;
          fVar138 = fStack_109c + fVar138;
          fVar140 = fStack_1098 + fVar140;
          fVar142 = fStack_1094 + fVar142;
          fVar144 = fStack_1090 + fVar144;
          fVar146 = fStack_108c + fVar146;
          fVar148 = fStack_1088 + fVar148;
          uStack_3928._4_4_ = uStack_3928._4_4_ + uStack_38c8._4_4_;
          local_3fe0 = CONCAT44(fVar138,fVar135);
          uStack_3fd8 = CONCAT44(fVar142,fVar140);
          uStack_3fd0 = CONCAT44(fVar146,fVar144);
          uStack_3fc8 = CONCAT44(uStack_3928._4_4_,fVar148);
          local_5b48 = local_6c90;
          local_5b80 = *local_6c90;
          local_3cc0 = CONCAT44(local_5b80,local_5b80);
          uStack_3cb8 = CONCAT44(local_5b80,local_5b80);
          uStack_3cb0 = CONCAT44(local_5b80,local_5b80);
          uStack_3ca8 = CONCAT44(local_5b80,local_5b80);
          local_5b88 = local_6c90 + 1;
          local_5bc0 = *local_5b88;
          local_3d20 = CONCAT44(local_5bc0,local_5bc0);
          uStack_3d18 = CONCAT44(local_5bc0,local_5bc0);
          uStack_3d10 = CONCAT44(local_5bc0,local_5bc0);
          uStack_3d08 = CONCAT44(local_5bc0,local_5bc0);
          local_5bc8 = local_6c90 + 2;
          local_5c00 = *local_5bc8;
          local_3d80 = CONCAT44(local_5c00,local_5c00);
          uStack_3d78 = CONCAT44(local_5c00,local_5c00);
          uStack_3d70 = CONCAT44(local_5c00,local_5c00);
          uStack_3d68 = CONCAT44(local_5c00,local_5c00);
          local_5c08 = local_6c90 + 3;
          local_5c40 = *local_5c08;
          local_3de0 = CONCAT44(local_5c40,local_5c40);
          uStack_3dd8 = CONCAT44(local_5c40,local_5c40);
          uStack_3dd0 = CONCAT44(local_5c40,local_5c40);
          uStack_3dc8 = CONCAT44(local_5c40,local_5c40);
          local_5c48 = local_6c90 + 4;
          local_5c80 = *local_5c48;
          local_3e40 = CONCAT44(local_5c80,local_5c80);
          uStack_3e38 = CONCAT44(local_5c80,local_5c80);
          uStack_3e30 = CONCAT44(local_5c80,local_5c80);
          uStack_3e28 = CONCAT44(local_5c80,local_5c80);
          local_5c88 = local_6c90 + 5;
          local_5cc0 = *local_5c88;
          local_3ea0 = CONCAT44(local_5cc0,local_5cc0);
          uStack_3e98 = CONCAT44(local_5cc0,local_5cc0);
          uStack_3e90 = CONCAT44(local_5cc0,local_5cc0);
          uStack_3e88 = CONCAT44(local_5cc0,local_5cc0);
          local_5cc8 = local_6c90 + 6;
          local_5d00 = *local_5cc8;
          local_3f00 = CONCAT44(local_5d00,local_5d00);
          uStack_3ef8 = CONCAT44(local_5d00,local_5d00);
          uStack_3ef0 = CONCAT44(local_5d00,local_5d00);
          uStack_3ee8 = CONCAT44(local_5d00,local_5d00);
          local_5d08 = local_6c90 + 7;
          local_5d40 = *local_5d08;
          local_3f60 = CONCAT44(local_5d40,local_5d40);
          uStack_3f58 = CONCAT44(local_5d40,local_5d40);
          uStack_3f50 = CONCAT44(local_5d40,local_5d40);
          uStack_3f48 = CONCAT44(local_5d40,local_5d40);
          local_3fa0 = *(undefined8 *)local_69e0;
          uStack_3f98 = *(undefined8 *)(pfVar133 + 0x82);
          uStack_3f90 = *(undefined8 *)(pfVar133 + 0x84);
          uStack_3f88 = *(undefined8 *)(pfVar133 + 0x86);
          local_69e8 = pfVar133 + 0x88;
          local_4000 = *(undefined8 *)local_69e8;
          uStack_3ff8 = *(undefined8 *)(pfVar133 + 0x8a);
          uStack_3ff0 = *(undefined8 *)(pfVar133 + 0x8c);
          uStack_3fe8 = *(undefined8 *)(pfVar133 + 0x8e);
          local_69f0 = pfVar133 + 0x90;
          local_4060 = *(undefined8 *)local_69f0;
          uStack_4058 = *(undefined8 *)(pfVar133 + 0x92);
          uStack_4050 = *(undefined8 *)(pfVar133 + 0x94);
          uStack_4048 = *(undefined8 *)(pfVar133 + 0x96);
          local_69f8 = pfVar133 + 0x98;
          local_40c0 = *(undefined8 *)local_69f8;
          uStack_40b8 = *(undefined8 *)(pfVar133 + 0x9a);
          uStack_40b0 = *(undefined8 *)(pfVar133 + 0x9c);
          uStack_40a8 = *(undefined8 *)(pfVar133 + 0x9e);
          local_6a00 = pfVar133 + 0xa0;
          local_3ca0._0_4_ = (float)local_3fa0;
          local_2860 = (float)local_3ca0;
          local_3ca0._4_4_ = (float)((ulong)local_3fa0 >> 0x20);
          fStack_285c = local_3ca0._4_4_;
          uStack_3c98._0_4_ = (float)uStack_3f98;
          fStack_2858 = (float)uStack_3c98;
          uStack_3c98._4_4_ = (float)((ulong)uStack_3f98 >> 0x20);
          fStack_2854 = uStack_3c98._4_4_;
          uStack_3c90._0_4_ = (float)uStack_3f90;
          fStack_2850 = (float)uStack_3c90;
          uStack_3c90._4_4_ = (float)((ulong)uStack_3f90 >> 0x20);
          fStack_284c = uStack_3c90._4_4_;
          uStack_3c88._0_4_ = (float)uStack_3f88;
          fStack_2848 = (float)uStack_3c88;
          uStack_3c88._4_4_ = (float)((ulong)uStack_3f88 >> 0x20);
          fStack_2844 = uStack_3c88._4_4_;
          local_1060 = (float)local_3ca0 * local_5b80;
          fStack_105c = local_3ca0._4_4_ * local_5b80;
          fStack_1058 = (float)uStack_3c98 * local_5b80;
          fStack_1054 = uStack_3c98._4_4_ * local_5b80;
          fStack_1050 = (float)uStack_3c90 * local_5b80;
          fStack_104c = uStack_3c90._4_4_ * local_5b80;
          fStack_1048 = (float)uStack_3c88 * local_5b80;
          fVar134 = local_1060 + fVar134;
          fVar137 = fStack_105c + fVar137;
          fVar139 = fStack_1058 + fVar139;
          fVar141 = fStack_1054 + fVar141;
          fVar143 = fStack_1050 + fVar143;
          fVar145 = fStack_104c + fVar145;
          fVar147 = fStack_1048 + fVar147;
          fVar149 = uStack_3c88._4_4_ + fVar149;
          local_3d40 = CONCAT44(fVar137,fVar134);
          uStack_3d38 = CONCAT44(fVar141,fVar139);
          uStack_3d30 = CONCAT44(fVar145,fVar143);
          uStack_3d28 = CONCAT44(fVar149,fVar147);
          local_3d00._0_4_ = (float)local_4000;
          local_2820 = (float)local_3d00;
          local_3d00._4_4_ = (float)((ulong)local_4000 >> 0x20);
          fStack_281c = local_3d00._4_4_;
          uStack_3cf8._0_4_ = (float)uStack_3ff8;
          fStack_2818 = (float)uStack_3cf8;
          uStack_3cf8._4_4_ = (float)((ulong)uStack_3ff8 >> 0x20);
          fStack_2814 = uStack_3cf8._4_4_;
          uStack_3cf0._0_4_ = (float)uStack_3ff0;
          fStack_2810 = (float)uStack_3cf0;
          uStack_3cf0._4_4_ = (float)((ulong)uStack_3ff0 >> 0x20);
          fStack_280c = uStack_3cf0._4_4_;
          uStack_3ce8._0_4_ = (float)uStack_3fe8;
          fStack_2808 = (float)uStack_3ce8;
          uStack_3ce8._4_4_ = (float)((ulong)uStack_3fe8 >> 0x20);
          fStack_2804 = uStack_3ce8._4_4_;
          local_1020 = (float)local_3d00 * local_5bc0;
          fStack_101c = local_3d00._4_4_ * local_5bc0;
          fStack_1018 = (float)uStack_3cf8 * local_5bc0;
          fStack_1014 = uStack_3cf8._4_4_ * local_5bc0;
          fStack_1010 = (float)uStack_3cf0 * local_5bc0;
          fStack_100c = uStack_3cf0._4_4_ * local_5bc0;
          fStack_1008 = (float)uStack_3ce8 * local_5bc0;
          fVar134 = local_1020 + fVar134;
          fVar137 = fStack_101c + fVar137;
          fVar139 = fStack_1018 + fVar139;
          fVar141 = fStack_1014 + fVar141;
          fVar143 = fStack_1010 + fVar143;
          fVar145 = fStack_100c + fVar145;
          fVar147 = fStack_1008 + fVar147;
          fVar149 = uStack_3ce8._4_4_ + fVar149;
          local_3da0 = CONCAT44(fVar137,fVar134);
          uStack_3d98 = CONCAT44(fVar141,fVar139);
          uStack_3d90 = CONCAT44(fVar145,fVar143);
          uStack_3d88 = CONCAT44(fVar149,fVar147);
          local_3d60._0_4_ = (float)local_4060;
          local_27e0 = (float)local_3d60;
          local_3d60._4_4_ = (float)((ulong)local_4060 >> 0x20);
          fStack_27dc = local_3d60._4_4_;
          uStack_3d58._0_4_ = (float)uStack_4058;
          fStack_27d8 = (float)uStack_3d58;
          uStack_3d58._4_4_ = (float)((ulong)uStack_4058 >> 0x20);
          fStack_27d4 = uStack_3d58._4_4_;
          uStack_3d50._0_4_ = (float)uStack_4050;
          fStack_27d0 = (float)uStack_3d50;
          uStack_3d50._4_4_ = (float)((ulong)uStack_4050 >> 0x20);
          fStack_27cc = uStack_3d50._4_4_;
          uStack_3d48._0_4_ = (float)uStack_4048;
          fStack_27c8 = (float)uStack_3d48;
          uStack_3d48._4_4_ = (float)((ulong)uStack_4048 >> 0x20);
          fStack_27c4 = uStack_3d48._4_4_;
          local_fe0 = (float)local_3d60 * local_5c00;
          fStack_fdc = local_3d60._4_4_ * local_5c00;
          fStack_fd8 = (float)uStack_3d58 * local_5c00;
          fStack_fd4 = uStack_3d58._4_4_ * local_5c00;
          fStack_fd0 = (float)uStack_3d50 * local_5c00;
          fStack_fcc = uStack_3d50._4_4_ * local_5c00;
          fStack_fc8 = (float)uStack_3d48 * local_5c00;
          fVar134 = local_fe0 + fVar134;
          fVar137 = fStack_fdc + fVar137;
          fVar139 = fStack_fd8 + fVar139;
          fVar141 = fStack_fd4 + fVar141;
          fVar143 = fStack_fd0 + fVar143;
          fVar145 = fStack_fcc + fVar145;
          fVar147 = fStack_fc8 + fVar147;
          fVar149 = uStack_3d48._4_4_ + fVar149;
          local_3e00 = CONCAT44(fVar137,fVar134);
          uStack_3df8 = CONCAT44(fVar141,fVar139);
          uStack_3df0 = CONCAT44(fVar145,fVar143);
          uStack_3de8 = CONCAT44(fVar149,fVar147);
          local_3dc0._0_4_ = (float)local_40c0;
          local_27a0 = (float)local_3dc0;
          local_3dc0._4_4_ = (float)((ulong)local_40c0 >> 0x20);
          fStack_279c = local_3dc0._4_4_;
          uStack_3db8._0_4_ = (float)uStack_40b8;
          fStack_2798 = (float)uStack_3db8;
          uStack_3db8._4_4_ = (float)((ulong)uStack_40b8 >> 0x20);
          fStack_2794 = uStack_3db8._4_4_;
          uStack_3db0._0_4_ = (float)uStack_40b0;
          fStack_2790 = (float)uStack_3db0;
          uStack_3db0._4_4_ = (float)((ulong)uStack_40b0 >> 0x20);
          fStack_278c = uStack_3db0._4_4_;
          uStack_3da8._0_4_ = (float)uStack_40a8;
          fStack_2788 = (float)uStack_3da8;
          uStack_3da8._4_4_ = (float)((ulong)uStack_40a8 >> 0x20);
          fStack_2784 = uStack_3da8._4_4_;
          local_fa0 = (float)local_3dc0 * local_5c40;
          fStack_f9c = local_3dc0._4_4_ * local_5c40;
          fStack_f98 = (float)uStack_3db8 * local_5c40;
          fStack_f94 = uStack_3db8._4_4_ * local_5c40;
          fStack_f90 = (float)uStack_3db0 * local_5c40;
          fStack_f8c = uStack_3db0._4_4_ * local_5c40;
          fStack_f88 = (float)uStack_3da8 * local_5c40;
          fVar134 = local_fa0 + fVar134;
          fVar137 = fStack_f9c + fVar137;
          fVar139 = fStack_f98 + fVar139;
          fVar141 = fStack_f94 + fVar141;
          fVar143 = fStack_f90 + fVar143;
          fVar145 = fStack_f8c + fVar145;
          fVar147 = fStack_f88 + fVar147;
          fVar149 = uStack_3da8._4_4_ + fVar149;
          local_3e60 = CONCAT44(fVar137,fVar134);
          uStack_3e58 = CONCAT44(fVar141,fVar139);
          uStack_3e50 = CONCAT44(fVar145,fVar143);
          uStack_3e48 = CONCAT44(fVar149,fVar147);
          local_4120 = *(undefined8 *)local_6a00;
          uStack_4118 = *(undefined8 *)(pfVar133 + 0xa2);
          uStack_4110 = *(undefined8 *)(pfVar133 + 0xa4);
          uStack_4108 = *(undefined8 *)(pfVar133 + 0xa6);
          local_6a08 = pfVar133 + 0xa8;
          local_4180 = *(undefined8 *)local_6a08;
          uStack_4178 = *(undefined8 *)(pfVar133 + 0xaa);
          uStack_4170 = *(undefined8 *)(pfVar133 + 0xac);
          uStack_4168 = *(undefined8 *)(pfVar133 + 0xae);
          local_6a10 = pfVar133 + 0xb0;
          local_41e0 = *(undefined8 *)local_6a10;
          uStack_41d8 = *(undefined8 *)(pfVar133 + 0xb2);
          uStack_41d0 = *(undefined8 *)(pfVar133 + 0xb4);
          uStack_41c8 = *(undefined8 *)(pfVar133 + 0xb6);
          local_6a18 = pfVar133 + 0xb8;
          local_4240 = *(undefined8 *)local_6a18;
          uStack_4238 = *(undefined8 *)(pfVar133 + 0xba);
          uStack_4230 = *(undefined8 *)(pfVar133 + 0xbc);
          uStack_4228 = *(undefined8 *)(pfVar133 + 0xbe);
          local_6a20 = pfVar133 + 0xc0;
          local_3e20._0_4_ = (float)local_4120;
          local_2760 = (float)local_3e20;
          local_3e20._4_4_ = (float)((ulong)local_4120 >> 0x20);
          fStack_275c = local_3e20._4_4_;
          uStack_3e18._0_4_ = (float)uStack_4118;
          fStack_2758 = (float)uStack_3e18;
          uStack_3e18._4_4_ = (float)((ulong)uStack_4118 >> 0x20);
          fStack_2754 = uStack_3e18._4_4_;
          uStack_3e10._0_4_ = (float)uStack_4110;
          fStack_2750 = (float)uStack_3e10;
          uStack_3e10._4_4_ = (float)((ulong)uStack_4110 >> 0x20);
          fStack_274c = uStack_3e10._4_4_;
          uStack_3e08._0_4_ = (float)uStack_4108;
          fStack_2748 = (float)uStack_3e08;
          uStack_3e08._4_4_ = (float)((ulong)uStack_4108 >> 0x20);
          fStack_2744 = uStack_3e08._4_4_;
          local_f60 = (float)local_3e20 * local_5c80;
          fStack_f5c = local_3e20._4_4_ * local_5c80;
          fStack_f58 = (float)uStack_3e18 * local_5c80;
          fStack_f54 = uStack_3e18._4_4_ * local_5c80;
          fStack_f50 = (float)uStack_3e10 * local_5c80;
          fStack_f4c = uStack_3e10._4_4_ * local_5c80;
          fStack_f48 = (float)uStack_3e08 * local_5c80;
          fVar134 = local_f60 + fVar134;
          fVar137 = fStack_f5c + fVar137;
          fVar139 = fStack_f58 + fVar139;
          fVar141 = fStack_f54 + fVar141;
          fVar143 = fStack_f50 + fVar143;
          fVar145 = fStack_f4c + fVar145;
          fVar147 = fStack_f48 + fVar147;
          fVar149 = uStack_3e08._4_4_ + fVar149;
          local_3ec0 = CONCAT44(fVar137,fVar134);
          uStack_3eb8 = CONCAT44(fVar141,fVar139);
          uStack_3eb0 = CONCAT44(fVar145,fVar143);
          uStack_3ea8 = CONCAT44(fVar149,fVar147);
          local_3e80._0_4_ = (float)local_4180;
          local_2720 = (float)local_3e80;
          local_3e80._4_4_ = (float)((ulong)local_4180 >> 0x20);
          fStack_271c = local_3e80._4_4_;
          uStack_3e78._0_4_ = (float)uStack_4178;
          fStack_2718 = (float)uStack_3e78;
          uStack_3e78._4_4_ = (float)((ulong)uStack_4178 >> 0x20);
          fStack_2714 = uStack_3e78._4_4_;
          uStack_3e70._0_4_ = (float)uStack_4170;
          fStack_2710 = (float)uStack_3e70;
          uStack_3e70._4_4_ = (float)((ulong)uStack_4170 >> 0x20);
          fStack_270c = uStack_3e70._4_4_;
          uStack_3e68._0_4_ = (float)uStack_4168;
          fStack_2708 = (float)uStack_3e68;
          uStack_3e68._4_4_ = (float)((ulong)uStack_4168 >> 0x20);
          fStack_2704 = uStack_3e68._4_4_;
          local_f20 = (float)local_3e80 * local_5cc0;
          fStack_f1c = local_3e80._4_4_ * local_5cc0;
          fStack_f18 = (float)uStack_3e78 * local_5cc0;
          fStack_f14 = uStack_3e78._4_4_ * local_5cc0;
          fStack_f10 = (float)uStack_3e70 * local_5cc0;
          fStack_f0c = uStack_3e70._4_4_ * local_5cc0;
          fStack_f08 = (float)uStack_3e68 * local_5cc0;
          fVar134 = local_f20 + fVar134;
          fVar137 = fStack_f1c + fVar137;
          fVar139 = fStack_f18 + fVar139;
          fVar141 = fStack_f14 + fVar141;
          fVar143 = fStack_f10 + fVar143;
          fVar145 = fStack_f0c + fVar145;
          fVar147 = fStack_f08 + fVar147;
          fVar149 = uStack_3e68._4_4_ + fVar149;
          local_3f20 = CONCAT44(fVar137,fVar134);
          uStack_3f18 = CONCAT44(fVar141,fVar139);
          uStack_3f10 = CONCAT44(fVar145,fVar143);
          uStack_3f08 = CONCAT44(fVar149,fVar147);
          local_3ee0._0_4_ = (float)local_41e0;
          local_26e0 = (float)local_3ee0;
          local_3ee0._4_4_ = (float)((ulong)local_41e0 >> 0x20);
          fStack_26dc = local_3ee0._4_4_;
          uStack_3ed8._0_4_ = (float)uStack_41d8;
          fStack_26d8 = (float)uStack_3ed8;
          uStack_3ed8._4_4_ = (float)((ulong)uStack_41d8 >> 0x20);
          fStack_26d4 = uStack_3ed8._4_4_;
          uStack_3ed0._0_4_ = (float)uStack_41d0;
          fStack_26d0 = (float)uStack_3ed0;
          uStack_3ed0._4_4_ = (float)((ulong)uStack_41d0 >> 0x20);
          fStack_26cc = uStack_3ed0._4_4_;
          uStack_3ec8._0_4_ = (float)uStack_41c8;
          fStack_26c8 = (float)uStack_3ec8;
          uStack_3ec8._4_4_ = (float)((ulong)uStack_41c8 >> 0x20);
          fStack_26c4 = uStack_3ec8._4_4_;
          local_ee0 = (float)local_3ee0 * local_5d00;
          fStack_edc = local_3ee0._4_4_ * local_5d00;
          fStack_ed8 = (float)uStack_3ed8 * local_5d00;
          fStack_ed4 = uStack_3ed8._4_4_ * local_5d00;
          fStack_ed0 = (float)uStack_3ed0 * local_5d00;
          fStack_ecc = uStack_3ed0._4_4_ * local_5d00;
          fStack_ec8 = (float)uStack_3ec8 * local_5d00;
          fVar134 = local_ee0 + fVar134;
          fVar137 = fStack_edc + fVar137;
          fVar139 = fStack_ed8 + fVar139;
          fVar141 = fStack_ed4 + fVar141;
          fVar143 = fStack_ed0 + fVar143;
          fVar145 = fStack_ecc + fVar145;
          fVar147 = fStack_ec8 + fVar147;
          fVar149 = uStack_3ec8._4_4_ + fVar149;
          local_3f80 = CONCAT44(fVar137,fVar134);
          uStack_3f78 = CONCAT44(fVar141,fVar139);
          uStack_3f70 = CONCAT44(fVar145,fVar143);
          uStack_3f68 = CONCAT44(fVar149,fVar147);
          local_3f40._0_4_ = (float)local_4240;
          local_26a0 = (float)local_3f40;
          local_3f40._4_4_ = (float)((ulong)local_4240 >> 0x20);
          fStack_269c = local_3f40._4_4_;
          uStack_3f38._0_4_ = (float)uStack_4238;
          fStack_2698 = (float)uStack_3f38;
          uStack_3f38._4_4_ = (float)((ulong)uStack_4238 >> 0x20);
          fStack_2694 = uStack_3f38._4_4_;
          uStack_3f30._0_4_ = (float)uStack_4230;
          fStack_2690 = (float)uStack_3f30;
          uStack_3f30._4_4_ = (float)((ulong)uStack_4230 >> 0x20);
          fStack_268c = uStack_3f30._4_4_;
          uStack_3f28._0_4_ = (float)uStack_4228;
          fStack_2688 = (float)uStack_3f28;
          uStack_3f28._4_4_ = (float)((ulong)uStack_4228 >> 0x20);
          fStack_2684 = uStack_3f28._4_4_;
          local_ea0 = (float)local_3f40 * local_5d40;
          fStack_e9c = local_3f40._4_4_ * local_5d40;
          fStack_e98 = (float)uStack_3f38 * local_5d40;
          fStack_e94 = uStack_3f38._4_4_ * local_5d40;
          fStack_e90 = (float)uStack_3f30 * local_5d40;
          fStack_e8c = uStack_3f30._4_4_ * local_5d40;
          fStack_e88 = (float)uStack_3f28 * local_5d40;
          fVar134 = local_ea0 + fVar134;
          fVar137 = fStack_e9c + fVar137;
          fVar139 = fStack_e98 + fVar139;
          fVar141 = fStack_e94 + fVar141;
          fVar143 = fStack_e90 + fVar143;
          fVar145 = fStack_e8c + fVar145;
          fVar147 = fStack_e88 + fVar147;
          fVar149 = uStack_3f28._4_4_ + fVar149;
          local_42e0 = CONCAT44(fVar137,fVar134);
          uStack_42d8 = CONCAT44(fVar141,fVar139);
          uStack_42d0 = CONCAT44(fVar145,fVar143);
          uStack_42c8 = CONCAT44(fVar149,fVar147);
          local_5d48 = local_6c90 + 8;
          local_5d80 = *local_5d48;
          local_42c0 = CONCAT44(local_5d80,local_5d80);
          uStack_42b8 = CONCAT44(local_5d80,local_5d80);
          uStack_42b0 = CONCAT44(local_5d80,local_5d80);
          uStack_42a8 = CONCAT44(local_5d80,local_5d80);
          local_5d88 = local_6c90 + 9;
          local_5dc0 = *local_5d88;
          local_4320 = CONCAT44(local_5dc0,local_5dc0);
          uStack_4318 = CONCAT44(local_5dc0,local_5dc0);
          uStack_4310 = CONCAT44(local_5dc0,local_5dc0);
          uStack_4308 = CONCAT44(local_5dc0,local_5dc0);
          local_5dc8 = local_6c90 + 10;
          local_5e00 = *local_5dc8;
          local_4380 = CONCAT44(local_5e00,local_5e00);
          uStack_4378 = CONCAT44(local_5e00,local_5e00);
          uStack_4370 = CONCAT44(local_5e00,local_5e00);
          uStack_4368 = CONCAT44(local_5e00,local_5e00);
          local_5e08 = local_6c90 + 0xb;
          local_5e40 = *local_5e08;
          local_43e0 = CONCAT44(local_5e40,local_5e40);
          uStack_43d8 = CONCAT44(local_5e40,local_5e40);
          uStack_43d0 = CONCAT44(local_5e40,local_5e40);
          uStack_43c8 = CONCAT44(local_5e40,local_5e40);
          local_5e48 = local_6c90 + 0xc;
          local_5e80 = *local_5e48;
          local_4440 = CONCAT44(local_5e80,local_5e80);
          uStack_4438 = CONCAT44(local_5e80,local_5e80);
          uStack_4430 = CONCAT44(local_5e80,local_5e80);
          uStack_4428 = CONCAT44(local_5e80,local_5e80);
          local_5e88 = local_6c90 + 0xd;
          local_5ec0 = *local_5e88;
          local_44a0 = CONCAT44(local_5ec0,local_5ec0);
          uStack_4498 = CONCAT44(local_5ec0,local_5ec0);
          uStack_4490 = CONCAT44(local_5ec0,local_5ec0);
          uStack_4488 = CONCAT44(local_5ec0,local_5ec0);
          local_5ec8 = local_6c90 + 0xe;
          local_5f00 = *local_5ec8;
          local_4500 = CONCAT44(local_5f00,local_5f00);
          uStack_44f8 = CONCAT44(local_5f00,local_5f00);
          uStack_44f0 = CONCAT44(local_5f00,local_5f00);
          uStack_44e8 = CONCAT44(local_5f00,local_5f00);
          local_5f08 = local_6c90 + 0xf;
          local_5f40 = *local_5f08;
          local_4560 = CONCAT44(local_5f40,local_5f40);
          uStack_4558 = CONCAT44(local_5f40,local_5f40);
          uStack_4550 = CONCAT44(local_5f40,local_5f40);
          uStack_4548 = CONCAT44(local_5f40,local_5f40);
          local_2660 = (float)local_3ca0;
          fStack_265c = local_3ca0._4_4_;
          fStack_2658 = (float)uStack_3c98;
          fStack_2654 = uStack_3c98._4_4_;
          fStack_2650 = (float)uStack_3c90;
          fStack_264c = uStack_3c90._4_4_;
          fStack_2648 = (float)uStack_3c88;
          fStack_2644 = uStack_3c88._4_4_;
          local_e60 = (float)local_3ca0 * local_5d80;
          fStack_e5c = local_3ca0._4_4_ * local_5d80;
          fStack_e58 = (float)uStack_3c98 * local_5d80;
          fStack_e54 = uStack_3c98._4_4_ * local_5d80;
          fStack_e50 = (float)uStack_3c90 * local_5d80;
          fStack_e4c = uStack_3c90._4_4_ * local_5d80;
          fStack_e48 = (float)uStack_3c88 * local_5d80;
          fVar135 = local_e60 + fVar135;
          fVar138 = fStack_e5c + fVar138;
          fVar140 = fStack_e58 + fVar140;
          fVar142 = fStack_e54 + fVar142;
          fVar144 = fStack_e50 + fVar144;
          fVar146 = fStack_e4c + fVar146;
          fVar148 = fStack_e48 + fVar148;
          uStack_3c88._4_4_ = uStack_3c88._4_4_ + uStack_3928._4_4_;
          local_4040 = CONCAT44(fVar138,fVar135);
          uStack_4038 = CONCAT44(fVar142,fVar140);
          uStack_4030 = CONCAT44(fVar146,fVar144);
          uStack_4028 = CONCAT44(uStack_3c88._4_4_,fVar148);
          local_2620 = (float)local_3d00;
          fStack_261c = local_3d00._4_4_;
          fStack_2618 = (float)uStack_3cf8;
          fStack_2614 = uStack_3cf8._4_4_;
          fStack_2610 = (float)uStack_3cf0;
          fStack_260c = uStack_3cf0._4_4_;
          fStack_2608 = (float)uStack_3ce8;
          fStack_2604 = uStack_3ce8._4_4_;
          local_e20 = (float)local_3d00 * local_5dc0;
          fStack_e1c = local_3d00._4_4_ * local_5dc0;
          fStack_e18 = (float)uStack_3cf8 * local_5dc0;
          fStack_e14 = uStack_3cf8._4_4_ * local_5dc0;
          fStack_e10 = (float)uStack_3cf0 * local_5dc0;
          fStack_e0c = uStack_3cf0._4_4_ * local_5dc0;
          fStack_e08 = (float)uStack_3ce8 * local_5dc0;
          fVar135 = local_e20 + fVar135;
          fVar138 = fStack_e1c + fVar138;
          fVar140 = fStack_e18 + fVar140;
          fVar142 = fStack_e14 + fVar142;
          fVar144 = fStack_e10 + fVar144;
          fVar146 = fStack_e0c + fVar146;
          fVar148 = fStack_e08 + fVar148;
          uStack_3ce8._4_4_ = uStack_3ce8._4_4_ + uStack_3c88._4_4_;
          local_40a0 = CONCAT44(fVar138,fVar135);
          uStack_4098 = CONCAT44(fVar142,fVar140);
          uStack_4090 = CONCAT44(fVar146,fVar144);
          uStack_4088 = CONCAT44(uStack_3ce8._4_4_,fVar148);
          local_25e0 = (float)local_3d60;
          fStack_25dc = local_3d60._4_4_;
          fStack_25d8 = (float)uStack_3d58;
          fStack_25d4 = uStack_3d58._4_4_;
          fStack_25d0 = (float)uStack_3d50;
          fStack_25cc = uStack_3d50._4_4_;
          fStack_25c8 = (float)uStack_3d48;
          fStack_25c4 = uStack_3d48._4_4_;
          local_de0 = (float)local_3d60 * local_5e00;
          fStack_ddc = local_3d60._4_4_ * local_5e00;
          fStack_dd8 = (float)uStack_3d58 * local_5e00;
          fStack_dd4 = uStack_3d58._4_4_ * local_5e00;
          fStack_dd0 = (float)uStack_3d50 * local_5e00;
          fStack_dcc = uStack_3d50._4_4_ * local_5e00;
          fStack_dc8 = (float)uStack_3d48 * local_5e00;
          fVar135 = local_de0 + fVar135;
          fVar138 = fStack_ddc + fVar138;
          fVar140 = fStack_dd8 + fVar140;
          fVar142 = fStack_dd4 + fVar142;
          fVar144 = fStack_dd0 + fVar144;
          fVar146 = fStack_dcc + fVar146;
          fVar148 = fStack_dc8 + fVar148;
          uStack_3d48._4_4_ = uStack_3d48._4_4_ + uStack_3ce8._4_4_;
          local_4100 = CONCAT44(fVar138,fVar135);
          uStack_40f8 = CONCAT44(fVar142,fVar140);
          uStack_40f0 = CONCAT44(fVar146,fVar144);
          uStack_40e8 = CONCAT44(uStack_3d48._4_4_,fVar148);
          local_25a0 = (float)local_3dc0;
          fStack_259c = local_3dc0._4_4_;
          fStack_2598 = (float)uStack_3db8;
          fStack_2594 = uStack_3db8._4_4_;
          fStack_2590 = (float)uStack_3db0;
          fStack_258c = uStack_3db0._4_4_;
          fStack_2588 = (float)uStack_3da8;
          fStack_2584 = uStack_3da8._4_4_;
          local_da0 = (float)local_3dc0 * local_5e40;
          fStack_d9c = local_3dc0._4_4_ * local_5e40;
          fStack_d98 = (float)uStack_3db8 * local_5e40;
          fStack_d94 = uStack_3db8._4_4_ * local_5e40;
          fStack_d90 = (float)uStack_3db0 * local_5e40;
          fStack_d8c = uStack_3db0._4_4_ * local_5e40;
          fStack_d88 = (float)uStack_3da8 * local_5e40;
          fVar135 = local_da0 + fVar135;
          fVar138 = fStack_d9c + fVar138;
          fVar140 = fStack_d98 + fVar140;
          fVar142 = fStack_d94 + fVar142;
          fVar144 = fStack_d90 + fVar144;
          fVar146 = fStack_d8c + fVar146;
          fVar148 = fStack_d88 + fVar148;
          uStack_3da8._4_4_ = uStack_3da8._4_4_ + uStack_3d48._4_4_;
          local_4160 = CONCAT44(fVar138,fVar135);
          uStack_4158 = CONCAT44(fVar142,fVar140);
          uStack_4150 = CONCAT44(fVar146,fVar144);
          uStack_4148 = CONCAT44(uStack_3da8._4_4_,fVar148);
          local_2560 = (float)local_3e20;
          fStack_255c = local_3e20._4_4_;
          fStack_2558 = (float)uStack_3e18;
          fStack_2554 = uStack_3e18._4_4_;
          fStack_2550 = (float)uStack_3e10;
          fStack_254c = uStack_3e10._4_4_;
          fStack_2548 = (float)uStack_3e08;
          fStack_2544 = uStack_3e08._4_4_;
          local_d60 = (float)local_3e20 * local_5e80;
          fStack_d5c = local_3e20._4_4_ * local_5e80;
          fStack_d58 = (float)uStack_3e18 * local_5e80;
          fStack_d54 = uStack_3e18._4_4_ * local_5e80;
          fStack_d50 = (float)uStack_3e10 * local_5e80;
          fStack_d4c = uStack_3e10._4_4_ * local_5e80;
          fStack_d48 = (float)uStack_3e08 * local_5e80;
          fVar135 = local_d60 + fVar135;
          fVar138 = fStack_d5c + fVar138;
          fVar140 = fStack_d58 + fVar140;
          fVar142 = fStack_d54 + fVar142;
          fVar144 = fStack_d50 + fVar144;
          fVar146 = fStack_d4c + fVar146;
          fVar148 = fStack_d48 + fVar148;
          uStack_3e08._4_4_ = uStack_3e08._4_4_ + uStack_3da8._4_4_;
          local_41c0 = CONCAT44(fVar138,fVar135);
          uStack_41b8 = CONCAT44(fVar142,fVar140);
          uStack_41b0 = CONCAT44(fVar146,fVar144);
          uStack_41a8 = CONCAT44(uStack_3e08._4_4_,fVar148);
          local_2520 = (float)local_3e80;
          fStack_251c = local_3e80._4_4_;
          fStack_2518 = (float)uStack_3e78;
          fStack_2514 = uStack_3e78._4_4_;
          fStack_2510 = (float)uStack_3e70;
          fStack_250c = uStack_3e70._4_4_;
          fStack_2508 = (float)uStack_3e68;
          fStack_2504 = uStack_3e68._4_4_;
          local_d20 = (float)local_3e80 * local_5ec0;
          fStack_d1c = local_3e80._4_4_ * local_5ec0;
          fStack_d18 = (float)uStack_3e78 * local_5ec0;
          fStack_d14 = uStack_3e78._4_4_ * local_5ec0;
          fStack_d10 = (float)uStack_3e70 * local_5ec0;
          fStack_d0c = uStack_3e70._4_4_ * local_5ec0;
          fStack_d08 = (float)uStack_3e68 * local_5ec0;
          fVar135 = local_d20 + fVar135;
          fVar138 = fStack_d1c + fVar138;
          fVar140 = fStack_d18 + fVar140;
          fVar142 = fStack_d14 + fVar142;
          fVar144 = fStack_d10 + fVar144;
          fVar146 = fStack_d0c + fVar146;
          fVar148 = fStack_d08 + fVar148;
          uStack_3e68._4_4_ = uStack_3e68._4_4_ + uStack_3e08._4_4_;
          local_4220 = CONCAT44(fVar138,fVar135);
          uStack_4218 = CONCAT44(fVar142,fVar140);
          uStack_4210 = CONCAT44(fVar146,fVar144);
          uStack_4208 = CONCAT44(uStack_3e68._4_4_,fVar148);
          local_24e0 = (float)local_3ee0;
          fStack_24dc = local_3ee0._4_4_;
          fStack_24d8 = (float)uStack_3ed8;
          fStack_24d4 = uStack_3ed8._4_4_;
          fStack_24d0 = (float)uStack_3ed0;
          fStack_24cc = uStack_3ed0._4_4_;
          fStack_24c8 = (float)uStack_3ec8;
          fStack_24c4 = uStack_3ec8._4_4_;
          local_ce0 = (float)local_3ee0 * local_5f00;
          fStack_cdc = local_3ee0._4_4_ * local_5f00;
          fStack_cd8 = (float)uStack_3ed8 * local_5f00;
          fStack_cd4 = uStack_3ed8._4_4_ * local_5f00;
          fStack_cd0 = (float)uStack_3ed0 * local_5f00;
          fStack_ccc = uStack_3ed0._4_4_ * local_5f00;
          fStack_cc8 = (float)uStack_3ec8 * local_5f00;
          fVar135 = local_ce0 + fVar135;
          fVar138 = fStack_cdc + fVar138;
          fVar140 = fStack_cd8 + fVar140;
          fVar142 = fStack_cd4 + fVar142;
          fVar144 = fStack_cd0 + fVar144;
          fVar146 = fStack_ccc + fVar146;
          fVar148 = fStack_cc8 + fVar148;
          uStack_3ec8._4_4_ = uStack_3ec8._4_4_ + uStack_3e68._4_4_;
          local_4280 = CONCAT44(fVar138,fVar135);
          uStack_4278 = CONCAT44(fVar142,fVar140);
          uStack_4270 = CONCAT44(fVar146,fVar144);
          uStack_4268 = CONCAT44(uStack_3ec8._4_4_,fVar148);
          local_24a0 = (float)local_3f40;
          fStack_249c = local_3f40._4_4_;
          fStack_2498 = (float)uStack_3f38;
          fStack_2494 = uStack_3f38._4_4_;
          fStack_2490 = (float)uStack_3f30;
          fStack_248c = uStack_3f30._4_4_;
          fStack_2488 = (float)uStack_3f28;
          fStack_2484 = uStack_3f28._4_4_;
          local_ca0 = (float)local_3f40 * local_5f40;
          fStack_c9c = local_3f40._4_4_ * local_5f40;
          fStack_c98 = (float)uStack_3f38 * local_5f40;
          fStack_c94 = uStack_3f38._4_4_ * local_5f40;
          fStack_c90 = (float)uStack_3f30 * local_5f40;
          fStack_c8c = uStack_3f30._4_4_ * local_5f40;
          fStack_c88 = (float)uStack_3f28 * local_5f40;
          fVar135 = local_ca0 + fVar135;
          fVar138 = fStack_c9c + fVar138;
          fVar140 = fStack_c98 + fVar140;
          fVar142 = fStack_c94 + fVar142;
          fVar144 = fStack_c90 + fVar144;
          fVar146 = fStack_c8c + fVar146;
          fVar148 = fStack_c88 + fVar148;
          uStack_3f28._4_4_ = uStack_3f28._4_4_ + uStack_3ec8._4_4_;
          local_45e0 = CONCAT44(fVar138,fVar135);
          uStack_45d8 = CONCAT44(fVar142,fVar140);
          uStack_45d0 = CONCAT44(fVar146,fVar144);
          uStack_45c8 = CONCAT44(uStack_3f28._4_4_,fVar148);
          local_45a0 = *(undefined8 *)local_6a20;
          uStack_4598 = *(undefined8 *)(pfVar133 + 0xc2);
          uStack_4590 = *(undefined8 *)(pfVar133 + 0xc4);
          uStack_4588 = *(undefined8 *)(pfVar133 + 0xc6);
          local_6a28 = pfVar133 + 200;
          local_4600 = *(undefined8 *)local_6a28;
          uStack_45f8 = *(undefined8 *)(pfVar133 + 0xca);
          uStack_45f0 = *(undefined8 *)(pfVar133 + 0xcc);
          uStack_45e8 = *(undefined8 *)(pfVar133 + 0xce);
          local_6a30 = pfVar133 + 0xd0;
          local_4660 = *(undefined8 *)local_6a30;
          uStack_4658 = *(undefined8 *)(pfVar133 + 0xd2);
          uStack_4650 = *(undefined8 *)(pfVar133 + 0xd4);
          uStack_4648 = *(undefined8 *)(pfVar133 + 0xd6);
          local_6a38 = pfVar133 + 0xd8;
          local_46c0 = *(undefined8 *)local_6a38;
          uStack_46b8 = *(undefined8 *)(pfVar133 + 0xda);
          uStack_46b0 = *(undefined8 *)(pfVar133 + 0xdc);
          uStack_46a8 = *(undefined8 *)(pfVar133 + 0xde);
          local_6a40 = pfVar133 + 0xe0;
          local_42a0._0_4_ = (float)local_45a0;
          local_2460 = (float)local_42a0;
          local_42a0._4_4_ = (float)((ulong)local_45a0 >> 0x20);
          fStack_245c = local_42a0._4_4_;
          uStack_4298._0_4_ = (float)uStack_4598;
          fStack_2458 = (float)uStack_4298;
          uStack_4298._4_4_ = (float)((ulong)uStack_4598 >> 0x20);
          fStack_2454 = uStack_4298._4_4_;
          uStack_4290._0_4_ = (float)uStack_4590;
          fStack_2450 = (float)uStack_4290;
          uStack_4290._4_4_ = (float)((ulong)uStack_4590 >> 0x20);
          fStack_244c = uStack_4290._4_4_;
          uStack_4288._0_4_ = (float)uStack_4588;
          fStack_2448 = (float)uStack_4288;
          uStack_4288._4_4_ = (float)((ulong)uStack_4588 >> 0x20);
          fStack_2444 = uStack_4288._4_4_;
          local_c60 = (float)local_42a0 * local_5d80;
          fStack_c5c = local_42a0._4_4_ * local_5d80;
          fStack_c58 = (float)uStack_4298 * local_5d80;
          fStack_c54 = uStack_4298._4_4_ * local_5d80;
          fStack_c50 = (float)uStack_4290 * local_5d80;
          fStack_c4c = uStack_4290._4_4_ * local_5d80;
          fStack_c48 = (float)uStack_4288 * local_5d80;
          fVar134 = local_c60 + fVar134;
          fVar137 = fStack_c5c + fVar137;
          fVar139 = fStack_c58 + fVar139;
          fVar141 = fStack_c54 + fVar141;
          fVar143 = fStack_c50 + fVar143;
          fVar145 = fStack_c4c + fVar145;
          fVar147 = fStack_c48 + fVar147;
          fVar149 = uStack_4288._4_4_ + fVar149;
          local_4340 = CONCAT44(fVar137,fVar134);
          uStack_4338 = CONCAT44(fVar141,fVar139);
          uStack_4330 = CONCAT44(fVar145,fVar143);
          uStack_4328 = CONCAT44(fVar149,fVar147);
          local_4300._0_4_ = (float)local_4600;
          local_2420 = (float)local_4300;
          local_4300._4_4_ = (float)((ulong)local_4600 >> 0x20);
          fStack_241c = local_4300._4_4_;
          uStack_42f8._0_4_ = (float)uStack_45f8;
          fStack_2418 = (float)uStack_42f8;
          uStack_42f8._4_4_ = (float)((ulong)uStack_45f8 >> 0x20);
          fStack_2414 = uStack_42f8._4_4_;
          uStack_42f0._0_4_ = (float)uStack_45f0;
          fStack_2410 = (float)uStack_42f0;
          uStack_42f0._4_4_ = (float)((ulong)uStack_45f0 >> 0x20);
          fStack_240c = uStack_42f0._4_4_;
          uStack_42e8._0_4_ = (float)uStack_45e8;
          fStack_2408 = (float)uStack_42e8;
          uStack_42e8._4_4_ = (float)((ulong)uStack_45e8 >> 0x20);
          fStack_2404 = uStack_42e8._4_4_;
          local_c20 = (float)local_4300 * local_5dc0;
          fStack_c1c = local_4300._4_4_ * local_5dc0;
          fStack_c18 = (float)uStack_42f8 * local_5dc0;
          fStack_c14 = uStack_42f8._4_4_ * local_5dc0;
          fStack_c10 = (float)uStack_42f0 * local_5dc0;
          fStack_c0c = uStack_42f0._4_4_ * local_5dc0;
          fStack_c08 = (float)uStack_42e8 * local_5dc0;
          fVar134 = local_c20 + fVar134;
          fVar137 = fStack_c1c + fVar137;
          fVar139 = fStack_c18 + fVar139;
          fVar141 = fStack_c14 + fVar141;
          fVar143 = fStack_c10 + fVar143;
          fVar145 = fStack_c0c + fVar145;
          fVar147 = fStack_c08 + fVar147;
          fVar149 = uStack_42e8._4_4_ + fVar149;
          local_43a0 = CONCAT44(fVar137,fVar134);
          uStack_4398 = CONCAT44(fVar141,fVar139);
          uStack_4390 = CONCAT44(fVar145,fVar143);
          uStack_4388 = CONCAT44(fVar149,fVar147);
          local_4360._0_4_ = (float)local_4660;
          local_23e0 = (float)local_4360;
          local_4360._4_4_ = (float)((ulong)local_4660 >> 0x20);
          fStack_23dc = local_4360._4_4_;
          uStack_4358._0_4_ = (float)uStack_4658;
          fStack_23d8 = (float)uStack_4358;
          uStack_4358._4_4_ = (float)((ulong)uStack_4658 >> 0x20);
          fStack_23d4 = uStack_4358._4_4_;
          uStack_4350._0_4_ = (float)uStack_4650;
          fStack_23d0 = (float)uStack_4350;
          uStack_4350._4_4_ = (float)((ulong)uStack_4650 >> 0x20);
          fStack_23cc = uStack_4350._4_4_;
          uStack_4348._0_4_ = (float)uStack_4648;
          fStack_23c8 = (float)uStack_4348;
          uStack_4348._4_4_ = (float)((ulong)uStack_4648 >> 0x20);
          fStack_23c4 = uStack_4348._4_4_;
          local_be0 = (float)local_4360 * local_5e00;
          fStack_bdc = local_4360._4_4_ * local_5e00;
          fStack_bd8 = (float)uStack_4358 * local_5e00;
          fStack_bd4 = uStack_4358._4_4_ * local_5e00;
          fStack_bd0 = (float)uStack_4350 * local_5e00;
          fStack_bcc = uStack_4350._4_4_ * local_5e00;
          fStack_bc8 = (float)uStack_4348 * local_5e00;
          fVar134 = local_be0 + fVar134;
          fVar137 = fStack_bdc + fVar137;
          fVar139 = fStack_bd8 + fVar139;
          fVar141 = fStack_bd4 + fVar141;
          fVar143 = fStack_bd0 + fVar143;
          fVar145 = fStack_bcc + fVar145;
          fVar147 = fStack_bc8 + fVar147;
          fVar149 = uStack_4348._4_4_ + fVar149;
          local_4400 = CONCAT44(fVar137,fVar134);
          uStack_43f8 = CONCAT44(fVar141,fVar139);
          uStack_43f0 = CONCAT44(fVar145,fVar143);
          uStack_43e8 = CONCAT44(fVar149,fVar147);
          local_43c0._0_4_ = (float)local_46c0;
          local_23a0 = (float)local_43c0;
          local_43c0._4_4_ = (float)((ulong)local_46c0 >> 0x20);
          fStack_239c = local_43c0._4_4_;
          uStack_43b8._0_4_ = (float)uStack_46b8;
          fStack_2398 = (float)uStack_43b8;
          uStack_43b8._4_4_ = (float)((ulong)uStack_46b8 >> 0x20);
          fStack_2394 = uStack_43b8._4_4_;
          uStack_43b0._0_4_ = (float)uStack_46b0;
          fStack_2390 = (float)uStack_43b0;
          uStack_43b0._4_4_ = (float)((ulong)uStack_46b0 >> 0x20);
          fStack_238c = uStack_43b0._4_4_;
          uStack_43a8._0_4_ = (float)uStack_46a8;
          fStack_2388 = (float)uStack_43a8;
          uStack_43a8._4_4_ = (float)((ulong)uStack_46a8 >> 0x20);
          fStack_2384 = uStack_43a8._4_4_;
          local_ba0 = (float)local_43c0 * local_5e40;
          fStack_b9c = local_43c0._4_4_ * local_5e40;
          fStack_b98 = (float)uStack_43b8 * local_5e40;
          fStack_b94 = uStack_43b8._4_4_ * local_5e40;
          fStack_b90 = (float)uStack_43b0 * local_5e40;
          fStack_b8c = uStack_43b0._4_4_ * local_5e40;
          fStack_b88 = (float)uStack_43a8 * local_5e40;
          fVar134 = local_ba0 + fVar134;
          fVar137 = fStack_b9c + fVar137;
          fVar139 = fStack_b98 + fVar139;
          fVar141 = fStack_b94 + fVar141;
          fVar143 = fStack_b90 + fVar143;
          fVar145 = fStack_b8c + fVar145;
          fVar147 = fStack_b88 + fVar147;
          fVar149 = uStack_43a8._4_4_ + fVar149;
          local_4460 = CONCAT44(fVar137,fVar134);
          uStack_4458 = CONCAT44(fVar141,fVar139);
          uStack_4450 = CONCAT44(fVar145,fVar143);
          uStack_4448 = CONCAT44(fVar149,fVar147);
          local_4720 = *(undefined8 *)local_6a40;
          uStack_4718 = *(undefined8 *)(pfVar133 + 0xe2);
          uStack_4710 = *(undefined8 *)(pfVar133 + 0xe4);
          uStack_4708 = *(undefined8 *)(pfVar133 + 0xe6);
          local_6a48 = pfVar133 + 0xe8;
          local_4780 = *(undefined8 *)local_6a48;
          uStack_4778 = *(undefined8 *)(pfVar133 + 0xea);
          uStack_4770 = *(undefined8 *)(pfVar133 + 0xec);
          uStack_4768 = *(undefined8 *)(pfVar133 + 0xee);
          local_6a50 = pfVar133 + 0xf0;
          local_47e0 = *(undefined8 *)local_6a50;
          uStack_47d8 = *(undefined8 *)(pfVar133 + 0xf2);
          uStack_47d0 = *(undefined8 *)(pfVar133 + 0xf4);
          uStack_47c8 = *(undefined8 *)(pfVar133 + 0xf6);
          local_6a58 = pfVar133 + 0xf8;
          local_4840 = *(undefined8 *)local_6a58;
          uStack_4838 = *(undefined8 *)(pfVar133 + 0xfa);
          uStack_4830 = *(undefined8 *)(pfVar133 + 0xfc);
          uStack_4828 = *(undefined8 *)(pfVar133 + 0xfe);
          local_4420._0_4_ = (float)local_4720;
          local_2360 = (float)local_4420;
          local_4420._4_4_ = (float)((ulong)local_4720 >> 0x20);
          fStack_235c = local_4420._4_4_;
          uStack_4418._0_4_ = (float)uStack_4718;
          fStack_2358 = (float)uStack_4418;
          uStack_4418._4_4_ = (float)((ulong)uStack_4718 >> 0x20);
          fStack_2354 = uStack_4418._4_4_;
          uStack_4410._0_4_ = (float)uStack_4710;
          fStack_2350 = (float)uStack_4410;
          uStack_4410._4_4_ = (float)((ulong)uStack_4710 >> 0x20);
          fStack_234c = uStack_4410._4_4_;
          uStack_4408._0_4_ = (float)uStack_4708;
          fStack_2348 = (float)uStack_4408;
          uStack_4408._4_4_ = (float)((ulong)uStack_4708 >> 0x20);
          fStack_2344 = uStack_4408._4_4_;
          local_b60 = (float)local_4420 * local_5e80;
          fStack_b5c = local_4420._4_4_ * local_5e80;
          fStack_b58 = (float)uStack_4418 * local_5e80;
          fStack_b54 = uStack_4418._4_4_ * local_5e80;
          fStack_b50 = (float)uStack_4410 * local_5e80;
          fStack_b4c = uStack_4410._4_4_ * local_5e80;
          fStack_b48 = (float)uStack_4408 * local_5e80;
          fVar134 = local_b60 + fVar134;
          fVar137 = fStack_b5c + fVar137;
          fVar139 = fStack_b58 + fVar139;
          fVar141 = fStack_b54 + fVar141;
          fVar143 = fStack_b50 + fVar143;
          fVar145 = fStack_b4c + fVar145;
          fVar147 = fStack_b48 + fVar147;
          fVar149 = uStack_4408._4_4_ + fVar149;
          local_44c0 = CONCAT44(fVar137,fVar134);
          uStack_44b8 = CONCAT44(fVar141,fVar139);
          uStack_44b0 = CONCAT44(fVar145,fVar143);
          uStack_44a8 = CONCAT44(fVar149,fVar147);
          local_4480._0_4_ = (float)local_4780;
          local_2320 = (float)local_4480;
          local_4480._4_4_ = (float)((ulong)local_4780 >> 0x20);
          fStack_231c = local_4480._4_4_;
          uStack_4478._0_4_ = (float)uStack_4778;
          fStack_2318 = (float)uStack_4478;
          uStack_4478._4_4_ = (float)((ulong)uStack_4778 >> 0x20);
          fStack_2314 = uStack_4478._4_4_;
          uStack_4470._0_4_ = (float)uStack_4770;
          fStack_2310 = (float)uStack_4470;
          uStack_4470._4_4_ = (float)((ulong)uStack_4770 >> 0x20);
          fStack_230c = uStack_4470._4_4_;
          uStack_4468._0_4_ = (float)uStack_4768;
          fStack_2308 = (float)uStack_4468;
          uStack_4468._4_4_ = (float)((ulong)uStack_4768 >> 0x20);
          fStack_2304 = uStack_4468._4_4_;
          local_b20 = (float)local_4480 * local_5ec0;
          fStack_b1c = local_4480._4_4_ * local_5ec0;
          fStack_b18 = (float)uStack_4478 * local_5ec0;
          fStack_b14 = uStack_4478._4_4_ * local_5ec0;
          fStack_b10 = (float)uStack_4470 * local_5ec0;
          fStack_b0c = uStack_4470._4_4_ * local_5ec0;
          fStack_b08 = (float)uStack_4468 * local_5ec0;
          fVar134 = local_b20 + fVar134;
          fVar137 = fStack_b1c + fVar137;
          fVar139 = fStack_b18 + fVar139;
          fVar141 = fStack_b14 + fVar141;
          fVar143 = fStack_b10 + fVar143;
          fVar145 = fStack_b0c + fVar145;
          fVar147 = fStack_b08 + fVar147;
          fVar149 = uStack_4468._4_4_ + fVar149;
          local_4520 = CONCAT44(fVar137,fVar134);
          uStack_4518 = CONCAT44(fVar141,fVar139);
          uStack_4510 = CONCAT44(fVar145,fVar143);
          uStack_4508 = CONCAT44(fVar149,fVar147);
          local_44e0._0_4_ = (float)local_47e0;
          local_22e0 = (float)local_44e0;
          local_44e0._4_4_ = (float)((ulong)local_47e0 >> 0x20);
          fStack_22dc = local_44e0._4_4_;
          uStack_44d8._0_4_ = (float)uStack_47d8;
          fStack_22d8 = (float)uStack_44d8;
          uStack_44d8._4_4_ = (float)((ulong)uStack_47d8 >> 0x20);
          fStack_22d4 = uStack_44d8._4_4_;
          uStack_44d0._0_4_ = (float)uStack_47d0;
          fStack_22d0 = (float)uStack_44d0;
          uStack_44d0._4_4_ = (float)((ulong)uStack_47d0 >> 0x20);
          fStack_22cc = uStack_44d0._4_4_;
          uStack_44c8._0_4_ = (float)uStack_47c8;
          fStack_22c8 = (float)uStack_44c8;
          uStack_44c8._4_4_ = (float)((ulong)uStack_47c8 >> 0x20);
          fStack_22c4 = uStack_44c8._4_4_;
          local_ae0 = (float)local_44e0 * local_5f00;
          fStack_adc = local_44e0._4_4_ * local_5f00;
          fStack_ad8 = (float)uStack_44d8 * local_5f00;
          fStack_ad4 = uStack_44d8._4_4_ * local_5f00;
          fStack_ad0 = (float)uStack_44d0 * local_5f00;
          fStack_acc = uStack_44d0._4_4_ * local_5f00;
          fStack_ac8 = (float)uStack_44c8 * local_5f00;
          fVar134 = local_ae0 + fVar134;
          fVar137 = fStack_adc + fVar137;
          fVar139 = fStack_ad8 + fVar139;
          fVar141 = fStack_ad4 + fVar141;
          fVar143 = fStack_ad0 + fVar143;
          fVar145 = fStack_acc + fVar145;
          fVar147 = fStack_ac8 + fVar147;
          fVar149 = uStack_44c8._4_4_ + fVar149;
          local_4580 = CONCAT44(fVar137,fVar134);
          uStack_4578 = CONCAT44(fVar141,fVar139);
          uStack_4570 = CONCAT44(fVar145,fVar143);
          uStack_4568 = CONCAT44(fVar149,fVar147);
          local_4540._0_4_ = (float)local_4840;
          local_22a0 = (float)local_4540;
          local_4540._4_4_ = (float)((ulong)local_4840 >> 0x20);
          fStack_229c = local_4540._4_4_;
          uStack_4538._0_4_ = (float)uStack_4838;
          fStack_2298 = (float)uStack_4538;
          uStack_4538._4_4_ = (float)((ulong)uStack_4838 >> 0x20);
          fStack_2294 = uStack_4538._4_4_;
          uStack_4530._0_4_ = (float)uStack_4830;
          fStack_2290 = (float)uStack_4530;
          uStack_4530._4_4_ = (float)((ulong)uStack_4830 >> 0x20);
          fStack_228c = uStack_4530._4_4_;
          uStack_4528._0_4_ = (float)uStack_4828;
          fStack_2288 = (float)uStack_4528;
          uStack_4528._4_4_ = (float)((ulong)uStack_4828 >> 0x20);
          fStack_2284 = uStack_4528._4_4_;
          local_aa0 = (float)local_4540 * local_5f40;
          fStack_a9c = local_4540._4_4_ * local_5f40;
          fStack_a98 = (float)uStack_4538 * local_5f40;
          fStack_a94 = uStack_4538._4_4_ * local_5f40;
          fStack_a90 = (float)uStack_4530 * local_5f40;
          fStack_a8c = uStack_4530._4_4_ * local_5f40;
          fStack_a88 = (float)uStack_4528 * local_5f40;
          local_54c0 = CONCAT44(fStack_a9c + fVar137,local_aa0 + fVar134);
          uStack_54b8 = CONCAT44(fStack_a94 + fVar141,fStack_a98 + fVar139);
          uStack_54b0 = CONCAT44(fStack_a8c + fVar145,fStack_a90 + fVar143);
          uStack_54a8 = CONCAT44(uStack_4528._4_4_ + fVar149,fStack_a88 + fVar147);
          local_5f48 = local_6c90 + 0x10;
          local_5f80 = *local_5f48;
          local_45c0 = CONCAT44(local_5f80,local_5f80);
          uStack_45b8 = CONCAT44(local_5f80,local_5f80);
          uStack_45b0 = CONCAT44(local_5f80,local_5f80);
          uStack_45a8 = CONCAT44(local_5f80,local_5f80);
          local_5f88 = local_6c90 + 0x11;
          local_5fc0 = *local_5f88;
          local_4620 = CONCAT44(local_5fc0,local_5fc0);
          uStack_4618 = CONCAT44(local_5fc0,local_5fc0);
          uStack_4610 = CONCAT44(local_5fc0,local_5fc0);
          uStack_4608 = CONCAT44(local_5fc0,local_5fc0);
          local_5fc8 = local_6c90 + 0x12;
          local_6000 = *local_5fc8;
          local_4680 = CONCAT44(local_6000,local_6000);
          uStack_4678 = CONCAT44(local_6000,local_6000);
          uStack_4670 = CONCAT44(local_6000,local_6000);
          uStack_4668 = CONCAT44(local_6000,local_6000);
          local_6008 = local_6c90 + 0x13;
          local_6040 = *local_6008;
          local_46e0 = CONCAT44(local_6040,local_6040);
          uStack_46d8 = CONCAT44(local_6040,local_6040);
          uStack_46d0 = CONCAT44(local_6040,local_6040);
          uStack_46c8 = CONCAT44(local_6040,local_6040);
          local_6048 = local_6c90 + 0x14;
          local_6080 = *local_6048;
          local_4740 = CONCAT44(local_6080,local_6080);
          uStack_4738 = CONCAT44(local_6080,local_6080);
          uStack_4730 = CONCAT44(local_6080,local_6080);
          uStack_4728 = CONCAT44(local_6080,local_6080);
          local_6088 = local_6c90 + 0x15;
          local_60c0 = *local_6088;
          local_47a0 = CONCAT44(local_60c0,local_60c0);
          uStack_4798 = CONCAT44(local_60c0,local_60c0);
          uStack_4790 = CONCAT44(local_60c0,local_60c0);
          uStack_4788 = CONCAT44(local_60c0,local_60c0);
          local_60c8 = local_6c90 + 0x16;
          local_6100 = *local_60c8;
          local_4800 = CONCAT44(local_6100,local_6100);
          uStack_47f8 = CONCAT44(local_6100,local_6100);
          uStack_47f0 = CONCAT44(local_6100,local_6100);
          uStack_47e8 = CONCAT44(local_6100,local_6100);
          local_6108 = local_6c90 + 0x17;
          local_6140 = *local_6108;
          local_4860 = CONCAT44(local_6140,local_6140);
          uStack_4858 = CONCAT44(local_6140,local_6140);
          uStack_4850 = CONCAT44(local_6140,local_6140);
          uStack_4848 = CONCAT44(local_6140,local_6140);
          local_2260 = (float)local_42a0;
          fStack_225c = local_42a0._4_4_;
          fStack_2258 = (float)uStack_4298;
          fStack_2254 = uStack_4298._4_4_;
          fStack_2250 = (float)uStack_4290;
          fStack_224c = uStack_4290._4_4_;
          fStack_2248 = (float)uStack_4288;
          fStack_2244 = uStack_4288._4_4_;
          local_a60 = (float)local_42a0 * local_5f80;
          fStack_a5c = local_42a0._4_4_ * local_5f80;
          fStack_a58 = (float)uStack_4298 * local_5f80;
          fStack_a54 = uStack_4298._4_4_ * local_5f80;
          fStack_a50 = (float)uStack_4290 * local_5f80;
          fStack_a4c = uStack_4290._4_4_ * local_5f80;
          fStack_a48 = (float)uStack_4288 * local_5f80;
          fVar135 = local_a60 + fVar135;
          fVar138 = fStack_a5c + fVar138;
          fVar140 = fStack_a58 + fVar140;
          fVar142 = fStack_a54 + fVar142;
          fVar144 = fStack_a50 + fVar144;
          fVar146 = fStack_a4c + fVar146;
          fVar148 = fStack_a48 + fVar148;
          uStack_4288._4_4_ = uStack_4288._4_4_ + uStack_3f28._4_4_;
          local_4640 = CONCAT44(fVar138,fVar135);
          uStack_4638 = CONCAT44(fVar142,fVar140);
          uStack_4630 = CONCAT44(fVar146,fVar144);
          uStack_4628 = CONCAT44(uStack_4288._4_4_,fVar148);
          local_2220 = (float)local_4300;
          fStack_221c = local_4300._4_4_;
          fStack_2218 = (float)uStack_42f8;
          fStack_2214 = uStack_42f8._4_4_;
          fStack_2210 = (float)uStack_42f0;
          fStack_220c = uStack_42f0._4_4_;
          fStack_2208 = (float)uStack_42e8;
          fStack_2204 = uStack_42e8._4_4_;
          local_a20 = (float)local_4300 * local_5fc0;
          fStack_a1c = local_4300._4_4_ * local_5fc0;
          fStack_a18 = (float)uStack_42f8 * local_5fc0;
          fStack_a14 = uStack_42f8._4_4_ * local_5fc0;
          fStack_a10 = (float)uStack_42f0 * local_5fc0;
          fStack_a0c = uStack_42f0._4_4_ * local_5fc0;
          fStack_a08 = (float)uStack_42e8 * local_5fc0;
          fVar135 = local_a20 + fVar135;
          fVar138 = fStack_a1c + fVar138;
          fVar140 = fStack_a18 + fVar140;
          fVar142 = fStack_a14 + fVar142;
          fVar144 = fStack_a10 + fVar144;
          fVar146 = fStack_a0c + fVar146;
          fVar148 = fStack_a08 + fVar148;
          uStack_42e8._4_4_ = uStack_42e8._4_4_ + uStack_4288._4_4_;
          local_46a0 = CONCAT44(fVar138,fVar135);
          uStack_4698 = CONCAT44(fVar142,fVar140);
          uStack_4690 = CONCAT44(fVar146,fVar144);
          uStack_4688 = CONCAT44(uStack_42e8._4_4_,fVar148);
          local_21e0 = (float)local_4360;
          fStack_21dc = local_4360._4_4_;
          fStack_21d8 = (float)uStack_4358;
          fStack_21d4 = uStack_4358._4_4_;
          fStack_21d0 = (float)uStack_4350;
          fStack_21cc = uStack_4350._4_4_;
          fStack_21c8 = (float)uStack_4348;
          fStack_21c4 = uStack_4348._4_4_;
          local_9e0 = (float)local_4360 * local_6000;
          fStack_9dc = local_4360._4_4_ * local_6000;
          fStack_9d8 = (float)uStack_4358 * local_6000;
          fStack_9d4 = uStack_4358._4_4_ * local_6000;
          fStack_9d0 = (float)uStack_4350 * local_6000;
          fStack_9cc = uStack_4350._4_4_ * local_6000;
          fStack_9c8 = (float)uStack_4348 * local_6000;
          fVar135 = local_9e0 + fVar135;
          fVar138 = fStack_9dc + fVar138;
          fVar140 = fStack_9d8 + fVar140;
          fVar142 = fStack_9d4 + fVar142;
          fVar144 = fStack_9d0 + fVar144;
          fVar146 = fStack_9cc + fVar146;
          fVar148 = fStack_9c8 + fVar148;
          uStack_4348._4_4_ = uStack_4348._4_4_ + uStack_42e8._4_4_;
          local_4700 = CONCAT44(fVar138,fVar135);
          uStack_46f8 = CONCAT44(fVar142,fVar140);
          uStack_46f0 = CONCAT44(fVar146,fVar144);
          uStack_46e8 = CONCAT44(uStack_4348._4_4_,fVar148);
          local_21a0 = (float)local_43c0;
          fStack_219c = local_43c0._4_4_;
          fStack_2198 = (float)uStack_43b8;
          fStack_2194 = uStack_43b8._4_4_;
          fStack_2190 = (float)uStack_43b0;
          fStack_218c = uStack_43b0._4_4_;
          fStack_2188 = (float)uStack_43a8;
          fStack_2184 = uStack_43a8._4_4_;
          local_9a0 = (float)local_43c0 * local_6040;
          fStack_99c = local_43c0._4_4_ * local_6040;
          fStack_998 = (float)uStack_43b8 * local_6040;
          fStack_994 = uStack_43b8._4_4_ * local_6040;
          fStack_990 = (float)uStack_43b0 * local_6040;
          fStack_98c = uStack_43b0._4_4_ * local_6040;
          fStack_988 = (float)uStack_43a8 * local_6040;
          fVar135 = local_9a0 + fVar135;
          fVar138 = fStack_99c + fVar138;
          fVar140 = fStack_998 + fVar140;
          fVar142 = fStack_994 + fVar142;
          fVar144 = fStack_990 + fVar144;
          fVar146 = fStack_98c + fVar146;
          fVar148 = fStack_988 + fVar148;
          uStack_43a8._4_4_ = uStack_43a8._4_4_ + uStack_4348._4_4_;
          local_4760 = CONCAT44(fVar138,fVar135);
          uStack_4758 = CONCAT44(fVar142,fVar140);
          uStack_4750 = CONCAT44(fVar146,fVar144);
          uStack_4748 = CONCAT44(uStack_43a8._4_4_,fVar148);
          local_2160 = (float)local_4420;
          fStack_215c = local_4420._4_4_;
          fStack_2158 = (float)uStack_4418;
          fStack_2154 = uStack_4418._4_4_;
          fStack_2150 = (float)uStack_4410;
          fStack_214c = uStack_4410._4_4_;
          fStack_2148 = (float)uStack_4408;
          fStack_2144 = uStack_4408._4_4_;
          local_960 = (float)local_4420 * local_6080;
          fStack_95c = local_4420._4_4_ * local_6080;
          fStack_958 = (float)uStack_4418 * local_6080;
          fStack_954 = uStack_4418._4_4_ * local_6080;
          fStack_950 = (float)uStack_4410 * local_6080;
          fStack_94c = uStack_4410._4_4_ * local_6080;
          fStack_948 = (float)uStack_4408 * local_6080;
          fVar135 = local_960 + fVar135;
          fVar138 = fStack_95c + fVar138;
          fVar140 = fStack_958 + fVar140;
          fVar142 = fStack_954 + fVar142;
          fVar144 = fStack_950 + fVar144;
          fVar146 = fStack_94c + fVar146;
          fVar148 = fStack_948 + fVar148;
          uStack_4408._4_4_ = uStack_4408._4_4_ + uStack_43a8._4_4_;
          local_47c0 = CONCAT44(fVar138,fVar135);
          uStack_47b8 = CONCAT44(fVar142,fVar140);
          uStack_47b0 = CONCAT44(fVar146,fVar144);
          uStack_47a8 = CONCAT44(uStack_4408._4_4_,fVar148);
          local_2120 = (float)local_4480;
          fStack_211c = local_4480._4_4_;
          fStack_2118 = (float)uStack_4478;
          fStack_2114 = uStack_4478._4_4_;
          fStack_2110 = (float)uStack_4470;
          fStack_210c = uStack_4470._4_4_;
          fStack_2108 = (float)uStack_4468;
          fStack_2104 = uStack_4468._4_4_;
          local_920 = (float)local_4480 * local_60c0;
          fStack_91c = local_4480._4_4_ * local_60c0;
          fStack_918 = (float)uStack_4478 * local_60c0;
          fStack_914 = uStack_4478._4_4_ * local_60c0;
          fStack_910 = (float)uStack_4470 * local_60c0;
          fStack_90c = uStack_4470._4_4_ * local_60c0;
          fStack_908 = (float)uStack_4468 * local_60c0;
          fVar135 = local_920 + fVar135;
          fVar138 = fStack_91c + fVar138;
          fVar140 = fStack_918 + fVar140;
          fVar142 = fStack_914 + fVar142;
          fVar144 = fStack_910 + fVar144;
          fVar146 = fStack_90c + fVar146;
          fVar148 = fStack_908 + fVar148;
          uStack_4468._4_4_ = uStack_4468._4_4_ + uStack_4408._4_4_;
          local_4820 = CONCAT44(fVar138,fVar135);
          uStack_4818 = CONCAT44(fVar142,fVar140);
          uStack_4810 = CONCAT44(fVar146,fVar144);
          uStack_4808 = CONCAT44(uStack_4468._4_4_,fVar148);
          local_20e0 = (float)local_44e0;
          fStack_20dc = local_44e0._4_4_;
          fStack_20d8 = (float)uStack_44d8;
          fStack_20d4 = uStack_44d8._4_4_;
          fStack_20d0 = (float)uStack_44d0;
          fStack_20cc = uStack_44d0._4_4_;
          fStack_20c8 = (float)uStack_44c8;
          fStack_20c4 = uStack_44c8._4_4_;
          local_8e0 = (float)local_44e0 * local_6100;
          fStack_8dc = local_44e0._4_4_ * local_6100;
          fStack_8d8 = (float)uStack_44d8 * local_6100;
          fStack_8d4 = uStack_44d8._4_4_ * local_6100;
          fStack_8d0 = (float)uStack_44d0 * local_6100;
          fStack_8cc = uStack_44d0._4_4_ * local_6100;
          fStack_8c8 = (float)uStack_44c8 * local_6100;
          fVar135 = local_8e0 + fVar135;
          fVar138 = fStack_8dc + fVar138;
          fVar140 = fStack_8d8 + fVar140;
          fVar142 = fStack_8d4 + fVar142;
          fVar144 = fStack_8d0 + fVar144;
          fVar146 = fStack_8cc + fVar146;
          fVar148 = fStack_8c8 + fVar148;
          uStack_44c8._4_4_ = uStack_44c8._4_4_ + uStack_4468._4_4_;
          local_4880 = CONCAT44(fVar138,fVar135);
          uStack_4878 = CONCAT44(fVar142,fVar140);
          uStack_4870 = CONCAT44(fVar146,fVar144);
          uStack_4868 = CONCAT44(uStack_44c8._4_4_,fVar148);
          local_20a0 = (float)local_4540;
          fStack_209c = local_4540._4_4_;
          fStack_2098 = (float)uStack_4538;
          fStack_2094 = uStack_4538._4_4_;
          fStack_2090 = (float)uStack_4530;
          fStack_208c = uStack_4530._4_4_;
          fStack_2088 = (float)uStack_4528;
          fStack_2084 = uStack_4528._4_4_;
          local_8a0 = (float)local_4540 * local_6140;
          fStack_89c = local_4540._4_4_ * local_6140;
          fStack_898 = (float)uStack_4538 * local_6140;
          fStack_894 = uStack_4538._4_4_ * local_6140;
          fStack_890 = (float)uStack_4530 * local_6140;
          fStack_88c = uStack_4530._4_4_ * local_6140;
          fStack_888 = (float)uStack_4528 * local_6140;
          local_5500 = CONCAT44(fStack_89c + fVar138,local_8a0 + fVar135);
          uStack_54f8 = CONCAT44(fStack_894 + fVar142,fStack_898 + fVar140);
          uStack_54f0 = CONCAT44(fStack_88c + fVar146,fStack_890 + fVar144);
          uStack_54e8 = CONCAT44(uStack_4528._4_4_ + uStack_44c8._4_4_,fStack_888 + fVar148);
          local_5488 = local_6c38;
          *(undefined8 *)*local_6c38 = local_54c0;
          *(undefined8 *)(*local_6c38 + 8) = uStack_54b8;
          *(undefined8 *)(*local_6c38 + 0x10) = uStack_54b0;
          *(undefined8 *)(*local_6c38 + 0x18) = uStack_54a8;
          local_54c8 = local_6c38 + 1;
          auVar132._8_8_ = uStack_54f8;
          auVar132._0_8_ = local_5500;
          auVar132._16_8_ = uStack_54f0;
          auVar132._24_8_ = uStack_54e8;
          *local_54c8 = auVar132;
          local_6c38 = local_6c38 + 2;
          local_6c90 = local_5f48;
          local_6c88 = local_5948;
          local_6960 = pfVar133;
          fStack_613c = local_6140;
          fStack_6138 = local_6140;
          fStack_6134 = local_6140;
          fStack_6130 = local_6140;
          fStack_612c = local_6140;
          fStack_6128 = local_6140;
          fStack_6124 = local_6140;
          local_610c = local_6140;
          fStack_60fc = local_6100;
          fStack_60f8 = local_6100;
          fStack_60f4 = local_6100;
          fStack_60f0 = local_6100;
          fStack_60ec = local_6100;
          fStack_60e8 = local_6100;
          fStack_60e4 = local_6100;
          local_60cc = local_6100;
          fStack_60bc = local_60c0;
          fStack_60b8 = local_60c0;
          fStack_60b4 = local_60c0;
          fStack_60b0 = local_60c0;
          fStack_60ac = local_60c0;
          fStack_60a8 = local_60c0;
          fStack_60a4 = local_60c0;
          local_608c = local_60c0;
          fStack_607c = local_6080;
          fStack_6078 = local_6080;
          fStack_6074 = local_6080;
          fStack_6070 = local_6080;
          fStack_606c = local_6080;
          fStack_6068 = local_6080;
          fStack_6064 = local_6080;
          local_604c = local_6080;
          fStack_603c = local_6040;
          fStack_6038 = local_6040;
          fStack_6034 = local_6040;
          fStack_6030 = local_6040;
          fStack_602c = local_6040;
          fStack_6028 = local_6040;
          fStack_6024 = local_6040;
          local_600c = local_6040;
          fStack_5ffc = local_6000;
          fStack_5ff8 = local_6000;
          fStack_5ff4 = local_6000;
          fStack_5ff0 = local_6000;
          fStack_5fec = local_6000;
          fStack_5fe8 = local_6000;
          fStack_5fe4 = local_6000;
          local_5fcc = local_6000;
          fStack_5fbc = local_5fc0;
          fStack_5fb8 = local_5fc0;
          fStack_5fb4 = local_5fc0;
          fStack_5fb0 = local_5fc0;
          fStack_5fac = local_5fc0;
          fStack_5fa8 = local_5fc0;
          fStack_5fa4 = local_5fc0;
          local_5f8c = local_5fc0;
          fStack_5f7c = local_5f80;
          fStack_5f78 = local_5f80;
          fStack_5f74 = local_5f80;
          fStack_5f70 = local_5f80;
          fStack_5f6c = local_5f80;
          fStack_5f68 = local_5f80;
          fStack_5f64 = local_5f80;
          local_5f4c = local_5f80;
          fStack_5f3c = local_5f40;
          fStack_5f38 = local_5f40;
          fStack_5f34 = local_5f40;
          fStack_5f30 = local_5f40;
          fStack_5f2c = local_5f40;
          fStack_5f28 = local_5f40;
          fStack_5f24 = local_5f40;
          local_5f0c = local_5f40;
          fStack_5efc = local_5f00;
          fStack_5ef8 = local_5f00;
          fStack_5ef4 = local_5f00;
          fStack_5ef0 = local_5f00;
          fStack_5eec = local_5f00;
          fStack_5ee8 = local_5f00;
          fStack_5ee4 = local_5f00;
          local_5ecc = local_5f00;
          fStack_5ebc = local_5ec0;
          fStack_5eb8 = local_5ec0;
          fStack_5eb4 = local_5ec0;
          fStack_5eb0 = local_5ec0;
          fStack_5eac = local_5ec0;
          fStack_5ea8 = local_5ec0;
          fStack_5ea4 = local_5ec0;
          local_5e8c = local_5ec0;
          fStack_5e7c = local_5e80;
          fStack_5e78 = local_5e80;
          fStack_5e74 = local_5e80;
          fStack_5e70 = local_5e80;
          fStack_5e6c = local_5e80;
          fStack_5e68 = local_5e80;
          fStack_5e64 = local_5e80;
          local_5e4c = local_5e80;
          fStack_5e3c = local_5e40;
          fStack_5e38 = local_5e40;
          fStack_5e34 = local_5e40;
          fStack_5e30 = local_5e40;
          fStack_5e2c = local_5e40;
          fStack_5e28 = local_5e40;
          fStack_5e24 = local_5e40;
          local_5e0c = local_5e40;
          fStack_5dfc = local_5e00;
          fStack_5df8 = local_5e00;
          fStack_5df4 = local_5e00;
          fStack_5df0 = local_5e00;
          fStack_5dec = local_5e00;
          fStack_5de8 = local_5e00;
          fStack_5de4 = local_5e00;
          local_5dcc = local_5e00;
          fStack_5dbc = local_5dc0;
          fStack_5db8 = local_5dc0;
          fStack_5db4 = local_5dc0;
          fStack_5db0 = local_5dc0;
          fStack_5dac = local_5dc0;
          fStack_5da8 = local_5dc0;
          fStack_5da4 = local_5dc0;
          local_5d8c = local_5dc0;
          fStack_5d7c = local_5d80;
          fStack_5d78 = local_5d80;
          fStack_5d74 = local_5d80;
          fStack_5d70 = local_5d80;
          fStack_5d6c = local_5d80;
          fStack_5d68 = local_5d80;
          fStack_5d64 = local_5d80;
          local_5d4c = local_5d80;
          fStack_5d3c = local_5d40;
          fStack_5d38 = local_5d40;
          fStack_5d34 = local_5d40;
          fStack_5d30 = local_5d40;
          fStack_5d2c = local_5d40;
          fStack_5d28 = local_5d40;
          fStack_5d24 = local_5d40;
          local_5d0c = local_5d40;
          fStack_5cfc = local_5d00;
          fStack_5cf8 = local_5d00;
          fStack_5cf4 = local_5d00;
          fStack_5cf0 = local_5d00;
          fStack_5cec = local_5d00;
          fStack_5ce8 = local_5d00;
          fStack_5ce4 = local_5d00;
          local_5ccc = local_5d00;
          fStack_5cbc = local_5cc0;
          fStack_5cb8 = local_5cc0;
          fStack_5cb4 = local_5cc0;
          fStack_5cb0 = local_5cc0;
          fStack_5cac = local_5cc0;
          fStack_5ca8 = local_5cc0;
          fStack_5ca4 = local_5cc0;
          local_5c8c = local_5cc0;
          fStack_5c7c = local_5c80;
          fStack_5c78 = local_5c80;
          fStack_5c74 = local_5c80;
          fStack_5c70 = local_5c80;
          fStack_5c6c = local_5c80;
          fStack_5c68 = local_5c80;
          fStack_5c64 = local_5c80;
          local_5c4c = local_5c80;
          fStack_5c3c = local_5c40;
          fStack_5c38 = local_5c40;
          fStack_5c34 = local_5c40;
          fStack_5c30 = local_5c40;
          fStack_5c2c = local_5c40;
          fStack_5c28 = local_5c40;
          fStack_5c24 = local_5c40;
          local_5c0c = local_5c40;
          fStack_5bfc = local_5c00;
          fStack_5bf8 = local_5c00;
          fStack_5bf4 = local_5c00;
          fStack_5bf0 = local_5c00;
          fStack_5bec = local_5c00;
          fStack_5be8 = local_5c00;
          fStack_5be4 = local_5c00;
          local_5bcc = local_5c00;
          fStack_5bbc = local_5bc0;
          fStack_5bb8 = local_5bc0;
          fStack_5bb4 = local_5bc0;
          fStack_5bb0 = local_5bc0;
          fStack_5bac = local_5bc0;
          fStack_5ba8 = local_5bc0;
          fStack_5ba4 = local_5bc0;
          local_5b8c = local_5bc0;
          fStack_5b7c = local_5b80;
          fStack_5b78 = local_5b80;
          fStack_5b74 = local_5b80;
          fStack_5b70 = local_5b80;
          fStack_5b6c = local_5b80;
          fStack_5b68 = local_5b80;
          fStack_5b64 = local_5b80;
          local_5b4c = local_5b80;
          fStack_5b3c = local_5b40;
          fStack_5b38 = local_5b40;
          fStack_5b34 = local_5b40;
          fStack_5b30 = local_5b40;
          fStack_5b2c = local_5b40;
          fStack_5b28 = local_5b40;
          fStack_5b24 = local_5b40;
          local_5b0c = local_5b40;
          fStack_5afc = local_5b00;
          fStack_5af8 = local_5b00;
          fStack_5af4 = local_5b00;
          fStack_5af0 = local_5b00;
          fStack_5aec = local_5b00;
          fStack_5ae8 = local_5b00;
          fStack_5ae4 = local_5b00;
          local_5acc = local_5b00;
          fStack_5abc = local_5ac0;
          fStack_5ab8 = local_5ac0;
          fStack_5ab4 = local_5ac0;
          fStack_5ab0 = local_5ac0;
          fStack_5aac = local_5ac0;
          fStack_5aa8 = local_5ac0;
          fStack_5aa4 = local_5ac0;
          local_5a8c = local_5ac0;
          fStack_5a7c = local_5a80;
          fStack_5a78 = local_5a80;
          fStack_5a74 = local_5a80;
          fStack_5a70 = local_5a80;
          fStack_5a6c = local_5a80;
          fStack_5a68 = local_5a80;
          fStack_5a64 = local_5a80;
          local_5a4c = local_5a80;
          fStack_5a3c = local_5a40;
          fStack_5a38 = local_5a40;
          fStack_5a34 = local_5a40;
          fStack_5a30 = local_5a40;
          fStack_5a2c = local_5a40;
          fStack_5a28 = local_5a40;
          fStack_5a24 = local_5a40;
          local_5a0c = local_5a40;
          fStack_59fc = local_5a00;
          fStack_59f8 = local_5a00;
          fStack_59f4 = local_5a00;
          fStack_59f0 = local_5a00;
          fStack_59ec = local_5a00;
          fStack_59e8 = local_5a00;
          fStack_59e4 = local_5a00;
          local_59cc = local_5a00;
          fStack_59bc = local_59c0;
          fStack_59b8 = local_59c0;
          fStack_59b4 = local_59c0;
          fStack_59b0 = local_59c0;
          fStack_59ac = local_59c0;
          fStack_59a8 = local_59c0;
          fStack_59a4 = local_59c0;
          local_598c = local_59c0;
          fStack_597c = local_5980;
          fStack_5978 = local_5980;
          fStack_5974 = local_5980;
          fStack_5970 = local_5980;
          fStack_596c = local_5980;
          fStack_5968 = local_5980;
          fStack_5964 = local_5980;
          local_594c = local_5980;
          fStack_593c = local_5940;
          fStack_5938 = local_5940;
          fStack_5934 = local_5940;
          fStack_5930 = local_5940;
          fStack_592c = local_5940;
          fStack_5928 = local_5940;
          fStack_5924 = local_5940;
          local_590c = local_5940;
          fStack_58fc = local_5900;
          fStack_58f8 = local_5900;
          fStack_58f4 = local_5900;
          fStack_58f0 = local_5900;
          fStack_58ec = local_5900;
          fStack_58e8 = local_5900;
          fStack_58e4 = local_5900;
          local_58cc = local_5900;
          fStack_58bc = local_58c0;
          fStack_58b8 = local_58c0;
          fStack_58b4 = local_58c0;
          fStack_58b0 = local_58c0;
          fStack_58ac = local_58c0;
          fStack_58a8 = local_58c0;
          fStack_58a4 = local_58c0;
          local_588c = local_58c0;
          fStack_587c = local_5880;
          fStack_5878 = local_5880;
          fStack_5874 = local_5880;
          fStack_5870 = local_5880;
          fStack_586c = local_5880;
          fStack_5868 = local_5880;
          fStack_5864 = local_5880;
          local_584c = local_5880;
          fStack_583c = local_5840;
          fStack_5838 = local_5840;
          fStack_5834 = local_5840;
          fStack_5830 = local_5840;
          fStack_582c = local_5840;
          fStack_5828 = local_5840;
          fStack_5824 = local_5840;
          local_580c = local_5840;
          fStack_57fc = local_5800;
          fStack_57f8 = local_5800;
          fStack_57f4 = local_5800;
          fStack_57f0 = local_5800;
          fStack_57ec = local_5800;
          fStack_57e8 = local_5800;
          fStack_57e4 = local_5800;
          local_57cc = local_5800;
          fStack_57bc = local_57c0;
          fStack_57b8 = local_57c0;
          fStack_57b4 = local_57c0;
          fStack_57b0 = local_57c0;
          fStack_57ac = local_57c0;
          fStack_57a8 = local_57c0;
          fStack_57a4 = local_57c0;
          local_578c = local_57c0;
          fStack_577c = local_5780;
          fStack_5778 = local_5780;
          fStack_5774 = local_5780;
          fStack_5770 = local_5780;
          fStack_576c = local_5780;
          fStack_5768 = local_5780;
          fStack_5764 = local_5780;
          local_574c = local_5780;
          fStack_573c = local_5740;
          fStack_5738 = local_5740;
          fStack_5734 = local_5740;
          fStack_5730 = local_5740;
          fStack_572c = local_5740;
          fStack_5728 = local_5740;
          fStack_5724 = local_5740;
          local_570c = local_5740;
          fStack_56fc = local_5700;
          fStack_56f8 = local_5700;
          fStack_56f4 = local_5700;
          fStack_56f0 = local_5700;
          fStack_56ec = local_5700;
          fStack_56e8 = local_5700;
          fStack_56e4 = local_5700;
          local_56cc = local_5700;
          fStack_56bc = local_56c0;
          fStack_56b8 = local_56c0;
          fStack_56b4 = local_56c0;
          fStack_56b0 = local_56c0;
          fStack_56ac = local_56c0;
          fStack_56a8 = local_56c0;
          fStack_56a4 = local_56c0;
          local_568c = local_56c0;
          fStack_567c = local_5680;
          fStack_5678 = local_5680;
          fStack_5674 = local_5680;
          fStack_5670 = local_5680;
          fStack_566c = local_5680;
          fStack_5668 = local_5680;
          fStack_5664 = local_5680;
          local_564c = local_5680;
          fStack_563c = local_5640;
          fStack_5638 = local_5640;
          fStack_5634 = local_5640;
          fStack_5630 = local_5640;
          fStack_562c = local_5640;
          fStack_5628 = local_5640;
          fStack_5624 = local_5640;
          local_560c = local_5640;
          fStack_55fc = local_5600;
          fStack_55f8 = local_5600;
          fStack_55f4 = local_5600;
          fStack_55f0 = local_5600;
          fStack_55ec = local_5600;
          fStack_55e8 = local_5600;
          fStack_55e4 = local_5600;
          local_55cc = local_5600;
          fStack_55bc = local_55c0;
          fStack_55b8 = local_55c0;
          fStack_55b4 = local_55c0;
          fStack_55b0 = local_55c0;
          fStack_55ac = local_55c0;
          fStack_55a8 = local_55c0;
          fStack_55a4 = local_55c0;
          local_558c = local_55c0;
          fStack_557c = local_5580;
          fStack_5578 = local_5580;
          fStack_5574 = local_5580;
          fStack_5570 = local_5580;
          fStack_556c = local_5580;
          fStack_5568 = local_5580;
          fStack_5564 = local_5580;
          local_554c = local_5580;
          local_4540 = local_4840;
          uStack_4538 = uStack_4838;
          uStack_4530 = uStack_4830;
          uStack_4528 = uStack_4828;
          local_44e0 = local_47e0;
          uStack_44d8 = uStack_47d8;
          uStack_44d0 = uStack_47d0;
          uStack_44c8 = uStack_47c8;
          local_4480 = local_4780;
          uStack_4478 = uStack_4778;
          uStack_4470 = uStack_4770;
          uStack_4468 = uStack_4768;
          local_4420 = local_4720;
          uStack_4418 = uStack_4718;
          uStack_4410 = uStack_4710;
          uStack_4408 = uStack_4708;
          local_43c0 = local_46c0;
          uStack_43b8 = uStack_46b8;
          uStack_43b0 = uStack_46b0;
          uStack_43a8 = uStack_46a8;
          local_4360 = local_4660;
          uStack_4358 = uStack_4658;
          uStack_4350 = uStack_4650;
          uStack_4348 = uStack_4648;
          local_4300 = local_4600;
          uStack_42f8 = uStack_45f8;
          uStack_42f0 = uStack_45f0;
          uStack_42e8 = uStack_45e8;
          local_42a0 = local_45a0;
          uStack_4298 = uStack_4598;
          uStack_4290 = uStack_4590;
          uStack_4288 = uStack_4588;
          local_4260 = local_4560;
          uStack_4258 = uStack_4558;
          uStack_4250 = uStack_4550;
          uStack_4248 = uStack_4548;
          local_4200 = local_4500;
          uStack_41f8 = uStack_44f8;
          uStack_41f0 = uStack_44f0;
          uStack_41e8 = uStack_44e8;
          local_41a0 = local_44a0;
          uStack_4198 = uStack_4498;
          uStack_4190 = uStack_4490;
          uStack_4188 = uStack_4488;
          local_4140 = local_4440;
          uStack_4138 = uStack_4438;
          uStack_4130 = uStack_4430;
          uStack_4128 = uStack_4428;
          local_40e0 = local_43e0;
          uStack_40d8 = uStack_43d8;
          uStack_40d0 = uStack_43d0;
          uStack_40c8 = uStack_43c8;
          local_4080 = local_4380;
          uStack_4078 = uStack_4378;
          uStack_4070 = uStack_4370;
          uStack_4068 = uStack_4368;
          local_4020 = local_4320;
          uStack_4018 = uStack_4318;
          uStack_4010 = uStack_4310;
          uStack_4008 = uStack_4308;
          local_3fc0 = local_42c0;
          uStack_3fb8 = uStack_42b8;
          uStack_3fb0 = uStack_42b0;
          uStack_3fa8 = uStack_42a8;
          local_3f40 = local_4240;
          uStack_3f38 = uStack_4238;
          uStack_3f30 = uStack_4230;
          uStack_3f28 = uStack_4228;
          local_3ee0 = local_41e0;
          uStack_3ed8 = uStack_41d8;
          uStack_3ed0 = uStack_41d0;
          uStack_3ec8 = uStack_41c8;
          local_3e80 = local_4180;
          uStack_3e78 = uStack_4178;
          uStack_3e70 = uStack_4170;
          uStack_3e68 = uStack_4168;
          local_3e20 = local_4120;
          uStack_3e18 = uStack_4118;
          uStack_3e10 = uStack_4110;
          uStack_3e08 = uStack_4108;
          local_3dc0 = local_40c0;
          uStack_3db8 = uStack_40b8;
          uStack_3db0 = uStack_40b0;
          uStack_3da8 = uStack_40a8;
          local_3d60 = local_4060;
          uStack_3d58 = uStack_4058;
          uStack_3d50 = uStack_4050;
          uStack_3d48 = uStack_4048;
          local_3d00 = local_4000;
          uStack_3cf8 = uStack_3ff8;
          uStack_3cf0 = uStack_3ff0;
          uStack_3ce8 = uStack_3fe8;
          local_3ca0 = local_3fa0;
          uStack_3c98 = uStack_3f98;
          uStack_3c90 = uStack_3f90;
          uStack_3c88 = uStack_3f88;
          local_3940 = local_3c40;
          uStack_3938 = uStack_3c38;
          uStack_3930 = uStack_3c30;
          uStack_3928 = uStack_3c28;
          local_38e0 = local_3be0;
          uStack_38d8 = uStack_3bd8;
          uStack_38d0 = uStack_3bd0;
          uStack_38c8 = uStack_3bc8;
          local_3880 = local_3b80;
          uStack_3878 = uStack_3b78;
          uStack_3870 = uStack_3b70;
          uStack_3868 = uStack_3b68;
          local_3820 = local_3b20;
          uStack_3818 = uStack_3b18;
          uStack_3810 = uStack_3b10;
          uStack_3808 = uStack_3b08;
          local_37c0 = local_3ac0;
          uStack_37b8 = uStack_3ab8;
          uStack_37b0 = uStack_3ab0;
          uStack_37a8 = uStack_3aa8;
          local_3760 = local_3a60;
          uStack_3758 = uStack_3a58;
          uStack_3750 = uStack_3a50;
          uStack_3748 = uStack_3a48;
          local_3700 = local_3a00;
          uStack_36f8 = uStack_39f8;
          uStack_36f0 = uStack_39f0;
          uStack_36e8 = uStack_39e8;
          local_36a0 = local_39a0;
          uStack_3698 = uStack_3998;
          uStack_3690 = uStack_3990;
          uStack_3688 = uStack_3988;
          local_3660 = local_3960;
          uStack_3658 = uStack_3958;
          uStack_3650 = uStack_3950;
          uStack_3648 = uStack_3948;
          local_3600 = local_3900;
          uStack_35f8 = uStack_38f8;
          uStack_35f0 = uStack_38f0;
          uStack_35e8 = uStack_38e8;
          local_35a0 = local_38a0;
          uStack_3598 = uStack_3898;
          uStack_3590 = uStack_3890;
          uStack_3588 = uStack_3888;
          local_3540 = local_3840;
          uStack_3538 = uStack_3838;
          uStack_3530 = uStack_3830;
          uStack_3528 = uStack_3828;
          local_34e0 = local_37e0;
          uStack_34d8 = uStack_37d8;
          uStack_34d0 = uStack_37d0;
          uStack_34c8 = uStack_37c8;
          local_3480 = local_3780;
          uStack_3478 = uStack_3778;
          uStack_3470 = uStack_3770;
          uStack_3468 = uStack_3768;
          local_3420 = local_3720;
          uStack_3418 = uStack_3718;
          uStack_3410 = uStack_3710;
          uStack_3408 = uStack_3708;
          local_33c0 = local_36c0;
          uStack_33b8 = uStack_36b8;
          uStack_33b0 = uStack_36b0;
          uStack_33a8 = uStack_36a8;
          local_3340 = local_3640;
          uStack_3338 = uStack_3638;
          uStack_3330 = uStack_3630;
          uStack_3328 = uStack_3628;
          local_32e0 = local_35e0;
          uStack_32d8 = uStack_35d8;
          uStack_32d0 = uStack_35d0;
          uStack_32c8 = uStack_35c8;
          local_3280 = local_3580;
          uStack_3278 = uStack_3578;
          uStack_3270 = uStack_3570;
          uStack_3268 = uStack_3568;
          local_3220 = local_3520;
          uStack_3218 = uStack_3518;
          uStack_3210 = uStack_3510;
          uStack_3208 = uStack_3508;
          local_31c0 = local_34c0;
          uStack_31b8 = uStack_34b8;
          uStack_31b0 = uStack_34b0;
          uStack_31a8 = uStack_34a8;
          local_3160 = local_3460;
          uStack_3158 = uStack_3458;
          uStack_3150 = uStack_3450;
          uStack_3148 = uStack_3448;
          local_3100 = local_3400;
          uStack_30f8 = uStack_33f8;
          uStack_30f0 = uStack_33f0;
          uStack_30e8 = uStack_33e8;
          local_30a0 = local_33a0;
          uStack_3098 = uStack_3398;
          uStack_3090 = uStack_3390;
          uStack_3088 = uStack_3388;
          local_3080 = local_30c0;
          uStack_3078 = uStack_30b8;
          uStack_3070 = uStack_30b0;
          uStack_3068 = uStack_30a8;
          local_3040 = local_3120;
          uStack_3038 = uStack_3118;
          uStack_3030 = uStack_3110;
          uStack_3028 = uStack_3108;
          local_3000 = local_3180;
          uStack_2ff8 = uStack_3178;
          uStack_2ff0 = uStack_3170;
          uStack_2fe8 = uStack_3168;
          local_2fc0 = local_31e0;
          uStack_2fb8 = uStack_31d8;
          uStack_2fb0 = uStack_31d0;
          uStack_2fa8 = uStack_31c8;
          local_2f80 = local_3240;
          uStack_2f78 = uStack_3238;
          uStack_2f70 = uStack_3230;
          uStack_2f68 = uStack_3228;
          local_2f40 = local_32a0;
          uStack_2f38 = uStack_3298;
          uStack_2f30 = uStack_3290;
          uStack_2f28 = uStack_3288;
          local_2f00 = local_3300;
          uStack_2ef8 = uStack_32f8;
          uStack_2ef0 = uStack_32f0;
          uStack_2ee8 = uStack_32e8;
          local_2ec0 = local_3360;
          uStack_2eb8 = uStack_3358;
          uStack_2eb0 = uStack_3350;
          uStack_2ea8 = uStack_3348;
          local_2e80 = local_36c0;
          uStack_2e78 = uStack_36b8;
          uStack_2e70 = uStack_36b0;
          uStack_2e68 = uStack_36a8;
          local_2e40 = local_3720;
          uStack_2e38 = uStack_3718;
          uStack_2e30 = uStack_3710;
          uStack_2e28 = uStack_3708;
          local_2e00 = local_3780;
          uStack_2df8 = uStack_3778;
          uStack_2df0 = uStack_3770;
          uStack_2de8 = uStack_3768;
          local_2dc0 = local_37e0;
          uStack_2db8 = uStack_37d8;
          uStack_2db0 = uStack_37d0;
          uStack_2da8 = uStack_37c8;
          local_2d80 = local_3840;
          uStack_2d78 = uStack_3838;
          uStack_2d70 = uStack_3830;
          uStack_2d68 = uStack_3828;
          local_2d40 = local_38a0;
          uStack_2d38 = uStack_3898;
          uStack_2d30 = uStack_3890;
          uStack_2d28 = uStack_3888;
          local_2d00 = local_3900;
          uStack_2cf8 = uStack_38f8;
          uStack_2cf0 = uStack_38f0;
          uStack_2ce8 = uStack_38e8;
          local_2cc0 = local_3960;
          uStack_2cb8 = uStack_3958;
          uStack_2cb0 = uStack_3950;
          uStack_2ca8 = uStack_3948;
          local_2c80 = local_36c0;
          uStack_2c78 = uStack_36b8;
          uStack_2c70 = uStack_36b0;
          uStack_2c68 = uStack_36a8;
          local_2c40 = local_3720;
          uStack_2c38 = uStack_3718;
          uStack_2c30 = uStack_3710;
          uStack_2c28 = uStack_3708;
          local_2c00 = local_3780;
          uStack_2bf8 = uStack_3778;
          uStack_2bf0 = uStack_3770;
          uStack_2be8 = uStack_3768;
          local_2bc0 = local_37e0;
          uStack_2bb8 = uStack_37d8;
          uStack_2bb0 = uStack_37d0;
          uStack_2ba8 = uStack_37c8;
          local_2b80 = local_3840;
          uStack_2b78 = uStack_3838;
          uStack_2b70 = uStack_3830;
          uStack_2b68 = uStack_3828;
          local_2b40 = local_38a0;
          uStack_2b38 = uStack_3898;
          uStack_2b30 = uStack_3890;
          uStack_2b28 = uStack_3888;
          local_2b00 = local_3900;
          uStack_2af8 = uStack_38f8;
          uStack_2af0 = uStack_38f0;
          uStack_2ae8 = uStack_38e8;
          local_2ac0 = local_3960;
          uStack_2ab8 = uStack_3958;
          uStack_2ab0 = uStack_3950;
          uStack_2aa8 = uStack_3948;
          local_2a80 = local_39c0;
          uStack_2a78 = uStack_39b8;
          uStack_2a70 = uStack_39b0;
          uStack_2a68 = uStack_39a8;
          local_2a40 = local_3a20;
          uStack_2a38 = uStack_3a18;
          uStack_2a30 = uStack_3a10;
          uStack_2a28 = uStack_3a08;
          local_2a00 = local_3a80;
          uStack_29f8 = uStack_3a78;
          uStack_29f0 = uStack_3a70;
          uStack_29e8 = uStack_3a68;
          local_29c0 = local_3ae0;
          uStack_29b8 = uStack_3ad8;
          uStack_29b0 = uStack_3ad0;
          uStack_29a8 = uStack_3ac8;
          local_2980 = local_3b40;
          uStack_2978 = uStack_3b38;
          uStack_2970 = uStack_3b30;
          uStack_2968 = uStack_3b28;
          local_2940 = local_3ba0;
          uStack_2938 = uStack_3b98;
          uStack_2930 = uStack_3b90;
          uStack_2928 = uStack_3b88;
          local_2900 = local_3c00;
          uStack_28f8 = uStack_3bf8;
          uStack_28f0 = uStack_3bf0;
          uStack_28e8 = uStack_3be8;
          local_28c0 = local_3c60;
          uStack_28b8 = uStack_3c58;
          uStack_28b0 = uStack_3c50;
          uStack_28a8 = uStack_3c48;
          local_2880 = local_3cc0;
          uStack_2878 = uStack_3cb8;
          uStack_2870 = uStack_3cb0;
          uStack_2868 = uStack_3ca8;
          local_2840 = local_3d20;
          uStack_2838 = uStack_3d18;
          uStack_2830 = uStack_3d10;
          uStack_2828 = uStack_3d08;
          local_2800 = local_3d80;
          uStack_27f8 = uStack_3d78;
          uStack_27f0 = uStack_3d70;
          uStack_27e8 = uStack_3d68;
          local_27c0 = local_3de0;
          uStack_27b8 = uStack_3dd8;
          uStack_27b0 = uStack_3dd0;
          uStack_27a8 = uStack_3dc8;
          local_2780 = local_3e40;
          uStack_2778 = uStack_3e38;
          uStack_2770 = uStack_3e30;
          uStack_2768 = uStack_3e28;
          local_2740 = local_3ea0;
          uStack_2738 = uStack_3e98;
          uStack_2730 = uStack_3e90;
          uStack_2728 = uStack_3e88;
          local_2700 = local_3f00;
          uStack_26f8 = uStack_3ef8;
          uStack_26f0 = uStack_3ef0;
          uStack_26e8 = uStack_3ee8;
          local_26c0 = local_3f60;
          uStack_26b8 = uStack_3f58;
          uStack_26b0 = uStack_3f50;
          uStack_26a8 = uStack_3f48;
          local_2680 = local_42c0;
          uStack_2678 = uStack_42b8;
          uStack_2670 = uStack_42b0;
          uStack_2668 = uStack_42a8;
          local_2640 = local_4320;
          uStack_2638 = uStack_4318;
          uStack_2630 = uStack_4310;
          uStack_2628 = uStack_4308;
          local_2600 = local_4380;
          uStack_25f8 = uStack_4378;
          uStack_25f0 = uStack_4370;
          uStack_25e8 = uStack_4368;
          local_25c0 = local_43e0;
          uStack_25b8 = uStack_43d8;
          uStack_25b0 = uStack_43d0;
          uStack_25a8 = uStack_43c8;
          local_2580 = local_4440;
          uStack_2578 = uStack_4438;
          uStack_2570 = uStack_4430;
          uStack_2568 = uStack_4428;
          local_2540 = local_44a0;
          uStack_2538 = uStack_4498;
          uStack_2530 = uStack_4490;
          uStack_2528 = uStack_4488;
          local_2500 = local_4500;
          uStack_24f8 = uStack_44f8;
          uStack_24f0 = uStack_44f0;
          uStack_24e8 = uStack_44e8;
          local_24c0 = local_4560;
          uStack_24b8 = uStack_4558;
          uStack_24b0 = uStack_4550;
          uStack_24a8 = uStack_4548;
          local_2480 = local_42c0;
          uStack_2478 = uStack_42b8;
          uStack_2470 = uStack_42b0;
          uStack_2468 = uStack_42a8;
          local_2440 = local_4320;
          uStack_2438 = uStack_4318;
          uStack_2430 = uStack_4310;
          uStack_2428 = uStack_4308;
          local_2400 = local_4380;
          uStack_23f8 = uStack_4378;
          uStack_23f0 = uStack_4370;
          uStack_23e8 = uStack_4368;
          local_23c0 = local_43e0;
          uStack_23b8 = uStack_43d8;
          uStack_23b0 = uStack_43d0;
          uStack_23a8 = uStack_43c8;
          local_2380 = local_4440;
          uStack_2378 = uStack_4438;
          uStack_2370 = uStack_4430;
          uStack_2368 = uStack_4428;
          local_2340 = local_44a0;
          uStack_2338 = uStack_4498;
          uStack_2330 = uStack_4490;
          uStack_2328 = uStack_4488;
          local_2300 = local_4500;
          uStack_22f8 = uStack_44f8;
          uStack_22f0 = uStack_44f0;
          uStack_22e8 = uStack_44e8;
          local_22c0 = local_4560;
          uStack_22b8 = uStack_4558;
          uStack_22b0 = uStack_4550;
          uStack_22a8 = uStack_4548;
          local_2280 = local_45c0;
          uStack_2278 = uStack_45b8;
          uStack_2270 = uStack_45b0;
          uStack_2268 = uStack_45a8;
          local_2240 = local_4620;
          uStack_2238 = uStack_4618;
          uStack_2230 = uStack_4610;
          uStack_2228 = uStack_4608;
          local_2200 = local_4680;
          uStack_21f8 = uStack_4678;
          uStack_21f0 = uStack_4670;
          uStack_21e8 = uStack_4668;
          local_21c0 = local_46e0;
          uStack_21b8 = uStack_46d8;
          uStack_21b0 = uStack_46d0;
          uStack_21a8 = uStack_46c8;
          local_2180 = local_4740;
          uStack_2178 = uStack_4738;
          uStack_2170 = uStack_4730;
          uStack_2168 = uStack_4728;
          local_2140 = local_47a0;
          uStack_2138 = uStack_4798;
          uStack_2130 = uStack_4790;
          uStack_2128 = uStack_4788;
          local_2100 = local_4800;
          uStack_20f8 = uStack_47f8;
          uStack_20f0 = uStack_47f0;
          uStack_20e8 = uStack_47e8;
          local_20c0 = local_4860;
          uStack_20b8 = uStack_4858;
          uStack_20b0 = uStack_4850;
          uStack_20a8 = uStack_4848;
          local_1880 = local_30e0;
          uStack_1878 = uStack_30d8;
          uStack_1870 = uStack_30d0;
          uStack_1868 = uStack_30c8;
          fStack_1844 = fStack_3044;
          local_1840 = local_3140;
          uStack_1838 = uStack_3138;
          uStack_1830 = uStack_3130;
          uStack_1828 = uStack_3128;
          fStack_1804 = fStack_3004;
          local_1800 = local_31a0;
          uStack_17f8 = uStack_3198;
          uStack_17f0 = uStack_3190;
          uStack_17e8 = uStack_3188;
          fStack_17c4 = fStack_2fc4;
          local_17c0 = local_3200;
          uStack_17b8 = uStack_31f8;
          uStack_17b0 = uStack_31f0;
          uStack_17a8 = uStack_31e8;
          fStack_1784 = fStack_2f84;
          local_1780 = local_3260;
          uStack_1778 = uStack_3258;
          uStack_1770 = uStack_3250;
          uStack_1768 = uStack_3248;
          fStack_1744 = fStack_2f44;
          local_1740 = local_32c0;
          uStack_1738 = uStack_32b8;
          uStack_1730 = uStack_32b0;
          uStack_1728 = uStack_32a8;
          fStack_1704 = fStack_2f04;
          local_1700 = local_3320;
          uStack_16f8 = uStack_3318;
          uStack_16f0 = uStack_3310;
          uStack_16e8 = uStack_3308;
          fStack_16c4 = fStack_2ec4;
          local_16c0 = local_3380;
          uStack_16b8 = uStack_3378;
          uStack_16b0 = uStack_3370;
          uStack_16a8 = uStack_3368;
          fStack_1684 = fStack_2e84;
          local_1680 = local_33e0;
          uStack_1678 = uStack_33d8;
          uStack_1670 = uStack_33d0;
          uStack_1668 = uStack_33c8;
          fStack_1644 = fStack_2e44;
          local_1640 = local_3440;
          uStack_1638 = uStack_3438;
          uStack_1630 = uStack_3430;
          uStack_1628 = uStack_3428;
          fStack_1604 = fStack_2e04;
          local_1600 = local_34a0;
          uStack_15f8 = uStack_3498;
          uStack_15f0 = uStack_3490;
          uStack_15e8 = uStack_3488;
          fStack_15c4 = fStack_2dc4;
          local_15c0 = local_3500;
          uStack_15b8 = uStack_34f8;
          uStack_15b0 = uStack_34f0;
          uStack_15a8 = uStack_34e8;
          fStack_1584 = fStack_2d84;
          local_1580 = local_3560;
          uStack_1578 = uStack_3558;
          uStack_1570 = uStack_3550;
          uStack_1568 = uStack_3548;
          fStack_1544 = fStack_2d44;
          local_1540 = local_35c0;
          uStack_1538 = uStack_35b8;
          uStack_1530 = uStack_35b0;
          uStack_1528 = uStack_35a8;
          fStack_1504 = fStack_2d04;
          local_1500 = local_3620;
          uStack_14f8 = uStack_3618;
          uStack_14f0 = uStack_3610;
          uStack_14e8 = uStack_3608;
          fStack_14c4 = fStack_2cc4;
          local_14c0 = local_3680;
          uStack_14b8 = uStack_3678;
          uStack_14b0 = uStack_3670;
          uStack_14a8 = uStack_3668;
          fStack_1484 = fStack_2c84;
          local_1480 = local_36e0;
          uStack_1478 = uStack_36d8;
          uStack_1470 = uStack_36d0;
          uStack_1468 = uStack_36c8;
          fStack_1444 = fStack_2c44;
          local_1440 = local_3740;
          uStack_1438 = uStack_3738;
          uStack_1430 = uStack_3730;
          uStack_1428 = uStack_3728;
          fStack_1404 = fStack_2c04;
          local_1400 = local_37a0;
          uStack_13f8 = uStack_3798;
          uStack_13f0 = uStack_3790;
          uStack_13e8 = uStack_3788;
          fStack_13c4 = fStack_2bc4;
          local_13c0 = local_3800;
          uStack_13b8 = uStack_37f8;
          uStack_13b0 = uStack_37f0;
          uStack_13a8 = uStack_37e8;
          fStack_1384 = fStack_2b84;
          local_1380 = local_3860;
          uStack_1378 = uStack_3858;
          uStack_1370 = uStack_3850;
          uStack_1368 = uStack_3848;
          fStack_1344 = fStack_2b44;
          local_1340 = local_38c0;
          uStack_1338 = uStack_38b8;
          uStack_1330 = uStack_38b0;
          uStack_1328 = uStack_38a8;
          fStack_1304 = fStack_2b04;
          local_1300 = local_3920;
          uStack_12f8 = uStack_3918;
          uStack_12f0 = uStack_3910;
          uStack_12e8 = uStack_3908;
          fStack_12c4 = fStack_2ac4;
          local_12c0 = local_3980;
          uStack_12b8 = uStack_3978;
          uStack_12b0 = uStack_3970;
          uStack_12a8 = uStack_3968;
          fStack_1284 = fStack_2a84;
          local_1280 = local_39e0;
          uStack_1278 = uStack_39d8;
          uStack_1270 = uStack_39d0;
          uStack_1268 = uStack_39c8;
          fStack_1244 = fStack_2a44;
          local_1240 = local_3a40;
          uStack_1238 = uStack_3a38;
          uStack_1230 = uStack_3a30;
          uStack_1228 = uStack_3a28;
          fStack_1204 = fStack_2a04;
          local_1200 = local_3aa0;
          uStack_11f8 = uStack_3a98;
          uStack_11f0 = uStack_3a90;
          uStack_11e8 = uStack_3a88;
          fStack_11c4 = fStack_29c4;
          local_11c0 = local_3b00;
          uStack_11b8 = uStack_3af8;
          uStack_11b0 = uStack_3af0;
          uStack_11a8 = uStack_3ae8;
          fStack_1184 = fStack_2984;
          local_1180 = local_3b60;
          uStack_1178 = uStack_3b58;
          uStack_1170 = uStack_3b50;
          uStack_1168 = uStack_3b48;
          fStack_1144 = fStack_2944;
          local_1140 = local_3bc0;
          uStack_1138 = uStack_3bb8;
          uStack_1130 = uStack_3bb0;
          uStack_1128 = uStack_3ba8;
          fStack_1104 = fStack_2904;
          local_1100 = local_3c20;
          uStack_10f8 = uStack_3c18;
          uStack_10f0 = uStack_3c10;
          uStack_10e8 = uStack_3c08;
          fStack_10c4 = fStack_28c4;
          local_10c0 = local_3c80;
          uStack_10b8 = uStack_3c78;
          uStack_10b0 = uStack_3c70;
          uStack_10a8 = uStack_3c68;
          fStack_1084 = fStack_2884;
          local_1080 = local_3ce0;
          uStack_1078 = uStack_3cd8;
          uStack_1070 = uStack_3cd0;
          uStack_1068 = uStack_3cc8;
          fStack_1044 = fStack_2844;
          local_1040 = local_3d40;
          uStack_1038 = uStack_3d38;
          uStack_1030 = uStack_3d30;
          uStack_1028 = uStack_3d28;
          fStack_1004 = fStack_2804;
          local_1000 = local_3da0;
          uStack_ff8 = uStack_3d98;
          uStack_ff0 = uStack_3d90;
          uStack_fe8 = uStack_3d88;
          fStack_fc4 = fStack_27c4;
          local_fc0 = local_3e00;
          uStack_fb8 = uStack_3df8;
          uStack_fb0 = uStack_3df0;
          uStack_fa8 = uStack_3de8;
          fStack_f84 = fStack_2784;
          local_f80 = local_3e60;
          uStack_f78 = uStack_3e58;
          uStack_f70 = uStack_3e50;
          uStack_f68 = uStack_3e48;
          fStack_f44 = fStack_2744;
          local_f40 = local_3ec0;
          uStack_f38 = uStack_3eb8;
          uStack_f30 = uStack_3eb0;
          uStack_f28 = uStack_3ea8;
          fStack_f04 = fStack_2704;
          local_f00 = local_3f20;
          uStack_ef8 = uStack_3f18;
          uStack_ef0 = uStack_3f10;
          uStack_ee8 = uStack_3f08;
          fStack_ec4 = fStack_26c4;
          local_ec0 = local_3f80;
          uStack_eb8 = uStack_3f78;
          uStack_eb0 = uStack_3f70;
          uStack_ea8 = uStack_3f68;
          fStack_e84 = fStack_2684;
          local_e80 = local_3fe0;
          uStack_e78 = uStack_3fd8;
          uStack_e70 = uStack_3fd0;
          uStack_e68 = uStack_3fc8;
          fStack_e44 = fStack_2644;
          local_e40 = local_4040;
          uStack_e38 = uStack_4038;
          uStack_e30 = uStack_4030;
          uStack_e28 = uStack_4028;
          fStack_e04 = fStack_2604;
          local_e00 = local_40a0;
          uStack_df8 = uStack_4098;
          uStack_df0 = uStack_4090;
          uStack_de8 = uStack_4088;
          fStack_dc4 = fStack_25c4;
          local_dc0 = local_4100;
          uStack_db8 = uStack_40f8;
          uStack_db0 = uStack_40f0;
          uStack_da8 = uStack_40e8;
          fStack_d84 = fStack_2584;
          local_d80 = local_4160;
          uStack_d78 = uStack_4158;
          uStack_d70 = uStack_4150;
          uStack_d68 = uStack_4148;
          fStack_d44 = fStack_2544;
          local_d40 = local_41c0;
          uStack_d38 = uStack_41b8;
          uStack_d30 = uStack_41b0;
          uStack_d28 = uStack_41a8;
          fStack_d04 = fStack_2504;
          local_d00 = local_4220;
          uStack_cf8 = uStack_4218;
          uStack_cf0 = uStack_4210;
          uStack_ce8 = uStack_4208;
          fStack_cc4 = fStack_24c4;
          local_cc0 = local_4280;
          uStack_cb8 = uStack_4278;
          uStack_cb0 = uStack_4270;
          uStack_ca8 = uStack_4268;
          fStack_c84 = fStack_2484;
          local_c80 = local_42e0;
          uStack_c78 = uStack_42d8;
          uStack_c70 = uStack_42d0;
          uStack_c68 = uStack_42c8;
          fStack_c44 = fStack_2444;
          local_c40 = local_4340;
          uStack_c38 = uStack_4338;
          uStack_c30 = uStack_4330;
          uStack_c28 = uStack_4328;
          fStack_c04 = fStack_2404;
          local_c00 = local_43a0;
          uStack_bf8 = uStack_4398;
          uStack_bf0 = uStack_4390;
          uStack_be8 = uStack_4388;
          fStack_bc4 = fStack_23c4;
          local_bc0 = local_4400;
          uStack_bb8 = uStack_43f8;
          uStack_bb0 = uStack_43f0;
          uStack_ba8 = uStack_43e8;
          fStack_b84 = fStack_2384;
          local_b80 = local_4460;
          uStack_b78 = uStack_4458;
          uStack_b70 = uStack_4450;
          uStack_b68 = uStack_4448;
          fStack_b44 = fStack_2344;
          local_b40 = local_44c0;
          uStack_b38 = uStack_44b8;
          uStack_b30 = uStack_44b0;
          uStack_b28 = uStack_44a8;
          fStack_b04 = fStack_2304;
          local_b00 = local_4520;
          uStack_af8 = uStack_4518;
          uStack_af0 = uStack_4510;
          uStack_ae8 = uStack_4508;
          fStack_ac4 = fStack_22c4;
          local_ac0 = local_4580;
          uStack_ab8 = uStack_4578;
          uStack_ab0 = uStack_4570;
          uStack_aa8 = uStack_4568;
          fStack_a84 = fStack_2284;
          local_a80 = local_45e0;
          uStack_a78 = uStack_45d8;
          uStack_a70 = uStack_45d0;
          uStack_a68 = uStack_45c8;
          fStack_a44 = fStack_2244;
          local_a40 = local_4640;
          uStack_a38 = uStack_4638;
          uStack_a30 = uStack_4630;
          uStack_a28 = uStack_4628;
          fStack_a04 = fStack_2204;
          local_a00 = local_46a0;
          uStack_9f8 = uStack_4698;
          uStack_9f0 = uStack_4690;
          uStack_9e8 = uStack_4688;
          fStack_9c4 = fStack_21c4;
          local_9c0 = local_4700;
          uStack_9b8 = uStack_46f8;
          uStack_9b0 = uStack_46f0;
          uStack_9a8 = uStack_46e8;
          fStack_984 = fStack_2184;
          local_980 = local_4760;
          uStack_978 = uStack_4758;
          uStack_970 = uStack_4750;
          uStack_968 = uStack_4748;
          fStack_944 = fStack_2144;
          local_940 = local_47c0;
          uStack_938 = uStack_47b8;
          uStack_930 = uStack_47b0;
          uStack_928 = uStack_47a8;
          fStack_904 = fStack_2104;
          local_900 = local_4820;
          uStack_8f8 = uStack_4818;
          uStack_8f0 = uStack_4810;
          uStack_8e8 = uStack_4808;
          fStack_8c4 = fStack_20c4;
          local_8c0 = local_4880;
          uStack_8b8 = uStack_4878;
          uStack_8b0 = uStack_4870;
          uStack_8a8 = uStack_4868;
          fStack_884 = fStack_2084;
        }
        for (; local_6ce8 < local_6b98; local_6ce8 = local_6ce8 + 1) {
          local_6a60 = local_6c38;
          local_48e0 = *(undefined8 *)*local_6c38;
          uStack_48d8 = *(undefined8 *)(*local_6c38 + 8);
          uStack_48d0 = *(undefined8 *)(*local_6c38 + 0x10);
          uStack_48c8 = *(undefined8 *)(*local_6c38 + 0x18);
          local_6148 = local_6c88;
          local_6180 = *local_6c88;
          local_48c0 = CONCAT44(local_6180,local_6180);
          uStack_48b8 = CONCAT44(local_6180,local_6180);
          uStack_48b0 = CONCAT44(local_6180,local_6180);
          uStack_48a8 = CONCAT44(local_6180,local_6180);
          local_6188 = local_6c88 + 1;
          local_61c0 = *local_6188;
          local_4920 = CONCAT44(local_61c0,local_61c0);
          uStack_4918 = CONCAT44(local_61c0,local_61c0);
          uStack_4910 = CONCAT44(local_61c0,local_61c0);
          uStack_4908 = CONCAT44(local_61c0,local_61c0);
          local_61c8 = local_6c88 + 2;
          local_6200 = *local_61c8;
          local_4980 = CONCAT44(local_6200,local_6200);
          uStack_4978 = CONCAT44(local_6200,local_6200);
          uStack_4970 = CONCAT44(local_6200,local_6200);
          uStack_4968 = CONCAT44(local_6200,local_6200);
          local_6208 = local_6c88 + 3;
          local_6240 = *local_6208;
          local_49e0 = CONCAT44(local_6240,local_6240);
          uStack_49d8 = CONCAT44(local_6240,local_6240);
          uStack_49d0 = CONCAT44(local_6240,local_6240);
          uStack_49c8 = CONCAT44(local_6240,local_6240);
          local_6248 = local_6c88 + 4;
          local_6280 = *local_6248;
          local_4a40 = CONCAT44(local_6280,local_6280);
          uStack_4a38 = CONCAT44(local_6280,local_6280);
          uStack_4a30 = CONCAT44(local_6280,local_6280);
          uStack_4a28 = CONCAT44(local_6280,local_6280);
          local_6288 = local_6c88 + 5;
          local_62c0 = *local_6288;
          local_4aa0 = CONCAT44(local_62c0,local_62c0);
          uStack_4a98 = CONCAT44(local_62c0,local_62c0);
          uStack_4a90 = CONCAT44(local_62c0,local_62c0);
          uStack_4a88 = CONCAT44(local_62c0,local_62c0);
          local_62c8 = local_6c88 + 6;
          local_6300 = *local_62c8;
          local_4b00 = CONCAT44(local_6300,local_6300);
          uStack_4af8 = CONCAT44(local_6300,local_6300);
          uStack_4af0 = CONCAT44(local_6300,local_6300);
          uStack_4ae8 = CONCAT44(local_6300,local_6300);
          local_6308 = local_6c88 + 7;
          local_6340 = *local_6308;
          local_4b60 = CONCAT44(local_6340,local_6340);
          uStack_4b58 = CONCAT44(local_6340,local_6340);
          uStack_4b50 = CONCAT44(local_6340,local_6340);
          uStack_4b48 = CONCAT44(local_6340,local_6340);
          uVar3 = *(undefined8 *)pfVar133;
          uVar4 = *(undefined8 *)(pfVar133 + 2);
          uVar5 = *(undefined8 *)(pfVar133 + 4);
          uVar6 = *(undefined8 *)(pfVar133 + 6);
          local_6a70 = pfVar133 + 8;
          uVar7 = *(undefined8 *)local_6a70;
          uVar8 = *(undefined8 *)(pfVar133 + 10);
          uVar9 = *(undefined8 *)(pfVar133 + 0xc);
          uVar10 = *(undefined8 *)(pfVar133 + 0xe);
          local_6a78 = pfVar133 + 0x10;
          uVar11 = *(undefined8 *)local_6a78;
          uVar12 = *(undefined8 *)(pfVar133 + 0x12);
          uVar13 = *(undefined8 *)(pfVar133 + 0x14);
          uVar14 = *(undefined8 *)(pfVar133 + 0x16);
          local_6a80 = pfVar133 + 0x18;
          uVar15 = *(undefined8 *)local_6a80;
          uVar16 = *(undefined8 *)(pfVar133 + 0x1a);
          uVar17 = *(undefined8 *)(pfVar133 + 0x1c);
          uVar18 = *(undefined8 *)(pfVar133 + 0x1e);
          local_6a88 = pfVar133 + 0x20;
          local_48a0._0_4_ = (float)uVar3;
          local_2060 = (float)local_48a0;
          local_48a0._4_4_ = (float)((ulong)uVar3 >> 0x20);
          fStack_205c = local_48a0._4_4_;
          uStack_4898._0_4_ = (float)uVar4;
          fStack_2058 = (float)uStack_4898;
          uStack_4898._4_4_ = (float)((ulong)uVar4 >> 0x20);
          fStack_2054 = uStack_4898._4_4_;
          uStack_4890._0_4_ = (float)uVar5;
          fStack_2050 = (float)uStack_4890;
          uStack_4890._4_4_ = (float)((ulong)uVar5 >> 0x20);
          fStack_204c = uStack_4890._4_4_;
          uStack_4888._0_4_ = (float)uVar6;
          fStack_2048 = (float)uStack_4888;
          uStack_4888._4_4_ = (float)((ulong)uVar6 >> 0x20);
          fStack_2044 = uStack_4888._4_4_;
          local_860 = (float)local_48a0 * local_6180;
          fStack_85c = local_48a0._4_4_ * local_6180;
          fStack_858 = (float)uStack_4898 * local_6180;
          fStack_854 = uStack_4898._4_4_ * local_6180;
          fStack_850 = (float)uStack_4890 * local_6180;
          fStack_84c = uStack_4890._4_4_ * local_6180;
          fStack_848 = (float)uStack_4888 * local_6180;
          local_880._0_4_ = (float)local_48e0;
          local_880._4_4_ = (float)((ulong)local_48e0 >> 0x20);
          uStack_878._0_4_ = (float)uStack_48d8;
          uStack_878._4_4_ = (float)((ulong)uStack_48d8 >> 0x20);
          uStack_870._0_4_ = (float)uStack_48d0;
          uStack_870._4_4_ = (float)((ulong)uStack_48d0 >> 0x20);
          uStack_868._0_4_ = (float)uStack_48c8;
          uStack_868._4_4_ = (float)((ulong)uStack_48c8 >> 0x20);
          local_4940 = CONCAT44(fStack_85c + local_880._4_4_,local_860 + (float)local_880);
          uStack_4938 = CONCAT44(fStack_854 + uStack_878._4_4_,fStack_858 + (float)uStack_878);
          uStack_4930 = CONCAT44(fStack_84c + uStack_870._4_4_,fStack_850 + (float)uStack_870);
          uStack_4928 = CONCAT44(uStack_4888._4_4_ + uStack_868._4_4_,fStack_848 + (float)uStack_868
                                );
          local_4900._0_4_ = (float)uVar7;
          local_2020 = (float)local_4900;
          local_4900._4_4_ = (float)((ulong)uVar7 >> 0x20);
          fStack_201c = local_4900._4_4_;
          uStack_48f8._0_4_ = (float)uVar8;
          fStack_2018 = (float)uStack_48f8;
          uStack_48f8._4_4_ = (float)((ulong)uVar8 >> 0x20);
          fStack_2014 = uStack_48f8._4_4_;
          uStack_48f0._0_4_ = (float)uVar9;
          fStack_2010 = (float)uStack_48f0;
          uStack_48f0._4_4_ = (float)((ulong)uVar9 >> 0x20);
          fStack_200c = uStack_48f0._4_4_;
          uStack_48e8._0_4_ = (float)uVar10;
          fStack_2008 = (float)uStack_48e8;
          uStack_48e8._4_4_ = (float)((ulong)uVar10 >> 0x20);
          fStack_2004 = uStack_48e8._4_4_;
          local_820 = (float)local_4900 * local_61c0;
          fStack_81c = local_4900._4_4_ * local_61c0;
          fStack_818 = (float)uStack_48f8 * local_61c0;
          fStack_814 = uStack_48f8._4_4_ * local_61c0;
          fStack_810 = (float)uStack_48f0 * local_61c0;
          fStack_80c = uStack_48f0._4_4_ * local_61c0;
          fStack_808 = (float)uStack_48e8 * local_61c0;
          in_stack_ffffffffffff6be0 = local_820 + local_860 + (float)local_880;
          in_stack_ffffffffffff6be4 = fStack_81c + fStack_85c + local_880._4_4_;
          in_stack_ffffffffffff6be8 = fStack_818 + fStack_858 + (float)uStack_878;
          in_stack_ffffffffffff6bec = fStack_814 + fStack_854 + uStack_878._4_4_;
          in_stack_ffffffffffff6c10 = fStack_810 + fStack_850 + (float)uStack_870;
          in_stack_ffffffffffff6c14 = fStack_80c + fStack_84c + uStack_870._4_4_;
          in_stack_ffffffffffff6bd8 = fStack_808 + fStack_848 + (float)uStack_868;
          uStack_48e8._4_4_ = uStack_48e8._4_4_ + uStack_4888._4_4_ + uStack_868._4_4_;
          local_49a0 = CONCAT44(in_stack_ffffffffffff6be4,in_stack_ffffffffffff6be0);
          uStack_4998 = CONCAT44(in_stack_ffffffffffff6bec,in_stack_ffffffffffff6be8);
          uStack_4990 = CONCAT44(in_stack_ffffffffffff6c14,in_stack_ffffffffffff6c10);
          uStack_4988 = CONCAT44(uStack_48e8._4_4_,in_stack_ffffffffffff6bd8);
          local_4960._0_4_ = (float)uVar11;
          local_1fe0 = (float)local_4960;
          local_4960._4_4_ = (float)((ulong)uVar11 >> 0x20);
          fStack_1fdc = local_4960._4_4_;
          uStack_4958._0_4_ = (float)uVar12;
          fStack_1fd8 = (float)uStack_4958;
          uStack_4958._4_4_ = (float)((ulong)uVar12 >> 0x20);
          fStack_1fd4 = uStack_4958._4_4_;
          uStack_4950._0_4_ = (float)uVar13;
          fStack_1fd0 = (float)uStack_4950;
          uStack_4950._4_4_ = (float)((ulong)uVar13 >> 0x20);
          fStack_1fcc = uStack_4950._4_4_;
          uStack_4948._0_4_ = (float)uVar14;
          fStack_1fc8 = (float)uStack_4948;
          uStack_4948._4_4_ = (float)((ulong)uVar14 >> 0x20);
          fStack_1fc4 = uStack_4948._4_4_;
          local_7e0 = (float)local_4960 * local_6200;
          fStack_7dc = local_4960._4_4_ * local_6200;
          fStack_7d8 = (float)uStack_4958 * local_6200;
          fStack_7d4 = uStack_4958._4_4_ * local_6200;
          fStack_7d0 = (float)uStack_4950 * local_6200;
          fStack_7cc = uStack_4950._4_4_ * local_6200;
          fStack_7c8 = (float)uStack_4948 * local_6200;
          in_stack_ffffffffffff6be0 = local_7e0 + in_stack_ffffffffffff6be0;
          in_stack_ffffffffffff6be4 = fStack_7dc + in_stack_ffffffffffff6be4;
          in_stack_ffffffffffff6be8 = fStack_7d8 + in_stack_ffffffffffff6be8;
          in_stack_ffffffffffff6bec = fStack_7d4 + in_stack_ffffffffffff6bec;
          in_stack_ffffffffffff6c10 = fStack_7d0 + in_stack_ffffffffffff6c10;
          in_stack_ffffffffffff6c14 = fStack_7cc + in_stack_ffffffffffff6c14;
          in_stack_ffffffffffff6bd8 = fStack_7c8 + in_stack_ffffffffffff6bd8;
          uStack_4948._4_4_ = uStack_4948._4_4_ + uStack_48e8._4_4_;
          local_4a00 = CONCAT44(in_stack_ffffffffffff6be4,in_stack_ffffffffffff6be0);
          uStack_49f8 = CONCAT44(in_stack_ffffffffffff6bec,in_stack_ffffffffffff6be8);
          uStack_49f0 = CONCAT44(in_stack_ffffffffffff6c14,in_stack_ffffffffffff6c10);
          uStack_49e8 = CONCAT44(uStack_4948._4_4_,in_stack_ffffffffffff6bd8);
          local_49c0._0_4_ = (float)uVar15;
          local_1fa0 = (float)local_49c0;
          local_49c0._4_4_ = (float)((ulong)uVar15 >> 0x20);
          fStack_1f9c = local_49c0._4_4_;
          uStack_49b8._0_4_ = (float)uVar16;
          fStack_1f98 = (float)uStack_49b8;
          uStack_49b8._4_4_ = (float)((ulong)uVar16 >> 0x20);
          fStack_1f94 = uStack_49b8._4_4_;
          uStack_49b0._0_4_ = (float)uVar17;
          fStack_1f90 = (float)uStack_49b0;
          uStack_49b0._4_4_ = (float)((ulong)uVar17 >> 0x20);
          fStack_1f8c = uStack_49b0._4_4_;
          uStack_49a8._0_4_ = (float)uVar18;
          fStack_1f88 = (float)uStack_49a8;
          uStack_49a8._4_4_ = (float)((ulong)uVar18 >> 0x20);
          fStack_1f84 = uStack_49a8._4_4_;
          local_7a0 = (float)local_49c0 * local_6240;
          fStack_79c = local_49c0._4_4_ * local_6240;
          fStack_798 = (float)uStack_49b8 * local_6240;
          fStack_794 = uStack_49b8._4_4_ * local_6240;
          fStack_790 = (float)uStack_49b0 * local_6240;
          fStack_78c = uStack_49b0._4_4_ * local_6240;
          fStack_788 = (float)uStack_49a8 * local_6240;
          in_stack_ffffffffffff6be0 = local_7a0 + in_stack_ffffffffffff6be0;
          in_stack_ffffffffffff6be4 = fStack_79c + in_stack_ffffffffffff6be4;
          in_stack_ffffffffffff6be8 = fStack_798 + in_stack_ffffffffffff6be8;
          in_stack_ffffffffffff6bec = fStack_794 + in_stack_ffffffffffff6bec;
          in_stack_ffffffffffff6c10 = fStack_790 + in_stack_ffffffffffff6c10;
          in_stack_ffffffffffff6c14 = fStack_78c + in_stack_ffffffffffff6c14;
          in_stack_ffffffffffff6bd8 = fStack_788 + in_stack_ffffffffffff6bd8;
          uStack_49a8._4_4_ = uStack_49a8._4_4_ + uStack_4948._4_4_;
          local_4a60 = CONCAT44(in_stack_ffffffffffff6be4,in_stack_ffffffffffff6be0);
          uStack_4a58 = CONCAT44(in_stack_ffffffffffff6bec,in_stack_ffffffffffff6be8);
          uStack_4a50 = CONCAT44(in_stack_ffffffffffff6c14,in_stack_ffffffffffff6c10);
          uStack_4a48 = CONCAT44(uStack_49a8._4_4_,in_stack_ffffffffffff6bd8);
          uVar19 = *(undefined8 *)local_6a88;
          uVar20 = *(undefined8 *)(pfVar133 + 0x22);
          uVar21 = *(undefined8 *)(pfVar133 + 0x24);
          uVar22 = *(undefined8 *)(pfVar133 + 0x26);
          local_6a90 = pfVar133 + 0x28;
          uVar23 = *(undefined8 *)local_6a90;
          uVar24 = *(undefined8 *)(pfVar133 + 0x2a);
          uVar25 = *(undefined8 *)(pfVar133 + 0x2c);
          uVar26 = *(undefined8 *)(pfVar133 + 0x2e);
          local_6a98 = pfVar133 + 0x30;
          uVar27 = *(undefined8 *)local_6a98;
          uVar28 = *(undefined8 *)(pfVar133 + 0x32);
          uVar29 = *(undefined8 *)(pfVar133 + 0x34);
          uVar30 = *(undefined8 *)(pfVar133 + 0x36);
          local_6aa0 = pfVar133 + 0x38;
          uVar31 = *(undefined8 *)local_6aa0;
          uVar32 = *(undefined8 *)(pfVar133 + 0x3a);
          uVar33 = *(undefined8 *)(pfVar133 + 0x3c);
          uVar34 = *(undefined8 *)(pfVar133 + 0x3e);
          local_6aa8 = pfVar133 + 0x40;
          local_4a20._0_4_ = (float)uVar19;
          local_1f60 = (float)local_4a20;
          local_4a20._4_4_ = (float)((ulong)uVar19 >> 0x20);
          fStack_1f5c = local_4a20._4_4_;
          uStack_4a18._0_4_ = (float)uVar20;
          fStack_1f58 = (float)uStack_4a18;
          uStack_4a18._4_4_ = (float)((ulong)uVar20 >> 0x20);
          fStack_1f54 = uStack_4a18._4_4_;
          uStack_4a10._0_4_ = (float)uVar21;
          fStack_1f50 = (float)uStack_4a10;
          uStack_4a10._4_4_ = (float)((ulong)uVar21 >> 0x20);
          fStack_1f4c = uStack_4a10._4_4_;
          uStack_4a08._0_4_ = (float)uVar22;
          fStack_1f48 = (float)uStack_4a08;
          uStack_4a08._4_4_ = (float)((ulong)uVar22 >> 0x20);
          fStack_1f44 = uStack_4a08._4_4_;
          local_760 = (float)local_4a20 * local_6280;
          fStack_75c = local_4a20._4_4_ * local_6280;
          fStack_758 = (float)uStack_4a18 * local_6280;
          fStack_754 = uStack_4a18._4_4_ * local_6280;
          fStack_750 = (float)uStack_4a10 * local_6280;
          fStack_74c = uStack_4a10._4_4_ * local_6280;
          fStack_748 = (float)uStack_4a08 * local_6280;
          in_stack_ffffffffffff6be0 = local_760 + in_stack_ffffffffffff6be0;
          in_stack_ffffffffffff6be4 = fStack_75c + in_stack_ffffffffffff6be4;
          in_stack_ffffffffffff6be8 = fStack_758 + in_stack_ffffffffffff6be8;
          in_stack_ffffffffffff6bec = fStack_754 + in_stack_ffffffffffff6bec;
          in_stack_ffffffffffff6c10 = fStack_750 + in_stack_ffffffffffff6c10;
          in_stack_ffffffffffff6c14 = fStack_74c + in_stack_ffffffffffff6c14;
          in_stack_ffffffffffff6bd8 = fStack_748 + in_stack_ffffffffffff6bd8;
          uStack_4a08._4_4_ = uStack_4a08._4_4_ + uStack_49a8._4_4_;
          local_4ac0 = CONCAT44(in_stack_ffffffffffff6be4,in_stack_ffffffffffff6be0);
          uStack_4ab8 = CONCAT44(in_stack_ffffffffffff6bec,in_stack_ffffffffffff6be8);
          uStack_4ab0 = CONCAT44(in_stack_ffffffffffff6c14,in_stack_ffffffffffff6c10);
          uStack_4aa8 = CONCAT44(uStack_4a08._4_4_,in_stack_ffffffffffff6bd8);
          local_4a80._0_4_ = (float)uVar23;
          local_1f20 = (float)local_4a80;
          local_4a80._4_4_ = (float)((ulong)uVar23 >> 0x20);
          fStack_1f1c = local_4a80._4_4_;
          uStack_4a78._0_4_ = (float)uVar24;
          fStack_1f18 = (float)uStack_4a78;
          uStack_4a78._4_4_ = (float)((ulong)uVar24 >> 0x20);
          fStack_1f14 = uStack_4a78._4_4_;
          uStack_4a70._0_4_ = (float)uVar25;
          fStack_1f10 = (float)uStack_4a70;
          uStack_4a70._4_4_ = (float)((ulong)uVar25 >> 0x20);
          fStack_1f0c = uStack_4a70._4_4_;
          uStack_4a68._0_4_ = (float)uVar26;
          fStack_1f08 = (float)uStack_4a68;
          uStack_4a68._4_4_ = (float)((ulong)uVar26 >> 0x20);
          fStack_1f04 = uStack_4a68._4_4_;
          local_720 = (float)local_4a80 * local_62c0;
          fStack_71c = local_4a80._4_4_ * local_62c0;
          fStack_718 = (float)uStack_4a78 * local_62c0;
          fStack_714 = uStack_4a78._4_4_ * local_62c0;
          fStack_710 = (float)uStack_4a70 * local_62c0;
          fStack_70c = uStack_4a70._4_4_ * local_62c0;
          fStack_708 = (float)uStack_4a68 * local_62c0;
          in_stack_ffffffffffff6be0 = local_720 + in_stack_ffffffffffff6be0;
          in_stack_ffffffffffff6be4 = fStack_71c + in_stack_ffffffffffff6be4;
          in_stack_ffffffffffff6be8 = fStack_718 + in_stack_ffffffffffff6be8;
          in_stack_ffffffffffff6bec = fStack_714 + in_stack_ffffffffffff6bec;
          in_stack_ffffffffffff6c10 = fStack_710 + in_stack_ffffffffffff6c10;
          in_stack_ffffffffffff6c14 = fStack_70c + in_stack_ffffffffffff6c14;
          in_stack_ffffffffffff6bd8 = fStack_708 + in_stack_ffffffffffff6bd8;
          uStack_4a68._4_4_ = uStack_4a68._4_4_ + uStack_4a08._4_4_;
          local_4b20 = CONCAT44(in_stack_ffffffffffff6be4,in_stack_ffffffffffff6be0);
          uStack_4b18 = CONCAT44(in_stack_ffffffffffff6bec,in_stack_ffffffffffff6be8);
          uStack_4b10 = CONCAT44(in_stack_ffffffffffff6c14,in_stack_ffffffffffff6c10);
          uStack_4b08 = CONCAT44(uStack_4a68._4_4_,in_stack_ffffffffffff6bd8);
          local_4ae0._0_4_ = (float)uVar27;
          local_1ee0 = (float)local_4ae0;
          local_4ae0._4_4_ = (float)((ulong)uVar27 >> 0x20);
          fStack_1edc = local_4ae0._4_4_;
          uStack_4ad8._0_4_ = (float)uVar28;
          fStack_1ed8 = (float)uStack_4ad8;
          uStack_4ad8._4_4_ = (float)((ulong)uVar28 >> 0x20);
          fStack_1ed4 = uStack_4ad8._4_4_;
          uStack_4ad0._0_4_ = (float)uVar29;
          fStack_1ed0 = (float)uStack_4ad0;
          uStack_4ad0._4_4_ = (float)((ulong)uVar29 >> 0x20);
          fStack_1ecc = uStack_4ad0._4_4_;
          uStack_4ac8._0_4_ = (float)uVar30;
          fStack_1ec8 = (float)uStack_4ac8;
          uStack_4ac8._4_4_ = (float)((ulong)uVar30 >> 0x20);
          fStack_1ec4 = uStack_4ac8._4_4_;
          local_6e0 = (float)local_4ae0 * local_6300;
          fStack_6dc = local_4ae0._4_4_ * local_6300;
          fStack_6d8 = (float)uStack_4ad8 * local_6300;
          fStack_6d4 = uStack_4ad8._4_4_ * local_6300;
          fStack_6d0 = (float)uStack_4ad0 * local_6300;
          fStack_6cc = uStack_4ad0._4_4_ * local_6300;
          fStack_6c8 = (float)uStack_4ac8 * local_6300;
          in_stack_ffffffffffff6be0 = local_6e0 + in_stack_ffffffffffff6be0;
          in_stack_ffffffffffff6be4 = fStack_6dc + in_stack_ffffffffffff6be4;
          in_stack_ffffffffffff6be8 = fStack_6d8 + in_stack_ffffffffffff6be8;
          in_stack_ffffffffffff6bec = fStack_6d4 + in_stack_ffffffffffff6bec;
          in_stack_ffffffffffff6c10 = fStack_6d0 + in_stack_ffffffffffff6c10;
          in_stack_ffffffffffff6c14 = fStack_6cc + in_stack_ffffffffffff6c14;
          in_stack_ffffffffffff6bd8 = fStack_6c8 + in_stack_ffffffffffff6bd8;
          uStack_4ac8._4_4_ = uStack_4ac8._4_4_ + uStack_4a68._4_4_;
          local_4b80 = CONCAT44(in_stack_ffffffffffff6be4,in_stack_ffffffffffff6be0);
          uStack_4b78 = CONCAT44(in_stack_ffffffffffff6bec,in_stack_ffffffffffff6be8);
          uStack_4b70 = CONCAT44(in_stack_ffffffffffff6c14,in_stack_ffffffffffff6c10);
          uStack_4b68 = CONCAT44(uStack_4ac8._4_4_,in_stack_ffffffffffff6bd8);
          local_4b40._0_4_ = (float)uVar31;
          local_1ea0 = (float)local_4b40;
          local_4b40._4_4_ = (float)((ulong)uVar31 >> 0x20);
          fStack_1e9c = local_4b40._4_4_;
          uStack_4b38._0_4_ = (float)uVar32;
          fStack_1e98 = (float)uStack_4b38;
          uStack_4b38._4_4_ = (float)((ulong)uVar32 >> 0x20);
          fStack_1e94 = uStack_4b38._4_4_;
          uStack_4b30._0_4_ = (float)uVar33;
          fStack_1e90 = (float)uStack_4b30;
          uStack_4b30._4_4_ = (float)((ulong)uVar33 >> 0x20);
          fStack_1e8c = uStack_4b30._4_4_;
          uStack_4b28._0_4_ = (float)uVar34;
          fStack_1e88 = (float)uStack_4b28;
          uStack_4b28._4_4_ = (float)((ulong)uVar34 >> 0x20);
          fStack_1e84 = uStack_4b28._4_4_;
          local_6a0 = (float)local_4b40 * local_6340;
          fStack_69c = local_4b40._4_4_ * local_6340;
          fStack_698 = (float)uStack_4b38 * local_6340;
          fStack_694 = uStack_4b38._4_4_ * local_6340;
          fStack_690 = (float)uStack_4b30 * local_6340;
          fStack_68c = uStack_4b30._4_4_ * local_6340;
          fStack_688 = (float)uStack_4b28 * local_6340;
          in_stack_ffffffffffff6be0 = local_6a0 + in_stack_ffffffffffff6be0;
          in_stack_ffffffffffff6be4 = fStack_69c + in_stack_ffffffffffff6be4;
          in_stack_ffffffffffff6be8 = fStack_698 + in_stack_ffffffffffff6be8;
          in_stack_ffffffffffff6bec = fStack_694 + in_stack_ffffffffffff6bec;
          in_stack_ffffffffffff6c10 = fStack_690 + in_stack_ffffffffffff6c10;
          in_stack_ffffffffffff6c14 = fStack_68c + in_stack_ffffffffffff6c14;
          in_stack_ffffffffffff6bd8 = fStack_688 + in_stack_ffffffffffff6bd8;
          uStack_4b28._4_4_ = uStack_4b28._4_4_ + uStack_4ac8._4_4_;
          local_4be0 = CONCAT44(in_stack_ffffffffffff6be4,in_stack_ffffffffffff6be0);
          uStack_4bd8 = CONCAT44(in_stack_ffffffffffff6bec,in_stack_ffffffffffff6be8);
          uStack_4bd0 = CONCAT44(in_stack_ffffffffffff6c14,in_stack_ffffffffffff6c10);
          uStack_4bc8 = CONCAT44(uStack_4b28._4_4_,in_stack_ffffffffffff6bd8);
          local_6348 = local_6c88 + 8;
          local_6380 = *local_6348;
          local_4bc0 = CONCAT44(local_6380,local_6380);
          uStack_4bb8 = CONCAT44(local_6380,local_6380);
          uStack_4bb0 = CONCAT44(local_6380,local_6380);
          uStack_4ba8 = CONCAT44(local_6380,local_6380);
          local_6388 = local_6c88 + 9;
          local_63c0 = *local_6388;
          local_4c20 = CONCAT44(local_63c0,local_63c0);
          uStack_4c18 = CONCAT44(local_63c0,local_63c0);
          uStack_4c10 = CONCAT44(local_63c0,local_63c0);
          uStack_4c08 = CONCAT44(local_63c0,local_63c0);
          local_63c8 = local_6c88 + 10;
          local_6400 = *local_63c8;
          local_4c80 = CONCAT44(local_6400,local_6400);
          uStack_4c78 = CONCAT44(local_6400,local_6400);
          uStack_4c70 = CONCAT44(local_6400,local_6400);
          uStack_4c68 = CONCAT44(local_6400,local_6400);
          local_6408 = local_6c88 + 0xb;
          local_6440 = *local_6408;
          local_4ce0 = CONCAT44(local_6440,local_6440);
          uStack_4cd8 = CONCAT44(local_6440,local_6440);
          uStack_4cd0 = CONCAT44(local_6440,local_6440);
          uStack_4cc8 = CONCAT44(local_6440,local_6440);
          local_6448 = local_6c88 + 0xc;
          local_6480 = *local_6448;
          local_4d40 = CONCAT44(local_6480,local_6480);
          uStack_4d38 = CONCAT44(local_6480,local_6480);
          uStack_4d30 = CONCAT44(local_6480,local_6480);
          uStack_4d28 = CONCAT44(local_6480,local_6480);
          local_6488 = local_6c88 + 0xd;
          local_64c0 = *local_6488;
          local_4da0 = CONCAT44(local_64c0,local_64c0);
          uStack_4d98 = CONCAT44(local_64c0,local_64c0);
          uStack_4d90 = CONCAT44(local_64c0,local_64c0);
          uStack_4d88 = CONCAT44(local_64c0,local_64c0);
          local_64c8 = local_6c88 + 0xe;
          local_6500 = *local_64c8;
          local_4e00 = CONCAT44(local_6500,local_6500);
          uStack_4df8 = CONCAT44(local_6500,local_6500);
          uStack_4df0 = CONCAT44(local_6500,local_6500);
          uStack_4de8 = CONCAT44(local_6500,local_6500);
          local_6508 = local_6c88 + 0xf;
          local_6540 = *local_6508;
          local_4e60 = CONCAT44(local_6540,local_6540);
          uStack_4e58 = CONCAT44(local_6540,local_6540);
          uStack_4e50 = CONCAT44(local_6540,local_6540);
          uStack_4e48 = CONCAT44(local_6540,local_6540);
          uVar35 = *(undefined8 *)local_6aa8;
          uVar36 = *(undefined8 *)(pfVar133 + 0x42);
          uVar37 = *(undefined8 *)(pfVar133 + 0x44);
          uVar38 = *(undefined8 *)(pfVar133 + 0x46);
          local_6ab0 = pfVar133 + 0x48;
          uVar39 = *(undefined8 *)local_6ab0;
          uVar40 = *(undefined8 *)(pfVar133 + 0x4a);
          uVar41 = *(undefined8 *)(pfVar133 + 0x4c);
          uVar42 = *(undefined8 *)(pfVar133 + 0x4e);
          local_6ab8 = pfVar133 + 0x50;
          uVar43 = *(undefined8 *)local_6ab8;
          uVar44 = *(undefined8 *)(pfVar133 + 0x52);
          uVar45 = *(undefined8 *)(pfVar133 + 0x54);
          uVar46 = *(undefined8 *)(pfVar133 + 0x56);
          local_6ac0 = pfVar133 + 0x58;
          uVar47 = *(undefined8 *)local_6ac0;
          uVar48 = *(undefined8 *)(pfVar133 + 0x5a);
          uVar49 = *(undefined8 *)(pfVar133 + 0x5c);
          uVar50 = *(undefined8 *)(pfVar133 + 0x5e);
          local_6ac8 = pfVar133 + 0x60;
          local_4ba0._0_4_ = (float)uVar35;
          local_1e60 = (float)local_4ba0;
          local_4ba0._4_4_ = (float)((ulong)uVar35 >> 0x20);
          fStack_1e5c = local_4ba0._4_4_;
          uStack_4b98._0_4_ = (float)uVar36;
          fStack_1e58 = (float)uStack_4b98;
          uStack_4b98._4_4_ = (float)((ulong)uVar36 >> 0x20);
          fStack_1e54 = uStack_4b98._4_4_;
          uStack_4b90._0_4_ = (float)uVar37;
          fStack_1e50 = (float)uStack_4b90;
          uStack_4b90._4_4_ = (float)((ulong)uVar37 >> 0x20);
          fStack_1e4c = uStack_4b90._4_4_;
          uStack_4b88._0_4_ = (float)uVar38;
          fStack_1e48 = (float)uStack_4b88;
          uStack_4b88._4_4_ = (float)((ulong)uVar38 >> 0x20);
          fStack_1e44 = uStack_4b88._4_4_;
          local_660 = (float)local_4ba0 * local_6380;
          fStack_65c = local_4ba0._4_4_ * local_6380;
          fStack_658 = (float)uStack_4b98 * local_6380;
          fStack_654 = uStack_4b98._4_4_ * local_6380;
          fStack_650 = (float)uStack_4b90 * local_6380;
          fStack_64c = uStack_4b90._4_4_ * local_6380;
          fStack_648 = (float)uStack_4b88 * local_6380;
          in_stack_ffffffffffff6be0 = local_660 + in_stack_ffffffffffff6be0;
          in_stack_ffffffffffff6be4 = fStack_65c + in_stack_ffffffffffff6be4;
          in_stack_ffffffffffff6be8 = fStack_658 + in_stack_ffffffffffff6be8;
          in_stack_ffffffffffff6bec = fStack_654 + in_stack_ffffffffffff6bec;
          in_stack_ffffffffffff6c10 = fStack_650 + in_stack_ffffffffffff6c10;
          in_stack_ffffffffffff6c14 = fStack_64c + in_stack_ffffffffffff6c14;
          in_stack_ffffffffffff6bd8 = fStack_648 + in_stack_ffffffffffff6bd8;
          uStack_4b88._4_4_ = uStack_4b88._4_4_ + uStack_4b28._4_4_;
          local_4c40 = CONCAT44(in_stack_ffffffffffff6be4,in_stack_ffffffffffff6be0);
          uStack_4c38 = CONCAT44(in_stack_ffffffffffff6bec,in_stack_ffffffffffff6be8);
          uStack_4c30 = CONCAT44(in_stack_ffffffffffff6c14,in_stack_ffffffffffff6c10);
          uStack_4c28 = CONCAT44(uStack_4b88._4_4_,in_stack_ffffffffffff6bd8);
          local_4c00._0_4_ = (float)uVar39;
          local_1e20 = (float)local_4c00;
          local_4c00._4_4_ = (float)((ulong)uVar39 >> 0x20);
          fStack_1e1c = local_4c00._4_4_;
          uStack_4bf8._0_4_ = (float)uVar40;
          fStack_1e18 = (float)uStack_4bf8;
          uStack_4bf8._4_4_ = (float)((ulong)uVar40 >> 0x20);
          fStack_1e14 = uStack_4bf8._4_4_;
          uStack_4bf0._0_4_ = (float)uVar41;
          fStack_1e10 = (float)uStack_4bf0;
          uStack_4bf0._4_4_ = (float)((ulong)uVar41 >> 0x20);
          fStack_1e0c = uStack_4bf0._4_4_;
          uStack_4be8._0_4_ = (float)uVar42;
          fStack_1e08 = (float)uStack_4be8;
          uStack_4be8._4_4_ = (float)((ulong)uVar42 >> 0x20);
          fStack_1e04 = uStack_4be8._4_4_;
          local_620 = (float)local_4c00 * local_63c0;
          fStack_61c = local_4c00._4_4_ * local_63c0;
          fStack_618 = (float)uStack_4bf8 * local_63c0;
          fStack_614 = uStack_4bf8._4_4_ * local_63c0;
          fStack_610 = (float)uStack_4bf0 * local_63c0;
          fStack_60c = uStack_4bf0._4_4_ * local_63c0;
          fStack_608 = (float)uStack_4be8 * local_63c0;
          in_stack_ffffffffffff6be0 = local_620 + in_stack_ffffffffffff6be0;
          in_stack_ffffffffffff6be4 = fStack_61c + in_stack_ffffffffffff6be4;
          in_stack_ffffffffffff6be8 = fStack_618 + in_stack_ffffffffffff6be8;
          in_stack_ffffffffffff6bec = fStack_614 + in_stack_ffffffffffff6bec;
          in_stack_ffffffffffff6c10 = fStack_610 + in_stack_ffffffffffff6c10;
          in_stack_ffffffffffff6c14 = fStack_60c + in_stack_ffffffffffff6c14;
          in_stack_ffffffffffff6bd8 = fStack_608 + in_stack_ffffffffffff6bd8;
          uStack_4be8._4_4_ = uStack_4be8._4_4_ + uStack_4b88._4_4_;
          local_4ca0 = CONCAT44(in_stack_ffffffffffff6be4,in_stack_ffffffffffff6be0);
          uStack_4c98 = CONCAT44(in_stack_ffffffffffff6bec,in_stack_ffffffffffff6be8);
          uStack_4c90 = CONCAT44(in_stack_ffffffffffff6c14,in_stack_ffffffffffff6c10);
          uStack_4c88 = CONCAT44(uStack_4be8._4_4_,in_stack_ffffffffffff6bd8);
          local_4c60._0_4_ = (float)uVar43;
          local_1de0 = (float)local_4c60;
          local_4c60._4_4_ = (float)((ulong)uVar43 >> 0x20);
          fStack_1ddc = local_4c60._4_4_;
          uStack_4c58._0_4_ = (float)uVar44;
          fStack_1dd8 = (float)uStack_4c58;
          uStack_4c58._4_4_ = (float)((ulong)uVar44 >> 0x20);
          fStack_1dd4 = uStack_4c58._4_4_;
          uStack_4c50._0_4_ = (float)uVar45;
          fStack_1dd0 = (float)uStack_4c50;
          uStack_4c50._4_4_ = (float)((ulong)uVar45 >> 0x20);
          fStack_1dcc = uStack_4c50._4_4_;
          uStack_4c48._0_4_ = (float)uVar46;
          fStack_1dc8 = (float)uStack_4c48;
          uStack_4c48._4_4_ = (float)((ulong)uVar46 >> 0x20);
          fStack_1dc4 = uStack_4c48._4_4_;
          local_5e0 = (float)local_4c60 * local_6400;
          fStack_5dc = local_4c60._4_4_ * local_6400;
          fStack_5d8 = (float)uStack_4c58 * local_6400;
          fStack_5d4 = uStack_4c58._4_4_ * local_6400;
          fStack_5d0 = (float)uStack_4c50 * local_6400;
          fStack_5cc = uStack_4c50._4_4_ * local_6400;
          fStack_5c8 = (float)uStack_4c48 * local_6400;
          in_stack_ffffffffffff6be0 = local_5e0 + in_stack_ffffffffffff6be0;
          in_stack_ffffffffffff6be4 = fStack_5dc + in_stack_ffffffffffff6be4;
          in_stack_ffffffffffff6be8 = fStack_5d8 + in_stack_ffffffffffff6be8;
          in_stack_ffffffffffff6bec = fStack_5d4 + in_stack_ffffffffffff6bec;
          in_stack_ffffffffffff6c10 = fStack_5d0 + in_stack_ffffffffffff6c10;
          in_stack_ffffffffffff6c14 = fStack_5cc + in_stack_ffffffffffff6c14;
          in_stack_ffffffffffff6bd8 = fStack_5c8 + in_stack_ffffffffffff6bd8;
          uStack_4c48._4_4_ = uStack_4c48._4_4_ + uStack_4be8._4_4_;
          local_4d00 = CONCAT44(in_stack_ffffffffffff6be4,in_stack_ffffffffffff6be0);
          uStack_4cf8 = CONCAT44(in_stack_ffffffffffff6bec,in_stack_ffffffffffff6be8);
          uStack_4cf0 = CONCAT44(in_stack_ffffffffffff6c14,in_stack_ffffffffffff6c10);
          uStack_4ce8 = CONCAT44(uStack_4c48._4_4_,in_stack_ffffffffffff6bd8);
          local_4cc0._0_4_ = (float)uVar47;
          local_1da0 = (float)local_4cc0;
          local_4cc0._4_4_ = (float)((ulong)uVar47 >> 0x20);
          fStack_1d9c = local_4cc0._4_4_;
          uStack_4cb8._0_4_ = (float)uVar48;
          fStack_1d98 = (float)uStack_4cb8;
          uStack_4cb8._4_4_ = (float)((ulong)uVar48 >> 0x20);
          fStack_1d94 = uStack_4cb8._4_4_;
          uStack_4cb0._0_4_ = (float)uVar49;
          fStack_1d90 = (float)uStack_4cb0;
          uStack_4cb0._4_4_ = (float)((ulong)uVar49 >> 0x20);
          fStack_1d8c = uStack_4cb0._4_4_;
          uStack_4ca8._0_4_ = (float)uVar50;
          fStack_1d88 = (float)uStack_4ca8;
          uStack_4ca8._4_4_ = (float)((ulong)uVar50 >> 0x20);
          fStack_1d84 = uStack_4ca8._4_4_;
          local_5a0 = (float)local_4cc0 * local_6440;
          fStack_59c = local_4cc0._4_4_ * local_6440;
          fStack_598 = (float)uStack_4cb8 * local_6440;
          fStack_594 = uStack_4cb8._4_4_ * local_6440;
          fStack_590 = (float)uStack_4cb0 * local_6440;
          fStack_58c = uStack_4cb0._4_4_ * local_6440;
          fStack_588 = (float)uStack_4ca8 * local_6440;
          in_stack_ffffffffffff6be0 = local_5a0 + in_stack_ffffffffffff6be0;
          in_stack_ffffffffffff6be4 = fStack_59c + in_stack_ffffffffffff6be4;
          in_stack_ffffffffffff6be8 = fStack_598 + in_stack_ffffffffffff6be8;
          in_stack_ffffffffffff6bec = fStack_594 + in_stack_ffffffffffff6bec;
          in_stack_ffffffffffff6c10 = fStack_590 + in_stack_ffffffffffff6c10;
          in_stack_ffffffffffff6c14 = fStack_58c + in_stack_ffffffffffff6c14;
          in_stack_ffffffffffff6bd8 = fStack_588 + in_stack_ffffffffffff6bd8;
          uStack_4ca8._4_4_ = uStack_4ca8._4_4_ + uStack_4c48._4_4_;
          local_4d60 = CONCAT44(in_stack_ffffffffffff6be4,in_stack_ffffffffffff6be0);
          uStack_4d58 = CONCAT44(in_stack_ffffffffffff6bec,in_stack_ffffffffffff6be8);
          uStack_4d50 = CONCAT44(in_stack_ffffffffffff6c14,in_stack_ffffffffffff6c10);
          uStack_4d48 = CONCAT44(uStack_4ca8._4_4_,in_stack_ffffffffffff6bd8);
          uVar51 = *(undefined8 *)local_6ac8;
          uVar52 = *(undefined8 *)(pfVar133 + 0x62);
          uVar53 = *(undefined8 *)(pfVar133 + 100);
          uVar54 = *(undefined8 *)(pfVar133 + 0x66);
          local_6ad0 = pfVar133 + 0x68;
          uVar55 = *(undefined8 *)local_6ad0;
          uVar56 = *(undefined8 *)(pfVar133 + 0x6a);
          uVar57 = *(undefined8 *)(pfVar133 + 0x6c);
          uVar58 = *(undefined8 *)(pfVar133 + 0x6e);
          local_6ad8 = pfVar133 + 0x70;
          uVar59 = *(undefined8 *)local_6ad8;
          uVar60 = *(undefined8 *)(pfVar133 + 0x72);
          uVar61 = *(undefined8 *)(pfVar133 + 0x74);
          uVar62 = *(undefined8 *)(pfVar133 + 0x76);
          local_6ae0 = pfVar133 + 0x78;
          uVar63 = *(undefined8 *)local_6ae0;
          uVar64 = *(undefined8 *)(pfVar133 + 0x7a);
          uVar65 = *(undefined8 *)(pfVar133 + 0x7c);
          uVar66 = *(undefined8 *)(pfVar133 + 0x7e);
          local_6ae8 = pfVar133 + 0x80;
          local_4d20._0_4_ = (float)uVar51;
          local_1d60 = (float)local_4d20;
          local_4d20._4_4_ = (float)((ulong)uVar51 >> 0x20);
          fStack_1d5c = local_4d20._4_4_;
          uStack_4d18._0_4_ = (float)uVar52;
          fStack_1d58 = (float)uStack_4d18;
          uStack_4d18._4_4_ = (float)((ulong)uVar52 >> 0x20);
          fStack_1d54 = uStack_4d18._4_4_;
          uStack_4d10._0_4_ = (float)uVar53;
          fStack_1d50 = (float)uStack_4d10;
          uStack_4d10._4_4_ = (float)((ulong)uVar53 >> 0x20);
          fStack_1d4c = uStack_4d10._4_4_;
          uStack_4d08._0_4_ = (float)uVar54;
          fStack_1d48 = (float)uStack_4d08;
          uStack_4d08._4_4_ = (float)((ulong)uVar54 >> 0x20);
          fStack_1d44 = uStack_4d08._4_4_;
          local_560 = (float)local_4d20 * local_6480;
          fStack_55c = local_4d20._4_4_ * local_6480;
          fStack_558 = (float)uStack_4d18 * local_6480;
          fStack_554 = uStack_4d18._4_4_ * local_6480;
          fStack_550 = (float)uStack_4d10 * local_6480;
          fStack_54c = uStack_4d10._4_4_ * local_6480;
          fStack_548 = (float)uStack_4d08 * local_6480;
          in_stack_ffffffffffff6be0 = local_560 + in_stack_ffffffffffff6be0;
          in_stack_ffffffffffff6be4 = fStack_55c + in_stack_ffffffffffff6be4;
          in_stack_ffffffffffff6be8 = fStack_558 + in_stack_ffffffffffff6be8;
          in_stack_ffffffffffff6bec = fStack_554 + in_stack_ffffffffffff6bec;
          in_stack_ffffffffffff6c10 = fStack_550 + in_stack_ffffffffffff6c10;
          in_stack_ffffffffffff6c14 = fStack_54c + in_stack_ffffffffffff6c14;
          in_stack_ffffffffffff6bd8 = fStack_548 + in_stack_ffffffffffff6bd8;
          uStack_4d08._4_4_ = uStack_4d08._4_4_ + uStack_4ca8._4_4_;
          local_4dc0 = CONCAT44(in_stack_ffffffffffff6be4,in_stack_ffffffffffff6be0);
          uStack_4db8 = CONCAT44(in_stack_ffffffffffff6bec,in_stack_ffffffffffff6be8);
          uStack_4db0 = CONCAT44(in_stack_ffffffffffff6c14,in_stack_ffffffffffff6c10);
          uStack_4da8 = CONCAT44(uStack_4d08._4_4_,in_stack_ffffffffffff6bd8);
          local_4d80._0_4_ = (float)uVar55;
          local_1d20 = (float)local_4d80;
          local_4d80._4_4_ = (float)((ulong)uVar55 >> 0x20);
          fStack_1d1c = local_4d80._4_4_;
          uStack_4d78._0_4_ = (float)uVar56;
          fStack_1d18 = (float)uStack_4d78;
          uStack_4d78._4_4_ = (float)((ulong)uVar56 >> 0x20);
          fStack_1d14 = uStack_4d78._4_4_;
          uStack_4d70._0_4_ = (float)uVar57;
          fStack_1d10 = (float)uStack_4d70;
          uStack_4d70._4_4_ = (float)((ulong)uVar57 >> 0x20);
          fStack_1d0c = uStack_4d70._4_4_;
          uStack_4d68._0_4_ = (float)uVar58;
          fStack_1d08 = (float)uStack_4d68;
          uStack_4d68._4_4_ = (float)((ulong)uVar58 >> 0x20);
          fStack_1d04 = uStack_4d68._4_4_;
          local_520 = (float)local_4d80 * local_64c0;
          fStack_51c = local_4d80._4_4_ * local_64c0;
          fStack_518 = (float)uStack_4d78 * local_64c0;
          fStack_514 = uStack_4d78._4_4_ * local_64c0;
          fStack_510 = (float)uStack_4d70 * local_64c0;
          fStack_50c = uStack_4d70._4_4_ * local_64c0;
          fStack_508 = (float)uStack_4d68 * local_64c0;
          in_stack_ffffffffffff6be0 = local_520 + in_stack_ffffffffffff6be0;
          in_stack_ffffffffffff6be4 = fStack_51c + in_stack_ffffffffffff6be4;
          in_stack_ffffffffffff6be8 = fStack_518 + in_stack_ffffffffffff6be8;
          in_stack_ffffffffffff6bec = fStack_514 + in_stack_ffffffffffff6bec;
          in_stack_ffffffffffff6c10 = fStack_510 + in_stack_ffffffffffff6c10;
          in_stack_ffffffffffff6c14 = fStack_50c + in_stack_ffffffffffff6c14;
          in_stack_ffffffffffff6bd8 = fStack_508 + in_stack_ffffffffffff6bd8;
          uStack_4d68._4_4_ = uStack_4d68._4_4_ + uStack_4d08._4_4_;
          local_4e20 = CONCAT44(in_stack_ffffffffffff6be4,in_stack_ffffffffffff6be0);
          uStack_4e18 = CONCAT44(in_stack_ffffffffffff6bec,in_stack_ffffffffffff6be8);
          uStack_4e10 = CONCAT44(in_stack_ffffffffffff6c14,in_stack_ffffffffffff6c10);
          uStack_4e08 = CONCAT44(uStack_4d68._4_4_,in_stack_ffffffffffff6bd8);
          local_4de0._0_4_ = (float)uVar59;
          local_1ce0 = (float)local_4de0;
          local_4de0._4_4_ = (float)((ulong)uVar59 >> 0x20);
          fStack_1cdc = local_4de0._4_4_;
          uStack_4dd8._0_4_ = (float)uVar60;
          fStack_1cd8 = (float)uStack_4dd8;
          uStack_4dd8._4_4_ = (float)((ulong)uVar60 >> 0x20);
          fStack_1cd4 = uStack_4dd8._4_4_;
          uStack_4dd0._0_4_ = (float)uVar61;
          fStack_1cd0 = (float)uStack_4dd0;
          uStack_4dd0._4_4_ = (float)((ulong)uVar61 >> 0x20);
          fStack_1ccc = uStack_4dd0._4_4_;
          uStack_4dc8._0_4_ = (float)uVar62;
          fStack_1cc8 = (float)uStack_4dc8;
          uStack_4dc8._4_4_ = (float)((ulong)uVar62 >> 0x20);
          fStack_1cc4 = uStack_4dc8._4_4_;
          local_4e0 = (float)local_4de0 * local_6500;
          fStack_4dc = local_4de0._4_4_ * local_6500;
          fStack_4d8 = (float)uStack_4dd8 * local_6500;
          fStack_4d4 = uStack_4dd8._4_4_ * local_6500;
          fStack_4d0 = (float)uStack_4dd0 * local_6500;
          fStack_4cc = uStack_4dd0._4_4_ * local_6500;
          fStack_4c8 = (float)uStack_4dc8 * local_6500;
          in_stack_ffffffffffff6be0 = local_4e0 + in_stack_ffffffffffff6be0;
          in_stack_ffffffffffff6be4 = fStack_4dc + in_stack_ffffffffffff6be4;
          in_stack_ffffffffffff6be8 = fStack_4d8 + in_stack_ffffffffffff6be8;
          in_stack_ffffffffffff6bec = fStack_4d4 + in_stack_ffffffffffff6bec;
          in_stack_ffffffffffff6c10 = fStack_4d0 + in_stack_ffffffffffff6c10;
          in_stack_ffffffffffff6c14 = fStack_4cc + in_stack_ffffffffffff6c14;
          in_stack_ffffffffffff6bd8 = fStack_4c8 + in_stack_ffffffffffff6bd8;
          uStack_4dc8._4_4_ = uStack_4dc8._4_4_ + uStack_4d68._4_4_;
          local_4e80 = CONCAT44(in_stack_ffffffffffff6be4,in_stack_ffffffffffff6be0);
          uStack_4e78 = CONCAT44(in_stack_ffffffffffff6bec,in_stack_ffffffffffff6be8);
          uStack_4e70 = CONCAT44(in_stack_ffffffffffff6c14,in_stack_ffffffffffff6c10);
          uStack_4e68 = CONCAT44(uStack_4dc8._4_4_,in_stack_ffffffffffff6bd8);
          local_4e40._0_4_ = (float)uVar63;
          local_1ca0 = (float)local_4e40;
          local_4e40._4_4_ = (float)((ulong)uVar63 >> 0x20);
          fStack_1c9c = local_4e40._4_4_;
          uStack_4e38._0_4_ = (float)uVar64;
          fStack_1c98 = (float)uStack_4e38;
          uStack_4e38._4_4_ = (float)((ulong)uVar64 >> 0x20);
          fStack_1c94 = uStack_4e38._4_4_;
          uStack_4e30._0_4_ = (float)uVar65;
          fStack_1c90 = (float)uStack_4e30;
          uStack_4e30._4_4_ = (float)((ulong)uVar65 >> 0x20);
          fStack_1c8c = uStack_4e30._4_4_;
          uStack_4e28._0_4_ = (float)uVar66;
          fStack_1c88 = (float)uStack_4e28;
          uStack_4e28._4_4_ = (float)((ulong)uVar66 >> 0x20);
          fStack_1c84 = uStack_4e28._4_4_;
          local_4a0 = (float)local_4e40 * local_6540;
          fStack_49c = local_4e40._4_4_ * local_6540;
          fStack_498 = (float)uStack_4e38 * local_6540;
          fStack_494 = uStack_4e38._4_4_ * local_6540;
          fStack_490 = (float)uStack_4e30 * local_6540;
          fStack_48c = uStack_4e30._4_4_ * local_6540;
          fStack_488 = (float)uStack_4e28 * local_6540;
          in_stack_ffffffffffff6be0 = local_4a0 + in_stack_ffffffffffff6be0;
          in_stack_ffffffffffff6be4 = fStack_49c + in_stack_ffffffffffff6be4;
          in_stack_ffffffffffff6be8 = fStack_498 + in_stack_ffffffffffff6be8;
          in_stack_ffffffffffff6bec = fStack_494 + in_stack_ffffffffffff6bec;
          in_stack_ffffffffffff6c10 = fStack_490 + in_stack_ffffffffffff6c10;
          in_stack_ffffffffffff6c14 = fStack_48c + in_stack_ffffffffffff6c14;
          in_stack_ffffffffffff6bd8 = fStack_488 + in_stack_ffffffffffff6bd8;
          uStack_4e28._4_4_ = uStack_4e28._4_4_ + uStack_4dc8._4_4_;
          local_4ee0 = CONCAT44(in_stack_ffffffffffff6be4,in_stack_ffffffffffff6be0);
          uStack_4ed8 = CONCAT44(in_stack_ffffffffffff6bec,in_stack_ffffffffffff6be8);
          uStack_4ed0 = CONCAT44(in_stack_ffffffffffff6c14,in_stack_ffffffffffff6c10);
          uStack_4ec8 = CONCAT44(uStack_4e28._4_4_,in_stack_ffffffffffff6bd8);
          local_6548 = local_6c90;
          local_6580 = *local_6c90;
          local_4ec0 = CONCAT44(local_6580,local_6580);
          uStack_4eb8 = CONCAT44(local_6580,local_6580);
          uStack_4eb0 = CONCAT44(local_6580,local_6580);
          uStack_4ea8 = CONCAT44(local_6580,local_6580);
          local_6588 = local_6c90 + 1;
          local_65c0 = *local_6588;
          local_4f20 = CONCAT44(local_65c0,local_65c0);
          uStack_4f18 = CONCAT44(local_65c0,local_65c0);
          uStack_4f10 = CONCAT44(local_65c0,local_65c0);
          uStack_4f08 = CONCAT44(local_65c0,local_65c0);
          local_65c8 = local_6c90 + 2;
          local_6600 = *local_65c8;
          local_4f80 = CONCAT44(local_6600,local_6600);
          uStack_4f78 = CONCAT44(local_6600,local_6600);
          uStack_4f70 = CONCAT44(local_6600,local_6600);
          uStack_4f68 = CONCAT44(local_6600,local_6600);
          local_6608 = local_6c90 + 3;
          local_6640 = *local_6608;
          local_4fe0 = CONCAT44(local_6640,local_6640);
          uStack_4fd8 = CONCAT44(local_6640,local_6640);
          uStack_4fd0 = CONCAT44(local_6640,local_6640);
          uStack_4fc8 = CONCAT44(local_6640,local_6640);
          local_6648 = local_6c90 + 4;
          local_6680 = *local_6648;
          local_5040 = CONCAT44(local_6680,local_6680);
          uStack_5038 = CONCAT44(local_6680,local_6680);
          uStack_5030 = CONCAT44(local_6680,local_6680);
          uStack_5028 = CONCAT44(local_6680,local_6680);
          local_6688 = local_6c90 + 5;
          local_66c0 = *local_6688;
          local_50a0 = CONCAT44(local_66c0,local_66c0);
          uStack_5098 = CONCAT44(local_66c0,local_66c0);
          uStack_5090 = CONCAT44(local_66c0,local_66c0);
          uStack_5088 = CONCAT44(local_66c0,local_66c0);
          local_66c8 = local_6c90 + 6;
          local_6700 = *local_66c8;
          local_5100 = CONCAT44(local_6700,local_6700);
          uStack_50f8 = CONCAT44(local_6700,local_6700);
          uStack_50f0 = CONCAT44(local_6700,local_6700);
          uStack_50e8 = CONCAT44(local_6700,local_6700);
          local_6708 = local_6c90 + 7;
          local_6740 = *local_6708;
          local_5160 = CONCAT44(local_6740,local_6740);
          uStack_5158 = CONCAT44(local_6740,local_6740);
          uStack_5150 = CONCAT44(local_6740,local_6740);
          uStack_5148 = CONCAT44(local_6740,local_6740);
          uVar67 = *(undefined8 *)local_6ae8;
          uVar68 = *(undefined8 *)(pfVar133 + 0x82);
          uVar69 = *(undefined8 *)(pfVar133 + 0x84);
          uVar70 = *(undefined8 *)(pfVar133 + 0x86);
          local_6af0 = pfVar133 + 0x88;
          uVar71 = *(undefined8 *)local_6af0;
          uVar72 = *(undefined8 *)(pfVar133 + 0x8a);
          uVar73 = *(undefined8 *)(pfVar133 + 0x8c);
          uVar74 = *(undefined8 *)(pfVar133 + 0x8e);
          local_6af8 = pfVar133 + 0x90;
          uVar75 = *(undefined8 *)local_6af8;
          uVar76 = *(undefined8 *)(pfVar133 + 0x92);
          uVar77 = *(undefined8 *)(pfVar133 + 0x94);
          uVar78 = *(undefined8 *)(pfVar133 + 0x96);
          local_6b00 = pfVar133 + 0x98;
          uVar79 = *(undefined8 *)local_6b00;
          uVar80 = *(undefined8 *)(pfVar133 + 0x9a);
          uVar81 = *(undefined8 *)(pfVar133 + 0x9c);
          uVar82 = *(undefined8 *)(pfVar133 + 0x9e);
          local_6b08 = pfVar133 + 0xa0;
          local_4ea0._0_4_ = (float)uVar67;
          local_1c60 = (float)local_4ea0;
          local_4ea0._4_4_ = (float)((ulong)uVar67 >> 0x20);
          fStack_1c5c = local_4ea0._4_4_;
          uStack_4e98._0_4_ = (float)uVar68;
          fStack_1c58 = (float)uStack_4e98;
          uStack_4e98._4_4_ = (float)((ulong)uVar68 >> 0x20);
          fStack_1c54 = uStack_4e98._4_4_;
          uStack_4e90._0_4_ = (float)uVar69;
          fStack_1c50 = (float)uStack_4e90;
          uStack_4e90._4_4_ = (float)((ulong)uVar69 >> 0x20);
          fStack_1c4c = uStack_4e90._4_4_;
          uStack_4e88._0_4_ = (float)uVar70;
          fStack_1c48 = (float)uStack_4e88;
          uStack_4e88._4_4_ = (float)((ulong)uVar70 >> 0x20);
          fStack_1c44 = uStack_4e88._4_4_;
          local_460 = (float)local_4ea0 * local_6580;
          fStack_45c = local_4ea0._4_4_ * local_6580;
          fStack_458 = (float)uStack_4e98 * local_6580;
          fStack_454 = uStack_4e98._4_4_ * local_6580;
          fStack_450 = (float)uStack_4e90 * local_6580;
          fStack_44c = uStack_4e90._4_4_ * local_6580;
          fStack_448 = (float)uStack_4e88 * local_6580;
          in_stack_ffffffffffff6be0 = local_460 + in_stack_ffffffffffff6be0;
          in_stack_ffffffffffff6be4 = fStack_45c + in_stack_ffffffffffff6be4;
          in_stack_ffffffffffff6be8 = fStack_458 + in_stack_ffffffffffff6be8;
          in_stack_ffffffffffff6bec = fStack_454 + in_stack_ffffffffffff6bec;
          in_stack_ffffffffffff6c10 = fStack_450 + in_stack_ffffffffffff6c10;
          in_stack_ffffffffffff6c14 = fStack_44c + in_stack_ffffffffffff6c14;
          in_stack_ffffffffffff6bd8 = fStack_448 + in_stack_ffffffffffff6bd8;
          uStack_4e88._4_4_ = uStack_4e88._4_4_ + uStack_4e28._4_4_;
          local_4f40 = CONCAT44(in_stack_ffffffffffff6be4,in_stack_ffffffffffff6be0);
          uStack_4f38 = CONCAT44(in_stack_ffffffffffff6bec,in_stack_ffffffffffff6be8);
          uStack_4f30 = CONCAT44(in_stack_ffffffffffff6c14,in_stack_ffffffffffff6c10);
          uStack_4f28 = CONCAT44(uStack_4e88._4_4_,in_stack_ffffffffffff6bd8);
          local_4f00._0_4_ = (float)uVar71;
          local_1c20 = (float)local_4f00;
          local_4f00._4_4_ = (float)((ulong)uVar71 >> 0x20);
          fStack_1c1c = local_4f00._4_4_;
          uStack_4ef8._0_4_ = (float)uVar72;
          fStack_1c18 = (float)uStack_4ef8;
          uStack_4ef8._4_4_ = (float)((ulong)uVar72 >> 0x20);
          fStack_1c14 = uStack_4ef8._4_4_;
          uStack_4ef0._0_4_ = (float)uVar73;
          fStack_1c10 = (float)uStack_4ef0;
          uStack_4ef0._4_4_ = (float)((ulong)uVar73 >> 0x20);
          fStack_1c0c = uStack_4ef0._4_4_;
          uStack_4ee8._0_4_ = (float)uVar74;
          fStack_1c08 = (float)uStack_4ee8;
          uStack_4ee8._4_4_ = (float)((ulong)uVar74 >> 0x20);
          fStack_1c04 = uStack_4ee8._4_4_;
          local_420 = (float)local_4f00 * local_65c0;
          fStack_41c = local_4f00._4_4_ * local_65c0;
          fStack_418 = (float)uStack_4ef8 * local_65c0;
          fStack_414 = uStack_4ef8._4_4_ * local_65c0;
          fStack_410 = (float)uStack_4ef0 * local_65c0;
          fStack_40c = uStack_4ef0._4_4_ * local_65c0;
          fStack_408 = (float)uStack_4ee8 * local_65c0;
          in_stack_ffffffffffff6be0 = local_420 + in_stack_ffffffffffff6be0;
          in_stack_ffffffffffff6be4 = fStack_41c + in_stack_ffffffffffff6be4;
          in_stack_ffffffffffff6be8 = fStack_418 + in_stack_ffffffffffff6be8;
          in_stack_ffffffffffff6bec = fStack_414 + in_stack_ffffffffffff6bec;
          in_stack_ffffffffffff6c10 = fStack_410 + in_stack_ffffffffffff6c10;
          in_stack_ffffffffffff6c14 = fStack_40c + in_stack_ffffffffffff6c14;
          in_stack_ffffffffffff6bd8 = fStack_408 + in_stack_ffffffffffff6bd8;
          uStack_4ee8._4_4_ = uStack_4ee8._4_4_ + uStack_4e88._4_4_;
          local_4fa0 = CONCAT44(in_stack_ffffffffffff6be4,in_stack_ffffffffffff6be0);
          uStack_4f98 = CONCAT44(in_stack_ffffffffffff6bec,in_stack_ffffffffffff6be8);
          uStack_4f90 = CONCAT44(in_stack_ffffffffffff6c14,in_stack_ffffffffffff6c10);
          uStack_4f88 = CONCAT44(uStack_4ee8._4_4_,in_stack_ffffffffffff6bd8);
          local_4f60._0_4_ = (float)uVar75;
          local_1be0 = (float)local_4f60;
          local_4f60._4_4_ = (float)((ulong)uVar75 >> 0x20);
          fStack_1bdc = local_4f60._4_4_;
          uStack_4f58._0_4_ = (float)uVar76;
          fStack_1bd8 = (float)uStack_4f58;
          uStack_4f58._4_4_ = (float)((ulong)uVar76 >> 0x20);
          fStack_1bd4 = uStack_4f58._4_4_;
          uStack_4f50._0_4_ = (float)uVar77;
          fStack_1bd0 = (float)uStack_4f50;
          uStack_4f50._4_4_ = (float)((ulong)uVar77 >> 0x20);
          fStack_1bcc = uStack_4f50._4_4_;
          uStack_4f48._0_4_ = (float)uVar78;
          fStack_1bc8 = (float)uStack_4f48;
          uStack_4f48._4_4_ = (float)((ulong)uVar78 >> 0x20);
          fStack_1bc4 = uStack_4f48._4_4_;
          local_3e0 = (float)local_4f60 * local_6600;
          fStack_3dc = local_4f60._4_4_ * local_6600;
          fStack_3d8 = (float)uStack_4f58 * local_6600;
          fStack_3d4 = uStack_4f58._4_4_ * local_6600;
          fStack_3d0 = (float)uStack_4f50 * local_6600;
          fStack_3cc = uStack_4f50._4_4_ * local_6600;
          fStack_3c8 = (float)uStack_4f48 * local_6600;
          in_stack_ffffffffffff6be0 = local_3e0 + in_stack_ffffffffffff6be0;
          in_stack_ffffffffffff6be4 = fStack_3dc + in_stack_ffffffffffff6be4;
          in_stack_ffffffffffff6be8 = fStack_3d8 + in_stack_ffffffffffff6be8;
          in_stack_ffffffffffff6bec = fStack_3d4 + in_stack_ffffffffffff6bec;
          in_stack_ffffffffffff6c10 = fStack_3d0 + in_stack_ffffffffffff6c10;
          in_stack_ffffffffffff6c14 = fStack_3cc + in_stack_ffffffffffff6c14;
          in_stack_ffffffffffff6bd8 = fStack_3c8 + in_stack_ffffffffffff6bd8;
          uStack_4f48._4_4_ = uStack_4f48._4_4_ + uStack_4ee8._4_4_;
          local_5000 = CONCAT44(in_stack_ffffffffffff6be4,in_stack_ffffffffffff6be0);
          uStack_4ff8 = CONCAT44(in_stack_ffffffffffff6bec,in_stack_ffffffffffff6be8);
          uStack_4ff0 = CONCAT44(in_stack_ffffffffffff6c14,in_stack_ffffffffffff6c10);
          uStack_4fe8 = CONCAT44(uStack_4f48._4_4_,in_stack_ffffffffffff6bd8);
          local_4fc0._0_4_ = (float)uVar79;
          local_1ba0 = (float)local_4fc0;
          local_4fc0._4_4_ = (float)((ulong)uVar79 >> 0x20);
          fStack_1b9c = local_4fc0._4_4_;
          uStack_4fb8._0_4_ = (float)uVar80;
          fStack_1b98 = (float)uStack_4fb8;
          uStack_4fb8._4_4_ = (float)((ulong)uVar80 >> 0x20);
          fStack_1b94 = uStack_4fb8._4_4_;
          uStack_4fb0._0_4_ = (float)uVar81;
          fStack_1b90 = (float)uStack_4fb0;
          uStack_4fb0._4_4_ = (float)((ulong)uVar81 >> 0x20);
          fStack_1b8c = uStack_4fb0._4_4_;
          uStack_4fa8._0_4_ = (float)uVar82;
          fStack_1b88 = (float)uStack_4fa8;
          uStack_4fa8._4_4_ = (float)((ulong)uVar82 >> 0x20);
          fStack_1b84 = uStack_4fa8._4_4_;
          local_3a0 = (float)local_4fc0 * local_6640;
          fStack_39c = local_4fc0._4_4_ * local_6640;
          fStack_398 = (float)uStack_4fb8 * local_6640;
          fStack_394 = uStack_4fb8._4_4_ * local_6640;
          fStack_390 = (float)uStack_4fb0 * local_6640;
          fStack_38c = uStack_4fb0._4_4_ * local_6640;
          fStack_388 = (float)uStack_4fa8 * local_6640;
          in_stack_ffffffffffff6be0 = local_3a0 + in_stack_ffffffffffff6be0;
          in_stack_ffffffffffff6be4 = fStack_39c + in_stack_ffffffffffff6be4;
          in_stack_ffffffffffff6be8 = fStack_398 + in_stack_ffffffffffff6be8;
          in_stack_ffffffffffff6bec = fStack_394 + in_stack_ffffffffffff6bec;
          in_stack_ffffffffffff6c10 = fStack_390 + in_stack_ffffffffffff6c10;
          in_stack_ffffffffffff6c14 = fStack_38c + in_stack_ffffffffffff6c14;
          in_stack_ffffffffffff6bd8 = fStack_388 + in_stack_ffffffffffff6bd8;
          uStack_4fa8._4_4_ = uStack_4fa8._4_4_ + uStack_4f48._4_4_;
          local_5060 = CONCAT44(in_stack_ffffffffffff6be4,in_stack_ffffffffffff6be0);
          uStack_5058 = CONCAT44(in_stack_ffffffffffff6bec,in_stack_ffffffffffff6be8);
          uStack_5050 = CONCAT44(in_stack_ffffffffffff6c14,in_stack_ffffffffffff6c10);
          uStack_5048 = CONCAT44(uStack_4fa8._4_4_,in_stack_ffffffffffff6bd8);
          uVar83 = *(undefined8 *)local_6b08;
          uVar84 = *(undefined8 *)(pfVar133 + 0xa2);
          uVar85 = *(undefined8 *)(pfVar133 + 0xa4);
          uVar86 = *(undefined8 *)(pfVar133 + 0xa6);
          local_6b10 = pfVar133 + 0xa8;
          uVar87 = *(undefined8 *)local_6b10;
          uVar88 = *(undefined8 *)(pfVar133 + 0xaa);
          uVar89 = *(undefined8 *)(pfVar133 + 0xac);
          uVar90 = *(undefined8 *)(pfVar133 + 0xae);
          local_6b18 = pfVar133 + 0xb0;
          uVar91 = *(undefined8 *)local_6b18;
          uVar92 = *(undefined8 *)(pfVar133 + 0xb2);
          uVar93 = *(undefined8 *)(pfVar133 + 0xb4);
          uVar94 = *(undefined8 *)(pfVar133 + 0xb6);
          local_6b20 = pfVar133 + 0xb8;
          uVar95 = *(undefined8 *)local_6b20;
          uVar96 = *(undefined8 *)(pfVar133 + 0xba);
          uVar97 = *(undefined8 *)(pfVar133 + 0xbc);
          uVar98 = *(undefined8 *)(pfVar133 + 0xbe);
          local_6b28 = pfVar133 + 0xc0;
          local_5020._0_4_ = (float)uVar83;
          local_1b60 = (float)local_5020;
          local_5020._4_4_ = (float)((ulong)uVar83 >> 0x20);
          fStack_1b5c = local_5020._4_4_;
          uStack_5018._0_4_ = (float)uVar84;
          fStack_1b58 = (float)uStack_5018;
          uStack_5018._4_4_ = (float)((ulong)uVar84 >> 0x20);
          fStack_1b54 = uStack_5018._4_4_;
          uStack_5010._0_4_ = (float)uVar85;
          fStack_1b50 = (float)uStack_5010;
          uStack_5010._4_4_ = (float)((ulong)uVar85 >> 0x20);
          fStack_1b4c = uStack_5010._4_4_;
          uStack_5008._0_4_ = (float)uVar86;
          fStack_1b48 = (float)uStack_5008;
          uStack_5008._4_4_ = (float)((ulong)uVar86 >> 0x20);
          fStack_1b44 = uStack_5008._4_4_;
          local_360 = (float)local_5020 * local_6680;
          fStack_35c = local_5020._4_4_ * local_6680;
          fStack_358 = (float)uStack_5018 * local_6680;
          fStack_354 = uStack_5018._4_4_ * local_6680;
          fStack_350 = (float)uStack_5010 * local_6680;
          fStack_34c = uStack_5010._4_4_ * local_6680;
          fStack_348 = (float)uStack_5008 * local_6680;
          in_stack_ffffffffffff6be0 = local_360 + in_stack_ffffffffffff6be0;
          in_stack_ffffffffffff6be4 = fStack_35c + in_stack_ffffffffffff6be4;
          in_stack_ffffffffffff6be8 = fStack_358 + in_stack_ffffffffffff6be8;
          in_stack_ffffffffffff6bec = fStack_354 + in_stack_ffffffffffff6bec;
          in_stack_ffffffffffff6c10 = fStack_350 + in_stack_ffffffffffff6c10;
          in_stack_ffffffffffff6c14 = fStack_34c + in_stack_ffffffffffff6c14;
          in_stack_ffffffffffff6bd8 = fStack_348 + in_stack_ffffffffffff6bd8;
          uStack_5008._4_4_ = uStack_5008._4_4_ + uStack_4fa8._4_4_;
          local_50c0 = CONCAT44(in_stack_ffffffffffff6be4,in_stack_ffffffffffff6be0);
          uStack_50b8 = CONCAT44(in_stack_ffffffffffff6bec,in_stack_ffffffffffff6be8);
          uStack_50b0 = CONCAT44(in_stack_ffffffffffff6c14,in_stack_ffffffffffff6c10);
          uStack_50a8 = CONCAT44(uStack_5008._4_4_,in_stack_ffffffffffff6bd8);
          local_5080._0_4_ = (float)uVar87;
          local_1b20 = (float)local_5080;
          local_5080._4_4_ = (float)((ulong)uVar87 >> 0x20);
          fStack_1b1c = local_5080._4_4_;
          uStack_5078._0_4_ = (float)uVar88;
          fStack_1b18 = (float)uStack_5078;
          uStack_5078._4_4_ = (float)((ulong)uVar88 >> 0x20);
          fStack_1b14 = uStack_5078._4_4_;
          uStack_5070._0_4_ = (float)uVar89;
          fStack_1b10 = (float)uStack_5070;
          uStack_5070._4_4_ = (float)((ulong)uVar89 >> 0x20);
          fStack_1b0c = uStack_5070._4_4_;
          uStack_5068._0_4_ = (float)uVar90;
          fStack_1b08 = (float)uStack_5068;
          uStack_5068._4_4_ = (float)((ulong)uVar90 >> 0x20);
          fStack_1b04 = uStack_5068._4_4_;
          local_320 = (float)local_5080 * local_66c0;
          fStack_31c = local_5080._4_4_ * local_66c0;
          fStack_318 = (float)uStack_5078 * local_66c0;
          fStack_314 = uStack_5078._4_4_ * local_66c0;
          fStack_310 = (float)uStack_5070 * local_66c0;
          fStack_30c = uStack_5070._4_4_ * local_66c0;
          fStack_308 = (float)uStack_5068 * local_66c0;
          in_stack_ffffffffffff6be0 = local_320 + in_stack_ffffffffffff6be0;
          in_stack_ffffffffffff6be4 = fStack_31c + in_stack_ffffffffffff6be4;
          in_stack_ffffffffffff6be8 = fStack_318 + in_stack_ffffffffffff6be8;
          in_stack_ffffffffffff6bec = fStack_314 + in_stack_ffffffffffff6bec;
          in_stack_ffffffffffff6c10 = fStack_310 + in_stack_ffffffffffff6c10;
          in_stack_ffffffffffff6c14 = fStack_30c + in_stack_ffffffffffff6c14;
          in_stack_ffffffffffff6bd8 = fStack_308 + in_stack_ffffffffffff6bd8;
          uStack_5068._4_4_ = uStack_5068._4_4_ + uStack_5008._4_4_;
          local_5120 = CONCAT44(in_stack_ffffffffffff6be4,in_stack_ffffffffffff6be0);
          uStack_5118 = CONCAT44(in_stack_ffffffffffff6bec,in_stack_ffffffffffff6be8);
          uStack_5110 = CONCAT44(in_stack_ffffffffffff6c14,in_stack_ffffffffffff6c10);
          uStack_5108 = CONCAT44(uStack_5068._4_4_,in_stack_ffffffffffff6bd8);
          local_50e0._0_4_ = (float)uVar91;
          local_1ae0 = (float)local_50e0;
          local_50e0._4_4_ = (float)((ulong)uVar91 >> 0x20);
          fStack_1adc = local_50e0._4_4_;
          uStack_50d8._0_4_ = (float)uVar92;
          fStack_1ad8 = (float)uStack_50d8;
          uStack_50d8._4_4_ = (float)((ulong)uVar92 >> 0x20);
          fStack_1ad4 = uStack_50d8._4_4_;
          uStack_50d0._0_4_ = (float)uVar93;
          fStack_1ad0 = (float)uStack_50d0;
          uStack_50d0._4_4_ = (float)((ulong)uVar93 >> 0x20);
          fStack_1acc = uStack_50d0._4_4_;
          uStack_50c8._0_4_ = (float)uVar94;
          fStack_1ac8 = (float)uStack_50c8;
          uStack_50c8._4_4_ = (float)((ulong)uVar94 >> 0x20);
          fStack_1ac4 = uStack_50c8._4_4_;
          local_2e0 = (float)local_50e0 * local_6700;
          fStack_2dc = local_50e0._4_4_ * local_6700;
          fStack_2d8 = (float)uStack_50d8 * local_6700;
          fStack_2d4 = uStack_50d8._4_4_ * local_6700;
          fStack_2d0 = (float)uStack_50d0 * local_6700;
          fStack_2cc = uStack_50d0._4_4_ * local_6700;
          fStack_2c8 = (float)uStack_50c8 * local_6700;
          in_stack_ffffffffffff6be0 = local_2e0 + in_stack_ffffffffffff6be0;
          in_stack_ffffffffffff6be4 = fStack_2dc + in_stack_ffffffffffff6be4;
          in_stack_ffffffffffff6be8 = fStack_2d8 + in_stack_ffffffffffff6be8;
          in_stack_ffffffffffff6bec = fStack_2d4 + in_stack_ffffffffffff6bec;
          in_stack_ffffffffffff6c10 = fStack_2d0 + in_stack_ffffffffffff6c10;
          in_stack_ffffffffffff6c14 = fStack_2cc + in_stack_ffffffffffff6c14;
          in_stack_ffffffffffff6bd8 = fStack_2c8 + in_stack_ffffffffffff6bd8;
          uStack_50c8._4_4_ = uStack_50c8._4_4_ + uStack_5068._4_4_;
          local_5180 = CONCAT44(in_stack_ffffffffffff6be4,in_stack_ffffffffffff6be0);
          uStack_5178 = CONCAT44(in_stack_ffffffffffff6bec,in_stack_ffffffffffff6be8);
          uStack_5170 = CONCAT44(in_stack_ffffffffffff6c14,in_stack_ffffffffffff6c10);
          uStack_5168 = CONCAT44(uStack_50c8._4_4_,in_stack_ffffffffffff6bd8);
          local_5140._0_4_ = (float)uVar95;
          local_1aa0 = (float)local_5140;
          local_5140._4_4_ = (float)((ulong)uVar95 >> 0x20);
          fStack_1a9c = local_5140._4_4_;
          uStack_5138._0_4_ = (float)uVar96;
          fStack_1a98 = (float)uStack_5138;
          uStack_5138._4_4_ = (float)((ulong)uVar96 >> 0x20);
          fStack_1a94 = uStack_5138._4_4_;
          uStack_5130._0_4_ = (float)uVar97;
          fStack_1a90 = (float)uStack_5130;
          uStack_5130._4_4_ = (float)((ulong)uVar97 >> 0x20);
          fStack_1a8c = uStack_5130._4_4_;
          uStack_5128._0_4_ = (float)uVar98;
          fStack_1a88 = (float)uStack_5128;
          uStack_5128._4_4_ = (float)((ulong)uVar98 >> 0x20);
          fStack_1a84 = uStack_5128._4_4_;
          local_2a0 = (float)local_5140 * local_6740;
          fStack_29c = local_5140._4_4_ * local_6740;
          fStack_298 = (float)uStack_5138 * local_6740;
          fStack_294 = uStack_5138._4_4_ * local_6740;
          fStack_290 = (float)uStack_5130 * local_6740;
          fStack_28c = uStack_5130._4_4_ * local_6740;
          fStack_288 = (float)uStack_5128 * local_6740;
          in_stack_ffffffffffff6be0 = local_2a0 + in_stack_ffffffffffff6be0;
          in_stack_ffffffffffff6be4 = fStack_29c + in_stack_ffffffffffff6be4;
          in_stack_ffffffffffff6be8 = fStack_298 + in_stack_ffffffffffff6be8;
          in_stack_ffffffffffff6bec = fStack_294 + in_stack_ffffffffffff6bec;
          in_stack_ffffffffffff6c10 = fStack_290 + in_stack_ffffffffffff6c10;
          in_stack_ffffffffffff6c14 = fStack_28c + in_stack_ffffffffffff6c14;
          in_stack_ffffffffffff6bd8 = fStack_288 + in_stack_ffffffffffff6bd8;
          uStack_5128._4_4_ = uStack_5128._4_4_ + uStack_50c8._4_4_;
          local_51e0 = CONCAT44(in_stack_ffffffffffff6be4,in_stack_ffffffffffff6be0);
          uStack_51d8 = CONCAT44(in_stack_ffffffffffff6bec,in_stack_ffffffffffff6be8);
          uStack_51d0 = CONCAT44(in_stack_ffffffffffff6c14,in_stack_ffffffffffff6c10);
          uStack_51c8 = CONCAT44(uStack_5128._4_4_,in_stack_ffffffffffff6bd8);
          local_6748 = local_6c90 + 8;
          local_6780 = *local_6748;
          local_51c0 = CONCAT44(local_6780,local_6780);
          uStack_51b8 = CONCAT44(local_6780,local_6780);
          uStack_51b0 = CONCAT44(local_6780,local_6780);
          uStack_51a8 = CONCAT44(local_6780,local_6780);
          local_6788 = local_6c90 + 9;
          local_67c0 = *local_6788;
          local_5220 = CONCAT44(local_67c0,local_67c0);
          uStack_5218 = CONCAT44(local_67c0,local_67c0);
          uStack_5210 = CONCAT44(local_67c0,local_67c0);
          uStack_5208 = CONCAT44(local_67c0,local_67c0);
          local_67c8 = local_6c90 + 10;
          local_6800 = *local_67c8;
          local_5280 = CONCAT44(local_6800,local_6800);
          uStack_5278 = CONCAT44(local_6800,local_6800);
          uStack_5270 = CONCAT44(local_6800,local_6800);
          uStack_5268 = CONCAT44(local_6800,local_6800);
          local_6808 = local_6c90 + 0xb;
          local_6840 = *local_6808;
          local_52e0 = CONCAT44(local_6840,local_6840);
          uStack_52d8 = CONCAT44(local_6840,local_6840);
          uStack_52d0 = CONCAT44(local_6840,local_6840);
          uStack_52c8 = CONCAT44(local_6840,local_6840);
          local_6848 = local_6c90 + 0xc;
          local_6880 = *local_6848;
          local_5340 = CONCAT44(local_6880,local_6880);
          uStack_5338 = CONCAT44(local_6880,local_6880);
          uStack_5330 = CONCAT44(local_6880,local_6880);
          uStack_5328 = CONCAT44(local_6880,local_6880);
          local_6888 = local_6c90 + 0xd;
          local_68c0 = *local_6888;
          local_53a0 = CONCAT44(local_68c0,local_68c0);
          uStack_5398 = CONCAT44(local_68c0,local_68c0);
          uStack_5390 = CONCAT44(local_68c0,local_68c0);
          uStack_5388 = CONCAT44(local_68c0,local_68c0);
          local_68c8 = local_6c90 + 0xe;
          local_6900 = *local_68c8;
          local_5400 = CONCAT44(local_6900,local_6900);
          uStack_53f8 = CONCAT44(local_6900,local_6900);
          uStack_53f0 = CONCAT44(local_6900,local_6900);
          uStack_53e8 = CONCAT44(local_6900,local_6900);
          local_6908 = local_6c90 + 0xf;
          local_6940 = *local_6908;
          local_5460 = CONCAT44(local_6940,local_6940);
          uStack_5458 = CONCAT44(local_6940,local_6940);
          uStack_5450 = CONCAT44(local_6940,local_6940);
          uStack_5448 = CONCAT44(local_6940,local_6940);
          uVar99 = *(undefined8 *)local_6b28;
          uVar100 = *(undefined8 *)(pfVar133 + 0xc2);
          uVar101 = *(undefined8 *)(pfVar133 + 0xc4);
          uVar102 = *(undefined8 *)(pfVar133 + 0xc6);
          local_6b30 = pfVar133 + 200;
          uVar103 = *(undefined8 *)local_6b30;
          uVar104 = *(undefined8 *)(pfVar133 + 0xca);
          uVar105 = *(undefined8 *)(pfVar133 + 0xcc);
          uVar106 = *(undefined8 *)(pfVar133 + 0xce);
          local_6b38 = pfVar133 + 0xd0;
          uVar107 = *(undefined8 *)local_6b38;
          uVar108 = *(undefined8 *)(pfVar133 + 0xd2);
          uVar109 = *(undefined8 *)(pfVar133 + 0xd4);
          uVar110 = *(undefined8 *)(pfVar133 + 0xd6);
          local_6b40 = pfVar133 + 0xd8;
          uVar111 = *(undefined8 *)local_6b40;
          uVar112 = *(undefined8 *)(pfVar133 + 0xda);
          uVar113 = *(undefined8 *)(pfVar133 + 0xdc);
          uVar114 = *(undefined8 *)(pfVar133 + 0xde);
          local_6b48 = pfVar133 + 0xe0;
          local_51a0._0_4_ = (float)uVar99;
          local_1a60 = (float)local_51a0;
          local_51a0._4_4_ = (float)((ulong)uVar99 >> 0x20);
          fStack_1a5c = local_51a0._4_4_;
          uStack_5198._0_4_ = (float)uVar100;
          fStack_1a58 = (float)uStack_5198;
          uStack_5198._4_4_ = (float)((ulong)uVar100 >> 0x20);
          fStack_1a54 = uStack_5198._4_4_;
          uStack_5190._0_4_ = (float)uVar101;
          fStack_1a50 = (float)uStack_5190;
          uStack_5190._4_4_ = (float)((ulong)uVar101 >> 0x20);
          fStack_1a4c = uStack_5190._4_4_;
          uStack_5188._0_4_ = (float)uVar102;
          fStack_1a48 = (float)uStack_5188;
          uStack_5188._4_4_ = (float)((ulong)uVar102 >> 0x20);
          fStack_1a44 = uStack_5188._4_4_;
          local_260 = (float)local_51a0 * local_6780;
          fStack_25c = local_51a0._4_4_ * local_6780;
          fStack_258 = (float)uStack_5198 * local_6780;
          fStack_254 = uStack_5198._4_4_ * local_6780;
          fStack_250 = (float)uStack_5190 * local_6780;
          fStack_24c = uStack_5190._4_4_ * local_6780;
          fStack_248 = (float)uStack_5188 * local_6780;
          in_stack_ffffffffffff6be0 = local_260 + in_stack_ffffffffffff6be0;
          in_stack_ffffffffffff6be4 = fStack_25c + in_stack_ffffffffffff6be4;
          in_stack_ffffffffffff6be8 = fStack_258 + in_stack_ffffffffffff6be8;
          in_stack_ffffffffffff6bec = fStack_254 + in_stack_ffffffffffff6bec;
          in_stack_ffffffffffff6c10 = fStack_250 + in_stack_ffffffffffff6c10;
          in_stack_ffffffffffff6c14 = fStack_24c + in_stack_ffffffffffff6c14;
          in_stack_ffffffffffff6bd8 = fStack_248 + in_stack_ffffffffffff6bd8;
          uStack_5188._4_4_ = uStack_5188._4_4_ + uStack_5128._4_4_;
          local_5240 = CONCAT44(in_stack_ffffffffffff6be4,in_stack_ffffffffffff6be0);
          uStack_5238 = CONCAT44(in_stack_ffffffffffff6bec,in_stack_ffffffffffff6be8);
          uStack_5230 = CONCAT44(in_stack_ffffffffffff6c14,in_stack_ffffffffffff6c10);
          uStack_5228 = CONCAT44(uStack_5188._4_4_,in_stack_ffffffffffff6bd8);
          local_5200._0_4_ = (float)uVar103;
          local_1a20 = (float)local_5200;
          local_5200._4_4_ = (float)((ulong)uVar103 >> 0x20);
          fStack_1a1c = local_5200._4_4_;
          uStack_51f8._0_4_ = (float)uVar104;
          fStack_1a18 = (float)uStack_51f8;
          uStack_51f8._4_4_ = (float)((ulong)uVar104 >> 0x20);
          fStack_1a14 = uStack_51f8._4_4_;
          uStack_51f0._0_4_ = (float)uVar105;
          fStack_1a10 = (float)uStack_51f0;
          uStack_51f0._4_4_ = (float)((ulong)uVar105 >> 0x20);
          fStack_1a0c = uStack_51f0._4_4_;
          uStack_51e8._0_4_ = (float)uVar106;
          fStack_1a08 = (float)uStack_51e8;
          uStack_51e8._4_4_ = (float)((ulong)uVar106 >> 0x20);
          fStack_1a04 = uStack_51e8._4_4_;
          local_220 = (float)local_5200 * local_67c0;
          fStack_21c = local_5200._4_4_ * local_67c0;
          fStack_218 = (float)uStack_51f8 * local_67c0;
          fStack_214 = uStack_51f8._4_4_ * local_67c0;
          fStack_210 = (float)uStack_51f0 * local_67c0;
          fStack_20c = uStack_51f0._4_4_ * local_67c0;
          fStack_208 = (float)uStack_51e8 * local_67c0;
          in_stack_ffffffffffff6be0 = local_220 + in_stack_ffffffffffff6be0;
          in_stack_ffffffffffff6be4 = fStack_21c + in_stack_ffffffffffff6be4;
          in_stack_ffffffffffff6be8 = fStack_218 + in_stack_ffffffffffff6be8;
          in_stack_ffffffffffff6bec = fStack_214 + in_stack_ffffffffffff6bec;
          in_stack_ffffffffffff6c10 = fStack_210 + in_stack_ffffffffffff6c10;
          in_stack_ffffffffffff6c14 = fStack_20c + in_stack_ffffffffffff6c14;
          in_stack_ffffffffffff6bd8 = fStack_208 + in_stack_ffffffffffff6bd8;
          uStack_51e8._4_4_ = uStack_51e8._4_4_ + uStack_5188._4_4_;
          local_52a0 = CONCAT44(in_stack_ffffffffffff6be4,in_stack_ffffffffffff6be0);
          uStack_5298 = CONCAT44(in_stack_ffffffffffff6bec,in_stack_ffffffffffff6be8);
          uStack_5290 = CONCAT44(in_stack_ffffffffffff6c14,in_stack_ffffffffffff6c10);
          uStack_5288 = CONCAT44(uStack_51e8._4_4_,in_stack_ffffffffffff6bd8);
          local_5260._0_4_ = (float)uVar107;
          local_19e0 = (float)local_5260;
          local_5260._4_4_ = (float)((ulong)uVar107 >> 0x20);
          fStack_19dc = local_5260._4_4_;
          uStack_5258._0_4_ = (float)uVar108;
          fStack_19d8 = (float)uStack_5258;
          uStack_5258._4_4_ = (float)((ulong)uVar108 >> 0x20);
          fStack_19d4 = uStack_5258._4_4_;
          uStack_5250._0_4_ = (float)uVar109;
          fStack_19d0 = (float)uStack_5250;
          uStack_5250._4_4_ = (float)((ulong)uVar109 >> 0x20);
          fStack_19cc = uStack_5250._4_4_;
          uStack_5248._0_4_ = (float)uVar110;
          fStack_19c8 = (float)uStack_5248;
          uStack_5248._4_4_ = (float)((ulong)uVar110 >> 0x20);
          fStack_19c4 = uStack_5248._4_4_;
          local_1e0 = (float)local_5260 * local_6800;
          fStack_1dc = local_5260._4_4_ * local_6800;
          fStack_1d8 = (float)uStack_5258 * local_6800;
          fStack_1d4 = uStack_5258._4_4_ * local_6800;
          fStack_1d0 = (float)uStack_5250 * local_6800;
          fStack_1cc = uStack_5250._4_4_ * local_6800;
          fStack_1c8 = (float)uStack_5248 * local_6800;
          in_stack_ffffffffffff6be0 = local_1e0 + in_stack_ffffffffffff6be0;
          in_stack_ffffffffffff6be4 = fStack_1dc + in_stack_ffffffffffff6be4;
          in_stack_ffffffffffff6be8 = fStack_1d8 + in_stack_ffffffffffff6be8;
          in_stack_ffffffffffff6bec = fStack_1d4 + in_stack_ffffffffffff6bec;
          in_stack_ffffffffffff6c10 = fStack_1d0 + in_stack_ffffffffffff6c10;
          in_stack_ffffffffffff6c14 = fStack_1cc + in_stack_ffffffffffff6c14;
          in_stack_ffffffffffff6bd8 = fStack_1c8 + in_stack_ffffffffffff6bd8;
          uStack_5248._4_4_ = uStack_5248._4_4_ + uStack_51e8._4_4_;
          local_5300 = CONCAT44(in_stack_ffffffffffff6be4,in_stack_ffffffffffff6be0);
          uStack_52f8 = CONCAT44(in_stack_ffffffffffff6bec,in_stack_ffffffffffff6be8);
          uStack_52f0 = CONCAT44(in_stack_ffffffffffff6c14,in_stack_ffffffffffff6c10);
          uStack_52e8 = CONCAT44(uStack_5248._4_4_,in_stack_ffffffffffff6bd8);
          local_52c0._0_4_ = (float)uVar111;
          local_19a0 = (float)local_52c0;
          local_52c0._4_4_ = (float)((ulong)uVar111 >> 0x20);
          fStack_199c = local_52c0._4_4_;
          uStack_52b8._0_4_ = (float)uVar112;
          fStack_1998 = (float)uStack_52b8;
          uStack_52b8._4_4_ = (float)((ulong)uVar112 >> 0x20);
          fStack_1994 = uStack_52b8._4_4_;
          uStack_52b0._0_4_ = (float)uVar113;
          fStack_1990 = (float)uStack_52b0;
          uStack_52b0._4_4_ = (float)((ulong)uVar113 >> 0x20);
          fStack_198c = uStack_52b0._4_4_;
          uStack_52a8._0_4_ = (float)uVar114;
          fStack_1988 = (float)uStack_52a8;
          uStack_52a8._4_4_ = (float)((ulong)uVar114 >> 0x20);
          fStack_1984 = uStack_52a8._4_4_;
          local_1a0 = (float)local_52c0 * local_6840;
          fStack_19c = local_52c0._4_4_ * local_6840;
          fStack_198 = (float)uStack_52b8 * local_6840;
          fStack_194 = uStack_52b8._4_4_ * local_6840;
          fStack_190 = (float)uStack_52b0 * local_6840;
          fStack_18c = uStack_52b0._4_4_ * local_6840;
          fStack_188 = (float)uStack_52a8 * local_6840;
          in_stack_ffffffffffff6be0 = local_1a0 + in_stack_ffffffffffff6be0;
          in_stack_ffffffffffff6be4 = fStack_19c + in_stack_ffffffffffff6be4;
          in_stack_ffffffffffff6be8 = fStack_198 + in_stack_ffffffffffff6be8;
          in_stack_ffffffffffff6bec = fStack_194 + in_stack_ffffffffffff6bec;
          in_stack_ffffffffffff6c10 = fStack_190 + in_stack_ffffffffffff6c10;
          in_stack_ffffffffffff6c14 = fStack_18c + in_stack_ffffffffffff6c14;
          in_stack_ffffffffffff6bd8 = fStack_188 + in_stack_ffffffffffff6bd8;
          uStack_52a8._4_4_ = uStack_52a8._4_4_ + uStack_5248._4_4_;
          local_5360 = CONCAT44(in_stack_ffffffffffff6be4,in_stack_ffffffffffff6be0);
          uStack_5358 = CONCAT44(in_stack_ffffffffffff6bec,in_stack_ffffffffffff6be8);
          uStack_5350 = CONCAT44(in_stack_ffffffffffff6c14,in_stack_ffffffffffff6c10);
          uStack_5348 = CONCAT44(uStack_52a8._4_4_,in_stack_ffffffffffff6bd8);
          uVar115 = *(undefined8 *)local_6b48;
          uVar116 = *(undefined8 *)(pfVar133 + 0xe2);
          uVar117 = *(undefined8 *)(pfVar133 + 0xe4);
          uVar118 = *(undefined8 *)(pfVar133 + 0xe6);
          local_6b50 = pfVar133 + 0xe8;
          uVar119 = *(undefined8 *)local_6b50;
          uVar120 = *(undefined8 *)(pfVar133 + 0xea);
          uVar121 = *(undefined8 *)(pfVar133 + 0xec);
          uVar122 = *(undefined8 *)(pfVar133 + 0xee);
          local_6b58 = pfVar133 + 0xf0;
          uVar123 = *(undefined8 *)local_6b58;
          uVar124 = *(undefined8 *)(pfVar133 + 0xf2);
          uVar125 = *(undefined8 *)(pfVar133 + 0xf4);
          uVar126 = *(undefined8 *)(pfVar133 + 0xf6);
          local_6b60 = pfVar133 + 0xf8;
          uVar127 = *(undefined8 *)local_6b60;
          uVar128 = *(undefined8 *)(pfVar133 + 0xfa);
          uVar129 = *(undefined8 *)(pfVar133 + 0xfc);
          uVar130 = *(undefined8 *)(pfVar133 + 0xfe);
          local_5320._0_4_ = (float)uVar115;
          local_1960 = (float)local_5320;
          local_5320._4_4_ = (float)((ulong)uVar115 >> 0x20);
          fStack_195c = local_5320._4_4_;
          uStack_5318._0_4_ = (float)uVar116;
          fStack_1958 = (float)uStack_5318;
          uStack_5318._4_4_ = (float)((ulong)uVar116 >> 0x20);
          fStack_1954 = uStack_5318._4_4_;
          uStack_5310._0_4_ = (float)uVar117;
          fStack_1950 = (float)uStack_5310;
          uStack_5310._4_4_ = (float)((ulong)uVar117 >> 0x20);
          fStack_194c = uStack_5310._4_4_;
          uStack_5308._0_4_ = (float)uVar118;
          fStack_1948 = (float)uStack_5308;
          uStack_5308._4_4_ = (float)((ulong)uVar118 >> 0x20);
          fStack_1944 = uStack_5308._4_4_;
          local_160 = (float)local_5320 * local_6880;
          fStack_15c = local_5320._4_4_ * local_6880;
          fStack_158 = (float)uStack_5318 * local_6880;
          fStack_154 = uStack_5318._4_4_ * local_6880;
          fStack_150 = (float)uStack_5310 * local_6880;
          fStack_14c = uStack_5310._4_4_ * local_6880;
          fStack_148 = (float)uStack_5308 * local_6880;
          in_stack_ffffffffffff6be0 = local_160 + in_stack_ffffffffffff6be0;
          in_stack_ffffffffffff6be4 = fStack_15c + in_stack_ffffffffffff6be4;
          in_stack_ffffffffffff6be8 = fStack_158 + in_stack_ffffffffffff6be8;
          in_stack_ffffffffffff6bec = fStack_154 + in_stack_ffffffffffff6bec;
          in_stack_ffffffffffff6c10 = fStack_150 + in_stack_ffffffffffff6c10;
          in_stack_ffffffffffff6c14 = fStack_14c + in_stack_ffffffffffff6c14;
          in_stack_ffffffffffff6bd8 = fStack_148 + in_stack_ffffffffffff6bd8;
          uStack_5308._4_4_ = uStack_5308._4_4_ + uStack_52a8._4_4_;
          local_53c0 = CONCAT44(in_stack_ffffffffffff6be4,in_stack_ffffffffffff6be0);
          uStack_53b8 = CONCAT44(in_stack_ffffffffffff6bec,in_stack_ffffffffffff6be8);
          uStack_53b0 = CONCAT44(in_stack_ffffffffffff6c14,in_stack_ffffffffffff6c10);
          uStack_53a8 = CONCAT44(uStack_5308._4_4_,in_stack_ffffffffffff6bd8);
          local_5380._0_4_ = (float)uVar119;
          local_1920 = (float)local_5380;
          local_5380._4_4_ = (float)((ulong)uVar119 >> 0x20);
          fStack_191c = local_5380._4_4_;
          uStack_5378._0_4_ = (float)uVar120;
          fStack_1918 = (float)uStack_5378;
          uStack_5378._4_4_ = (float)((ulong)uVar120 >> 0x20);
          fStack_1914 = uStack_5378._4_4_;
          uStack_5370._0_4_ = (float)uVar121;
          fStack_1910 = (float)uStack_5370;
          uStack_5370._4_4_ = (float)((ulong)uVar121 >> 0x20);
          fStack_190c = uStack_5370._4_4_;
          uStack_5368._0_4_ = (float)uVar122;
          fStack_1908 = (float)uStack_5368;
          uStack_5368._4_4_ = (float)((ulong)uVar122 >> 0x20);
          fStack_1904 = uStack_5368._4_4_;
          local_120 = (float)local_5380 * local_68c0;
          fStack_11c = local_5380._4_4_ * local_68c0;
          fStack_118 = (float)uStack_5378 * local_68c0;
          fStack_114 = uStack_5378._4_4_ * local_68c0;
          fStack_110 = (float)uStack_5370 * local_68c0;
          fStack_10c = uStack_5370._4_4_ * local_68c0;
          fStack_108 = (float)uStack_5368 * local_68c0;
          in_stack_ffffffffffff6be0 = local_120 + in_stack_ffffffffffff6be0;
          in_stack_ffffffffffff6be4 = fStack_11c + in_stack_ffffffffffff6be4;
          in_stack_ffffffffffff6be8 = fStack_118 + in_stack_ffffffffffff6be8;
          in_stack_ffffffffffff6bec = fStack_114 + in_stack_ffffffffffff6bec;
          in_stack_ffffffffffff6c10 = fStack_110 + in_stack_ffffffffffff6c10;
          in_stack_ffffffffffff6c14 = fStack_10c + in_stack_ffffffffffff6c14;
          in_stack_ffffffffffff6bd8 = fStack_108 + in_stack_ffffffffffff6bd8;
          uStack_5368._4_4_ = uStack_5368._4_4_ + uStack_5308._4_4_;
          local_5420 = CONCAT44(in_stack_ffffffffffff6be4,in_stack_ffffffffffff6be0);
          uStack_5418 = CONCAT44(in_stack_ffffffffffff6bec,in_stack_ffffffffffff6be8);
          uStack_5410 = CONCAT44(in_stack_ffffffffffff6c14,in_stack_ffffffffffff6c10);
          uStack_5408 = CONCAT44(uStack_5368._4_4_,in_stack_ffffffffffff6bd8);
          local_53e0._0_4_ = (float)uVar123;
          local_18e0 = (float)local_53e0;
          local_53e0._4_4_ = (float)((ulong)uVar123 >> 0x20);
          fStack_18dc = local_53e0._4_4_;
          uStack_53d8._0_4_ = (float)uVar124;
          fStack_18d8 = (float)uStack_53d8;
          uStack_53d8._4_4_ = (float)((ulong)uVar124 >> 0x20);
          fStack_18d4 = uStack_53d8._4_4_;
          uStack_53d0._0_4_ = (float)uVar125;
          fStack_18d0 = (float)uStack_53d0;
          uStack_53d0._4_4_ = (float)((ulong)uVar125 >> 0x20);
          fStack_18cc = uStack_53d0._4_4_;
          uStack_53c8._0_4_ = (float)uVar126;
          fStack_18c8 = (float)uStack_53c8;
          uStack_53c8._4_4_ = (float)((ulong)uVar126 >> 0x20);
          fStack_18c4 = uStack_53c8._4_4_;
          local_e0 = (float)local_53e0 * local_6900;
          fStack_dc = local_53e0._4_4_ * local_6900;
          fStack_d8 = (float)uStack_53d8 * local_6900;
          fStack_d4 = uStack_53d8._4_4_ * local_6900;
          fStack_d0 = (float)uStack_53d0 * local_6900;
          fStack_cc = uStack_53d0._4_4_ * local_6900;
          fStack_c8 = (float)uStack_53c8 * local_6900;
          in_stack_ffffffffffff6be0 = local_e0 + in_stack_ffffffffffff6be0;
          in_stack_ffffffffffff6be4 = fStack_dc + in_stack_ffffffffffff6be4;
          in_stack_ffffffffffff6be8 = fStack_d8 + in_stack_ffffffffffff6be8;
          in_stack_ffffffffffff6bec = fStack_d4 + in_stack_ffffffffffff6bec;
          in_stack_ffffffffffff6bf0 = fStack_d0 + in_stack_ffffffffffff6c10;
          in_stack_ffffffffffff6bf4 = fStack_cc + in_stack_ffffffffffff6c14;
          in_stack_ffffffffffff6bd8 = fStack_c8 + in_stack_ffffffffffff6bd8;
          uStack_53c8._4_4_ = uStack_53c8._4_4_ + uStack_5368._4_4_;
          local_5480 = CONCAT44(in_stack_ffffffffffff6be4,in_stack_ffffffffffff6be0);
          uStack_5478 = CONCAT44(in_stack_ffffffffffff6bec,in_stack_ffffffffffff6be8);
          uStack_5470 = CONCAT44(in_stack_ffffffffffff6bf4,in_stack_ffffffffffff6bf0);
          uStack_5468 = CONCAT44(uStack_53c8._4_4_,in_stack_ffffffffffff6bd8);
          local_5440._0_4_ = (float)uVar127;
          local_18a0 = (float)local_5440;
          local_5440._4_4_ = (float)((ulong)uVar127 >> 0x20);
          fStack_189c = local_5440._4_4_;
          uStack_5438._0_4_ = (float)uVar128;
          fStack_1898 = (float)uStack_5438;
          uStack_5438._4_4_ = (float)((ulong)uVar128 >> 0x20);
          fStack_1894 = uStack_5438._4_4_;
          uStack_5430._0_4_ = (float)uVar129;
          fStack_1890 = (float)uStack_5430;
          uStack_5430._4_4_ = (float)((ulong)uVar129 >> 0x20);
          fStack_188c = uStack_5430._4_4_;
          uStack_5428._0_4_ = (float)uVar130;
          fStack_1888 = (float)uStack_5428;
          uStack_5428._4_4_ = (float)((ulong)uVar130 >> 0x20);
          fStack_1884 = uStack_5428._4_4_;
          local_a0 = (float)local_5440 * local_6940;
          fStack_9c = local_5440._4_4_ * local_6940;
          fStack_98 = (float)uStack_5438 * local_6940;
          fStack_94 = uStack_5438._4_4_ * local_6940;
          fStack_90 = (float)uStack_5430 * local_6940;
          fStack_8c = uStack_5430._4_4_ * local_6940;
          fStack_88 = (float)uStack_5428 * local_6940;
          in_stack_ffffffffffff6bd8 = fStack_88 + in_stack_ffffffffffff6bd8;
          in_stack_ffffffffffff6bdc = uStack_5428._4_4_ + uStack_53c8._4_4_;
          local_5540 = CONCAT44(fStack_9c + in_stack_ffffffffffff6be4,
                                local_a0 + in_stack_ffffffffffff6be0);
          uStack_5538 = CONCAT44(fStack_94 + in_stack_ffffffffffff6bec,
                                 fStack_98 + in_stack_ffffffffffff6be8);
          uStack_5530 = CONCAT44(fStack_8c + in_stack_ffffffffffff6bf4,
                                 fStack_90 + in_stack_ffffffffffff6bf0);
          uStack_5528 = CONCAT44(in_stack_ffffffffffff6bdc,in_stack_ffffffffffff6bd8);
          local_5508 = local_6c38;
          auVar131._8_8_ = uStack_5538;
          auVar131._0_8_ = local_5540;
          auVar131._16_8_ = uStack_5530;
          auVar131._24_8_ = uStack_5528;
          *local_6c38 = auVar131;
          local_6c38 = local_6c38 + 1;
          local_6c90 = local_6748;
          local_6c88 = local_6348;
          local_6a68 = pfVar133;
          fStack_693c = local_6940;
          fStack_6938 = local_6940;
          fStack_6934 = local_6940;
          fStack_6930 = local_6940;
          fStack_692c = local_6940;
          fStack_6928 = local_6940;
          fStack_6924 = local_6940;
          local_690c = local_6940;
          fStack_68fc = local_6900;
          fStack_68f8 = local_6900;
          fStack_68f4 = local_6900;
          fStack_68f0 = local_6900;
          fStack_68ec = local_6900;
          fStack_68e8 = local_6900;
          fStack_68e4 = local_6900;
          local_68cc = local_6900;
          fStack_68bc = local_68c0;
          fStack_68b8 = local_68c0;
          fStack_68b4 = local_68c0;
          fStack_68b0 = local_68c0;
          fStack_68ac = local_68c0;
          fStack_68a8 = local_68c0;
          fStack_68a4 = local_68c0;
          local_688c = local_68c0;
          fStack_687c = local_6880;
          fStack_6878 = local_6880;
          fStack_6874 = local_6880;
          fStack_6870 = local_6880;
          fStack_686c = local_6880;
          fStack_6868 = local_6880;
          fStack_6864 = local_6880;
          local_684c = local_6880;
          fStack_683c = local_6840;
          fStack_6838 = local_6840;
          fStack_6834 = local_6840;
          fStack_6830 = local_6840;
          fStack_682c = local_6840;
          fStack_6828 = local_6840;
          fStack_6824 = local_6840;
          local_680c = local_6840;
          fStack_67fc = local_6800;
          fStack_67f8 = local_6800;
          fStack_67f4 = local_6800;
          fStack_67f0 = local_6800;
          fStack_67ec = local_6800;
          fStack_67e8 = local_6800;
          fStack_67e4 = local_6800;
          local_67cc = local_6800;
          fStack_67bc = local_67c0;
          fStack_67b8 = local_67c0;
          fStack_67b4 = local_67c0;
          fStack_67b0 = local_67c0;
          fStack_67ac = local_67c0;
          fStack_67a8 = local_67c0;
          fStack_67a4 = local_67c0;
          local_678c = local_67c0;
          fStack_677c = local_6780;
          fStack_6778 = local_6780;
          fStack_6774 = local_6780;
          fStack_6770 = local_6780;
          fStack_676c = local_6780;
          fStack_6768 = local_6780;
          fStack_6764 = local_6780;
          local_674c = local_6780;
          fStack_673c = local_6740;
          fStack_6738 = local_6740;
          fStack_6734 = local_6740;
          fStack_6730 = local_6740;
          fStack_672c = local_6740;
          fStack_6728 = local_6740;
          fStack_6724 = local_6740;
          local_670c = local_6740;
          fStack_66fc = local_6700;
          fStack_66f8 = local_6700;
          fStack_66f4 = local_6700;
          fStack_66f0 = local_6700;
          fStack_66ec = local_6700;
          fStack_66e8 = local_6700;
          fStack_66e4 = local_6700;
          local_66cc = local_6700;
          fStack_66bc = local_66c0;
          fStack_66b8 = local_66c0;
          fStack_66b4 = local_66c0;
          fStack_66b0 = local_66c0;
          fStack_66ac = local_66c0;
          fStack_66a8 = local_66c0;
          fStack_66a4 = local_66c0;
          local_668c = local_66c0;
          fStack_667c = local_6680;
          fStack_6678 = local_6680;
          fStack_6674 = local_6680;
          fStack_6670 = local_6680;
          fStack_666c = local_6680;
          fStack_6668 = local_6680;
          fStack_6664 = local_6680;
          local_664c = local_6680;
          fStack_663c = local_6640;
          fStack_6638 = local_6640;
          fStack_6634 = local_6640;
          fStack_6630 = local_6640;
          fStack_662c = local_6640;
          fStack_6628 = local_6640;
          fStack_6624 = local_6640;
          local_660c = local_6640;
          fStack_65fc = local_6600;
          fStack_65f8 = local_6600;
          fStack_65f4 = local_6600;
          fStack_65f0 = local_6600;
          fStack_65ec = local_6600;
          fStack_65e8 = local_6600;
          fStack_65e4 = local_6600;
          local_65cc = local_6600;
          fStack_65bc = local_65c0;
          fStack_65b8 = local_65c0;
          fStack_65b4 = local_65c0;
          fStack_65b0 = local_65c0;
          fStack_65ac = local_65c0;
          fStack_65a8 = local_65c0;
          fStack_65a4 = local_65c0;
          local_658c = local_65c0;
          fStack_657c = local_6580;
          fStack_6578 = local_6580;
          fStack_6574 = local_6580;
          fStack_6570 = local_6580;
          fStack_656c = local_6580;
          fStack_6568 = local_6580;
          fStack_6564 = local_6580;
          local_654c = local_6580;
          fStack_653c = local_6540;
          fStack_6538 = local_6540;
          fStack_6534 = local_6540;
          fStack_6530 = local_6540;
          fStack_652c = local_6540;
          fStack_6528 = local_6540;
          fStack_6524 = local_6540;
          local_650c = local_6540;
          fStack_64fc = local_6500;
          fStack_64f8 = local_6500;
          fStack_64f4 = local_6500;
          fStack_64f0 = local_6500;
          fStack_64ec = local_6500;
          fStack_64e8 = local_6500;
          fStack_64e4 = local_6500;
          local_64cc = local_6500;
          fStack_64bc = local_64c0;
          fStack_64b8 = local_64c0;
          fStack_64b4 = local_64c0;
          fStack_64b0 = local_64c0;
          fStack_64ac = local_64c0;
          fStack_64a8 = local_64c0;
          fStack_64a4 = local_64c0;
          local_648c = local_64c0;
          fStack_647c = local_6480;
          fStack_6478 = local_6480;
          fStack_6474 = local_6480;
          fStack_6470 = local_6480;
          fStack_646c = local_6480;
          fStack_6468 = local_6480;
          fStack_6464 = local_6480;
          local_644c = local_6480;
          fStack_643c = local_6440;
          fStack_6438 = local_6440;
          fStack_6434 = local_6440;
          fStack_6430 = local_6440;
          fStack_642c = local_6440;
          fStack_6428 = local_6440;
          fStack_6424 = local_6440;
          local_640c = local_6440;
          fStack_63fc = local_6400;
          fStack_63f8 = local_6400;
          fStack_63f4 = local_6400;
          fStack_63f0 = local_6400;
          fStack_63ec = local_6400;
          fStack_63e8 = local_6400;
          fStack_63e4 = local_6400;
          local_63cc = local_6400;
          fStack_63bc = local_63c0;
          fStack_63b8 = local_63c0;
          fStack_63b4 = local_63c0;
          fStack_63b0 = local_63c0;
          fStack_63ac = local_63c0;
          fStack_63a8 = local_63c0;
          fStack_63a4 = local_63c0;
          local_638c = local_63c0;
          fStack_637c = local_6380;
          fStack_6378 = local_6380;
          fStack_6374 = local_6380;
          fStack_6370 = local_6380;
          fStack_636c = local_6380;
          fStack_6368 = local_6380;
          fStack_6364 = local_6380;
          local_634c = local_6380;
          fStack_633c = local_6340;
          fStack_6338 = local_6340;
          fStack_6334 = local_6340;
          fStack_6330 = local_6340;
          fStack_632c = local_6340;
          fStack_6328 = local_6340;
          fStack_6324 = local_6340;
          local_630c = local_6340;
          fStack_62fc = local_6300;
          fStack_62f8 = local_6300;
          fStack_62f4 = local_6300;
          fStack_62f0 = local_6300;
          fStack_62ec = local_6300;
          fStack_62e8 = local_6300;
          fStack_62e4 = local_6300;
          local_62cc = local_6300;
          fStack_62bc = local_62c0;
          fStack_62b8 = local_62c0;
          fStack_62b4 = local_62c0;
          fStack_62b0 = local_62c0;
          fStack_62ac = local_62c0;
          fStack_62a8 = local_62c0;
          fStack_62a4 = local_62c0;
          local_628c = local_62c0;
          fStack_627c = local_6280;
          fStack_6278 = local_6280;
          fStack_6274 = local_6280;
          fStack_6270 = local_6280;
          fStack_626c = local_6280;
          fStack_6268 = local_6280;
          fStack_6264 = local_6280;
          local_624c = local_6280;
          fStack_623c = local_6240;
          fStack_6238 = local_6240;
          fStack_6234 = local_6240;
          fStack_6230 = local_6240;
          fStack_622c = local_6240;
          fStack_6228 = local_6240;
          fStack_6224 = local_6240;
          local_620c = local_6240;
          fStack_61fc = local_6200;
          fStack_61f8 = local_6200;
          fStack_61f4 = local_6200;
          fStack_61f0 = local_6200;
          fStack_61ec = local_6200;
          fStack_61e8 = local_6200;
          fStack_61e4 = local_6200;
          local_61cc = local_6200;
          fStack_61bc = local_61c0;
          fStack_61b8 = local_61c0;
          fStack_61b4 = local_61c0;
          fStack_61b0 = local_61c0;
          fStack_61ac = local_61c0;
          fStack_61a8 = local_61c0;
          fStack_61a4 = local_61c0;
          local_618c = local_61c0;
          fStack_617c = local_6180;
          fStack_6178 = local_6180;
          fStack_6174 = local_6180;
          fStack_6170 = local_6180;
          fStack_616c = local_6180;
          fStack_6168 = local_6180;
          fStack_6164 = local_6180;
          local_614c = local_6180;
          local_5440 = uVar127;
          uStack_5438 = uVar128;
          uStack_5430 = uVar129;
          uStack_5428 = uVar130;
          local_53e0 = uVar123;
          uStack_53d8 = uVar124;
          uStack_53d0 = uVar125;
          uStack_53c8 = uVar126;
          local_5380 = uVar119;
          uStack_5378 = uVar120;
          uStack_5370 = uVar121;
          uStack_5368 = uVar122;
          local_5320 = uVar115;
          uStack_5318 = uVar116;
          uStack_5310 = uVar117;
          uStack_5308 = uVar118;
          local_52c0 = uVar111;
          uStack_52b8 = uVar112;
          uStack_52b0 = uVar113;
          uStack_52a8 = uVar114;
          local_5260 = uVar107;
          uStack_5258 = uVar108;
          uStack_5250 = uVar109;
          uStack_5248 = uVar110;
          local_5200 = uVar103;
          uStack_51f8 = uVar104;
          uStack_51f0 = uVar105;
          uStack_51e8 = uVar106;
          local_51a0 = uVar99;
          uStack_5198 = uVar100;
          uStack_5190 = uVar101;
          uStack_5188 = uVar102;
          local_5140 = uVar95;
          uStack_5138 = uVar96;
          uStack_5130 = uVar97;
          uStack_5128 = uVar98;
          local_50e0 = uVar91;
          uStack_50d8 = uVar92;
          uStack_50d0 = uVar93;
          uStack_50c8 = uVar94;
          local_5080 = uVar87;
          uStack_5078 = uVar88;
          uStack_5070 = uVar89;
          uStack_5068 = uVar90;
          local_5020 = uVar83;
          uStack_5018 = uVar84;
          uStack_5010 = uVar85;
          uStack_5008 = uVar86;
          local_4fc0 = uVar79;
          uStack_4fb8 = uVar80;
          uStack_4fb0 = uVar81;
          uStack_4fa8 = uVar82;
          local_4f60 = uVar75;
          uStack_4f58 = uVar76;
          uStack_4f50 = uVar77;
          uStack_4f48 = uVar78;
          local_4f00 = uVar71;
          uStack_4ef8 = uVar72;
          uStack_4ef0 = uVar73;
          uStack_4ee8 = uVar74;
          local_4ea0 = uVar67;
          uStack_4e98 = uVar68;
          uStack_4e90 = uVar69;
          uStack_4e88 = uVar70;
          local_4e40 = uVar63;
          uStack_4e38 = uVar64;
          uStack_4e30 = uVar65;
          uStack_4e28 = uVar66;
          local_4de0 = uVar59;
          uStack_4dd8 = uVar60;
          uStack_4dd0 = uVar61;
          uStack_4dc8 = uVar62;
          local_4d80 = uVar55;
          uStack_4d78 = uVar56;
          uStack_4d70 = uVar57;
          uStack_4d68 = uVar58;
          local_4d20 = uVar51;
          uStack_4d18 = uVar52;
          uStack_4d10 = uVar53;
          uStack_4d08 = uVar54;
          local_4cc0 = uVar47;
          uStack_4cb8 = uVar48;
          uStack_4cb0 = uVar49;
          uStack_4ca8 = uVar50;
          local_4c60 = uVar43;
          uStack_4c58 = uVar44;
          uStack_4c50 = uVar45;
          uStack_4c48 = uVar46;
          local_4c00 = uVar39;
          uStack_4bf8 = uVar40;
          uStack_4bf0 = uVar41;
          uStack_4be8 = uVar42;
          local_4ba0 = uVar35;
          uStack_4b98 = uVar36;
          uStack_4b90 = uVar37;
          uStack_4b88 = uVar38;
          local_4b40 = uVar31;
          uStack_4b38 = uVar32;
          uStack_4b30 = uVar33;
          uStack_4b28 = uVar34;
          local_4ae0 = uVar27;
          uStack_4ad8 = uVar28;
          uStack_4ad0 = uVar29;
          uStack_4ac8 = uVar30;
          local_4a80 = uVar23;
          uStack_4a78 = uVar24;
          uStack_4a70 = uVar25;
          uStack_4a68 = uVar26;
          local_4a20 = uVar19;
          uStack_4a18 = uVar20;
          uStack_4a10 = uVar21;
          uStack_4a08 = uVar22;
          local_49c0 = uVar15;
          uStack_49b8 = uVar16;
          uStack_49b0 = uVar17;
          uStack_49a8 = uVar18;
          local_4960 = uVar11;
          uStack_4958 = uVar12;
          uStack_4950 = uVar13;
          uStack_4948 = uVar14;
          local_4900 = uVar7;
          uStack_48f8 = uVar8;
          uStack_48f0 = uVar9;
          uStack_48e8 = uVar10;
          local_48a0 = uVar3;
          uStack_4898 = uVar4;
          uStack_4890 = uVar5;
          uStack_4888 = uVar6;
          local_2080 = local_48c0;
          uStack_2078 = uStack_48b8;
          uStack_2070 = uStack_48b0;
          uStack_2068 = uStack_48a8;
          local_2040 = local_4920;
          uStack_2038 = uStack_4918;
          uStack_2030 = uStack_4910;
          uStack_2028 = uStack_4908;
          local_2000 = local_4980;
          uStack_1ff8 = uStack_4978;
          uStack_1ff0 = uStack_4970;
          uStack_1fe8 = uStack_4968;
          local_1fc0 = local_49e0;
          uStack_1fb8 = uStack_49d8;
          uStack_1fb0 = uStack_49d0;
          uStack_1fa8 = uStack_49c8;
          local_1f80 = local_4a40;
          uStack_1f78 = uStack_4a38;
          uStack_1f70 = uStack_4a30;
          uStack_1f68 = uStack_4a28;
          local_1f40 = local_4aa0;
          uStack_1f38 = uStack_4a98;
          uStack_1f30 = uStack_4a90;
          uStack_1f28 = uStack_4a88;
          local_1f00 = local_4b00;
          uStack_1ef8 = uStack_4af8;
          uStack_1ef0 = uStack_4af0;
          uStack_1ee8 = uStack_4ae8;
          local_1ec0 = local_4b60;
          uStack_1eb8 = uStack_4b58;
          uStack_1eb0 = uStack_4b50;
          uStack_1ea8 = uStack_4b48;
          local_1e80 = local_4bc0;
          uStack_1e78 = uStack_4bb8;
          uStack_1e70 = uStack_4bb0;
          uStack_1e68 = uStack_4ba8;
          local_1e40 = local_4c20;
          uStack_1e38 = uStack_4c18;
          uStack_1e30 = uStack_4c10;
          uStack_1e28 = uStack_4c08;
          local_1e00 = local_4c80;
          uStack_1df8 = uStack_4c78;
          uStack_1df0 = uStack_4c70;
          uStack_1de8 = uStack_4c68;
          local_1dc0 = local_4ce0;
          uStack_1db8 = uStack_4cd8;
          uStack_1db0 = uStack_4cd0;
          uStack_1da8 = uStack_4cc8;
          local_1d80 = local_4d40;
          uStack_1d78 = uStack_4d38;
          uStack_1d70 = uStack_4d30;
          uStack_1d68 = uStack_4d28;
          local_1d40 = local_4da0;
          uStack_1d38 = uStack_4d98;
          uStack_1d30 = uStack_4d90;
          uStack_1d28 = uStack_4d88;
          local_1d00 = local_4e00;
          uStack_1cf8 = uStack_4df8;
          uStack_1cf0 = uStack_4df0;
          uStack_1ce8 = uStack_4de8;
          local_1cc0 = local_4e60;
          uStack_1cb8 = uStack_4e58;
          uStack_1cb0 = uStack_4e50;
          uStack_1ca8 = uStack_4e48;
          local_1c80 = local_4ec0;
          uStack_1c78 = uStack_4eb8;
          uStack_1c70 = uStack_4eb0;
          uStack_1c68 = uStack_4ea8;
          local_1c40 = local_4f20;
          uStack_1c38 = uStack_4f18;
          uStack_1c30 = uStack_4f10;
          uStack_1c28 = uStack_4f08;
          local_1c00 = local_4f80;
          uStack_1bf8 = uStack_4f78;
          uStack_1bf0 = uStack_4f70;
          uStack_1be8 = uStack_4f68;
          local_1bc0 = local_4fe0;
          uStack_1bb8 = uStack_4fd8;
          uStack_1bb0 = uStack_4fd0;
          uStack_1ba8 = uStack_4fc8;
          local_1b80 = local_5040;
          uStack_1b78 = uStack_5038;
          uStack_1b70 = uStack_5030;
          uStack_1b68 = uStack_5028;
          local_1b40 = local_50a0;
          uStack_1b38 = uStack_5098;
          uStack_1b30 = uStack_5090;
          uStack_1b28 = uStack_5088;
          local_1b00 = local_5100;
          uStack_1af8 = uStack_50f8;
          uStack_1af0 = uStack_50f0;
          uStack_1ae8 = uStack_50e8;
          local_1ac0 = local_5160;
          uStack_1ab8 = uStack_5158;
          uStack_1ab0 = uStack_5150;
          uStack_1aa8 = uStack_5148;
          local_1a80 = local_51c0;
          uStack_1a78 = uStack_51b8;
          uStack_1a70 = uStack_51b0;
          uStack_1a68 = uStack_51a8;
          local_1a40 = local_5220;
          uStack_1a38 = uStack_5218;
          uStack_1a30 = uStack_5210;
          uStack_1a28 = uStack_5208;
          local_1a00 = local_5280;
          uStack_19f8 = uStack_5278;
          uStack_19f0 = uStack_5270;
          uStack_19e8 = uStack_5268;
          local_19c0 = local_52e0;
          uStack_19b8 = uStack_52d8;
          uStack_19b0 = uStack_52d0;
          uStack_19a8 = uStack_52c8;
          local_1980 = local_5340;
          uStack_1978 = uStack_5338;
          uStack_1970 = uStack_5330;
          uStack_1968 = uStack_5328;
          local_1940 = local_53a0;
          uStack_1938 = uStack_5398;
          uStack_1930 = uStack_5390;
          uStack_1928 = uStack_5388;
          local_1900 = local_5400;
          uStack_18f8 = uStack_53f8;
          uStack_18f0 = uStack_53f0;
          uStack_18e8 = uStack_53e8;
          local_18c0 = local_5460;
          uStack_18b8 = uStack_5458;
          uStack_18b0 = uStack_5450;
          uStack_18a8 = uStack_5448;
          local_880 = local_48e0;
          uStack_878 = uStack_48d8;
          uStack_870 = uStack_48d0;
          uStack_868 = uStack_48c8;
          fStack_844 = fStack_2044;
          local_840 = local_4940;
          uStack_838 = uStack_4938;
          uStack_830 = uStack_4930;
          uStack_828 = uStack_4928;
          fStack_804 = fStack_2004;
          local_800 = local_49a0;
          uStack_7f8 = uStack_4998;
          uStack_7f0 = uStack_4990;
          uStack_7e8 = uStack_4988;
          fStack_7c4 = fStack_1fc4;
          local_7c0 = local_4a00;
          uStack_7b8 = uStack_49f8;
          uStack_7b0 = uStack_49f0;
          uStack_7a8 = uStack_49e8;
          fStack_784 = fStack_1f84;
          local_780 = local_4a60;
          uStack_778 = uStack_4a58;
          uStack_770 = uStack_4a50;
          uStack_768 = uStack_4a48;
          fStack_744 = fStack_1f44;
          local_740 = local_4ac0;
          uStack_738 = uStack_4ab8;
          uStack_730 = uStack_4ab0;
          uStack_728 = uStack_4aa8;
          fStack_704 = fStack_1f04;
          local_700 = local_4b20;
          uStack_6f8 = uStack_4b18;
          uStack_6f0 = uStack_4b10;
          uStack_6e8 = uStack_4b08;
          fStack_6c4 = fStack_1ec4;
          local_6c0 = local_4b80;
          uStack_6b8 = uStack_4b78;
          uStack_6b0 = uStack_4b70;
          uStack_6a8 = uStack_4b68;
          fStack_684 = fStack_1e84;
          local_680 = local_4be0;
          uStack_678 = uStack_4bd8;
          uStack_670 = uStack_4bd0;
          uStack_668 = uStack_4bc8;
          fStack_644 = fStack_1e44;
          local_640 = local_4c40;
          uStack_638 = uStack_4c38;
          uStack_630 = uStack_4c30;
          uStack_628 = uStack_4c28;
          fStack_604 = fStack_1e04;
          local_600 = local_4ca0;
          uStack_5f8 = uStack_4c98;
          uStack_5f0 = uStack_4c90;
          uStack_5e8 = uStack_4c88;
          fStack_5c4 = fStack_1dc4;
          local_5c0 = local_4d00;
          uStack_5b8 = uStack_4cf8;
          uStack_5b0 = uStack_4cf0;
          uStack_5a8 = uStack_4ce8;
          fStack_584 = fStack_1d84;
          local_580 = local_4d60;
          uStack_578 = uStack_4d58;
          uStack_570 = uStack_4d50;
          uStack_568 = uStack_4d48;
          fStack_544 = fStack_1d44;
          local_540 = local_4dc0;
          uStack_538 = uStack_4db8;
          uStack_530 = uStack_4db0;
          uStack_528 = uStack_4da8;
          fStack_504 = fStack_1d04;
          local_500 = local_4e20;
          uStack_4f8 = uStack_4e18;
          uStack_4f0 = uStack_4e10;
          uStack_4e8 = uStack_4e08;
          fStack_4c4 = fStack_1cc4;
          local_4c0 = local_4e80;
          uStack_4b8 = uStack_4e78;
          uStack_4b0 = uStack_4e70;
          uStack_4a8 = uStack_4e68;
          fStack_484 = fStack_1c84;
          local_480 = local_4ee0;
          uStack_478 = uStack_4ed8;
          uStack_470 = uStack_4ed0;
          uStack_468 = uStack_4ec8;
          fStack_444 = fStack_1c44;
          local_440 = local_4f40;
          uStack_438 = uStack_4f38;
          uStack_430 = uStack_4f30;
          uStack_428 = uStack_4f28;
          fStack_404 = fStack_1c04;
          local_400 = local_4fa0;
          uStack_3f8 = uStack_4f98;
          uStack_3f0 = uStack_4f90;
          uStack_3e8 = uStack_4f88;
          fStack_3c4 = fStack_1bc4;
          local_3c0 = local_5000;
          uStack_3b8 = uStack_4ff8;
          uStack_3b0 = uStack_4ff0;
          uStack_3a8 = uStack_4fe8;
          fStack_384 = fStack_1b84;
          local_380 = local_5060;
          uStack_378 = uStack_5058;
          uStack_370 = uStack_5050;
          uStack_368 = uStack_5048;
          fStack_344 = fStack_1b44;
          local_340 = local_50c0;
          uStack_338 = uStack_50b8;
          uStack_330 = uStack_50b0;
          uStack_328 = uStack_50a8;
          fStack_304 = fStack_1b04;
          local_300 = local_5120;
          uStack_2f8 = uStack_5118;
          uStack_2f0 = uStack_5110;
          uStack_2e8 = uStack_5108;
          fStack_2c4 = fStack_1ac4;
          local_2c0 = local_5180;
          uStack_2b8 = uStack_5178;
          uStack_2b0 = uStack_5170;
          uStack_2a8 = uStack_5168;
          fStack_284 = fStack_1a84;
          local_280 = local_51e0;
          uStack_278 = uStack_51d8;
          uStack_270 = uStack_51d0;
          uStack_268 = uStack_51c8;
          fStack_244 = fStack_1a44;
          local_240 = local_5240;
          uStack_238 = uStack_5238;
          uStack_230 = uStack_5230;
          uStack_228 = uStack_5228;
          fStack_204 = fStack_1a04;
          local_200 = local_52a0;
          uStack_1f8 = uStack_5298;
          uStack_1f0 = uStack_5290;
          uStack_1e8 = uStack_5288;
          fStack_1c4 = fStack_19c4;
          local_1c0 = local_5300;
          uStack_1b8 = uStack_52f8;
          uStack_1b0 = uStack_52f0;
          uStack_1a8 = uStack_52e8;
          fStack_184 = fStack_1984;
          local_180 = local_5360;
          uStack_178 = uStack_5358;
          uStack_170 = uStack_5350;
          uStack_168 = uStack_5348;
          fStack_144 = fStack_1944;
          local_140 = local_53c0;
          uStack_138 = uStack_53b8;
          uStack_130 = uStack_53b0;
          uStack_128 = uStack_53a8;
          fStack_104 = fStack_1904;
          local_100 = local_5420;
          uStack_f8 = uStack_5418;
          uStack_f0 = uStack_5410;
          uStack_e8 = uStack_5408;
          fStack_c4 = fStack_18c4;
          local_c0 = local_5480;
          uStack_b8 = uStack_5478;
          uStack_b0 = uStack_5470;
          uStack_a8 = uStack_5468;
          fStack_84 = fStack_1884;
        }
        local_6c88 = local_6c88 + 8;
        local_6c90 = local_6c90 + 8;
      }
      local_6c98 = pfVar133;
      Mat::~Mat((Mat *)0x30cb3c);
    }
    Mat::~Mat((Mat *)0x30cb71);
  }
  return;
}

Assistant:

static void conv2x2s1_pack8_avx(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int inch = bottom_blob.c;
    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;
    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        Mat out0 = top_blob.channel(p);

        __m256 _bias0 = bias ? _mm256_loadu_ps((const float*)bias + p * 8) : _mm256_set1_ps(0.f);
        out0.fill(_bias0);

        for (int q = 0; q < inch; q++)
        {
            float* outptr0 = out0.row(0);

            const Mat img0 = bottom_blob.channel(q);

            const float* r0 = img0.row(0);
            const float* r1 = img0.row(1);

            const float* kptr = (const float*)kernel.channel(p).row(q);
            // const float* kptr = (const float*)kernel + 4 * inch * p * 64;

            int i = 0;
            for (; i < outh; i++)
            {
                int j = 0;

                for (; j + 1 < outw; j += 2)
                {
                    __m256 _sum0 = _mm256_loadu_ps(outptr0);
                    __m256 _sum1 = _mm256_loadu_ps(outptr0 + 8);

                    __m256 _r00 = _mm256_broadcast_ss(r0);
                    __m256 _r01 = _mm256_broadcast_ss(r0 + 1);
                    __m256 _r02 = _mm256_broadcast_ss(r0 + 2);
                    __m256 _r03 = _mm256_broadcast_ss(r0 + 3);
                    __m256 _r04 = _mm256_broadcast_ss(r0 + 4);
                    __m256 _r05 = _mm256_broadcast_ss(r0 + 5);
                    __m256 _r06 = _mm256_broadcast_ss(r0 + 6);
                    __m256 _r07 = _mm256_broadcast_ss(r0 + 7);
                    r0 += 8;

                    __m256 _k00 = _mm256_loadu_ps(kptr);
                    __m256 _k01 = _mm256_loadu_ps(kptr + 8);
                    __m256 _k02 = _mm256_loadu_ps(kptr + 16);
                    __m256 _k03 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k03, _r03, _sum0);

                    __m256 _k04 = _mm256_loadu_ps(kptr);
                    __m256 _k05 = _mm256_loadu_ps(kptr + 8);
                    __m256 _k06 = _mm256_loadu_ps(kptr + 16);
                    __m256 _k07 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum0 = _mm256_comp_fmadd_ps(_k04, _r04, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k05, _r05, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k06, _r06, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k07, _r07, _sum0);

                    //========================================

                    _r00 = _mm256_broadcast_ss(r0);
                    _r01 = _mm256_broadcast_ss(r0 + 1);
                    _r02 = _mm256_broadcast_ss(r0 + 2);
                    _r03 = _mm256_broadcast_ss(r0 + 3);
                    _r04 = _mm256_broadcast_ss(r0 + 4);
                    _r05 = _mm256_broadcast_ss(r0 + 5);
                    _r06 = _mm256_broadcast_ss(r0 + 6);
                    _r07 = _mm256_broadcast_ss(r0 + 7);
                    r0 += 8;

                    _sum1 = _mm256_comp_fmadd_ps(_k00, _r00, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k01, _r01, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k02, _r02, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k03, _r03, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k04, _r04, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k05, _r05, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k06, _r06, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k07, _r07, _sum1);

                    _k00 = _mm256_loadu_ps(kptr);
                    _k01 = _mm256_loadu_ps(kptr + 8);
                    _k02 = _mm256_loadu_ps(kptr + 16);
                    _k03 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k03, _r03, _sum0);

                    _k04 = _mm256_loadu_ps(kptr);
                    _k05 = _mm256_loadu_ps(kptr + 8);
                    _k06 = _mm256_loadu_ps(kptr + 16);
                    _k07 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum0 = _mm256_comp_fmadd_ps(_k04, _r04, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k05, _r05, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k06, _r06, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k07, _r07, _sum0);

                    _r00 = _mm256_broadcast_ss(r0);
                    _r01 = _mm256_broadcast_ss(r0 + 1);
                    _r02 = _mm256_broadcast_ss(r0 + 2);
                    _r03 = _mm256_broadcast_ss(r0 + 3);
                    _r04 = _mm256_broadcast_ss(r0 + 4);
                    _r05 = _mm256_broadcast_ss(r0 + 5);
                    _r06 = _mm256_broadcast_ss(r0 + 6);
                    _r07 = _mm256_broadcast_ss(r0 + 7);

                    _sum1 = _mm256_comp_fmadd_ps(_k00, _r00, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k01, _r01, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k02, _r02, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k03, _r03, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k04, _r04, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k05, _r05, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k06, _r06, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k07, _r07, _sum1);
                    //===============

                    __m256 _r10 = _mm256_broadcast_ss(r1);
                    __m256 _r11 = _mm256_broadcast_ss(r1 + 1);
                    __m256 _r12 = _mm256_broadcast_ss(r1 + 2);
                    __m256 _r13 = _mm256_broadcast_ss(r1 + 3);
                    __m256 _r14 = _mm256_broadcast_ss(r1 + 4);
                    __m256 _r15 = _mm256_broadcast_ss(r1 + 5);
                    __m256 _r16 = _mm256_broadcast_ss(r1 + 6);
                    __m256 _r17 = _mm256_broadcast_ss(r1 + 7);

                    __m256 _k10 = _mm256_loadu_ps(kptr);
                    __m256 _k11 = _mm256_loadu_ps(kptr + 8);
                    __m256 _k12 = _mm256_loadu_ps(kptr + 16);
                    __m256 _k13 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k13, _r13, _sum0);

                    __m256 _k14 = _mm256_loadu_ps(kptr);
                    __m256 _k15 = _mm256_loadu_ps(kptr + 8);
                    __m256 _k16 = _mm256_loadu_ps(kptr + 16);
                    __m256 _k17 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum0 = _mm256_comp_fmadd_ps(_k14, _r14, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k15, _r15, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k16, _r16, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k17, _r17, _sum0);

                    //=======================================
                    r1 += 8;
                    _r10 = _mm256_broadcast_ss(r1);
                    _r11 = _mm256_broadcast_ss(r1 + 1);
                    _r12 = _mm256_broadcast_ss(r1 + 2);
                    _r13 = _mm256_broadcast_ss(r1 + 3);
                    _r14 = _mm256_broadcast_ss(r1 + 4);
                    _r15 = _mm256_broadcast_ss(r1 + 5);
                    _r16 = _mm256_broadcast_ss(r1 + 6);
                    _r17 = _mm256_broadcast_ss(r1 + 7);

                    _sum1 = _mm256_comp_fmadd_ps(_k10, _r10, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k11, _r11, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k12, _r12, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k13, _r13, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k14, _r14, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k15, _r15, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k16, _r16, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k17, _r17, _sum1);

                    _k10 = _mm256_loadu_ps(kptr);
                    _k11 = _mm256_loadu_ps(kptr + 8);
                    _k12 = _mm256_loadu_ps(kptr + 16);
                    _k13 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k13, _r13, _sum0);

                    _k14 = _mm256_loadu_ps(kptr);
                    _k15 = _mm256_loadu_ps(kptr + 8);
                    _k16 = _mm256_loadu_ps(kptr + 16);
                    _k17 = _mm256_loadu_ps(kptr + 24);
                    _sum0 = _mm256_comp_fmadd_ps(_k14, _r14, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k15, _r15, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k16, _r16, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k17, _r17, _sum0);

                    r1 += 8;
                    _r10 = _mm256_broadcast_ss(r1);
                    _r11 = _mm256_broadcast_ss(r1 + 1);
                    _r12 = _mm256_broadcast_ss(r1 + 2);
                    _r13 = _mm256_broadcast_ss(r1 + 3);
                    _r14 = _mm256_broadcast_ss(r1 + 4);
                    _r15 = _mm256_broadcast_ss(r1 + 5);
                    _r16 = _mm256_broadcast_ss(r1 + 6);
                    _r17 = _mm256_broadcast_ss(r1 + 7);

                    _sum1 = _mm256_comp_fmadd_ps(_k10, _r10, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k11, _r11, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k12, _r12, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k13, _r13, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k14, _r14, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k15, _r15, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k16, _r16, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k17, _r17, _sum1);

                    kptr -= 224;
                    _mm256_storeu_ps(outptr0, _sum0);
                    _mm256_storeu_ps(outptr0 + 8, _sum1);
                    outptr0 += 16;
                }

                for (; j < outw; j++)
                {
                    __m256 _sum = _mm256_loadu_ps(outptr0);

                    __m256 _r00 = _mm256_broadcast_ss(r0);
                    __m256 _r01 = _mm256_broadcast_ss(r0 + 1);
                    __m256 _r02 = _mm256_broadcast_ss(r0 + 2);
                    __m256 _r03 = _mm256_broadcast_ss(r0 + 3);
                    __m256 _r04 = _mm256_broadcast_ss(r0 + 4);
                    __m256 _r05 = _mm256_broadcast_ss(r0 + 5);
                    __m256 _r06 = _mm256_broadcast_ss(r0 + 6);
                    __m256 _r07 = _mm256_broadcast_ss(r0 + 7);

                    __m256 _k00 = _mm256_loadu_ps(kptr);
                    __m256 _k01 = _mm256_loadu_ps(kptr + 8);
                    __m256 _k02 = _mm256_loadu_ps(kptr + 16);
                    __m256 _k03 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum = _mm256_comp_fmadd_ps(_k00, _r00, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k01, _r01, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k02, _r02, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k03, _r03, _sum);

                    __m256 _k04 = _mm256_loadu_ps(kptr);
                    __m256 _k05 = _mm256_loadu_ps(kptr + 8);
                    __m256 _k06 = _mm256_loadu_ps(kptr + 16);
                    __m256 _k07 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum = _mm256_comp_fmadd_ps(_k04, _r04, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k05, _r05, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k06, _r06, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k07, _r07, _sum);

                    //========================================
                    r0 += 8;
                    _r00 = _mm256_broadcast_ss(r0);
                    _r01 = _mm256_broadcast_ss(r0 + 1);
                    _r02 = _mm256_broadcast_ss(r0 + 2);
                    _r03 = _mm256_broadcast_ss(r0 + 3);
                    _r04 = _mm256_broadcast_ss(r0 + 4);
                    _r05 = _mm256_broadcast_ss(r0 + 5);
                    _r06 = _mm256_broadcast_ss(r0 + 6);
                    _r07 = _mm256_broadcast_ss(r0 + 7);

                    _k00 = _mm256_loadu_ps(kptr);
                    _k01 = _mm256_loadu_ps(kptr + 8);
                    _k02 = _mm256_loadu_ps(kptr + 16);
                    _k03 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum = _mm256_comp_fmadd_ps(_k00, _r00, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k01, _r01, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k02, _r02, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k03, _r03, _sum);

                    _k04 = _mm256_loadu_ps(kptr);
                    _k05 = _mm256_loadu_ps(kptr + 8);
                    _k06 = _mm256_loadu_ps(kptr + 16);
                    _k07 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum = _mm256_comp_fmadd_ps(_k04, _r04, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k05, _r05, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k06, _r06, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k07, _r07, _sum);
                    //===============

                    __m256 _r10 = _mm256_broadcast_ss(r1);
                    __m256 _r11 = _mm256_broadcast_ss(r1 + 1);
                    __m256 _r12 = _mm256_broadcast_ss(r1 + 2);
                    __m256 _r13 = _mm256_broadcast_ss(r1 + 3);
                    __m256 _r14 = _mm256_broadcast_ss(r1 + 4);
                    __m256 _r15 = _mm256_broadcast_ss(r1 + 5);
                    __m256 _r16 = _mm256_broadcast_ss(r1 + 6);
                    __m256 _r17 = _mm256_broadcast_ss(r1 + 7);

                    __m256 _k10 = _mm256_loadu_ps(kptr);
                    __m256 _k11 = _mm256_loadu_ps(kptr + 8);
                    __m256 _k12 = _mm256_loadu_ps(kptr + 16);
                    __m256 _k13 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum = _mm256_comp_fmadd_ps(_k10, _r10, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k11, _r11, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k12, _r12, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k13, _r13, _sum);

                    __m256 _k14 = _mm256_loadu_ps(kptr);
                    __m256 _k15 = _mm256_loadu_ps(kptr + 8);
                    __m256 _k16 = _mm256_loadu_ps(kptr + 16);
                    __m256 _k17 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum = _mm256_comp_fmadd_ps(_k14, _r14, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k15, _r15, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k16, _r16, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k17, _r17, _sum);

                    //=======================================
                    r1 += 8;
                    _r10 = _mm256_broadcast_ss(r1);
                    _r11 = _mm256_broadcast_ss(r1 + 1);
                    _r12 = _mm256_broadcast_ss(r1 + 2);
                    _r13 = _mm256_broadcast_ss(r1 + 3);
                    _r14 = _mm256_broadcast_ss(r1 + 4);
                    _r15 = _mm256_broadcast_ss(r1 + 5);
                    _r16 = _mm256_broadcast_ss(r1 + 6);
                    _r17 = _mm256_broadcast_ss(r1 + 7);

                    _k10 = _mm256_loadu_ps(kptr);
                    _k11 = _mm256_loadu_ps(kptr + 8);
                    _k12 = _mm256_loadu_ps(kptr + 16);
                    _k13 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum = _mm256_comp_fmadd_ps(_k10, _r10, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k11, _r11, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k12, _r12, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k13, _r13, _sum);

                    _k14 = _mm256_loadu_ps(kptr);
                    _k15 = _mm256_loadu_ps(kptr + 8);
                    _k16 = _mm256_loadu_ps(kptr + 16);
                    _k17 = _mm256_loadu_ps(kptr + 24);
                    _sum = _mm256_comp_fmadd_ps(_k14, _r14, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k15, _r15, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k16, _r16, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k17, _r17, _sum);

                    kptr -= 224;
                    _mm256_storeu_ps(outptr0, _sum);
                    outptr0 += 8;
                }

                r0 += 8;
                r1 += 8;
            }
        }
    }
}